

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx2.cpp
# Opt level: O1

int __thiscall
ncnn::BinaryOp_x86_avx2::forward
          (BinaryOp_x86_avx2 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  pointer pMVar1;
  float *pfVar2;
  undefined8 *puVar3;
  undefined4 uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  pointer pMVar8;
  Mat *pMVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar43 [8];
  int iVar44;
  void *pvVar45;
  int iVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  uint uVar50;
  undefined1 (*pauVar51) [32];
  undefined1 (*pauVar52) [16];
  int iVar53;
  undefined1 auVar54 [8];
  undefined8 *puVar55;
  undefined1 (*pauVar56) [32];
  undefined1 (*pauVar57) [16];
  undefined1 (*pauVar58) [32];
  undefined1 (*pauVar59) [16];
  void *pvVar60;
  float *pfVar61;
  float *pfVar62;
  long lVar63;
  ulong uVar64;
  void *pvVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  ulong uVar70;
  __m256 *pafVar71;
  __m256 *pafVar72;
  __m256 *pafVar73;
  undefined1 auVar74 [8];
  long lVar75;
  long lVar76;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined8 uVar203;
  undefined1 auVar136 [32];
  undefined8 uVar200;
  undefined1 auVar77 [16];
  undefined8 uVar201;
  undefined8 uVar204;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar92 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar129 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar130 [16];
  undefined1 auVar186 [32];
  undefined1 auVar188 [32];
  undefined1 auVar202 [56];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  __m256 afVar187;
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar205;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [16];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar301 [32];
  undefined1 auVar273 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar302 [64];
  undefined1 auVar303 [64];
  undefined1 auVar304 [64];
  undefined1 auVar305 [64];
  undefined1 auVar306 [64];
  undefined1 auVar307 [64];
  undefined1 auVar308 [64];
  undefined1 auVar310 [64];
  undefined1 auVar311 [64];
  undefined1 auVar312 [64];
  undefined1 auVar313 [64];
  undefined1 auVar314 [64];
  undefined1 auVar315 [64];
  undefined1 auVar316 [64];
  undefined1 auVar317 [64];
  undefined1 auVar318 [64];
  undefined1 auVar319 [64];
  undefined1 auVar320 [64];
  undefined1 auVar321 [64];
  undefined1 auVar322 [64];
  undefined1 auVar323 [64];
  undefined1 auVar324 [64];
  undefined1 auVar325 [64];
  undefined1 auVar326 [64];
  undefined1 auVar327 [64];
  undefined1 auVar328 [64];
  undefined1 auVar329 [64];
  __m128 afVar330;
  binary_op_pow_pack8 op;
  __m256 _b0;
  __m256 _p;
  __m256 *local_140;
  binary_op_pow_pack8 local_131;
  void *local_130;
  undefined8 local_128;
  pointer local_120;
  ulong local_118;
  pointer local_110;
  Mat *local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  __m256 local_80;
  ulong local_60;
  undefined1 auVar309 [64];
  
  pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pMVar1 = pMVar8 + 1;
  pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar44 = pMVar8->elempack;
  iVar46 = pMVar8[1].elempack;
  local_120 = pMVar8;
  local_110 = pMVar1;
  local_108 = pMVar9;
  if (iVar46 == 8 || iVar44 == 8) {
    switch(*(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86_avx2[-3])) {
    case 0:
      uVar69 = pMVar8->w;
      uVar48 = (ulong)uVar69;
      sVar10 = pMVar8->elemsize;
      uVar68 = pMVar8[1].w;
      uVar49 = (ulong)uVar68;
      uVar67 = pMVar8[1].h;
      uVar66 = pMVar8[1].c;
      uVar47 = (ulong)uVar66;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar67 * uVar68);
      local_f0 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar44 == 1 && uVar69 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar68,local_f0,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar68) {
                fVar205 = *pMVar8->data;
                pvVar60 = pMVar1->data;
                lVar63 = 0;
                do {
                  pfVar61 = (float *)((long)pvVar60 + lVar63);
                  fVar30 = pfVar61[1];
                  fVar31 = pfVar61[2];
                  fVar32 = pfVar61[3];
                  fVar33 = pfVar61[4];
                  fVar34 = pfVar61[5];
                  fVar35 = pfVar61[6];
                  fVar36 = pfVar61[7];
                  pfVar62 = (float *)((long)pvVar45 + lVar63);
                  *pfVar62 = fVar205 + *pfVar61;
                  pfVar62[1] = fVar205 + fVar30;
                  pfVar62[2] = fVar205 + fVar31;
                  pfVar62[3] = fVar205 + fVar32;
                  pfVar62[4] = fVar205 + fVar33;
                  pfVar62[5] = fVar205 + fVar34;
                  pfVar62[6] = fVar205 + fVar35;
                  pfVar62[7] = fVar205 + fVar36;
                  lVar63 = lVar63 + 0x20;
                  uVar69 = (int)uVar49 - 1;
                  uVar49 = (ulong)uVar69;
                } while (uVar69 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar68,uVar67,local_f0,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)local_130) {
                fVar205 = *pMVar8->data;
                pvVar60 = pMVar1->data;
                lVar63 = 0;
                do {
                  pfVar61 = (float *)((long)pvVar60 + lVar63);
                  fVar30 = pfVar61[1];
                  fVar31 = pfVar61[2];
                  fVar32 = pfVar61[3];
                  fVar33 = pfVar61[4];
                  fVar34 = pfVar61[5];
                  fVar35 = pfVar61[6];
                  fVar36 = pfVar61[7];
                  pfVar62 = (float *)((long)pvVar45 + lVar63);
                  *pfVar62 = fVar205 + *pfVar61;
                  pfVar62[1] = fVar205 + fVar30;
                  pfVar62[2] = fVar205 + fVar31;
                  pfVar62[3] = fVar205 + fVar32;
                  pfVar62[4] = fVar205 + fVar33;
                  pfVar62[5] = fVar205 + fVar34;
                  pfVar62[6] = fVar205 + fVar35;
                  pfVar62[7] = fVar205 + fVar36;
                  lVar63 = lVar63 + 0x20;
                  local_130._0_4_ = (int)local_130 + -1;
                } while ((int)local_130 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar66) {
                fVar205 = *pMVar8->data;
                uVar48 = 0;
                do {
                  if (0 < (int)local_130) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar45 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar60 = pMVar8[1].data;
                    lVar63 = 0;
                    iVar44 = (int)local_130;
                    do {
                      pfVar61 = (float *)((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48);
                      auVar237._0_4_ = fVar205 + *pfVar61;
                      auVar237._4_4_ = fVar205 + pfVar61[1];
                      auVar237._8_4_ = fVar205 + pfVar61[2];
                      auVar237._12_4_ = fVar205 + pfVar61[3];
                      auVar237._16_4_ = fVar205 + pfVar61[4];
                      auVar237._20_4_ = fVar205 + pfVar61[5];
                      auVar237._24_4_ = fVar205 + pfVar61[6];
                      auVar237._28_4_ = fVar205 + pfVar61[7];
                      *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) =
                           auVar237;
                      lVar63 = lVar63 + 0x20;
                      iVar44 = iVar44 + -1;
                    } while (iVar44 != 0);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar47);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar69,sVar10,iVar44,opt->blob_allocator);
          pvVar45 = pMVar9->data;
          if (pvVar45 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar46 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar69) {
              pvVar60 = pMVar8->data;
              pvVar65 = pMVar8[1].data;
              lVar63 = 0;
              do {
                pfVar61 = (float *)((long)pvVar65 + lVar63);
                fVar205 = pfVar61[1];
                fVar30 = pfVar61[2];
                fVar31 = pfVar61[3];
                fVar32 = pfVar61[4];
                fVar33 = pfVar61[5];
                fVar34 = pfVar61[6];
                fVar35 = pfVar61[7];
                pfVar62 = (float *)((long)pvVar60 + lVar63);
                fVar36 = pfVar62[1];
                fVar37 = pfVar62[2];
                fVar38 = pfVar62[3];
                fVar39 = pfVar62[4];
                fVar40 = pfVar62[5];
                fVar41 = pfVar62[6];
                fVar42 = pfVar62[7];
                pfVar2 = (float *)((long)pvVar45 + lVar63);
                *pfVar2 = *pfVar61 + *pfVar62;
                pfVar2[1] = fVar205 + fVar36;
                pfVar2[2] = fVar30 + fVar37;
                pfVar2[3] = fVar31 + fVar38;
                pfVar2[4] = fVar32 + fVar39;
                pfVar2[5] = fVar33 + fVar40;
                pfVar2[6] = fVar34 + fVar41;
                pfVar2[7] = fVar35 + fVar42;
                lVar63 = lVar63 + 0x20;
                uVar69 = (int)uVar48 - 1;
                uVar48 = (ulong)uVar69;
              } while (uVar69 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar69) {
            fVar205 = *local_110->data;
            pvVar60 = pMVar8->data;
            lVar63 = 0;
            do {
              pfVar61 = (float *)((long)pvVar60 + lVar63);
              fVar30 = pfVar61[1];
              fVar31 = pfVar61[2];
              fVar32 = pfVar61[3];
              fVar33 = pfVar61[4];
              fVar34 = pfVar61[5];
              fVar35 = pfVar61[6];
              fVar36 = pfVar61[7];
              pfVar62 = (float *)((long)pvVar45 + lVar63);
              *pfVar62 = fVar205 + *pfVar61;
              pfVar62[1] = fVar205 + fVar30;
              pfVar62[2] = fVar205 + fVar31;
              pfVar62[3] = fVar205 + fVar32;
              pfVar62[4] = fVar205 + fVar33;
              pfVar62[5] = fVar205 + fVar34;
              pfVar62[6] = fVar205 + fVar35;
              pfVar62[7] = fVar205 + fVar36;
              lVar63 = lVar63 + 0x20;
              uVar69 = (int)uVar48 - 1;
              uVar48 = (ulong)uVar69;
            } while (uVar69 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar68,uVar67,local_f0,iVar46,opt->blob_allocator);
          pauVar51 = (undefined1 (*) [32])pMVar9->data;
          if (pauVar51 == (undefined1 (*) [32])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar67) {
              pauVar58 = (undefined1 (*) [32])pMVar8->data;
              pfVar61 = (float *)pMVar8[1].data;
              uVar69 = 0;
              do {
                if (0 < (int)uVar68) {
                  auVar141 = *pauVar58;
                  uVar66 = uVar68;
                  do {
                    auVar242._0_4_ = auVar141._0_4_ + *pfVar61;
                    auVar242._4_4_ = auVar141._4_4_ + pfVar61[1];
                    auVar242._8_4_ = auVar141._8_4_ + pfVar61[2];
                    auVar242._12_4_ = auVar141._12_4_ + pfVar61[3];
                    auVar242._16_4_ = auVar141._16_4_ + pfVar61[4];
                    auVar242._20_4_ = auVar141._20_4_ + pfVar61[5];
                    auVar242._24_4_ = auVar141._24_4_ + pfVar61[6];
                    auVar242._28_4_ = auVar141._28_4_ + pfVar61[7];
                    *pauVar51 = auVar242;
                    pfVar61 = pfVar61 + 8;
                    pauVar51 = pauVar51 + 1;
                    uVar66 = uVar66 - 1;
                  } while (uVar66 != 0);
                }
                pauVar58 = pauVar58 + 1;
                uVar69 = uVar69 + 1;
              } while (uVar69 != uVar67);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar66) {
          uVar48 = 0;
          do {
            if (0 < (int)local_130) {
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar9->elemsize;
              auVar141 = *(undefined1 (*) [32])((long)pMVar8->data + uVar48 * 0x20);
              pvVar45 = pMVar9->data;
              sVar12 = pMVar8[1].cstep;
              sVar13 = pMVar8[1].elemsize;
              pvVar60 = pMVar8[1].data;
              lVar63 = 0;
              iVar44 = (int)local_130;
              do {
                pfVar61 = (float *)((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48);
                auVar238._0_4_ = auVar141._0_4_ + *pfVar61;
                auVar238._4_4_ = auVar141._4_4_ + pfVar61[1];
                auVar238._8_4_ = auVar141._8_4_ + pfVar61[2];
                auVar238._12_4_ = auVar141._12_4_ + pfVar61[3];
                auVar238._16_4_ = auVar141._16_4_ + pfVar61[4];
                auVar238._20_4_ = auVar141._20_4_ + pfVar61[5];
                auVar238._24_4_ = auVar141._24_4_ + pfVar61[6];
                auVar238._28_4_ = auVar141._28_4_ + pfVar61[7];
                *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) = auVar238
                ;
                lVar63 = lVar63 + 0x20;
                iVar44 = iVar44 + -1;
              } while (iVar44 != 0);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar47);
          return 0;
        }
        return 0;
      }
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar46);
      uVar6 = pMVar8->h;
      local_118 = CONCAT44(local_118._4_4_,uVar6 * uVar69);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar66) {
              uVar48 = 0;
              do {
                if (0 < (int)uVar67) {
                  pauVar51 = (undefined1 (*) [32])
                             (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                  pfVar61 = (float *)(local_120[1].cstep * uVar48 * local_120[1].elemsize +
                                     (long)local_120[1].data);
                  pauVar58 = (undefined1 (*) [32])
                             ((long)local_120->w * uVar48 * local_120->elemsize +
                             (long)local_120->data);
                  uVar69 = 0;
                  do {
                    if (0 < (int)uVar68) {
                      auVar141 = *pauVar58;
                      uVar66 = uVar68;
                      do {
                        auVar236._0_4_ = auVar141._0_4_ + *pfVar61;
                        auVar236._4_4_ = auVar141._4_4_ + pfVar61[1];
                        auVar236._8_4_ = auVar141._8_4_ + pfVar61[2];
                        auVar236._12_4_ = auVar141._12_4_ + pfVar61[3];
                        auVar236._16_4_ = auVar141._16_4_ + pfVar61[4];
                        auVar236._20_4_ = auVar141._20_4_ + pfVar61[5];
                        auVar236._24_4_ = auVar141._24_4_ + pfVar61[6];
                        auVar236._28_4_ = auVar141._28_4_ + pfVar61[7];
                        *pauVar51 = auVar236;
                        pfVar61 = pfVar61 + 8;
                        pauVar51 = pauVar51 + 1;
                        uVar66 = uVar66 - 1;
                      } while (uVar66 != 0);
                    }
                    pauVar58 = pauVar58 + 1;
                    uVar69 = uVar69 + 1;
                  } while (uVar69 != uVar67);
                }
                uVar48 = uVar48 + 1;
              } while (uVar48 != uVar47);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pvVar45 = pMVar9->data;
        if (pvVar45 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_118) {
            pvVar60 = local_120->data;
            pvVar65 = local_120[1].data;
            lVar63 = 0;
            do {
              pfVar61 = (float *)((long)pvVar65 + lVar63);
              fVar205 = pfVar61[1];
              fVar30 = pfVar61[2];
              fVar31 = pfVar61[3];
              fVar32 = pfVar61[4];
              fVar33 = pfVar61[5];
              fVar34 = pfVar61[6];
              fVar35 = pfVar61[7];
              pfVar62 = (float *)((long)pvVar60 + lVar63);
              fVar36 = pfVar62[1];
              fVar37 = pfVar62[2];
              fVar38 = pfVar62[3];
              fVar39 = pfVar62[4];
              fVar40 = pfVar62[5];
              fVar41 = pfVar62[6];
              fVar42 = pfVar62[7];
              pfVar2 = (float *)((long)pvVar45 + lVar63);
              *pfVar2 = *pfVar61 + *pfVar62;
              pfVar2[1] = fVar205 + fVar36;
              pfVar2[2] = fVar30 + fVar37;
              pfVar2[3] = fVar31 + fVar38;
              pfVar2[4] = fVar32 + fVar39;
              pfVar2[5] = fVar33 + fVar40;
              pfVar2[6] = fVar34 + fVar41;
              pfVar2[7] = fVar35 + fVar42;
              lVar63 = lVar63 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pauVar51 = (undefined1 (*) [32])pMVar9->data;
        if (pauVar51 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pfVar61 = (float *)local_120->data;
              pauVar58 = (undefined1 (*) [32])local_120[1].data;
              uVar68 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar141 = *pauVar58;
                  uVar47 = uVar48;
                  do {
                    auVar247._0_4_ = auVar141._0_4_ + *pfVar61;
                    auVar247._4_4_ = auVar141._4_4_ + pfVar61[1];
                    auVar247._8_4_ = auVar141._8_4_ + pfVar61[2];
                    auVar247._12_4_ = auVar141._12_4_ + pfVar61[3];
                    auVar247._16_4_ = auVar141._16_4_ + pfVar61[4];
                    auVar247._20_4_ = auVar141._20_4_ + pfVar61[5];
                    auVar247._24_4_ = auVar141._24_4_ + pfVar61[6];
                    auVar247._28_4_ = auVar141._28_4_ + pfVar61[7];
                    *pauVar51 = auVar247;
                    pfVar61 = pfVar61 + 8;
                    pauVar51 = pauVar51 + 1;
                    uVar67 = (int)uVar47 - 1;
                    uVar47 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                pauVar58 = pauVar58 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            fVar205 = *local_110->data;
            pvVar45 = local_120->data;
            lVar63 = 0;
            do {
              pfVar61 = (float *)((long)pvVar45 + lVar63);
              fVar30 = pfVar61[1];
              fVar31 = pfVar61[2];
              fVar32 = pfVar61[3];
              fVar33 = pfVar61[4];
              fVar34 = pfVar61[5];
              fVar35 = pfVar61[6];
              fVar36 = pfVar61[7];
              pfVar62 = (float *)((long)*pauVar51 + lVar63);
              *pfVar62 = fVar205 + *pfVar61;
              pfVar62[1] = fVar205 + fVar30;
              pfVar62[2] = fVar205 + fVar31;
              pfVar62[3] = fVar205 + fVar32;
              pfVar62[4] = fVar205 + fVar33;
              pfVar62[5] = fVar205 + fVar34;
              pfVar62[6] = fVar205 + fVar35;
              pfVar62[7] = fVar205 + fVar36;
              lVar63 = lVar63 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar64 = (ulong)uVar7;
      local_f8 = sVar10;
      if (pMVar8[1].dims != 3) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims == 1) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar7) {
              uVar47 = 0;
              do {
                if (0 < (int)local_118) {
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  auVar141 = *(undefined1 (*) [32])((long)local_110->data + uVar47 * 0x20);
                  pvVar45 = pMVar9->data;
                  sVar12 = local_120->cstep;
                  sVar13 = local_120->elemsize;
                  pvVar60 = local_120->data;
                  lVar63 = 0;
                  iVar44 = (int)local_118;
                  do {
                    pfVar61 = (float *)((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47);
                    auVar245._0_4_ = auVar141._0_4_ + *pfVar61;
                    auVar245._4_4_ = auVar141._4_4_ + pfVar61[1];
                    auVar245._8_4_ = auVar141._8_4_ + pfVar61[2];
                    auVar245._12_4_ = auVar141._12_4_ + pfVar61[3];
                    auVar245._16_4_ = auVar141._16_4_ + pfVar61[4];
                    auVar245._20_4_ = auVar141._20_4_ + pfVar61[5];
                    auVar245._24_4_ = auVar141._24_4_ + pfVar61[6];
                    auVar245._28_4_ = auVar141._28_4_ + pfVar61[7];
                    *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                         auVar245;
                    lVar63 = lVar63 + 0x20;
                    iVar44 = iVar44 + -1;
                  } while (iVar44 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar64);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar7) {
            fVar205 = *local_110->data;
            uVar47 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar45 = pMVar9->data;
                sVar12 = local_120->cstep;
                sVar13 = local_120->elemsize;
                pvVar60 = local_120->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  pfVar61 = (float *)((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47);
                  auVar244._0_4_ = fVar205 + *pfVar61;
                  auVar244._4_4_ = fVar205 + pfVar61[1];
                  auVar244._8_4_ = fVar205 + pfVar61[2];
                  auVar244._12_4_ = fVar205 + pfVar61[3];
                  auVar244._16_4_ = fVar205 + pfVar61[4];
                  auVar244._20_4_ = fVar205 + pfVar61[5];
                  auVar244._24_4_ = fVar205 + pfVar61[6];
                  auVar244._28_4_ = fVar205 + pfVar61[7];
                  *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                       auVar244;
                  lVar63 = lVar63 + 0x20;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        if (local_120[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar7) {
          uVar47 = 0;
          do {
            if (0 < (int)uVar6) {
              pauVar51 = (undefined1 (*) [32])
                         (pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar58 = (undefined1 (*) [32])
                         ((long)local_120[1].w * uVar47 * local_120[1].elemsize +
                         (long)local_120[1].data);
              pfVar61 = (float *)(local_120->cstep * uVar47 * local_120->elemsize +
                                 (long)local_120->data);
              uVar68 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar141 = *pauVar58;
                  uVar49 = uVar48;
                  do {
                    auVar239._0_4_ = auVar141._0_4_ + *pfVar61;
                    auVar239._4_4_ = auVar141._4_4_ + pfVar61[1];
                    auVar239._8_4_ = auVar141._8_4_ + pfVar61[2];
                    auVar239._12_4_ = auVar141._12_4_ + pfVar61[3];
                    auVar239._16_4_ = auVar141._16_4_ + pfVar61[4];
                    auVar239._20_4_ = auVar141._20_4_ + pfVar61[5];
                    auVar239._24_4_ = auVar141._24_4_ + pfVar61[6];
                    auVar239._28_4_ = auVar141._28_4_ + pfVar61[7];
                    *pauVar51 = auVar239;
                    pfVar61 = pfVar61 + 8;
                    pauVar51 = pauVar51 + 1;
                    uVar67 = (int)uVar49 - 1;
                    uVar49 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                pauVar58 = pauVar58 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != uVar64);
          return 0;
        }
        return 0;
      }
      if (uVar66 == uVar7 && (uVar67 == 1 && (uVar68 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                auVar141 = *(undefined1 (*) [32])
                            ((long)pMVar8[1].data + pMVar8[1].cstep * uVar47 * pMVar8[1].elemsize);
                pvVar45 = pMVar8->data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar60 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  pfVar61 = (float *)((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47);
                  auVar235._0_4_ = auVar141._0_4_ + *pfVar61;
                  auVar235._4_4_ = auVar141._4_4_ + pfVar61[1];
                  auVar235._8_4_ = auVar141._8_4_ + pfVar61[2];
                  auVar235._12_4_ = auVar141._12_4_ + pfVar61[3];
                  auVar235._16_4_ = auVar141._16_4_ + pfVar61[4];
                  auVar235._20_4_ = auVar141._20_4_ + pfVar61[5];
                  auVar235._24_4_ = auVar141._24_4_ + pfVar61[6];
                  auVar235._28_4_ = auVar141._28_4_ + pfVar61[7];
                  *(undefined1 (*) [32])((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47) =
                       auVar235;
                  lVar63 = lVar63 + 0x20;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar64;
      if ((uVar68 == uVar69) && (iVar46 == 1 && (uVar66 == 1 && uVar67 == uVar6))) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8->data;
                pvVar60 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  fVar205 = *(float *)((long)pvVar60 + lVar63);
                  pfVar61 = (float *)((long)pvVar45 + lVar63 * 8 + sVar10 * sVar11 * uVar47);
                  auVar147._0_4_ = fVar205 + *pfVar61;
                  auVar147._4_4_ = fVar205 + pfVar61[1];
                  auVar147._8_4_ = fVar205 + pfVar61[2];
                  auVar147._12_4_ = fVar205 + pfVar61[3];
                  auVar147._16_4_ = fVar205 + pfVar61[4];
                  auVar147._20_4_ = fVar205 + pfVar61[5];
                  auVar147._24_4_ = fVar205 + pfVar61[6];
                  auVar147._28_4_ = fVar205 + pfVar61[7];
                  *(undefined1 (*) [32])((long)pvVar65 + lVar63 * 8 + sVar12 * sVar13 * uVar47) =
                       auVar147;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar69 ^ 1) == 0) && uVar7 == uVar66) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                auVar141 = *(undefined1 (*) [32])
                            ((long)pMVar8->data + pMVar8->cstep * uVar48 * pMVar8->elemsize);
                pvVar45 = pMVar8[1].data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar60 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  pfVar61 = (float *)((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48);
                  auVar241._0_4_ = auVar141._0_4_ + *pfVar61;
                  auVar241._4_4_ = auVar141._4_4_ + pfVar61[1];
                  auVar241._8_4_ = auVar141._8_4_ + pfVar61[2];
                  auVar241._12_4_ = auVar141._12_4_ + pfVar61[3];
                  auVar241._16_4_ = auVar141._16_4_ + pfVar61[4];
                  auVar241._20_4_ = auVar141._20_4_ + pfVar61[5];
                  auVar241._24_4_ = auVar141._24_4_ + pfVar61[6];
                  auVar241._28_4_ = auVar141._28_4_ + pfVar61[7];
                  *(undefined1 (*) [32])((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48) =
                       auVar241;
                  lVar63 = lVar63 + 0x20;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar68 == uVar69) && (iVar44 == 1)) && ((uVar67 == uVar6 && (uVar7 == 1)))) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8[1].data;
                pvVar60 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  fVar205 = *(float *)((long)pvVar60 + lVar63);
                  pfVar61 = (float *)((long)pvVar45 + lVar63 * 8 + sVar10 * sVar11 * uVar48);
                  auVar168._0_4_ = fVar205 + *pfVar61;
                  auVar168._4_4_ = fVar205 + pfVar61[1];
                  auVar168._8_4_ = fVar205 + pfVar61[2];
                  auVar168._12_4_ = fVar205 + pfVar61[3];
                  auVar168._16_4_ = fVar205 + pfVar61[4];
                  auVar168._20_4_ = fVar205 + pfVar61[5];
                  auVar168._24_4_ = fVar205 + pfVar61[6];
                  auVar168._28_4_ = fVar205 + pfVar61[7];
                  *(undefined1 (*) [32])((long)pvVar65 + lVar63 * 8 + sVar12 * sVar13 * uVar48) =
                       auVar168;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_130 = (void *)uVar47;
      if ((((uVar68 ^ 1) == 0 && uVar67 == uVar6) && uVar7 == uVar66) && uVar69 != 1) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar49 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar45 = local_120[1].data;
                pauVar51 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar49 * pMVar9->elemsize + (long)pMVar9->data);
                pfVar61 = (float *)(local_120->cstep * uVar49 * local_120->elemsize +
                                   (long)local_120->data);
                uVar64 = 0;
                do {
                  if (0 < (int)uVar69) {
                    auVar141 = *(undefined1 (*) [32])
                                ((long)pvVar45 + uVar64 * 0x20 + sVar10 * uVar49 * sVar11);
                    uVar70 = uVar48;
                    do {
                      auVar243._0_4_ = auVar141._0_4_ + *pfVar61;
                      auVar243._4_4_ = auVar141._4_4_ + pfVar61[1];
                      auVar243._8_4_ = auVar141._8_4_ + pfVar61[2];
                      auVar243._12_4_ = auVar141._12_4_ + pfVar61[3];
                      auVar243._16_4_ = auVar141._16_4_ + pfVar61[4];
                      auVar243._20_4_ = auVar141._20_4_ + pfVar61[5];
                      auVar243._24_4_ = auVar141._24_4_ + pfVar61[6];
                      auVar243._28_4_ = auVar141._28_4_ + pfVar61[7];
                      *pauVar51 = auVar243;
                      pfVar61 = pfVar61 + 8;
                      pauVar51 = pauVar51 + 1;
                      uVar68 = (int)uVar70 - 1;
                      uVar70 = (ulong)uVar68;
                    } while (uVar68 != 0);
                  }
                  uVar64 = uVar64 + 1;
                } while (uVar64 != uVar6);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar67 == 1 && (uVar68 ^ uVar69) == 0) && uVar66 == uVar7) && uVar6 != 1) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar49 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar60 = (void *)(pMVar9->cstep * uVar49 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar65 = (void *)(local_120->cstep * uVar49 * local_120->elemsize +
                                  (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar45 = local_120[1].data;
                uVar68 = 0;
                do {
                  if (0 < (int)uVar69) {
                    lVar63 = 0;
                    do {
                      pfVar61 = (float *)((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar49);
                      pfVar62 = (float *)((long)pvVar65 + lVar63);
                      auVar182._0_4_ = *pfVar61 + *pfVar62;
                      auVar182._4_4_ = pfVar61[1] + pfVar62[1];
                      auVar182._8_4_ = pfVar61[2] + pfVar62[2];
                      auVar182._12_4_ = pfVar61[3] + pfVar62[3];
                      auVar182._16_4_ = pfVar61[4] + pfVar62[4];
                      auVar182._20_4_ = pfVar61[5] + pfVar62[5];
                      auVar182._24_4_ = pfVar61[6] + pfVar62[6];
                      auVar182._28_4_ = pfVar61[7] + pfVar62[7];
                      *(undefined1 (*) [32])((long)pvVar60 + lVar63) = auVar182;
                      lVar63 = lVar63 + 0x20;
                    } while (uVar48 << 5 != lVar63);
                    pvVar60 = (void *)((long)pvVar60 + lVar63);
                    pvVar65 = (void *)((long)pvVar65 + lVar63);
                  }
                  uVar68 = uVar68 + 1;
                } while (uVar68 != uVar6);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar69 ^ 1) == 0 && uVar6 == uVar67) && uVar66 == uVar7) && uVar68 != 1) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)uVar67) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar45 = local_120->data;
                pauVar51 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                pfVar61 = (float *)(local_120[1].cstep * uVar48 * local_120[1].elemsize +
                                   (long)local_120[1].data);
                uVar49 = 0;
                do {
                  if (0 < (int)uVar68) {
                    auVar141 = *(undefined1 (*) [32])
                                ((long)pvVar45 + uVar49 * 0x20 + sVar10 * uVar48 * sVar11);
                    uVar69 = uVar68;
                    do {
                      auVar246._0_4_ = auVar141._0_4_ + *pfVar61;
                      auVar246._4_4_ = auVar141._4_4_ + pfVar61[1];
                      auVar246._8_4_ = auVar141._8_4_ + pfVar61[2];
                      auVar246._12_4_ = auVar141._12_4_ + pfVar61[3];
                      auVar246._16_4_ = auVar141._16_4_ + pfVar61[4];
                      auVar246._20_4_ = auVar141._20_4_ + pfVar61[5];
                      auVar246._24_4_ = auVar141._24_4_ + pfVar61[6];
                      auVar246._28_4_ = auVar141._28_4_ + pfVar61[7];
                      *pauVar51 = auVar246;
                      pfVar61 = pfVar61 + 8;
                      pauVar51 = pauVar51 + 1;
                      uVar69 = uVar69 - 1;
                    } while (uVar69 != 0);
                  }
                  uVar49 = uVar49 + 1;
                } while (uVar49 != uVar67);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar68 ^ uVar69) == 0 && uVar6 == 1) && uVar7 == uVar66) && uVar67 != 1) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_130) {
            local_128 = (void *)(uVar49 << 5);
            iVar44 = 0;
            do {
              Mat::channel((Mat *)local_e0,local_120,iVar44);
              auVar43 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar44);
              auVar54 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar44);
              auVar74 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar67) {
                uVar69 = 0;
                do {
                  if (0 < (int)uVar68) {
                    lVar63 = 0;
                    do {
                      pfVar61 = (float *)((long)auVar54 + lVar63);
                      pfVar62 = (float *)((long)auVar43 + lVar63);
                      auVar186._0_4_ = *pfVar61 + *pfVar62;
                      auVar186._4_4_ = pfVar61[1] + pfVar62[1];
                      auVar186._8_4_ = pfVar61[2] + pfVar62[2];
                      auVar186._12_4_ = pfVar61[3] + pfVar62[3];
                      auVar186._16_4_ = pfVar61[4] + pfVar62[4];
                      auVar186._20_4_ = pfVar61[5] + pfVar62[5];
                      auVar186._24_4_ = pfVar61[6] + pfVar62[6];
                      auVar186._28_4_ = pfVar61[7] + pfVar62[7];
                      *(undefined1 (*) [32])((long)auVar74 + lVar63) = auVar186;
                      lVar63 = lVar63 + 0x20;
                    } while (local_128 != (void *)lVar63);
                    auVar74 = (undefined1  [8])((long)auVar74 + lVar63);
                    auVar54 = (undefined1  [8])((long)auVar54 + lVar63);
                  }
                  uVar69 = uVar69 + 1;
                } while (uVar69 != uVar67);
              }
              iVar44 = iVar44 + 1;
            } while (iVar44 != (int)local_130);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_100) {
          iVar44 = 0;
          do {
            pMVar9 = local_108;
            Mat::channel((Mat *)local_e0,local_120,iVar44);
            auVar43 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar44);
            auVar54 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar44);
            auVar74 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_118) {
              lVar63 = 0;
              iVar46 = (int)local_118;
              do {
                pfVar61 = (float *)((long)auVar54 + lVar63);
                pfVar62 = (float *)((long)auVar43 + lVar63);
                auVar188._0_4_ = *pfVar61 + *pfVar62;
                auVar188._4_4_ = pfVar61[1] + pfVar62[1];
                auVar188._8_4_ = pfVar61[2] + pfVar62[2];
                auVar188._12_4_ = pfVar61[3] + pfVar62[3];
                auVar188._16_4_ = pfVar61[4] + pfVar62[4];
                auVar188._20_4_ = pfVar61[5] + pfVar62[5];
                auVar188._24_4_ = pfVar61[6] + pfVar62[6];
                auVar188._28_4_ = pfVar61[7] + pfVar62[7];
                *(undefined1 (*) [32])((long)auVar74 + lVar63) = auVar188;
                lVar63 = lVar63 + 0x20;
                iVar46 = iVar46 + -1;
              } while (iVar46 != 0);
            }
            iVar44 = iVar44 + 1;
          } while (iVar44 != (int)local_100);
          return 0;
        }
        return 0;
      }
      return -100;
    case 1:
      uVar69 = pMVar8->w;
      uVar48 = (ulong)uVar69;
      sVar10 = pMVar8->elemsize;
      uVar68 = pMVar8[1].w;
      uVar49 = (ulong)uVar68;
      uVar67 = pMVar8[1].h;
      uVar66 = pMVar8[1].c;
      uVar47 = (ulong)uVar66;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar67 * uVar68);
      local_f0 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar44 == 1 && uVar69 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar68,local_f0,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar68) {
                uVar4 = *pMVar8->data;
                auVar163._4_4_ = uVar4;
                auVar163._0_4_ = uVar4;
                auVar163._8_4_ = uVar4;
                auVar163._12_4_ = uVar4;
                auVar163._16_4_ = uVar4;
                auVar163._20_4_ = uVar4;
                auVar163._24_4_ = uVar4;
                auVar163._28_4_ = uVar4;
                pvVar60 = pMVar1->data;
                lVar63 = 0;
                do {
                  auVar141 = vsubps_avx(auVar163,*(undefined1 (*) [32])((long)pvVar60 + lVar63));
                  *(undefined1 (*) [32])((long)pvVar45 + lVar63) = auVar141;
                  lVar63 = lVar63 + 0x20;
                  uVar69 = (int)uVar49 - 1;
                  uVar49 = (ulong)uVar69;
                } while (uVar69 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar68,uVar67,local_f0,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)local_130) {
                uVar4 = *pMVar8->data;
                auVar160._4_4_ = uVar4;
                auVar160._0_4_ = uVar4;
                auVar160._8_4_ = uVar4;
                auVar160._12_4_ = uVar4;
                auVar160._16_4_ = uVar4;
                auVar160._20_4_ = uVar4;
                auVar160._24_4_ = uVar4;
                auVar160._28_4_ = uVar4;
                pvVar60 = pMVar1->data;
                lVar63 = 0;
                do {
                  auVar141 = vsubps_avx(auVar160,*(undefined1 (*) [32])((long)pvVar60 + lVar63));
                  *(undefined1 (*) [32])((long)pvVar45 + lVar63) = auVar141;
                  lVar63 = lVar63 + 0x20;
                  local_130._0_4_ = (int)local_130 + -1;
                } while ((int)local_130 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar66) {
                uVar4 = *pMVar8->data;
                auVar140._4_4_ = uVar4;
                auVar140._0_4_ = uVar4;
                auVar140._8_4_ = uVar4;
                auVar140._12_4_ = uVar4;
                auVar140._16_4_ = uVar4;
                auVar140._20_4_ = uVar4;
                auVar140._24_4_ = uVar4;
                auVar140._28_4_ = uVar4;
                uVar48 = 0;
                do {
                  if (0 < (int)local_130) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar45 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar60 = pMVar8[1].data;
                    lVar63 = 0;
                    iVar44 = (int)local_130;
                    do {
                      auVar141 = vsubps_avx(auVar140,*(undefined1 (*) [32])
                                                      ((long)pvVar60 +
                                                      lVar63 + sVar12 * sVar13 * uVar48));
                      *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) =
                           auVar141;
                      lVar63 = lVar63 + 0x20;
                      iVar44 = iVar44 + -1;
                    } while (iVar44 != 0);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar47);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar69,sVar10,iVar44,opt->blob_allocator);
          pvVar45 = pMVar9->data;
          if (pvVar45 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar46 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar69) {
              pvVar60 = pMVar8->data;
              pvVar65 = pMVar8[1].data;
              lVar63 = 0;
              do {
                auVar141 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar60 + lVar63),
                                      *(undefined1 (*) [32])((long)pvVar65 + lVar63));
                *(undefined1 (*) [32])((long)pvVar45 + lVar63) = auVar141;
                lVar63 = lVar63 + 0x20;
                uVar69 = (int)uVar48 - 1;
                uVar48 = (ulong)uVar69;
              } while (uVar69 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar69) {
            uVar4 = *local_110->data;
            auVar152._4_4_ = uVar4;
            auVar152._0_4_ = uVar4;
            auVar152._8_4_ = uVar4;
            auVar152._12_4_ = uVar4;
            auVar152._16_4_ = uVar4;
            auVar152._20_4_ = uVar4;
            auVar152._24_4_ = uVar4;
            auVar152._28_4_ = uVar4;
            pvVar60 = pMVar8->data;
            lVar63 = 0;
            do {
              auVar141 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar60 + lVar63),auVar152);
              *(undefined1 (*) [32])((long)pvVar45 + lVar63) = auVar141;
              lVar63 = lVar63 + 0x20;
              uVar69 = (int)uVar48 - 1;
              uVar48 = (ulong)uVar69;
            } while (uVar69 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar68,uVar67,local_f0,iVar46,opt->blob_allocator);
          pauVar51 = (undefined1 (*) [32])pMVar9->data;
          if (pauVar51 == (undefined1 (*) [32])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar67) {
              pauVar58 = (undefined1 (*) [32])pMVar8->data;
              pauVar56 = (undefined1 (*) [32])pMVar8[1].data;
              uVar69 = 0;
              do {
                if (0 < (int)uVar68) {
                  auVar141 = *pauVar58;
                  uVar66 = uVar68;
                  do {
                    auVar179 = vsubps_avx(auVar141,*pauVar56);
                    *pauVar51 = auVar179;
                    pauVar56 = pauVar56 + 1;
                    pauVar51 = pauVar51 + 1;
                    uVar66 = uVar66 - 1;
                  } while (uVar66 != 0);
                }
                pauVar58 = pauVar58 + 1;
                uVar69 = uVar69 + 1;
              } while (uVar69 != uVar67);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar66) {
          uVar48 = 0;
          do {
            if (0 < (int)local_130) {
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar9->elemsize;
              auVar141 = *(undefined1 (*) [32])((long)pMVar8->data + uVar48 * 0x20);
              pvVar45 = pMVar9->data;
              sVar12 = pMVar8[1].cstep;
              sVar13 = pMVar8[1].elemsize;
              pvVar60 = pMVar8[1].data;
              lVar63 = 0;
              iVar44 = (int)local_130;
              do {
                auVar179 = vsubps_avx(auVar141,*(undefined1 (*) [32])
                                                ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48))
                ;
                *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) = auVar179
                ;
                lVar63 = lVar63 + 0x20;
                iVar44 = iVar44 + -1;
              } while (iVar44 != 0);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar47);
          return 0;
        }
        return 0;
      }
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar46);
      uVar6 = pMVar8->h;
      local_118 = CONCAT44(local_118._4_4_,uVar6 * uVar69);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar66) {
              uVar48 = 0;
              do {
                if (0 < (int)uVar67) {
                  pauVar51 = (undefined1 (*) [32])
                             (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                  pauVar58 = (undefined1 (*) [32])
                             (local_120[1].cstep * uVar48 * local_120[1].elemsize +
                             (long)local_120[1].data);
                  pauVar56 = (undefined1 (*) [32])
                             ((long)local_120->w * uVar48 * local_120->elemsize +
                             (long)local_120->data);
                  uVar69 = 0;
                  do {
                    if (0 < (int)uVar68) {
                      auVar141 = *pauVar56;
                      uVar66 = uVar68;
                      do {
                        auVar179 = vsubps_avx(auVar141,*pauVar58);
                        *pauVar51 = auVar179;
                        pauVar58 = pauVar58 + 1;
                        pauVar51 = pauVar51 + 1;
                        uVar66 = uVar66 - 1;
                      } while (uVar66 != 0);
                    }
                    pauVar56 = pauVar56 + 1;
                    uVar69 = uVar69 + 1;
                  } while (uVar69 != uVar67);
                }
                uVar48 = uVar48 + 1;
              } while (uVar48 != uVar47);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pvVar45 = pMVar9->data;
        if (pvVar45 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_118) {
            pvVar60 = local_120->data;
            pvVar65 = local_120[1].data;
            lVar63 = 0;
            do {
              auVar141 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar60 + lVar63),
                                    *(undefined1 (*) [32])((long)pvVar65 + lVar63));
              *(undefined1 (*) [32])((long)pvVar45 + lVar63) = auVar141;
              lVar63 = lVar63 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pauVar51 = (undefined1 (*) [32])pMVar9->data;
        if (pauVar51 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pauVar58 = (undefined1 (*) [32])local_120->data;
              pauVar56 = (undefined1 (*) [32])local_120[1].data;
              uVar68 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar141 = *pauVar56;
                  uVar47 = uVar48;
                  do {
                    auVar179 = vsubps_avx(*pauVar58,auVar141);
                    *pauVar51 = auVar179;
                    pauVar58 = pauVar58 + 1;
                    pauVar51 = pauVar51 + 1;
                    uVar67 = (int)uVar47 - 1;
                    uVar47 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                pauVar56 = pauVar56 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            uVar4 = *local_110->data;
            auVar175._4_4_ = uVar4;
            auVar175._0_4_ = uVar4;
            auVar175._8_4_ = uVar4;
            auVar175._12_4_ = uVar4;
            auVar175._16_4_ = uVar4;
            auVar175._20_4_ = uVar4;
            auVar175._24_4_ = uVar4;
            auVar175._28_4_ = uVar4;
            pvVar45 = local_120->data;
            lVar63 = 0;
            do {
              auVar141 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar45 + lVar63),auVar175);
              *(undefined1 (*) [32])((long)*pauVar51 + lVar63) = auVar141;
              lVar63 = lVar63 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar64 = (ulong)uVar7;
      local_f8 = sVar10;
      if (pMVar8[1].dims != 3) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims == 1) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar7) {
              uVar47 = 0;
              do {
                if (0 < (int)local_118) {
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  auVar141 = *(undefined1 (*) [32])((long)local_110->data + uVar47 * 0x20);
                  pvVar45 = pMVar9->data;
                  sVar12 = local_120->cstep;
                  sVar13 = local_120->elemsize;
                  pvVar60 = local_120->data;
                  lVar63 = 0;
                  iVar44 = (int)local_118;
                  do {
                    auVar179 = vsubps_avx(*(undefined1 (*) [32])
                                           ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47),
                                          auVar141);
                    *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                         auVar179;
                    lVar63 = lVar63 + 0x20;
                    iVar44 = iVar44 + -1;
                  } while (iVar44 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar64);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar7) {
            uVar4 = *local_110->data;
            auVar178._4_4_ = uVar4;
            auVar178._0_4_ = uVar4;
            auVar178._8_4_ = uVar4;
            auVar178._12_4_ = uVar4;
            auVar178._16_4_ = uVar4;
            auVar178._20_4_ = uVar4;
            auVar178._24_4_ = uVar4;
            auVar178._28_4_ = uVar4;
            uVar47 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar45 = pMVar9->data;
                sVar12 = local_120->cstep;
                sVar13 = local_120->elemsize;
                pvVar60 = local_120->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  auVar141 = vsubps_avx(*(undefined1 (*) [32])
                                         ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47),
                                        auVar178);
                  *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                       auVar141;
                  lVar63 = lVar63 + 0x20;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        if (local_120[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar7) {
          uVar47 = 0;
          do {
            if (0 < (int)uVar6) {
              pauVar51 = (undefined1 (*) [32])
                         (pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar58 = (undefined1 (*) [32])
                         ((long)local_120[1].w * uVar47 * local_120[1].elemsize +
                         (long)local_120[1].data);
              pauVar56 = (undefined1 (*) [32])
                         (local_120->cstep * uVar47 * local_120->elemsize + (long)local_120->data);
              uVar68 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar141 = *pauVar58;
                  uVar49 = uVar48;
                  do {
                    auVar179 = vsubps_avx(*pauVar56,auVar141);
                    *pauVar51 = auVar179;
                    pauVar56 = pauVar56 + 1;
                    pauVar51 = pauVar51 + 1;
                    uVar67 = (int)uVar49 - 1;
                    uVar49 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                pauVar58 = pauVar58 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != uVar64);
          return 0;
        }
        return 0;
      }
      if (uVar66 == uVar7 && (uVar67 == 1 && (uVar68 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                auVar141 = *(undefined1 (*) [32])
                            ((long)pMVar8[1].data + pMVar8[1].cstep * uVar47 * pMVar8[1].elemsize);
                pvVar45 = pMVar8->data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar60 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  auVar179 = vsubps_avx(*(undefined1 (*) [32])
                                         ((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47),
                                        auVar141);
                  *(undefined1 (*) [32])((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47) =
                       auVar179;
                  lVar63 = lVar63 + 0x20;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar64;
      if ((uVar68 == uVar69) && (iVar46 == 1 && (uVar66 == 1 && uVar67 == uVar6))) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8->data;
                pvVar60 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar60 + lVar63);
                  auVar240._4_4_ = uVar4;
                  auVar240._0_4_ = uVar4;
                  auVar240._8_4_ = uVar4;
                  auVar240._12_4_ = uVar4;
                  auVar240._16_4_ = uVar4;
                  auVar240._20_4_ = uVar4;
                  auVar240._24_4_ = uVar4;
                  auVar240._28_4_ = uVar4;
                  auVar141 = vsubps_avx(*(undefined1 (*) [32])
                                         ((long)pvVar45 + lVar63 * 8 + sVar10 * sVar11 * uVar47),
                                        auVar240);
                  *(undefined1 (*) [32])((long)pvVar65 + lVar63 * 8 + sVar12 * sVar13 * uVar47) =
                       auVar141;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar69 ^ 1) == 0) && uVar7 == uVar66) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                auVar141 = *(undefined1 (*) [32])
                            ((long)pMVar8->data + pMVar8->cstep * uVar48 * pMVar8->elemsize);
                pvVar45 = pMVar8[1].data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar60 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  auVar179 = vsubps_avx(auVar141,*(undefined1 (*) [32])
                                                  ((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48) =
                       auVar179;
                  lVar63 = lVar63 + 0x20;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar68 == uVar69) && (iVar44 == 1)) && (uVar67 == uVar6)) && (uVar7 == 1)) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8[1].data;
                pvVar60 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar60 + lVar63);
                  auVar169._4_4_ = uVar4;
                  auVar169._0_4_ = uVar4;
                  auVar169._8_4_ = uVar4;
                  auVar169._12_4_ = uVar4;
                  auVar169._16_4_ = uVar4;
                  auVar169._20_4_ = uVar4;
                  auVar169._24_4_ = uVar4;
                  auVar169._28_4_ = uVar4;
                  auVar141 = vsubps_avx(auVar169,*(undefined1 (*) [32])
                                                  ((long)pvVar45 +
                                                  lVar63 * 8 + sVar10 * sVar11 * uVar48));
                  *(undefined1 (*) [32])((long)pvVar65 + lVar63 * 8 + sVar12 * sVar13 * uVar48) =
                       auVar141;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_130 = (void *)uVar47;
      if ((((uVar68 ^ 1) == 0 && uVar67 == uVar6) && uVar7 == uVar66) && uVar69 != 1) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar49 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar45 = local_120[1].data;
                pauVar51 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar49 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar58 = (undefined1 (*) [32])
                           (local_120->cstep * uVar49 * local_120->elemsize + (long)local_120->data)
                ;
                uVar64 = 0;
                do {
                  if (0 < (int)uVar69) {
                    auVar141 = *(undefined1 (*) [32])
                                ((long)pvVar45 + uVar64 * 0x20 + sVar10 * uVar49 * sVar11);
                    uVar70 = uVar48;
                    do {
                      auVar179 = vsubps_avx(*pauVar58,auVar141);
                      *pauVar51 = auVar179;
                      pauVar58 = pauVar58 + 1;
                      pauVar51 = pauVar51 + 1;
                      uVar68 = (int)uVar70 - 1;
                      uVar70 = (ulong)uVar68;
                    } while (uVar68 != 0);
                  }
                  uVar64 = uVar64 + 1;
                } while (uVar64 != uVar6);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar67 == 1 && (uVar68 ^ uVar69) == 0) && uVar66 == uVar7) && uVar6 != 1) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar49 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar60 = (void *)(pMVar9->cstep * uVar49 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar65 = (void *)(local_120->cstep * uVar49 * local_120->elemsize +
                                  (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar45 = local_120[1].data;
                uVar68 = 0;
                do {
                  if (0 < (int)uVar69) {
                    lVar63 = 0;
                    do {
                      auVar141 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar65 + lVar63),
                                            *(undefined1 (*) [32])
                                             ((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar49));
                      *(undefined1 (*) [32])((long)pvVar60 + lVar63) = auVar141;
                      lVar63 = lVar63 + 0x20;
                    } while (uVar48 << 5 != lVar63);
                    pvVar60 = (void *)((long)pvVar60 + lVar63);
                    pvVar65 = (void *)((long)pvVar65 + lVar63);
                  }
                  uVar68 = uVar68 + 1;
                } while (uVar68 != uVar6);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar69 ^ 1) == 0 && uVar6 == uVar67) && uVar66 == uVar7) && uVar68 != 1) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)uVar67) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar45 = local_120->data;
                pauVar51 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar58 = (undefined1 (*) [32])
                           (local_120[1].cstep * uVar48 * local_120[1].elemsize +
                           (long)local_120[1].data);
                uVar49 = 0;
                do {
                  if (0 < (int)uVar68) {
                    auVar141 = *(undefined1 (*) [32])
                                ((long)pvVar45 + uVar49 * 0x20 + sVar10 * uVar48 * sVar11);
                    uVar69 = uVar68;
                    do {
                      auVar179 = vsubps_avx(auVar141,*pauVar58);
                      *pauVar51 = auVar179;
                      pauVar58 = pauVar58 + 1;
                      pauVar51 = pauVar51 + 1;
                      uVar69 = uVar69 - 1;
                    } while (uVar69 != 0);
                  }
                  uVar49 = uVar49 + 1;
                } while (uVar49 != uVar67);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar68 ^ uVar69) == 0 && uVar6 == 1) && uVar7 == uVar66) && uVar67 != 1) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_130) {
            local_128 = (void *)(uVar49 << 5);
            iVar44 = 0;
            do {
              Mat::channel((Mat *)local_e0,local_120,iVar44);
              auVar43 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar44);
              auVar54 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar44);
              auVar74 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar67) {
                uVar69 = 0;
                do {
                  if (0 < (int)uVar68) {
                    lVar63 = 0;
                    do {
                      auVar141 = vsubps_avx(*(undefined1 (*) [32])((long)auVar43 + lVar63),
                                            *(undefined1 (*) [32])((long)auVar54 + lVar63));
                      *(undefined1 (*) [32])((long)auVar74 + lVar63) = auVar141;
                      lVar63 = lVar63 + 0x20;
                    } while (local_128 != (void *)lVar63);
                    auVar74 = (undefined1  [8])((long)auVar74 + lVar63);
                    auVar54 = (undefined1  [8])((long)auVar54 + lVar63);
                  }
                  uVar69 = uVar69 + 1;
                } while (uVar69 != uVar67);
              }
              iVar44 = iVar44 + 1;
            } while (iVar44 != (int)local_130);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_100) {
          iVar44 = 0;
          do {
            pMVar9 = local_108;
            Mat::channel((Mat *)local_e0,local_120,iVar44);
            auVar43 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar44);
            auVar54 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar44);
            auVar74 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_118) {
              lVar63 = 0;
              iVar46 = (int)local_118;
              do {
                auVar141 = vsubps_avx(*(undefined1 (*) [32])((long)auVar43 + lVar63),
                                      *(undefined1 (*) [32])((long)auVar54 + lVar63));
                *(undefined1 (*) [32])((long)auVar74 + lVar63) = auVar141;
                lVar63 = lVar63 + 0x20;
                iVar46 = iVar46 + -1;
              } while (iVar46 != 0);
            }
            iVar44 = iVar44 + 1;
          } while (iVar44 != (int)local_100);
          return 0;
        }
        return 0;
      }
      return -100;
    case 2:
      uVar69 = pMVar8->w;
      uVar48 = (ulong)uVar69;
      sVar10 = pMVar8->elemsize;
      uVar68 = pMVar8[1].w;
      uVar49 = (ulong)uVar68;
      uVar67 = pMVar8[1].h;
      uVar66 = pMVar8[1].c;
      uVar47 = (ulong)uVar66;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar67 * uVar68);
      local_f0 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar44 == 1 && uVar69 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar68,local_f0,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar68) {
                fVar205 = *pMVar8->data;
                pvVar60 = pMVar1->data;
                lVar63 = 0;
                do {
                  pfVar61 = (float *)((long)pvVar60 + lVar63);
                  auVar259._0_4_ = fVar205 * *pfVar61;
                  auVar259._4_4_ = fVar205 * pfVar61[1];
                  auVar259._8_4_ = fVar205 * pfVar61[2];
                  auVar259._12_4_ = fVar205 * pfVar61[3];
                  auVar259._16_4_ = fVar205 * pfVar61[4];
                  auVar259._20_4_ = fVar205 * pfVar61[5];
                  auVar259._28_36_ = in_ZMM1._28_36_;
                  auVar259._24_4_ = fVar205 * pfVar61[6];
                  in_ZMM1 = ZEXT3264(auVar259._0_32_);
                  *(undefined1 (*) [32])((long)pvVar45 + lVar63) = auVar259._0_32_;
                  lVar63 = lVar63 + 0x20;
                  uVar69 = (int)uVar49 - 1;
                  uVar49 = (ulong)uVar69;
                } while (uVar69 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar68,uVar67,local_f0,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)local_130) {
                fVar205 = *pMVar8->data;
                pvVar60 = pMVar1->data;
                lVar63 = 0;
                do {
                  pfVar61 = (float *)((long)pvVar60 + lVar63);
                  auVar258._0_4_ = fVar205 * *pfVar61;
                  auVar258._4_4_ = fVar205 * pfVar61[1];
                  auVar258._8_4_ = fVar205 * pfVar61[2];
                  auVar258._12_4_ = fVar205 * pfVar61[3];
                  auVar258._16_4_ = fVar205 * pfVar61[4];
                  auVar258._20_4_ = fVar205 * pfVar61[5];
                  auVar258._28_36_ = in_ZMM1._28_36_;
                  auVar258._24_4_ = fVar205 * pfVar61[6];
                  in_ZMM1 = ZEXT3264(auVar258._0_32_);
                  *(undefined1 (*) [32])((long)pvVar45 + lVar63) = auVar258._0_32_;
                  lVar63 = lVar63 + 0x20;
                  local_130._0_4_ = (int)local_130 + -1;
                } while ((int)local_130 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar66) {
                fVar205 = *pMVar8->data;
                uVar48 = 0;
                do {
                  if (0 < (int)local_130) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar45 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar60 = pMVar8[1].data;
                    lVar63 = 0;
                    iVar44 = (int)local_130;
                    do {
                      pfVar61 = (float *)((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48);
                      auVar250._0_4_ = fVar205 * *pfVar61;
                      auVar250._4_4_ = fVar205 * pfVar61[1];
                      auVar250._8_4_ = fVar205 * pfVar61[2];
                      auVar250._12_4_ = fVar205 * pfVar61[3];
                      auVar250._16_4_ = fVar205 * pfVar61[4];
                      auVar250._20_4_ = fVar205 * pfVar61[5];
                      auVar250._28_36_ = in_ZMM1._28_36_;
                      auVar250._24_4_ = fVar205 * pfVar61[6];
                      in_ZMM1 = ZEXT3264(auVar250._0_32_);
                      *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) =
                           auVar250._0_32_;
                      lVar63 = lVar63 + 0x20;
                      iVar44 = iVar44 + -1;
                    } while (iVar44 != 0);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar47);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar69,sVar10,iVar44,opt->blob_allocator);
          pvVar45 = pMVar9->data;
          if (pvVar45 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar46 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar69) {
              pvVar60 = pMVar8->data;
              pvVar65 = pMVar8[1].data;
              lVar63 = 0;
              do {
                pfVar61 = (float *)((long)pvVar65 + lVar63);
                fVar205 = pfVar61[1];
                fVar30 = pfVar61[2];
                fVar31 = pfVar61[3];
                fVar32 = pfVar61[4];
                fVar33 = pfVar61[5];
                fVar34 = pfVar61[6];
                fVar35 = pfVar61[7];
                pfVar62 = (float *)((long)pvVar60 + lVar63);
                fVar36 = pfVar62[1];
                fVar37 = pfVar62[2];
                fVar38 = pfVar62[3];
                fVar39 = pfVar62[4];
                fVar40 = pfVar62[5];
                fVar41 = pfVar62[6];
                pfVar2 = (float *)((long)pvVar45 + lVar63);
                *pfVar2 = *pfVar61 * *pfVar62;
                pfVar2[1] = fVar205 * fVar36;
                pfVar2[2] = fVar30 * fVar37;
                pfVar2[3] = fVar31 * fVar38;
                pfVar2[4] = fVar32 * fVar39;
                pfVar2[5] = fVar33 * fVar40;
                pfVar2[6] = fVar34 * fVar41;
                pfVar2[7] = fVar35;
                lVar63 = lVar63 + 0x20;
                uVar69 = (int)uVar48 - 1;
                uVar48 = (ulong)uVar69;
              } while (uVar69 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar69) {
            fVar205 = *local_110->data;
            pvVar60 = pMVar8->data;
            lVar63 = 0;
            do {
              pfVar61 = (float *)((long)pvVar60 + lVar63);
              auVar256._0_4_ = fVar205 * *pfVar61;
              auVar256._4_4_ = fVar205 * pfVar61[1];
              auVar256._8_4_ = fVar205 * pfVar61[2];
              auVar256._12_4_ = fVar205 * pfVar61[3];
              auVar256._16_4_ = fVar205 * pfVar61[4];
              auVar256._20_4_ = fVar205 * pfVar61[5];
              auVar256._28_36_ = in_ZMM1._28_36_;
              auVar256._24_4_ = fVar205 * pfVar61[6];
              in_ZMM1 = ZEXT3264(auVar256._0_32_);
              *(undefined1 (*) [32])((long)pvVar45 + lVar63) = auVar256._0_32_;
              lVar63 = lVar63 + 0x20;
              uVar69 = (int)uVar48 - 1;
              uVar48 = (ulong)uVar69;
            } while (uVar69 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar68,uVar67,local_f0,iVar46,opt->blob_allocator);
          pauVar51 = (undefined1 (*) [32])pMVar9->data;
          if (pauVar51 == (undefined1 (*) [32])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar67) {
              pauVar58 = (undefined1 (*) [32])pMVar8->data;
              pfVar61 = (float *)pMVar8[1].data;
              uVar69 = 0;
              do {
                if (0 < (int)uVar68) {
                  auVar141 = *pauVar58;
                  uVar66 = uVar68;
                  do {
                    auVar255._0_4_ = auVar141._0_4_ * *pfVar61;
                    auVar255._4_4_ = auVar141._4_4_ * pfVar61[1];
                    auVar255._8_4_ = auVar141._8_4_ * pfVar61[2];
                    auVar255._12_4_ = auVar141._12_4_ * pfVar61[3];
                    auVar255._16_4_ = auVar141._16_4_ * pfVar61[4];
                    auVar255._20_4_ = auVar141._20_4_ * pfVar61[5];
                    auVar255._28_36_ = in_ZMM1._28_36_;
                    auVar255._24_4_ = auVar141._24_4_ * pfVar61[6];
                    in_ZMM1 = ZEXT3264(auVar255._0_32_);
                    *pauVar51 = auVar255._0_32_;
                    pfVar61 = pfVar61 + 8;
                    pauVar51 = pauVar51 + 1;
                    uVar66 = uVar66 - 1;
                  } while (uVar66 != 0);
                }
                pauVar58 = pauVar58 + 1;
                uVar69 = uVar69 + 1;
              } while (uVar69 != uVar67);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar66) {
          uVar48 = 0;
          do {
            if (0 < (int)local_130) {
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar9->elemsize;
              auVar141 = *(undefined1 (*) [32])((long)pMVar8->data + uVar48 * 0x20);
              pvVar45 = pMVar9->data;
              sVar12 = pMVar8[1].cstep;
              sVar13 = pMVar8[1].elemsize;
              pvVar60 = pMVar8[1].data;
              lVar63 = 0;
              iVar44 = (int)local_130;
              do {
                pfVar61 = (float *)((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48);
                auVar252._0_4_ = auVar141._0_4_ * *pfVar61;
                auVar252._4_4_ = auVar141._4_4_ * pfVar61[1];
                auVar252._8_4_ = auVar141._8_4_ * pfVar61[2];
                auVar252._12_4_ = auVar141._12_4_ * pfVar61[3];
                auVar252._16_4_ = auVar141._16_4_ * pfVar61[4];
                auVar252._20_4_ = auVar141._20_4_ * pfVar61[5];
                auVar252._28_36_ = in_ZMM1._28_36_;
                auVar252._24_4_ = auVar141._24_4_ * pfVar61[6];
                in_ZMM1 = ZEXT3264(auVar252._0_32_);
                *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) =
                     auVar252._0_32_;
                lVar63 = lVar63 + 0x20;
                iVar44 = iVar44 + -1;
              } while (iVar44 != 0);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar47);
          return 0;
        }
        return 0;
      }
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar46);
      uVar6 = pMVar8->h;
      local_118 = CONCAT44(local_118._4_4_,uVar6 * uVar69);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar66) {
              uVar48 = 0;
              do {
                if (0 < (int)uVar67) {
                  pauVar51 = (undefined1 (*) [32])
                             (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                  pfVar61 = (float *)(local_120[1].cstep * uVar48 * local_120[1].elemsize +
                                     (long)local_120[1].data);
                  pauVar58 = (undefined1 (*) [32])
                             ((long)local_120->w * uVar48 * local_120->elemsize +
                             (long)local_120->data);
                  uVar69 = 0;
                  do {
                    if (0 < (int)uVar68) {
                      auVar141 = *pauVar58;
                      uVar66 = uVar68;
                      do {
                        auVar249._0_4_ = auVar141._0_4_ * *pfVar61;
                        auVar249._4_4_ = auVar141._4_4_ * pfVar61[1];
                        auVar249._8_4_ = auVar141._8_4_ * pfVar61[2];
                        auVar249._12_4_ = auVar141._12_4_ * pfVar61[3];
                        auVar249._16_4_ = auVar141._16_4_ * pfVar61[4];
                        auVar249._20_4_ = auVar141._20_4_ * pfVar61[5];
                        auVar249._28_36_ = in_ZMM1._28_36_;
                        auVar249._24_4_ = auVar141._24_4_ * pfVar61[6];
                        in_ZMM1 = ZEXT3264(auVar249._0_32_);
                        *pauVar51 = auVar249._0_32_;
                        pfVar61 = pfVar61 + 8;
                        pauVar51 = pauVar51 + 1;
                        uVar66 = uVar66 - 1;
                      } while (uVar66 != 0);
                    }
                    pauVar58 = pauVar58 + 1;
                    uVar69 = uVar69 + 1;
                  } while (uVar69 != uVar67);
                }
                uVar48 = uVar48 + 1;
              } while (uVar48 != uVar47);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pvVar45 = pMVar9->data;
        if (pvVar45 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_118) {
            pvVar60 = local_120->data;
            pvVar65 = local_120[1].data;
            lVar63 = 0;
            do {
              pfVar61 = (float *)((long)pvVar65 + lVar63);
              fVar205 = pfVar61[1];
              fVar30 = pfVar61[2];
              fVar31 = pfVar61[3];
              fVar32 = pfVar61[4];
              fVar33 = pfVar61[5];
              fVar34 = pfVar61[6];
              fVar35 = pfVar61[7];
              pfVar62 = (float *)((long)pvVar60 + lVar63);
              fVar36 = pfVar62[1];
              fVar37 = pfVar62[2];
              fVar38 = pfVar62[3];
              fVar39 = pfVar62[4];
              fVar40 = pfVar62[5];
              fVar41 = pfVar62[6];
              pfVar2 = (float *)((long)pvVar45 + lVar63);
              *pfVar2 = *pfVar61 * *pfVar62;
              pfVar2[1] = fVar205 * fVar36;
              pfVar2[2] = fVar30 * fVar37;
              pfVar2[3] = fVar31 * fVar38;
              pfVar2[4] = fVar32 * fVar39;
              pfVar2[5] = fVar33 * fVar40;
              pfVar2[6] = fVar34 * fVar41;
              pfVar2[7] = fVar35;
              lVar63 = lVar63 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pauVar51 = (undefined1 (*) [32])pMVar9->data;
        if (pauVar51 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pfVar61 = (float *)local_120->data;
              pauVar58 = (undefined1 (*) [32])local_120[1].data;
              uVar68 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar141 = *pauVar58;
                  uVar47 = uVar48;
                  do {
                    auVar269._0_4_ = auVar141._0_4_ * *pfVar61;
                    auVar269._4_4_ = auVar141._4_4_ * pfVar61[1];
                    auVar269._8_4_ = auVar141._8_4_ * pfVar61[2];
                    auVar269._12_4_ = auVar141._12_4_ * pfVar61[3];
                    auVar269._16_4_ = auVar141._16_4_ * pfVar61[4];
                    auVar269._20_4_ = auVar141._20_4_ * pfVar61[5];
                    auVar269._28_36_ = in_ZMM1._28_36_;
                    auVar269._24_4_ = auVar141._24_4_ * pfVar61[6];
                    in_ZMM1 = ZEXT3264(auVar269._0_32_);
                    *pauVar51 = auVar269._0_32_;
                    pfVar61 = pfVar61 + 8;
                    pauVar51 = pauVar51 + 1;
                    uVar67 = (int)uVar47 - 1;
                    uVar47 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                pauVar58 = pauVar58 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            fVar205 = *local_110->data;
            pvVar45 = local_120->data;
            lVar63 = 0;
            do {
              pfVar61 = (float *)((long)pvVar45 + lVar63);
              auVar263._0_4_ = fVar205 * *pfVar61;
              auVar263._4_4_ = fVar205 * pfVar61[1];
              auVar263._8_4_ = fVar205 * pfVar61[2];
              auVar263._12_4_ = fVar205 * pfVar61[3];
              auVar263._16_4_ = fVar205 * pfVar61[4];
              auVar263._20_4_ = fVar205 * pfVar61[5];
              auVar263._28_36_ = in_ZMM1._28_36_;
              auVar263._24_4_ = fVar205 * pfVar61[6];
              in_ZMM1 = ZEXT3264(auVar263._0_32_);
              *(undefined1 (*) [32])((long)*pauVar51 + lVar63) = auVar263._0_32_;
              lVar63 = lVar63 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar64 = (ulong)uVar7;
      local_f8 = sVar10;
      if (pMVar8[1].dims != 3) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims == 1) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar7) {
              uVar47 = 0;
              do {
                if (0 < (int)local_118) {
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  auVar141 = *(undefined1 (*) [32])((long)local_110->data + uVar47 * 0x20);
                  pvVar45 = pMVar9->data;
                  sVar12 = local_120->cstep;
                  sVar13 = local_120->elemsize;
                  pvVar60 = local_120->data;
                  lVar63 = 0;
                  iVar44 = (int)local_118;
                  do {
                    pfVar61 = (float *)((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47);
                    auVar267._0_4_ = auVar141._0_4_ * *pfVar61;
                    auVar267._4_4_ = auVar141._4_4_ * pfVar61[1];
                    auVar267._8_4_ = auVar141._8_4_ * pfVar61[2];
                    auVar267._12_4_ = auVar141._12_4_ * pfVar61[3];
                    auVar267._16_4_ = auVar141._16_4_ * pfVar61[4];
                    auVar267._20_4_ = auVar141._20_4_ * pfVar61[5];
                    auVar267._28_36_ = in_ZMM1._28_36_;
                    auVar267._24_4_ = auVar141._24_4_ * pfVar61[6];
                    in_ZMM1 = ZEXT3264(auVar267._0_32_);
                    *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                         auVar267._0_32_;
                    lVar63 = lVar63 + 0x20;
                    iVar44 = iVar44 + -1;
                  } while (iVar44 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar64);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar7) {
            fVar205 = *local_110->data;
            uVar47 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar45 = pMVar9->data;
                sVar12 = local_120->cstep;
                sVar13 = local_120->elemsize;
                pvVar60 = local_120->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  pfVar61 = (float *)((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47);
                  auVar265._0_4_ = fVar205 * *pfVar61;
                  auVar265._4_4_ = fVar205 * pfVar61[1];
                  auVar265._8_4_ = fVar205 * pfVar61[2];
                  auVar265._12_4_ = fVar205 * pfVar61[3];
                  auVar265._16_4_ = fVar205 * pfVar61[4];
                  auVar265._20_4_ = fVar205 * pfVar61[5];
                  auVar265._28_36_ = in_ZMM1._28_36_;
                  auVar265._24_4_ = fVar205 * pfVar61[6];
                  in_ZMM1 = ZEXT3264(auVar265._0_32_);
                  *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                       auVar265._0_32_;
                  lVar63 = lVar63 + 0x20;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        if (local_120[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar7) {
          uVar47 = 0;
          do {
            if (0 < (int)uVar6) {
              pauVar51 = (undefined1 (*) [32])
                         (pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar58 = (undefined1 (*) [32])
                         ((long)local_120[1].w * uVar47 * local_120[1].elemsize +
                         (long)local_120[1].data);
              pfVar61 = (float *)(local_120->cstep * uVar47 * local_120->elemsize +
                                 (long)local_120->data);
              uVar68 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar141 = *pauVar58;
                  uVar49 = uVar48;
                  do {
                    auVar253._0_4_ = auVar141._0_4_ * *pfVar61;
                    auVar253._4_4_ = auVar141._4_4_ * pfVar61[1];
                    auVar253._8_4_ = auVar141._8_4_ * pfVar61[2];
                    auVar253._12_4_ = auVar141._12_4_ * pfVar61[3];
                    auVar253._16_4_ = auVar141._16_4_ * pfVar61[4];
                    auVar253._20_4_ = auVar141._20_4_ * pfVar61[5];
                    auVar253._28_36_ = in_ZMM1._28_36_;
                    auVar253._24_4_ = auVar141._24_4_ * pfVar61[6];
                    in_ZMM1 = ZEXT3264(auVar253._0_32_);
                    *pauVar51 = auVar253._0_32_;
                    pfVar61 = pfVar61 + 8;
                    pauVar51 = pauVar51 + 1;
                    uVar67 = (int)uVar49 - 1;
                    uVar49 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                pauVar58 = pauVar58 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != uVar64);
          return 0;
        }
        return 0;
      }
      if (uVar66 == uVar7 && (uVar67 == 1 && (uVar68 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                auVar141 = *(undefined1 (*) [32])
                            ((long)pMVar8[1].data + pMVar8[1].cstep * uVar47 * pMVar8[1].elemsize);
                pvVar45 = pMVar8->data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar60 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  pfVar61 = (float *)((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47);
                  auVar248._0_4_ = auVar141._0_4_ * *pfVar61;
                  auVar248._4_4_ = auVar141._4_4_ * pfVar61[1];
                  auVar248._8_4_ = auVar141._8_4_ * pfVar61[2];
                  auVar248._12_4_ = auVar141._12_4_ * pfVar61[3];
                  auVar248._16_4_ = auVar141._16_4_ * pfVar61[4];
                  auVar248._20_4_ = auVar141._20_4_ * pfVar61[5];
                  auVar248._28_36_ = in_ZMM1._28_36_;
                  auVar248._24_4_ = auVar141._24_4_ * pfVar61[6];
                  in_ZMM1 = ZEXT3264(auVar248._0_32_);
                  *(undefined1 (*) [32])((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47) =
                       auVar248._0_32_;
                  lVar63 = lVar63 + 0x20;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar64;
      if ((uVar68 == uVar69) && (iVar46 == 1 && (uVar66 == 1 && uVar67 == uVar6))) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8->data;
                pvVar60 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  fVar205 = *(float *)((long)pvVar60 + lVar63);
                  pfVar61 = (float *)((long)pvVar45 + lVar63 * 8 + sVar10 * sVar11 * uVar47);
                  auVar14._4_4_ = fVar205 * pfVar61[1];
                  auVar14._0_4_ = fVar205 * *pfVar61;
                  auVar14._8_4_ = fVar205 * pfVar61[2];
                  auVar14._12_4_ = fVar205 * pfVar61[3];
                  auVar14._16_4_ = fVar205 * pfVar61[4];
                  auVar14._20_4_ = fVar205 * pfVar61[5];
                  auVar14._24_4_ = fVar205 * pfVar61[6];
                  auVar14._28_4_ = fVar205;
                  *(undefined1 (*) [32])((long)pvVar65 + lVar63 * 8 + sVar12 * sVar13 * uVar47) =
                       auVar14;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar69 ^ 1) == 0) && uVar7 == uVar66) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                auVar141 = *(undefined1 (*) [32])
                            ((long)pMVar8->data + pMVar8->cstep * uVar48 * pMVar8->elemsize);
                pvVar45 = pMVar8[1].data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar60 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  pfVar61 = (float *)((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48);
                  auVar254._0_4_ = auVar141._0_4_ * *pfVar61;
                  auVar254._4_4_ = auVar141._4_4_ * pfVar61[1];
                  auVar254._8_4_ = auVar141._8_4_ * pfVar61[2];
                  auVar254._12_4_ = auVar141._12_4_ * pfVar61[3];
                  auVar254._16_4_ = auVar141._16_4_ * pfVar61[4];
                  auVar254._20_4_ = auVar141._20_4_ * pfVar61[5];
                  auVar254._28_36_ = in_ZMM1._28_36_;
                  auVar254._24_4_ = auVar141._24_4_ * pfVar61[6];
                  in_ZMM1 = ZEXT3264(auVar254._0_32_);
                  *(undefined1 (*) [32])((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48) =
                       auVar254._0_32_;
                  lVar63 = lVar63 + 0x20;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar68 == uVar69) && (iVar44 == 1)) && ((uVar67 == uVar6 && (uVar7 == 1)))) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8[1].data;
                pvVar60 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  fVar205 = *(float *)((long)pvVar60 + lVar63);
                  pfVar61 = (float *)((long)pvVar45 + lVar63 * 8 + sVar10 * sVar11 * uVar48);
                  auVar16._4_4_ = fVar205 * pfVar61[1];
                  auVar16._0_4_ = fVar205 * *pfVar61;
                  auVar16._8_4_ = fVar205 * pfVar61[2];
                  auVar16._12_4_ = fVar205 * pfVar61[3];
                  auVar16._16_4_ = fVar205 * pfVar61[4];
                  auVar16._20_4_ = fVar205 * pfVar61[5];
                  auVar16._24_4_ = fVar205 * pfVar61[6];
                  auVar16._28_4_ = fVar205;
                  *(undefined1 (*) [32])((long)pvVar65 + lVar63 * 8 + sVar12 * sVar13 * uVar48) =
                       auVar16;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_130 = (void *)uVar47;
      if ((((uVar68 ^ 1) == 0 && uVar67 == uVar6) && uVar7 == uVar66) && uVar69 != 1) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar49 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar45 = local_120[1].data;
                pauVar51 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar49 * pMVar9->elemsize + (long)pMVar9->data);
                pfVar61 = (float *)(local_120->cstep * uVar49 * local_120->elemsize +
                                   (long)local_120->data);
                uVar64 = 0;
                do {
                  if (0 < (int)uVar69) {
                    auVar141 = *(undefined1 (*) [32])
                                ((long)pvVar45 + uVar64 * 0x20 + sVar10 * uVar49 * sVar11);
                    uVar70 = uVar48;
                    do {
                      auVar262._0_4_ = auVar141._0_4_ * *pfVar61;
                      auVar262._4_4_ = auVar141._4_4_ * pfVar61[1];
                      auVar262._8_4_ = auVar141._8_4_ * pfVar61[2];
                      auVar262._12_4_ = auVar141._12_4_ * pfVar61[3];
                      auVar262._16_4_ = auVar141._16_4_ * pfVar61[4];
                      auVar262._20_4_ = auVar141._20_4_ * pfVar61[5];
                      auVar262._28_36_ = in_ZMM1._28_36_;
                      auVar262._24_4_ = auVar141._24_4_ * pfVar61[6];
                      in_ZMM1 = ZEXT3264(auVar262._0_32_);
                      *pauVar51 = auVar262._0_32_;
                      pfVar61 = pfVar61 + 8;
                      pauVar51 = pauVar51 + 1;
                      uVar68 = (int)uVar70 - 1;
                      uVar70 = (ulong)uVar68;
                    } while (uVar68 != 0);
                  }
                  uVar64 = uVar64 + 1;
                } while (uVar64 != uVar6);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar67 == 1 && (uVar68 ^ uVar69) == 0) && uVar66 == uVar7) && uVar6 != 1) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar49 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar60 = (void *)(pMVar9->cstep * uVar49 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar65 = (void *)(local_120->cstep * uVar49 * local_120->elemsize +
                                  (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar45 = local_120[1].data;
                uVar68 = 0;
                do {
                  if (0 < (int)uVar69) {
                    lVar63 = 0;
                    do {
                      pfVar61 = (float *)((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar49);
                      pfVar62 = (float *)((long)pvVar65 + lVar63);
                      auVar18._4_4_ = pfVar61[1] * pfVar62[1];
                      auVar18._0_4_ = *pfVar61 * *pfVar62;
                      auVar18._8_4_ = pfVar61[2] * pfVar62[2];
                      auVar18._12_4_ = pfVar61[3] * pfVar62[3];
                      auVar18._16_4_ = pfVar61[4] * pfVar62[4];
                      auVar18._20_4_ = pfVar61[5] * pfVar62[5];
                      auVar18._24_4_ = pfVar61[6] * pfVar62[6];
                      auVar18._28_4_ = pfVar61[7];
                      *(undefined1 (*) [32])((long)pvVar60 + lVar63) = auVar18;
                      lVar63 = lVar63 + 0x20;
                    } while (uVar48 << 5 != lVar63);
                    pvVar60 = (void *)((long)pvVar60 + lVar63);
                    pvVar65 = (void *)((long)pvVar65 + lVar63);
                  }
                  uVar68 = uVar68 + 1;
                } while (uVar68 != uVar6);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar69 ^ 1) == 0 && uVar6 == uVar67) && uVar66 == uVar7) && uVar68 != 1) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)uVar67) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar45 = local_120->data;
                pauVar51 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                pfVar61 = (float *)(local_120[1].cstep * uVar48 * local_120[1].elemsize +
                                   (long)local_120[1].data);
                uVar49 = 0;
                do {
                  if (0 < (int)uVar68) {
                    auVar141 = *(undefined1 (*) [32])
                                ((long)pvVar45 + uVar49 * 0x20 + sVar10 * uVar48 * sVar11);
                    uVar69 = uVar68;
                    do {
                      auVar268._0_4_ = auVar141._0_4_ * *pfVar61;
                      auVar268._4_4_ = auVar141._4_4_ * pfVar61[1];
                      auVar268._8_4_ = auVar141._8_4_ * pfVar61[2];
                      auVar268._12_4_ = auVar141._12_4_ * pfVar61[3];
                      auVar268._16_4_ = auVar141._16_4_ * pfVar61[4];
                      auVar268._20_4_ = auVar141._20_4_ * pfVar61[5];
                      auVar268._28_36_ = in_ZMM1._28_36_;
                      auVar268._24_4_ = auVar141._24_4_ * pfVar61[6];
                      in_ZMM1 = ZEXT3264(auVar268._0_32_);
                      *pauVar51 = auVar268._0_32_;
                      pfVar61 = pfVar61 + 8;
                      pauVar51 = pauVar51 + 1;
                      uVar69 = uVar69 - 1;
                    } while (uVar69 != 0);
                  }
                  uVar49 = uVar49 + 1;
                } while (uVar49 != uVar67);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar68 ^ uVar69) == 0 && uVar6 == 1) && uVar7 == uVar66) && uVar67 != 1) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_130) {
            local_128 = (void *)(uVar49 << 5);
            iVar44 = 0;
            do {
              Mat::channel((Mat *)local_e0,local_120,iVar44);
              auVar43 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar44);
              auVar54 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar44);
              auVar74 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar67) {
                uVar69 = 0;
                do {
                  if (0 < (int)uVar68) {
                    lVar63 = 0;
                    do {
                      pfVar61 = (float *)((long)auVar54 + lVar63);
                      pfVar62 = (float *)((long)auVar43 + lVar63);
                      auVar19._4_4_ = pfVar61[1] * pfVar62[1];
                      auVar19._0_4_ = *pfVar61 * *pfVar62;
                      auVar19._8_4_ = pfVar61[2] * pfVar62[2];
                      auVar19._12_4_ = pfVar61[3] * pfVar62[3];
                      auVar19._16_4_ = pfVar61[4] * pfVar62[4];
                      auVar19._20_4_ = pfVar61[5] * pfVar62[5];
                      auVar19._24_4_ = pfVar61[6] * pfVar62[6];
                      auVar19._28_4_ = pfVar61[7];
                      *(undefined1 (*) [32])((long)auVar74 + lVar63) = auVar19;
                      lVar63 = lVar63 + 0x20;
                    } while (local_128 != (void *)lVar63);
                    auVar74 = (undefined1  [8])((long)auVar74 + lVar63);
                    auVar54 = (undefined1  [8])((long)auVar54 + lVar63);
                  }
                  uVar69 = uVar69 + 1;
                } while (uVar69 != uVar67);
              }
              iVar44 = iVar44 + 1;
            } while (iVar44 != (int)local_130);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_100) {
          iVar44 = 0;
          do {
            pMVar9 = local_108;
            Mat::channel((Mat *)local_e0,local_120,iVar44);
            auVar43 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar44);
            auVar54 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar44);
            auVar74 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_118) {
              lVar63 = 0;
              iVar46 = (int)local_118;
              do {
                pfVar61 = (float *)((long)auVar54 + lVar63);
                pfVar62 = (float *)((long)auVar43 + lVar63);
                auVar20._4_4_ = pfVar61[1] * pfVar62[1];
                auVar20._0_4_ = *pfVar61 * *pfVar62;
                auVar20._8_4_ = pfVar61[2] * pfVar62[2];
                auVar20._12_4_ = pfVar61[3] * pfVar62[3];
                auVar20._16_4_ = pfVar61[4] * pfVar62[4];
                auVar20._20_4_ = pfVar61[5] * pfVar62[5];
                auVar20._24_4_ = pfVar61[6] * pfVar62[6];
                auVar20._28_4_ = pfVar61[7];
                *(undefined1 (*) [32])((long)auVar74 + lVar63) = auVar20;
                lVar63 = lVar63 + 0x20;
                iVar46 = iVar46 + -1;
              } while (iVar46 != 0);
            }
            iVar44 = iVar44 + 1;
          } while (iVar44 != (int)local_100);
          return 0;
        }
        return 0;
      }
      return -100;
    case 3:
      uVar69 = pMVar8->w;
      uVar48 = (ulong)uVar69;
      sVar10 = pMVar8->elemsize;
      uVar68 = pMVar8[1].w;
      uVar49 = (ulong)uVar68;
      uVar67 = pMVar8[1].h;
      uVar66 = pMVar8[1].c;
      uVar47 = (ulong)uVar66;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar67 * uVar68);
      local_f0 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar44 == 1 && uVar69 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar68,local_f0,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar68) {
                fVar205 = *pMVar8->data;
                auVar161._4_4_ = fVar205;
                auVar161._0_4_ = fVar205;
                auVar161._8_4_ = fVar205;
                auVar161._12_4_ = fVar205;
                auVar161._16_4_ = fVar205;
                auVar161._20_4_ = fVar205;
                auVar161._24_4_ = fVar205;
                auVar161._28_4_ = fVar205;
                pvVar60 = pMVar1->data;
                lVar63 = 0;
                do {
                  auVar141 = *(undefined1 (*) [32])((long)pvVar60 + lVar63);
                  auVar179 = vrcpps_avx(auVar141);
                  auVar314._0_4_ = fVar205 * auVar179._0_4_;
                  auVar314._4_4_ = fVar205 * auVar179._4_4_;
                  auVar314._8_4_ = fVar205 * auVar179._8_4_;
                  auVar314._12_4_ = fVar205 * auVar179._12_4_;
                  auVar314._16_4_ = fVar205 * auVar179._16_4_;
                  auVar314._20_4_ = fVar205 * auVar179._20_4_;
                  auVar314._28_36_ = in_ZMM3._28_36_;
                  auVar314._24_4_ = fVar205 * auVar179._24_4_;
                  auVar301 = auVar314._0_32_;
                  in_ZMM3 = ZEXT3264(auVar301);
                  auVar82 = vfmsub213ps_fma(auVar141,auVar301,auVar161);
                  auVar82 = vfnmadd213ps_fma(ZEXT1632(auVar82),auVar179,auVar301);
                  *(undefined1 (*) [32])((long)pvVar45 + lVar63) = ZEXT1632(auVar82);
                  lVar63 = lVar63 + 0x20;
                  uVar69 = (int)uVar49 - 1;
                  uVar49 = (ulong)uVar69;
                } while (uVar69 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar68,uVar67,local_f0,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)local_130) {
                fVar205 = *pMVar8->data;
                auVar158._4_4_ = fVar205;
                auVar158._0_4_ = fVar205;
                auVar158._8_4_ = fVar205;
                auVar158._12_4_ = fVar205;
                auVar158._16_4_ = fVar205;
                auVar158._20_4_ = fVar205;
                auVar158._24_4_ = fVar205;
                auVar158._28_4_ = fVar205;
                pvVar60 = pMVar1->data;
                lVar63 = 0;
                do {
                  auVar141 = *(undefined1 (*) [32])((long)pvVar60 + lVar63);
                  auVar179 = vrcpps_avx(auVar141);
                  auVar313._0_4_ = fVar205 * auVar179._0_4_;
                  auVar313._4_4_ = fVar205 * auVar179._4_4_;
                  auVar313._8_4_ = fVar205 * auVar179._8_4_;
                  auVar313._12_4_ = fVar205 * auVar179._12_4_;
                  auVar313._16_4_ = fVar205 * auVar179._16_4_;
                  auVar313._20_4_ = fVar205 * auVar179._20_4_;
                  auVar313._28_36_ = in_ZMM3._28_36_;
                  auVar313._24_4_ = fVar205 * auVar179._24_4_;
                  auVar301 = auVar313._0_32_;
                  in_ZMM3 = ZEXT3264(auVar301);
                  auVar82 = vfmsub213ps_fma(auVar141,auVar301,auVar158);
                  auVar82 = vfnmadd213ps_fma(ZEXT1632(auVar82),auVar179,auVar301);
                  *(undefined1 (*) [32])((long)pvVar45 + lVar63) = ZEXT1632(auVar82);
                  lVar63 = lVar63 + 0x20;
                  local_130._0_4_ = (int)local_130 + -1;
                } while ((int)local_130 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar66) {
                fVar205 = *pMVar8->data;
                auVar138._4_4_ = fVar205;
                auVar138._0_4_ = fVar205;
                auVar138._8_4_ = fVar205;
                auVar138._12_4_ = fVar205;
                auVar138._16_4_ = fVar205;
                auVar138._20_4_ = fVar205;
                auVar138._24_4_ = fVar205;
                auVar138._28_4_ = fVar205;
                uVar48 = 0;
                do {
                  if (0 < (int)local_130) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar45 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar60 = pMVar8[1].data;
                    lVar63 = 0;
                    iVar44 = (int)local_130;
                    do {
                      auVar141 = *(undefined1 (*) [32])
                                  ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48);
                      auVar179 = vrcpps_avx(auVar141);
                      auVar304._0_4_ = fVar205 * auVar179._0_4_;
                      auVar304._4_4_ = fVar205 * auVar179._4_4_;
                      auVar304._8_4_ = fVar205 * auVar179._8_4_;
                      auVar304._12_4_ = fVar205 * auVar179._12_4_;
                      auVar304._16_4_ = fVar205 * auVar179._16_4_;
                      auVar304._20_4_ = fVar205 * auVar179._20_4_;
                      auVar304._28_36_ = in_ZMM3._28_36_;
                      auVar304._24_4_ = fVar205 * auVar179._24_4_;
                      auVar301 = auVar304._0_32_;
                      in_ZMM3 = ZEXT3264(auVar301);
                      auVar82 = vfmsub213ps_fma(auVar141,auVar301,auVar138);
                      auVar82 = vfnmadd213ps_fma(ZEXT1632(auVar82),auVar179,auVar301);
                      *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) =
                           ZEXT1632(auVar82);
                      lVar63 = lVar63 + 0x20;
                      iVar44 = iVar44 + -1;
                    } while (iVar44 != 0);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar47);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar69,sVar10,iVar44,opt->blob_allocator);
          pvVar45 = pMVar9->data;
          if (pvVar45 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar46 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar69) {
              pvVar60 = pMVar8->data;
              pvVar65 = pMVar8[1].data;
              lVar63 = 0;
              do {
                auVar141 = *(undefined1 (*) [32])((long)pvVar65 + lVar63);
                auVar301 = vrcpps_avx(auVar141);
                auVar179 = *(undefined1 (*) [32])((long)pvVar60 + lVar63);
                auVar322._0_4_ = auVar179._0_4_ * auVar301._0_4_;
                auVar322._4_4_ = auVar179._4_4_ * auVar301._4_4_;
                auVar322._8_4_ = auVar179._8_4_ * auVar301._8_4_;
                auVar322._12_4_ = auVar179._12_4_ * auVar301._12_4_;
                auVar322._16_4_ = auVar179._16_4_ * auVar301._16_4_;
                auVar322._20_4_ = auVar179._20_4_ * auVar301._20_4_;
                auVar322._28_36_ = in_ZMM3._28_36_;
                auVar322._24_4_ = auVar179._24_4_ * auVar301._24_4_;
                auVar271 = auVar322._0_32_;
                in_ZMM3 = ZEXT3264(auVar271);
                auVar82 = vfmsub213ps_fma(auVar141,auVar271,auVar179);
                auVar82 = vfnmadd213ps_fma(ZEXT1632(auVar82),auVar301,auVar271);
                *(undefined1 (*) [32])((long)pvVar45 + lVar63) = ZEXT1632(auVar82);
                lVar63 = lVar63 + 0x20;
                uVar69 = (int)uVar48 - 1;
                uVar48 = (ulong)uVar69;
              } while (uVar69 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar69) {
            fVar205 = 1.0 / *local_110->data;
            pvVar60 = pMVar8->data;
            lVar63 = 0;
            do {
              pfVar61 = (float *)((long)pvVar60 + lVar63);
              auVar257._0_4_ = fVar205 * *pfVar61;
              auVar257._4_4_ = fVar205 * pfVar61[1];
              auVar257._8_4_ = fVar205 * pfVar61[2];
              auVar257._12_4_ = fVar205 * pfVar61[3];
              auVar257._16_4_ = fVar205 * pfVar61[4];
              auVar257._20_4_ = fVar205 * pfVar61[5];
              auVar257._28_36_ = in_ZMM1._28_36_;
              auVar257._24_4_ = fVar205 * pfVar61[6];
              in_ZMM1 = ZEXT3264(auVar257._0_32_);
              *(undefined1 (*) [32])((long)pvVar45 + lVar63) = auVar257._0_32_;
              lVar63 = lVar63 + 0x20;
              uVar69 = (int)uVar48 - 1;
              uVar48 = (ulong)uVar69;
            } while (uVar69 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar68,uVar67,local_f0,iVar46,opt->blob_allocator);
          pauVar51 = (undefined1 (*) [32])pMVar9->data;
          if (pauVar51 == (undefined1 (*) [32])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar67) {
              pauVar58 = (undefined1 (*) [32])pMVar8->data;
              pauVar56 = (undefined1 (*) [32])pMVar8[1].data;
              uVar69 = 0;
              do {
                if (0 < (int)uVar68) {
                  auVar141 = *pauVar58;
                  uVar66 = uVar68;
                  do {
                    auVar179 = vrcpps_avx(*pauVar56);
                    auVar311._0_4_ = auVar141._0_4_ * auVar179._0_4_;
                    auVar311._4_4_ = auVar141._4_4_ * auVar179._4_4_;
                    auVar311._8_4_ = auVar141._8_4_ * auVar179._8_4_;
                    auVar311._12_4_ = auVar141._12_4_ * auVar179._12_4_;
                    auVar311._16_4_ = auVar141._16_4_ * auVar179._16_4_;
                    auVar311._20_4_ = auVar141._20_4_ * auVar179._20_4_;
                    auVar311._28_36_ = in_ZMM3._28_36_;
                    auVar311._24_4_ = auVar141._24_4_ * auVar179._24_4_;
                    auVar301 = auVar311._0_32_;
                    in_ZMM3 = ZEXT3264(auVar301);
                    auVar82 = vfmsub213ps_fma(*pauVar56,auVar301,auVar141);
                    auVar82 = vfnmadd213ps_fma(ZEXT1632(auVar82),auVar179,auVar301);
                    *pauVar51 = ZEXT1632(auVar82);
                    pauVar56 = pauVar56 + 1;
                    pauVar51 = pauVar51 + 1;
                    uVar66 = uVar66 - 1;
                  } while (uVar66 != 0);
                }
                pauVar58 = pauVar58 + 1;
                uVar69 = uVar69 + 1;
              } while (uVar69 != uVar67);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar66) {
          uVar48 = 0;
          do {
            if (0 < (int)local_130) {
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar9->elemsize;
              auVar141 = *(undefined1 (*) [32])((long)pMVar8->data + uVar48 * 0x20);
              pvVar45 = pMVar9->data;
              sVar12 = pMVar8[1].cstep;
              sVar13 = pMVar8[1].elemsize;
              pvVar60 = pMVar8[1].data;
              lVar63 = 0;
              iVar44 = (int)local_130;
              do {
                auVar179 = *(undefined1 (*) [32])((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48)
                ;
                auVar301 = vrcpps_avx(auVar179);
                auVar305._0_4_ = auVar141._0_4_ * auVar301._0_4_;
                auVar305._4_4_ = auVar141._4_4_ * auVar301._4_4_;
                auVar305._8_4_ = auVar141._8_4_ * auVar301._8_4_;
                auVar305._12_4_ = auVar141._12_4_ * auVar301._12_4_;
                auVar305._16_4_ = auVar141._16_4_ * auVar301._16_4_;
                auVar305._20_4_ = auVar141._20_4_ * auVar301._20_4_;
                auVar305._28_36_ = in_ZMM3._28_36_;
                auVar305._24_4_ = auVar141._24_4_ * auVar301._24_4_;
                auVar271 = auVar305._0_32_;
                in_ZMM3 = ZEXT3264(auVar271);
                auVar82 = vfmsub213ps_fma(auVar179,auVar271,auVar141);
                auVar82 = vfnmadd213ps_fma(ZEXT1632(auVar82),auVar301,auVar271);
                *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) =
                     ZEXT1632(auVar82);
                lVar63 = lVar63 + 0x20;
                iVar44 = iVar44 + -1;
              } while (iVar44 != 0);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar47);
          return 0;
        }
        return 0;
      }
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar46);
      uVar6 = pMVar8->h;
      local_118 = CONCAT44(local_118._4_4_,uVar6 * uVar69);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar66) {
              uVar48 = 0;
              do {
                if (0 < (int)uVar67) {
                  pauVar51 = (undefined1 (*) [32])
                             (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                  pauVar58 = (undefined1 (*) [32])
                             (local_120[1].cstep * uVar48 * local_120[1].elemsize +
                             (long)local_120[1].data);
                  pauVar56 = (undefined1 (*) [32])
                             ((long)local_120->w * uVar48 * local_120->elemsize +
                             (long)local_120->data);
                  uVar69 = 0;
                  do {
                    if (0 < (int)uVar68) {
                      auVar141 = *pauVar56;
                      uVar66 = uVar68;
                      do {
                        auVar179 = vrcpps_avx(*pauVar58);
                        auVar303._0_4_ = auVar141._0_4_ * auVar179._0_4_;
                        auVar303._4_4_ = auVar141._4_4_ * auVar179._4_4_;
                        auVar303._8_4_ = auVar141._8_4_ * auVar179._8_4_;
                        auVar303._12_4_ = auVar141._12_4_ * auVar179._12_4_;
                        auVar303._16_4_ = auVar141._16_4_ * auVar179._16_4_;
                        auVar303._20_4_ = auVar141._20_4_ * auVar179._20_4_;
                        auVar303._28_36_ = in_ZMM3._28_36_;
                        auVar303._24_4_ = auVar141._24_4_ * auVar179._24_4_;
                        auVar301 = auVar303._0_32_;
                        in_ZMM3 = ZEXT3264(auVar301);
                        auVar82 = vfmsub213ps_fma(*pauVar58,auVar301,auVar141);
                        auVar82 = vfnmadd213ps_fma(ZEXT1632(auVar82),auVar179,auVar301);
                        *pauVar51 = ZEXT1632(auVar82);
                        pauVar58 = pauVar58 + 1;
                        pauVar51 = pauVar51 + 1;
                        uVar66 = uVar66 - 1;
                      } while (uVar66 != 0);
                    }
                    pauVar56 = pauVar56 + 1;
                    uVar69 = uVar69 + 1;
                  } while (uVar69 != uVar67);
                }
                uVar48 = uVar48 + 1;
              } while (uVar48 != uVar47);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pvVar45 = pMVar9->data;
        if (pvVar45 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_118) {
            pvVar60 = local_120->data;
            pvVar65 = local_120[1].data;
            lVar63 = 0;
            do {
              auVar141 = *(undefined1 (*) [32])((long)pvVar65 + lVar63);
              auVar301 = vrcpps_avx(auVar141);
              auVar179 = *(undefined1 (*) [32])((long)pvVar60 + lVar63);
              auVar306._0_4_ = auVar179._0_4_ * auVar301._0_4_;
              auVar306._4_4_ = auVar179._4_4_ * auVar301._4_4_;
              auVar306._8_4_ = auVar179._8_4_ * auVar301._8_4_;
              auVar306._12_4_ = auVar179._12_4_ * auVar301._12_4_;
              auVar306._16_4_ = auVar179._16_4_ * auVar301._16_4_;
              auVar306._20_4_ = auVar179._20_4_ * auVar301._20_4_;
              auVar306._28_36_ = in_ZMM3._28_36_;
              auVar306._24_4_ = auVar179._24_4_ * auVar301._24_4_;
              auVar271 = auVar306._0_32_;
              in_ZMM3 = ZEXT3264(auVar271);
              auVar82 = vfmsub213ps_fma(auVar141,auVar271,auVar179);
              auVar82 = vfnmadd213ps_fma(ZEXT1632(auVar82),auVar301,auVar271);
              *(undefined1 (*) [32])((long)pvVar45 + lVar63) = ZEXT1632(auVar82);
              lVar63 = lVar63 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pauVar51 = (undefined1 (*) [32])pMVar9->data;
        if (pauVar51 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pfVar61 = (float *)local_120->data;
              pauVar58 = (undefined1 (*) [32])local_120[1].data;
              uVar68 = 0;
              auVar185._8_4_ = 0x3f800000;
              auVar185._0_8_ = 0x3f8000003f800000;
              auVar185._12_4_ = 0x3f800000;
              auVar185._16_4_ = 0x3f800000;
              auVar185._20_4_ = 0x3f800000;
              auVar185._24_4_ = 0x3f800000;
              auVar185._28_4_ = 0x3f800000;
              do {
                if (0 < (int)uVar69) {
                  auVar141 = vrcpps_avx(*pauVar58);
                  auVar82 = vfmsub213ps_fma(*pauVar58,auVar141,auVar185);
                  auVar82 = vfnmadd132ps_fma(ZEXT1632(auVar82),auVar141,auVar141);
                  uVar47 = uVar48;
                  do {
                    auVar29._4_4_ = auVar82._4_4_ * pfVar61[1];
                    auVar29._0_4_ = auVar82._0_4_ * *pfVar61;
                    auVar29._8_4_ = auVar82._8_4_ * pfVar61[2];
                    auVar29._12_4_ = auVar82._12_4_ * pfVar61[3];
                    auVar29._16_4_ = pfVar61[4] * 0.0;
                    auVar29._20_4_ = pfVar61[5] * 0.0;
                    auVar29._24_4_ = pfVar61[6] * 0.0;
                    auVar29._28_4_ = auVar141._28_4_;
                    *pauVar51 = auVar29;
                    pfVar61 = pfVar61 + 8;
                    pauVar51 = pauVar51 + 1;
                    uVar67 = (int)uVar47 - 1;
                    uVar47 = (ulong)uVar67;
                    auVar141 = auVar29;
                  } while (uVar67 != 0);
                }
                pauVar58 = pauVar58 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            fVar205 = 1.0 / *local_110->data;
            pvVar45 = local_120->data;
            lVar63 = 0;
            do {
              pfVar61 = (float *)((long)pvVar45 + lVar63);
              auVar264._0_4_ = fVar205 * *pfVar61;
              auVar264._4_4_ = fVar205 * pfVar61[1];
              auVar264._8_4_ = fVar205 * pfVar61[2];
              auVar264._12_4_ = fVar205 * pfVar61[3];
              auVar264._16_4_ = fVar205 * pfVar61[4];
              auVar264._20_4_ = fVar205 * pfVar61[5];
              auVar264._28_36_ = in_ZMM1._28_36_;
              auVar264._24_4_ = fVar205 * pfVar61[6];
              in_ZMM1 = ZEXT3264(auVar264._0_32_);
              *(undefined1 (*) [32])((long)*pauVar51 + lVar63) = auVar264._0_32_;
              lVar63 = lVar63 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar64 = (ulong)uVar7;
      local_f8 = sVar10;
      if (pMVar8[1].dims != 3) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims == 1) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar7) {
              uVar47 = 0;
              auVar183._8_4_ = 0x3f800000;
              auVar183._0_8_ = 0x3f8000003f800000;
              auVar183._12_4_ = 0x3f800000;
              auVar183._16_4_ = 0x3f800000;
              auVar183._20_4_ = 0x3f800000;
              auVar183._24_4_ = 0x3f800000;
              auVar183._28_4_ = 0x3f800000;
              do {
                if (0 < (int)local_118) {
                  auVar141 = *(undefined1 (*) [32])((long)local_110->data + uVar47 * 0x20);
                  auVar179 = vrcpps_avx(auVar141);
                  sVar10 = pMVar9->cstep;
                  sVar11 = local_120->cstep;
                  sVar12 = pMVar9->elemsize;
                  auVar82 = vfmsub213ps_fma(auVar141,auVar179,auVar183);
                  pvVar45 = pMVar9->data;
                  auVar82 = vfnmadd132ps_fma(ZEXT1632(auVar82),auVar179,auVar179);
                  sVar13 = local_120->elemsize;
                  pvVar60 = local_120->data;
                  lVar63 = 0;
                  iVar44 = (int)local_118;
                  do {
                    pfVar61 = (float *)((long)pvVar60 + lVar63 + sVar11 * sVar13 * uVar47);
                    auVar27._4_4_ = auVar82._4_4_ * pfVar61[1];
                    auVar27._0_4_ = auVar82._0_4_ * *pfVar61;
                    auVar27._8_4_ = auVar82._8_4_ * pfVar61[2];
                    auVar27._12_4_ = auVar82._12_4_ * pfVar61[3];
                    auVar27._16_4_ = pfVar61[4] * 0.0;
                    auVar27._20_4_ = pfVar61[5] * 0.0;
                    auVar27._24_4_ = pfVar61[6] * 0.0;
                    auVar27._28_4_ = auVar179._28_4_;
                    *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar12 * uVar47) =
                         auVar27;
                    lVar63 = lVar63 + 0x20;
                    iVar44 = iVar44 + -1;
                    auVar179 = auVar27;
                  } while (iVar44 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar64);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar7) {
            fVar205 = 1.0 / *local_120[1].data;
            uVar47 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar45 = pMVar9->data;
                sVar12 = local_120->cstep;
                sVar13 = local_120->elemsize;
                pvVar60 = local_120->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  pfVar61 = (float *)((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47);
                  auVar266._0_4_ = fVar205 * *pfVar61;
                  auVar266._4_4_ = fVar205 * pfVar61[1];
                  auVar266._8_4_ = fVar205 * pfVar61[2];
                  auVar266._12_4_ = fVar205 * pfVar61[3];
                  auVar266._16_4_ = fVar205 * pfVar61[4];
                  auVar266._20_4_ = fVar205 * pfVar61[5];
                  auVar266._28_36_ = in_ZMM1._28_36_;
                  auVar266._24_4_ = fVar205 * pfVar61[6];
                  in_ZMM1 = ZEXT3264(auVar266._0_32_);
                  *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                       auVar266._0_32_;
                  lVar63 = lVar63 + 0x20;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        if (local_120[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar7) {
          uVar47 = 0;
          auVar144._8_4_ = 0x3f800000;
          auVar144._0_8_ = 0x3f8000003f800000;
          auVar144._12_4_ = 0x3f800000;
          auVar144._16_4_ = 0x3f800000;
          auVar144._20_4_ = 0x3f800000;
          auVar144._24_4_ = 0x3f800000;
          auVar144._28_4_ = 0x3f800000;
          do {
            if (0 < (int)uVar6) {
              pauVar51 = (undefined1 (*) [32])
                         (pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar58 = (undefined1 (*) [32])
                         ((long)local_120[1].w * uVar47 * local_120[1].elemsize +
                         (long)local_120[1].data);
              pfVar61 = (float *)(local_120->cstep * uVar47 * local_120->elemsize +
                                 (long)local_120->data);
              uVar68 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar141 = vrcpps_avx(*pauVar58);
                  auVar82 = vfmsub213ps_fma(*pauVar58,auVar141,auVar144);
                  auVar82 = vfnmadd132ps_fma(ZEXT1632(auVar82),auVar141,auVar141);
                  uVar49 = uVar48;
                  do {
                    auVar23._4_4_ = auVar82._4_4_ * pfVar61[1];
                    auVar23._0_4_ = auVar82._0_4_ * *pfVar61;
                    auVar23._8_4_ = auVar82._8_4_ * pfVar61[2];
                    auVar23._12_4_ = auVar82._12_4_ * pfVar61[3];
                    auVar23._16_4_ = pfVar61[4] * 0.0;
                    auVar23._20_4_ = pfVar61[5] * 0.0;
                    auVar23._24_4_ = pfVar61[6] * 0.0;
                    auVar23._28_4_ = auVar141._28_4_;
                    *pauVar51 = auVar23;
                    pfVar61 = pfVar61 + 8;
                    pauVar51 = pauVar51 + 1;
                    uVar67 = (int)uVar49 - 1;
                    uVar49 = (ulong)uVar67;
                    auVar141 = auVar23;
                  } while (uVar67 != 0);
                }
                pauVar58 = pauVar58 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != uVar64);
          return 0;
        }
        return 0;
      }
      if (uVar66 == uVar7 && (uVar67 == 1 && (uVar68 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            auVar136._8_4_ = 0x3f800000;
            auVar136._0_8_ = 0x3f8000003f800000;
            auVar136._12_4_ = 0x3f800000;
            auVar136._16_4_ = 0x3f800000;
            auVar136._20_4_ = 0x3f800000;
            auVar136._24_4_ = 0x3f800000;
            auVar136._28_4_ = 0x3f800000;
            do {
              if (0 < (int)local_118) {
                auVar141 = *(undefined1 (*) [32])
                            ((long)pMVar8[1].data + pMVar8[1].cstep * uVar47 * pMVar8[1].elemsize);
                auVar179 = vrcpps_avx(auVar141);
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar8->cstep;
                sVar12 = pMVar8->elemsize;
                auVar82 = vfmsub213ps_fma(auVar141,auVar179,auVar136);
                pvVar45 = pMVar8->data;
                auVar82 = vfnmadd132ps_fma(ZEXT1632(auVar82),auVar179,auVar179);
                sVar13 = pMVar9->elemsize;
                pvVar60 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  pfVar61 = (float *)((long)pvVar45 + lVar63 + sVar11 * sVar12 * uVar47);
                  auVar21._4_4_ = auVar82._4_4_ * pfVar61[1];
                  auVar21._0_4_ = auVar82._0_4_ * *pfVar61;
                  auVar21._8_4_ = auVar82._8_4_ * pfVar61[2];
                  auVar21._12_4_ = auVar82._12_4_ * pfVar61[3];
                  auVar21._16_4_ = pfVar61[4] * 0.0;
                  auVar21._20_4_ = pfVar61[5] * 0.0;
                  auVar21._24_4_ = pfVar61[6] * 0.0;
                  auVar21._28_4_ = auVar179._28_4_;
                  *(undefined1 (*) [32])((long)pvVar60 + lVar63 + sVar10 * sVar13 * uVar47) =
                       auVar21;
                  lVar63 = lVar63 + 0x20;
                  iVar44 = iVar44 + -1;
                  auVar179 = auVar21;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar64;
      if ((uVar68 == uVar69) && (iVar46 == 1 && (uVar66 == 1 && uVar67 == uVar6))) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8->data;
                pvVar60 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  fVar205 = 1.0 / *(float *)((long)pvVar60 + lVar63);
                  pfVar61 = (float *)((long)pvVar45 + lVar63 * 8 + sVar10 * sVar11 * uVar47);
                  auVar15._4_4_ = fVar205 * pfVar61[1];
                  auVar15._0_4_ = fVar205 * *pfVar61;
                  auVar15._8_4_ = fVar205 * pfVar61[2];
                  auVar15._12_4_ = fVar205 * pfVar61[3];
                  auVar15._16_4_ = fVar205 * pfVar61[4];
                  auVar15._20_4_ = fVar205 * pfVar61[5];
                  auVar15._24_4_ = fVar205 * pfVar61[6];
                  auVar15._28_4_ = fVar205;
                  *(undefined1 (*) [32])((long)pvVar65 + lVar63 * 8 + sVar12 * sVar13 * uVar47) =
                       auVar15;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar69 ^ 1) == 0) && uVar7 == uVar66) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                auVar141 = *(undefined1 (*) [32])
                            ((long)pMVar8->data + pMVar8->cstep * uVar48 * pMVar8->elemsize);
                pvVar45 = pMVar8[1].data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar60 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  auVar179 = *(undefined1 (*) [32])
                              ((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48);
                  auVar301 = vrcpps_avx(auVar179);
                  auVar310._0_4_ = auVar141._0_4_ * auVar301._0_4_;
                  auVar310._4_4_ = auVar141._4_4_ * auVar301._4_4_;
                  auVar310._8_4_ = auVar141._8_4_ * auVar301._8_4_;
                  auVar310._12_4_ = auVar141._12_4_ * auVar301._12_4_;
                  auVar310._16_4_ = auVar141._16_4_ * auVar301._16_4_;
                  auVar310._20_4_ = auVar141._20_4_ * auVar301._20_4_;
                  auVar310._28_36_ = in_ZMM3._28_36_;
                  auVar310._24_4_ = auVar141._24_4_ * auVar301._24_4_;
                  auVar271 = auVar310._0_32_;
                  in_ZMM3 = ZEXT3264(auVar271);
                  auVar82 = vfmsub213ps_fma(auVar179,auVar271,auVar141);
                  auVar82 = vfnmadd213ps_fma(ZEXT1632(auVar82),auVar301,auVar271);
                  *(undefined1 (*) [32])((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48) =
                       ZEXT1632(auVar82);
                  lVar63 = lVar63 + 0x20;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar68 == uVar69) && (iVar44 == 1)) && (uVar67 == uVar6)) && (uVar7 == 1)) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8[1].data;
                pvVar60 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  auVar141 = *(undefined1 (*) [32])
                              ((long)pvVar45 + lVar63 * 8 + sVar10 * sVar11 * uVar48);
                  auVar179 = vrcpps_avx(auVar141);
                  fVar205 = *(float *)((long)pvVar60 + lVar63);
                  auVar272._4_4_ = fVar205;
                  auVar272._0_4_ = fVar205;
                  auVar272._8_4_ = fVar205;
                  auVar272._12_4_ = fVar205;
                  auVar272._16_4_ = fVar205;
                  auVar272._20_4_ = fVar205;
                  auVar272._24_4_ = fVar205;
                  auVar272._28_4_ = fVar205;
                  auVar315._0_4_ = fVar205 * auVar179._0_4_;
                  auVar315._4_4_ = fVar205 * auVar179._4_4_;
                  auVar315._8_4_ = fVar205 * auVar179._8_4_;
                  auVar315._12_4_ = fVar205 * auVar179._12_4_;
                  auVar315._16_4_ = fVar205 * auVar179._16_4_;
                  auVar315._20_4_ = fVar205 * auVar179._20_4_;
                  auVar315._28_36_ = in_ZMM3._28_36_;
                  auVar315._24_4_ = fVar205 * auVar179._24_4_;
                  auVar301 = auVar315._0_32_;
                  in_ZMM3 = ZEXT3264(auVar301);
                  auVar82 = vfmsub213ps_fma(auVar141,auVar301,auVar272);
                  auVar82 = vfnmadd213ps_fma(ZEXT1632(auVar82),auVar179,auVar301);
                  *(undefined1 (*) [32])((long)pvVar65 + lVar63 * 8 + sVar12 * sVar13 * uVar48) =
                       ZEXT1632(auVar82);
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_130 = (void *)uVar47;
      if ((((uVar68 ^ 1) == 0 && uVar67 == uVar6) && uVar7 == uVar66) && uVar69 != 1) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar49 = 0;
            auVar171._8_4_ = 0x3f800000;
            auVar171._0_8_ = 0x3f8000003f800000;
            auVar171._12_4_ = 0x3f800000;
            auVar171._16_4_ = 0x3f800000;
            auVar171._20_4_ = 0x3f800000;
            auVar171._24_4_ = 0x3f800000;
            auVar171._28_4_ = 0x3f800000;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar45 = local_120[1].data;
                pauVar51 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar49 * pMVar9->elemsize + (long)pMVar9->data);
                pfVar61 = (float *)(local_120->cstep * uVar49 * local_120->elemsize +
                                   (long)local_120->data);
                uVar64 = 0;
                do {
                  if (0 < (int)uVar69) {
                    auVar141 = *(undefined1 (*) [32])
                                ((long)pvVar45 + uVar64 * 0x20 + sVar10 * uVar49 * sVar11);
                    auVar179 = vrcpps_avx(auVar141);
                    auVar82 = vfmsub213ps_fma(auVar141,auVar179,auVar171);
                    auVar82 = vfnmadd132ps_fma(ZEXT1632(auVar82),auVar179,auVar179);
                    uVar70 = uVar48;
                    do {
                      auVar26._4_4_ = auVar82._4_4_ * pfVar61[1];
                      auVar26._0_4_ = auVar82._0_4_ * *pfVar61;
                      auVar26._8_4_ = auVar82._8_4_ * pfVar61[2];
                      auVar26._12_4_ = auVar82._12_4_ * pfVar61[3];
                      auVar26._16_4_ = pfVar61[4] * 0.0;
                      auVar26._20_4_ = pfVar61[5] * 0.0;
                      auVar26._24_4_ = pfVar61[6] * 0.0;
                      auVar26._28_4_ = auVar179._28_4_;
                      *pauVar51 = auVar26;
                      pfVar61 = pfVar61 + 8;
                      pauVar51 = pauVar51 + 1;
                      uVar68 = (int)uVar70 - 1;
                      uVar70 = (ulong)uVar68;
                      auVar179 = auVar26;
                    } while (uVar68 != 0);
                  }
                  uVar64 = uVar64 + 1;
                } while (uVar64 != uVar6);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar67 == 1 && (uVar68 ^ uVar69) == 0) && uVar66 == uVar7) && uVar6 != 1) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar49 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar60 = (void *)(pMVar9->cstep * uVar49 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar65 = (void *)(local_120->cstep * uVar49 * local_120->elemsize +
                                  (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar45 = local_120[1].data;
                uVar68 = 0;
                do {
                  if (0 < (int)uVar69) {
                    lVar63 = 0;
                    do {
                      auVar141 = *(undefined1 (*) [32])
                                  ((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar49);
                      auVar301 = vrcpps_avx(auVar141);
                      auVar179 = *(undefined1 (*) [32])((long)pvVar65 + lVar63);
                      auVar319._0_4_ = auVar179._0_4_ * auVar301._0_4_;
                      auVar319._4_4_ = auVar179._4_4_ * auVar301._4_4_;
                      auVar319._8_4_ = auVar179._8_4_ * auVar301._8_4_;
                      auVar319._12_4_ = auVar179._12_4_ * auVar301._12_4_;
                      auVar319._16_4_ = auVar179._16_4_ * auVar301._16_4_;
                      auVar319._20_4_ = auVar179._20_4_ * auVar301._20_4_;
                      auVar319._28_36_ = in_ZMM3._28_36_;
                      auVar319._24_4_ = auVar179._24_4_ * auVar301._24_4_;
                      auVar271 = auVar319._0_32_;
                      in_ZMM3 = ZEXT3264(auVar271);
                      auVar82 = vfmsub213ps_fma(auVar141,auVar271,auVar179);
                      auVar82 = vfnmadd213ps_fma(ZEXT1632(auVar82),auVar301,auVar271);
                      *(undefined1 (*) [32])((long)pvVar60 + lVar63) = ZEXT1632(auVar82);
                      lVar63 = lVar63 + 0x20;
                    } while (uVar48 << 5 != lVar63);
                    pvVar60 = (void *)((long)pvVar60 + lVar63);
                    pvVar65 = (void *)((long)pvVar65 + lVar63);
                  }
                  uVar68 = uVar68 + 1;
                } while (uVar68 != uVar6);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar69 ^ 1) == 0 && uVar6 == uVar67) && uVar66 == uVar7) && uVar68 != 1) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)uVar67) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar45 = local_120->data;
                pauVar51 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar58 = (undefined1 (*) [32])
                           (local_120[1].cstep * uVar48 * local_120[1].elemsize +
                           (long)local_120[1].data);
                uVar49 = 0;
                do {
                  if (0 < (int)uVar68) {
                    auVar141 = *(undefined1 (*) [32])
                                ((long)pvVar45 + uVar49 * 0x20 + sVar10 * uVar48 * sVar11);
                    uVar69 = uVar68;
                    do {
                      auVar179 = vrcpps_avx(*pauVar58);
                      auVar324._0_4_ = auVar141._0_4_ * auVar179._0_4_;
                      auVar324._4_4_ = auVar141._4_4_ * auVar179._4_4_;
                      auVar324._8_4_ = auVar141._8_4_ * auVar179._8_4_;
                      auVar324._12_4_ = auVar141._12_4_ * auVar179._12_4_;
                      auVar324._16_4_ = auVar141._16_4_ * auVar179._16_4_;
                      auVar324._20_4_ = auVar141._20_4_ * auVar179._20_4_;
                      auVar324._28_36_ = in_ZMM3._28_36_;
                      auVar324._24_4_ = auVar141._24_4_ * auVar179._24_4_;
                      auVar301 = auVar324._0_32_;
                      in_ZMM3 = ZEXT3264(auVar301);
                      auVar82 = vfmsub213ps_fma(*pauVar58,auVar301,auVar141);
                      auVar82 = vfnmadd213ps_fma(ZEXT1632(auVar82),auVar179,auVar301);
                      *pauVar51 = ZEXT1632(auVar82);
                      pauVar58 = pauVar58 + 1;
                      pauVar51 = pauVar51 + 1;
                      uVar69 = uVar69 - 1;
                    } while (uVar69 != 0);
                  }
                  uVar49 = uVar49 + 1;
                } while (uVar49 != uVar67);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar68 ^ uVar69) == 0 && uVar6 == 1) && uVar66 == uVar7) && uVar67 != 1) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_130) {
            local_128 = (void *)(uVar49 << 5);
            iVar44 = 0;
            do {
              in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
              Mat::channel((Mat *)local_e0,local_120,iVar44);
              auVar43 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar44);
              auVar54 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar44);
              auVar74 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar67) {
                uVar69 = 0;
                do {
                  if (0 < (int)uVar68) {
                    lVar63 = 0;
                    do {
                      auVar179 = vrcpps_avx(*(undefined1 (*) [32])((long)auVar54 + lVar63));
                      auVar141 = *(undefined1 (*) [32])((long)auVar43 + lVar63);
                      auVar326._0_4_ = auVar141._0_4_ * auVar179._0_4_;
                      auVar326._4_4_ = auVar141._4_4_ * auVar179._4_4_;
                      auVar326._8_4_ = auVar141._8_4_ * auVar179._8_4_;
                      auVar326._12_4_ = auVar141._12_4_ * auVar179._12_4_;
                      auVar326._16_4_ = auVar141._16_4_ * auVar179._16_4_;
                      auVar326._20_4_ = auVar141._20_4_ * auVar179._20_4_;
                      auVar326._28_36_ = in_ZMM3._28_36_;
                      auVar326._24_4_ = auVar141._24_4_ * auVar179._24_4_;
                      auVar301 = auVar326._0_32_;
                      in_ZMM3 = ZEXT3264(auVar301);
                      auVar82 = vfmsub213ps_fma(*(undefined1 (*) [32])((long)auVar54 + lVar63),
                                                auVar301,auVar141);
                      auVar82 = vfnmadd213ps_fma(ZEXT1632(auVar82),auVar179,auVar301);
                      *(undefined1 (*) [32])((long)auVar74 + lVar63) = ZEXT1632(auVar82);
                      lVar63 = lVar63 + 0x20;
                    } while (local_128 != (void *)lVar63);
                    auVar74 = (undefined1  [8])((long)auVar74 + lVar63);
                    auVar54 = (undefined1  [8])((long)auVar54 + lVar63);
                  }
                  uVar69 = uVar69 + 1;
                } while (uVar69 != uVar67);
              }
              iVar44 = iVar44 + 1;
            } while (iVar44 != (int)local_130);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_100) {
          iVar44 = 0;
          do {
            pMVar9 = local_108;
            in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
            Mat::channel((Mat *)local_e0,local_120,iVar44);
            auVar43 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar44);
            auVar54 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar44);
            auVar74 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_118) {
              lVar63 = 0;
              iVar46 = (int)local_118;
              do {
                auVar179 = vrcpps_avx(*(undefined1 (*) [32])((long)auVar54 + lVar63));
                auVar141 = *(undefined1 (*) [32])((long)auVar43 + lVar63);
                auVar328._0_4_ = auVar141._0_4_ * auVar179._0_4_;
                auVar328._4_4_ = auVar141._4_4_ * auVar179._4_4_;
                auVar328._8_4_ = auVar141._8_4_ * auVar179._8_4_;
                auVar328._12_4_ = auVar141._12_4_ * auVar179._12_4_;
                auVar328._16_4_ = auVar141._16_4_ * auVar179._16_4_;
                auVar328._20_4_ = auVar141._20_4_ * auVar179._20_4_;
                auVar328._28_36_ = in_ZMM3._28_36_;
                auVar328._24_4_ = auVar141._24_4_ * auVar179._24_4_;
                auVar301 = auVar328._0_32_;
                in_ZMM3 = ZEXT3264(auVar301);
                auVar82 = vfmsub213ps_fma(*(undefined1 (*) [32])((long)auVar54 + lVar63),auVar301,
                                          auVar141);
                auVar82 = vfnmadd213ps_fma(ZEXT1632(auVar82),auVar179,auVar301);
                *(undefined1 (*) [32])((long)auVar74 + lVar63) = ZEXT1632(auVar82);
                lVar63 = lVar63 + 0x20;
                iVar46 = iVar46 + -1;
              } while (iVar46 != 0);
            }
            iVar44 = iVar44 + 1;
          } while (iVar44 != (int)local_100);
          return 0;
        }
        return 0;
      }
      return -100;
    case 4:
      uVar69 = pMVar8->w;
      uVar48 = (ulong)uVar69;
      sVar10 = pMVar8->elemsize;
      uVar68 = pMVar8[1].w;
      uVar49 = (ulong)uVar68;
      uVar67 = pMVar8[1].h;
      uVar66 = pMVar8[1].c;
      uVar47 = (ulong)uVar66;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar67 * uVar68);
      local_f0 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar44 == 1 && uVar69 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar68,local_f0,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar68) {
                uVar4 = *pMVar8->data;
                auVar157._4_4_ = uVar4;
                auVar157._0_4_ = uVar4;
                auVar157._8_4_ = uVar4;
                auVar157._12_4_ = uVar4;
                auVar157._16_4_ = uVar4;
                auVar157._20_4_ = uVar4;
                auVar157._24_4_ = uVar4;
                auVar157._28_4_ = uVar4;
                pvVar60 = pMVar1->data;
                lVar63 = 0;
                do {
                  auVar141 = vmaxps_avx(auVar157,*(undefined1 (*) [32])((long)pvVar60 + lVar63));
                  *(undefined1 (*) [32])((long)pvVar45 + lVar63) = auVar141;
                  lVar63 = lVar63 + 0x20;
                  uVar69 = (int)uVar49 - 1;
                  uVar49 = (ulong)uVar69;
                } while (uVar69 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar68,uVar67,local_f0,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)local_130) {
                uVar4 = *pMVar8->data;
                auVar156._4_4_ = uVar4;
                auVar156._0_4_ = uVar4;
                auVar156._8_4_ = uVar4;
                auVar156._12_4_ = uVar4;
                auVar156._16_4_ = uVar4;
                auVar156._20_4_ = uVar4;
                auVar156._24_4_ = uVar4;
                auVar156._28_4_ = uVar4;
                pvVar60 = pMVar1->data;
                lVar63 = 0;
                do {
                  auVar141 = vmaxps_avx(auVar156,*(undefined1 (*) [32])((long)pvVar60 + lVar63));
                  *(undefined1 (*) [32])((long)pvVar45 + lVar63) = auVar141;
                  lVar63 = lVar63 + 0x20;
                  local_130._0_4_ = (int)local_130 + -1;
                } while ((int)local_130 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar66) {
                uVar4 = *pMVar8->data;
                auVar137._4_4_ = uVar4;
                auVar137._0_4_ = uVar4;
                auVar137._8_4_ = uVar4;
                auVar137._12_4_ = uVar4;
                auVar137._16_4_ = uVar4;
                auVar137._20_4_ = uVar4;
                auVar137._24_4_ = uVar4;
                auVar137._28_4_ = uVar4;
                uVar48 = 0;
                do {
                  if (0 < (int)local_130) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar45 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar60 = pMVar8[1].data;
                    lVar63 = 0;
                    iVar44 = (int)local_130;
                    do {
                      auVar141 = vmaxps_avx(auVar137,*(undefined1 (*) [32])
                                                      ((long)pvVar60 +
                                                      lVar63 + sVar12 * sVar13 * uVar48));
                      *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) =
                           auVar141;
                      lVar63 = lVar63 + 0x20;
                      iVar44 = iVar44 + -1;
                    } while (iVar44 != 0);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar47);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar69,sVar10,iVar44,opt->blob_allocator);
          pvVar45 = pMVar9->data;
          if (pvVar45 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar46 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar69) {
              pvVar60 = pMVar8->data;
              pvVar65 = pMVar8[1].data;
              lVar63 = 0;
              do {
                auVar141 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar60 + lVar63),
                                      *(undefined1 (*) [32])((long)pvVar65 + lVar63));
                *(undefined1 (*) [32])((long)pvVar45 + lVar63) = auVar141;
                lVar63 = lVar63 + 0x20;
                uVar69 = (int)uVar48 - 1;
                uVar48 = (ulong)uVar69;
              } while (uVar69 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar69) {
            uVar4 = *local_110->data;
            auVar150._4_4_ = uVar4;
            auVar150._0_4_ = uVar4;
            auVar150._8_4_ = uVar4;
            auVar150._12_4_ = uVar4;
            auVar150._16_4_ = uVar4;
            auVar150._20_4_ = uVar4;
            auVar150._24_4_ = uVar4;
            auVar150._28_4_ = uVar4;
            pvVar60 = pMVar8->data;
            lVar63 = 0;
            do {
              auVar141 = vmaxps_avx(auVar150,*(undefined1 (*) [32])((long)pvVar60 + lVar63));
              *(undefined1 (*) [32])((long)pvVar45 + lVar63) = auVar141;
              lVar63 = lVar63 + 0x20;
              uVar69 = (int)uVar48 - 1;
              uVar48 = (ulong)uVar69;
            } while (uVar69 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar68,uVar67,local_f0,iVar46,opt->blob_allocator);
          pauVar51 = (undefined1 (*) [32])pMVar9->data;
          if (pauVar51 == (undefined1 (*) [32])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar67) {
              pauVar58 = (undefined1 (*) [32])pMVar8->data;
              pauVar56 = (undefined1 (*) [32])pMVar8[1].data;
              uVar69 = 0;
              do {
                if (0 < (int)uVar68) {
                  auVar141 = *pauVar58;
                  uVar66 = uVar68;
                  do {
                    auVar179 = vmaxps_avx(auVar141,*pauVar56);
                    *pauVar51 = auVar179;
                    pauVar56 = pauVar56 + 1;
                    pauVar51 = pauVar51 + 1;
                    uVar66 = uVar66 - 1;
                  } while (uVar66 != 0);
                }
                pauVar58 = pauVar58 + 1;
                uVar69 = uVar69 + 1;
              } while (uVar69 != uVar67);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar66) {
          uVar48 = 0;
          do {
            if (0 < (int)local_130) {
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar9->elemsize;
              auVar141 = *(undefined1 (*) [32])((long)pMVar8->data + uVar48 * 0x20);
              pvVar45 = pMVar9->data;
              sVar12 = pMVar8[1].cstep;
              sVar13 = pMVar8[1].elemsize;
              pvVar60 = pMVar8[1].data;
              lVar63 = 0;
              iVar44 = (int)local_130;
              do {
                auVar179 = vmaxps_avx(auVar141,*(undefined1 (*) [32])
                                                ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48))
                ;
                *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) = auVar179
                ;
                lVar63 = lVar63 + 0x20;
                iVar44 = iVar44 + -1;
              } while (iVar44 != 0);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar47);
          return 0;
        }
        return 0;
      }
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar46);
      uVar6 = pMVar8->h;
      local_118 = CONCAT44(local_118._4_4_,uVar6 * uVar69);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar66) {
              uVar48 = 0;
              do {
                if (0 < (int)uVar67) {
                  pauVar51 = (undefined1 (*) [32])
                             (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                  pauVar58 = (undefined1 (*) [32])
                             (local_120[1].cstep * uVar48 * local_120[1].elemsize +
                             (long)local_120[1].data);
                  pauVar56 = (undefined1 (*) [32])
                             ((long)local_120->w * uVar48 * local_120->elemsize +
                             (long)local_120->data);
                  uVar69 = 0;
                  do {
                    if (0 < (int)uVar68) {
                      auVar141 = *pauVar56;
                      uVar66 = uVar68;
                      do {
                        auVar179 = vmaxps_avx(auVar141,*pauVar58);
                        *pauVar51 = auVar179;
                        pauVar58 = pauVar58 + 1;
                        pauVar51 = pauVar51 + 1;
                        uVar66 = uVar66 - 1;
                      } while (uVar66 != 0);
                    }
                    pauVar56 = pauVar56 + 1;
                    uVar69 = uVar69 + 1;
                  } while (uVar69 != uVar67);
                }
                uVar48 = uVar48 + 1;
              } while (uVar48 != uVar47);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pvVar45 = pMVar9->data;
        if (pvVar45 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_118) {
            pvVar60 = local_120->data;
            pvVar65 = local_120[1].data;
            lVar63 = 0;
            do {
              auVar141 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar60 + lVar63),
                                    *(undefined1 (*) [32])((long)pvVar65 + lVar63));
              *(undefined1 (*) [32])((long)pvVar45 + lVar63) = auVar141;
              lVar63 = lVar63 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pauVar51 = (undefined1 (*) [32])pMVar9->data;
        if (pauVar51 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pauVar58 = (undefined1 (*) [32])local_120->data;
              pauVar56 = (undefined1 (*) [32])local_120[1].data;
              uVar68 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar141 = *pauVar56;
                  uVar47 = uVar48;
                  do {
                    auVar179 = vmaxps_avx(auVar141,*pauVar58);
                    *pauVar51 = auVar179;
                    pauVar58 = pauVar58 + 1;
                    pauVar51 = pauVar51 + 1;
                    uVar67 = (int)uVar47 - 1;
                    uVar47 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                pauVar56 = pauVar56 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            uVar4 = *local_110->data;
            auVar172._4_4_ = uVar4;
            auVar172._0_4_ = uVar4;
            auVar172._8_4_ = uVar4;
            auVar172._12_4_ = uVar4;
            auVar172._16_4_ = uVar4;
            auVar172._20_4_ = uVar4;
            auVar172._24_4_ = uVar4;
            auVar172._28_4_ = uVar4;
            pvVar45 = local_120->data;
            lVar63 = 0;
            do {
              auVar141 = vmaxps_avx(auVar172,*(undefined1 (*) [32])((long)pvVar45 + lVar63));
              *(undefined1 (*) [32])((long)*pauVar51 + lVar63) = auVar141;
              lVar63 = lVar63 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar64 = (ulong)uVar7;
      local_f8 = sVar10;
      if (pMVar8[1].dims != 3) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims == 1) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar7) {
              uVar47 = 0;
              do {
                if (0 < (int)local_118) {
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  auVar141 = *(undefined1 (*) [32])((long)local_110->data + uVar47 * 0x20);
                  pvVar45 = pMVar9->data;
                  sVar12 = local_120->cstep;
                  sVar13 = local_120->elemsize;
                  pvVar60 = local_120->data;
                  lVar63 = 0;
                  iVar44 = (int)local_118;
                  do {
                    auVar179 = vmaxps_avx(auVar141,*(undefined1 (*) [32])
                                                    ((long)pvVar60 +
                                                    lVar63 + sVar12 * sVar13 * uVar47));
                    *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                         auVar179;
                    lVar63 = lVar63 + 0x20;
                    iVar44 = iVar44 + -1;
                  } while (iVar44 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar64);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar7) {
            uVar4 = *local_110->data;
            auVar173._4_4_ = uVar4;
            auVar173._0_4_ = uVar4;
            auVar173._8_4_ = uVar4;
            auVar173._12_4_ = uVar4;
            auVar173._16_4_ = uVar4;
            auVar173._20_4_ = uVar4;
            auVar173._24_4_ = uVar4;
            auVar173._28_4_ = uVar4;
            uVar47 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar45 = pMVar9->data;
                sVar12 = local_120->cstep;
                sVar13 = local_120->elemsize;
                pvVar60 = local_120->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  auVar141 = vmaxps_avx(auVar173,*(undefined1 (*) [32])
                                                  ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                       auVar141;
                  lVar63 = lVar63 + 0x20;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        if (local_120[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar7) {
          uVar47 = 0;
          do {
            if (0 < (int)uVar6) {
              pauVar51 = (undefined1 (*) [32])
                         (pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar58 = (undefined1 (*) [32])
                         ((long)local_120[1].w * uVar47 * local_120[1].elemsize +
                         (long)local_120[1].data);
              pauVar56 = (undefined1 (*) [32])
                         (local_120->cstep * uVar47 * local_120->elemsize + (long)local_120->data);
              uVar68 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar141 = *pauVar58;
                  uVar49 = uVar48;
                  do {
                    auVar179 = vmaxps_avx(auVar141,*pauVar56);
                    *pauVar51 = auVar179;
                    pauVar56 = pauVar56 + 1;
                    pauVar51 = pauVar51 + 1;
                    uVar67 = (int)uVar49 - 1;
                    uVar49 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                pauVar58 = pauVar58 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != uVar64);
          return 0;
        }
        return 0;
      }
      if (uVar66 == uVar7 && (uVar67 == 1 && (uVar68 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                auVar141 = *(undefined1 (*) [32])
                            ((long)pMVar8[1].data + pMVar8[1].cstep * uVar47 * pMVar8[1].elemsize);
                pvVar45 = pMVar8->data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar60 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  auVar179 = vmaxps_avx(auVar141,*(undefined1 (*) [32])
                                                  ((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47) =
                       auVar179;
                  lVar63 = lVar63 + 0x20;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar64;
      if ((uVar68 == uVar69) && (iVar46 == 1 && (uVar66 == 1 && uVar67 == uVar6))) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8->data;
                pvVar60 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar60 + lVar63);
                  auVar145._4_4_ = uVar4;
                  auVar145._0_4_ = uVar4;
                  auVar145._8_4_ = uVar4;
                  auVar145._12_4_ = uVar4;
                  auVar145._16_4_ = uVar4;
                  auVar145._20_4_ = uVar4;
                  auVar145._24_4_ = uVar4;
                  auVar145._28_4_ = uVar4;
                  auVar141 = vmaxps_avx(auVar145,*(undefined1 (*) [32])
                                                  ((long)pvVar45 +
                                                  lVar63 * 8 + sVar10 * sVar11 * uVar47));
                  *(undefined1 (*) [32])((long)pvVar65 + lVar63 * 8 + sVar12 * sVar13 * uVar47) =
                       auVar141;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar69 ^ 1) == 0) && uVar7 == uVar66) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                auVar141 = *(undefined1 (*) [32])
                            ((long)pMVar8->data + pMVar8->cstep * uVar48 * pMVar8->elemsize);
                pvVar45 = pMVar8[1].data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar60 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  auVar179 = vmaxps_avx(auVar141,*(undefined1 (*) [32])
                                                  ((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48) =
                       auVar179;
                  lVar63 = lVar63 + 0x20;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar68 == uVar69) && (iVar44 == 1)) && ((uVar67 == uVar6 && (uVar7 == 1)))) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8[1].data;
                pvVar60 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar60 + lVar63);
                  auVar166._4_4_ = uVar4;
                  auVar166._0_4_ = uVar4;
                  auVar166._8_4_ = uVar4;
                  auVar166._12_4_ = uVar4;
                  auVar166._16_4_ = uVar4;
                  auVar166._20_4_ = uVar4;
                  auVar166._24_4_ = uVar4;
                  auVar166._28_4_ = uVar4;
                  auVar141 = vmaxps_avx(auVar166,*(undefined1 (*) [32])
                                                  ((long)pvVar45 +
                                                  lVar63 * 8 + sVar10 * sVar11 * uVar48));
                  *(undefined1 (*) [32])((long)pvVar65 + lVar63 * 8 + sVar12 * sVar13 * uVar48) =
                       auVar141;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_130 = (void *)uVar47;
      if ((((uVar68 ^ 1) == 0 && uVar67 == uVar6) && uVar7 == uVar66) && uVar69 != 1) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar49 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar45 = local_120[1].data;
                pauVar51 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar49 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar58 = (undefined1 (*) [32])
                           (local_120->cstep * uVar49 * local_120->elemsize + (long)local_120->data)
                ;
                uVar64 = 0;
                do {
                  if (0 < (int)uVar69) {
                    auVar141 = *(undefined1 (*) [32])
                                ((long)pvVar45 + uVar64 * 0x20 + sVar10 * uVar49 * sVar11);
                    uVar70 = uVar48;
                    do {
                      auVar179 = vmaxps_avx(auVar141,*pauVar58);
                      *pauVar51 = auVar179;
                      pauVar58 = pauVar58 + 1;
                      pauVar51 = pauVar51 + 1;
                      uVar68 = (int)uVar70 - 1;
                      uVar70 = (ulong)uVar68;
                    } while (uVar68 != 0);
                  }
                  uVar64 = uVar64 + 1;
                } while (uVar64 != uVar6);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar67 == 1 && (uVar68 ^ uVar69) == 0) && uVar66 == uVar7) && uVar6 != 1) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar49 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar60 = (void *)(pMVar9->cstep * uVar49 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar65 = (void *)(local_120->cstep * uVar49 * local_120->elemsize +
                                  (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar45 = local_120[1].data;
                uVar68 = 0;
                do {
                  if (0 < (int)uVar69) {
                    lVar63 = 0;
                    do {
                      auVar141 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar65 + lVar63),
                                            *(undefined1 (*) [32])
                                             ((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar49));
                      *(undefined1 (*) [32])((long)pvVar60 + lVar63) = auVar141;
                      lVar63 = lVar63 + 0x20;
                    } while (uVar48 << 5 != lVar63);
                    pvVar60 = (void *)((long)pvVar60 + lVar63);
                    pvVar65 = (void *)((long)pvVar65 + lVar63);
                  }
                  uVar68 = uVar68 + 1;
                } while (uVar68 != uVar6);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar69 ^ 1) == 0 && uVar6 == uVar67) && uVar66 == uVar7) && uVar68 != 1) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)uVar67) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar45 = local_120->data;
                pauVar51 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar58 = (undefined1 (*) [32])
                           (local_120[1].cstep * uVar48 * local_120[1].elemsize +
                           (long)local_120[1].data);
                uVar49 = 0;
                do {
                  if (0 < (int)uVar68) {
                    auVar141 = *(undefined1 (*) [32])
                                ((long)pvVar45 + uVar49 * 0x20 + sVar10 * uVar48 * sVar11);
                    uVar69 = uVar68;
                    do {
                      auVar179 = vmaxps_avx(auVar141,*pauVar58);
                      *pauVar51 = auVar179;
                      pauVar58 = pauVar58 + 1;
                      pauVar51 = pauVar51 + 1;
                      uVar69 = uVar69 - 1;
                    } while (uVar69 != 0);
                  }
                  uVar49 = uVar49 + 1;
                } while (uVar49 != uVar67);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar68 ^ uVar69) == 0 && uVar6 == 1) && uVar7 == uVar66) && uVar67 != 1) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_130) {
            local_128 = (void *)(uVar49 << 5);
            iVar44 = 0;
            do {
              Mat::channel((Mat *)local_e0,local_120,iVar44);
              auVar43 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar44);
              auVar54 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar44);
              auVar74 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar67) {
                uVar69 = 0;
                do {
                  if (0 < (int)uVar68) {
                    lVar63 = 0;
                    do {
                      auVar141 = vmaxps_avx(*(undefined1 (*) [32])((long)auVar43 + lVar63),
                                            *(undefined1 (*) [32])((long)auVar54 + lVar63));
                      *(undefined1 (*) [32])((long)auVar74 + lVar63) = auVar141;
                      lVar63 = lVar63 + 0x20;
                    } while (local_128 != (void *)lVar63);
                    auVar74 = (undefined1  [8])((long)auVar74 + lVar63);
                    auVar54 = (undefined1  [8])((long)auVar54 + lVar63);
                  }
                  uVar69 = uVar69 + 1;
                } while (uVar69 != uVar67);
              }
              iVar44 = iVar44 + 1;
            } while (iVar44 != (int)local_130);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_100) {
          iVar44 = 0;
          do {
            pMVar9 = local_108;
            Mat::channel((Mat *)local_e0,local_120,iVar44);
            auVar43 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar44);
            auVar54 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar44);
            auVar74 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_118) {
              lVar63 = 0;
              iVar46 = (int)local_118;
              do {
                auVar141 = vmaxps_avx(*(undefined1 (*) [32])((long)auVar43 + lVar63),
                                      *(undefined1 (*) [32])((long)auVar54 + lVar63));
                *(undefined1 (*) [32])((long)auVar74 + lVar63) = auVar141;
                lVar63 = lVar63 + 0x20;
                iVar46 = iVar46 + -1;
              } while (iVar46 != 0);
            }
            iVar44 = iVar44 + 1;
          } while (iVar44 != (int)local_100);
          return 0;
        }
        return 0;
      }
      return -100;
    case 5:
      uVar69 = pMVar8->w;
      uVar48 = (ulong)uVar69;
      sVar10 = pMVar8->elemsize;
      uVar68 = pMVar8[1].w;
      uVar49 = (ulong)uVar68;
      uVar67 = pMVar8[1].h;
      uVar66 = pMVar8[1].c;
      uVar47 = (ulong)uVar66;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar67 * uVar68);
      local_f0 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar44 == 1 && uVar69 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar68,local_f0,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar68) {
                uVar4 = *pMVar8->data;
                auVar165._4_4_ = uVar4;
                auVar165._0_4_ = uVar4;
                auVar165._8_4_ = uVar4;
                auVar165._12_4_ = uVar4;
                auVar165._16_4_ = uVar4;
                auVar165._20_4_ = uVar4;
                auVar165._24_4_ = uVar4;
                auVar165._28_4_ = uVar4;
                pvVar60 = pMVar1->data;
                lVar63 = 0;
                do {
                  auVar141 = vminps_avx(auVar165,*(undefined1 (*) [32])((long)pvVar60 + lVar63));
                  *(undefined1 (*) [32])((long)pvVar45 + lVar63) = auVar141;
                  lVar63 = lVar63 + 0x20;
                  uVar69 = (int)uVar49 - 1;
                  uVar49 = (ulong)uVar69;
                } while (uVar69 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar68,uVar67,local_f0,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)local_130) {
                uVar4 = *pMVar8->data;
                auVar164._4_4_ = uVar4;
                auVar164._0_4_ = uVar4;
                auVar164._8_4_ = uVar4;
                auVar164._12_4_ = uVar4;
                auVar164._16_4_ = uVar4;
                auVar164._20_4_ = uVar4;
                auVar164._24_4_ = uVar4;
                auVar164._28_4_ = uVar4;
                pvVar60 = pMVar1->data;
                lVar63 = 0;
                do {
                  auVar141 = vminps_avx(auVar164,*(undefined1 (*) [32])((long)pvVar60 + lVar63));
                  *(undefined1 (*) [32])((long)pvVar45 + lVar63) = auVar141;
                  lVar63 = lVar63 + 0x20;
                  local_130._0_4_ = (int)local_130 + -1;
                } while ((int)local_130 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar66) {
                uVar4 = *pMVar8->data;
                auVar142._4_4_ = uVar4;
                auVar142._0_4_ = uVar4;
                auVar142._8_4_ = uVar4;
                auVar142._12_4_ = uVar4;
                auVar142._16_4_ = uVar4;
                auVar142._20_4_ = uVar4;
                auVar142._24_4_ = uVar4;
                auVar142._28_4_ = uVar4;
                uVar48 = 0;
                do {
                  if (0 < (int)local_130) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar45 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar60 = pMVar8[1].data;
                    lVar63 = 0;
                    iVar44 = (int)local_130;
                    do {
                      auVar141 = vminps_avx(auVar142,*(undefined1 (*) [32])
                                                      ((long)pvVar60 +
                                                      lVar63 + sVar12 * sVar13 * uVar48));
                      *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) =
                           auVar141;
                      lVar63 = lVar63 + 0x20;
                      iVar44 = iVar44 + -1;
                    } while (iVar44 != 0);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar47);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar69,sVar10,iVar44,opt->blob_allocator);
          pvVar45 = pMVar9->data;
          if (pvVar45 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar46 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar69) {
              pvVar60 = pMVar8->data;
              pvVar65 = pMVar8[1].data;
              lVar63 = 0;
              do {
                auVar141 = vminps_avx(*(undefined1 (*) [32])((long)pvVar60 + lVar63),
                                      *(undefined1 (*) [32])((long)pvVar65 + lVar63));
                *(undefined1 (*) [32])((long)pvVar45 + lVar63) = auVar141;
                lVar63 = lVar63 + 0x20;
                uVar69 = (int)uVar48 - 1;
                uVar48 = (ulong)uVar69;
              } while (uVar69 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar69) {
            uVar4 = *local_110->data;
            auVar154._4_4_ = uVar4;
            auVar154._0_4_ = uVar4;
            auVar154._8_4_ = uVar4;
            auVar154._12_4_ = uVar4;
            auVar154._16_4_ = uVar4;
            auVar154._20_4_ = uVar4;
            auVar154._24_4_ = uVar4;
            auVar154._28_4_ = uVar4;
            pvVar60 = pMVar8->data;
            lVar63 = 0;
            do {
              auVar141 = vminps_avx(auVar154,*(undefined1 (*) [32])((long)pvVar60 + lVar63));
              *(undefined1 (*) [32])((long)pvVar45 + lVar63) = auVar141;
              lVar63 = lVar63 + 0x20;
              uVar69 = (int)uVar48 - 1;
              uVar48 = (ulong)uVar69;
            } while (uVar69 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar68,uVar67,local_f0,iVar46,opt->blob_allocator);
          pauVar51 = (undefined1 (*) [32])pMVar9->data;
          if (pauVar51 == (undefined1 (*) [32])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar67) {
              pauVar58 = (undefined1 (*) [32])pMVar8->data;
              pauVar56 = (undefined1 (*) [32])pMVar8[1].data;
              uVar69 = 0;
              do {
                if (0 < (int)uVar68) {
                  auVar141 = *pauVar58;
                  uVar66 = uVar68;
                  do {
                    auVar179 = vminps_avx(auVar141,*pauVar56);
                    *pauVar51 = auVar179;
                    pauVar56 = pauVar56 + 1;
                    pauVar51 = pauVar51 + 1;
                    uVar66 = uVar66 - 1;
                  } while (uVar66 != 0);
                }
                pauVar58 = pauVar58 + 1;
                uVar69 = uVar69 + 1;
              } while (uVar69 != uVar67);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar66) {
          uVar48 = 0;
          do {
            if (0 < (int)local_130) {
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar9->elemsize;
              auVar141 = *(undefined1 (*) [32])((long)pMVar8->data + uVar48 * 0x20);
              pvVar45 = pMVar9->data;
              sVar12 = pMVar8[1].cstep;
              sVar13 = pMVar8[1].elemsize;
              pvVar60 = pMVar8[1].data;
              lVar63 = 0;
              iVar44 = (int)local_130;
              do {
                auVar179 = vminps_avx(auVar141,*(undefined1 (*) [32])
                                                ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48))
                ;
                *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) = auVar179
                ;
                lVar63 = lVar63 + 0x20;
                iVar44 = iVar44 + -1;
              } while (iVar44 != 0);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar47);
          return 0;
        }
        return 0;
      }
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar46);
      uVar6 = pMVar8->h;
      local_118 = CONCAT44(local_118._4_4_,uVar6 * uVar69);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar66) {
              uVar48 = 0;
              do {
                if (0 < (int)uVar67) {
                  pauVar51 = (undefined1 (*) [32])
                             (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                  pauVar58 = (undefined1 (*) [32])
                             (local_120[1].cstep * uVar48 * local_120[1].elemsize +
                             (long)local_120[1].data);
                  pauVar56 = (undefined1 (*) [32])
                             ((long)local_120->w * uVar48 * local_120->elemsize +
                             (long)local_120->data);
                  uVar69 = 0;
                  do {
                    if (0 < (int)uVar68) {
                      auVar141 = *pauVar56;
                      uVar66 = uVar68;
                      do {
                        auVar179 = vminps_avx(auVar141,*pauVar58);
                        *pauVar51 = auVar179;
                        pauVar58 = pauVar58 + 1;
                        pauVar51 = pauVar51 + 1;
                        uVar66 = uVar66 - 1;
                      } while (uVar66 != 0);
                    }
                    pauVar56 = pauVar56 + 1;
                    uVar69 = uVar69 + 1;
                  } while (uVar69 != uVar67);
                }
                uVar48 = uVar48 + 1;
              } while (uVar48 != uVar47);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pvVar45 = pMVar9->data;
        if (pvVar45 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_118) {
            pvVar60 = local_120->data;
            pvVar65 = local_120[1].data;
            lVar63 = 0;
            do {
              auVar141 = vminps_avx(*(undefined1 (*) [32])((long)pvVar60 + lVar63),
                                    *(undefined1 (*) [32])((long)pvVar65 + lVar63));
              *(undefined1 (*) [32])((long)pvVar45 + lVar63) = auVar141;
              lVar63 = lVar63 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pauVar51 = (undefined1 (*) [32])pMVar9->data;
        if (pauVar51 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pauVar58 = (undefined1 (*) [32])local_120->data;
              pauVar56 = (undefined1 (*) [32])local_120[1].data;
              uVar68 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar141 = *pauVar56;
                  uVar47 = uVar48;
                  do {
                    auVar179 = vminps_avx(auVar141,*pauVar58);
                    *pauVar51 = auVar179;
                    pauVar58 = pauVar58 + 1;
                    pauVar51 = pauVar51 + 1;
                    uVar67 = (int)uVar47 - 1;
                    uVar47 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                pauVar56 = pauVar56 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            uVar4 = *local_110->data;
            auVar177._4_4_ = uVar4;
            auVar177._0_4_ = uVar4;
            auVar177._8_4_ = uVar4;
            auVar177._12_4_ = uVar4;
            auVar177._16_4_ = uVar4;
            auVar177._20_4_ = uVar4;
            auVar177._24_4_ = uVar4;
            auVar177._28_4_ = uVar4;
            pvVar45 = local_120->data;
            lVar63 = 0;
            do {
              auVar141 = vminps_avx(auVar177,*(undefined1 (*) [32])((long)pvVar45 + lVar63));
              *(undefined1 (*) [32])((long)*pauVar51 + lVar63) = auVar141;
              lVar63 = lVar63 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar64 = (ulong)uVar7;
      local_f8 = sVar10;
      if (pMVar8[1].dims != 3) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims == 1) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar7) {
              uVar47 = 0;
              do {
                if (0 < (int)local_118) {
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  auVar141 = *(undefined1 (*) [32])((long)local_110->data + uVar47 * 0x20);
                  pvVar45 = pMVar9->data;
                  sVar12 = local_120->cstep;
                  sVar13 = local_120->elemsize;
                  pvVar60 = local_120->data;
                  lVar63 = 0;
                  iVar44 = (int)local_118;
                  do {
                    auVar179 = vminps_avx(auVar141,*(undefined1 (*) [32])
                                                    ((long)pvVar60 +
                                                    lVar63 + sVar12 * sVar13 * uVar47));
                    *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                         auVar179;
                    lVar63 = lVar63 + 0x20;
                    iVar44 = iVar44 + -1;
                  } while (iVar44 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar64);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar7) {
            uVar4 = *local_110->data;
            auVar180._4_4_ = uVar4;
            auVar180._0_4_ = uVar4;
            auVar180._8_4_ = uVar4;
            auVar180._12_4_ = uVar4;
            auVar180._16_4_ = uVar4;
            auVar180._20_4_ = uVar4;
            auVar180._24_4_ = uVar4;
            auVar180._28_4_ = uVar4;
            uVar47 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar45 = pMVar9->data;
                sVar12 = local_120->cstep;
                sVar13 = local_120->elemsize;
                pvVar60 = local_120->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  auVar141 = vminps_avx(auVar180,*(undefined1 (*) [32])
                                                  ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                       auVar141;
                  lVar63 = lVar63 + 0x20;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        if (local_120[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar7) {
          uVar47 = 0;
          do {
            if (0 < (int)uVar6) {
              pauVar51 = (undefined1 (*) [32])
                         (pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar58 = (undefined1 (*) [32])
                         ((long)local_120[1].w * uVar47 * local_120[1].elemsize +
                         (long)local_120[1].data);
              pauVar56 = (undefined1 (*) [32])
                         (local_120->cstep * uVar47 * local_120->elemsize + (long)local_120->data);
              uVar68 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar141 = *pauVar58;
                  uVar49 = uVar48;
                  do {
                    auVar179 = vminps_avx(auVar141,*pauVar56);
                    *pauVar51 = auVar179;
                    pauVar56 = pauVar56 + 1;
                    pauVar51 = pauVar51 + 1;
                    uVar67 = (int)uVar49 - 1;
                    uVar49 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                pauVar58 = pauVar58 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != uVar64);
          return 0;
        }
        return 0;
      }
      if (uVar66 == uVar7 && (uVar67 == 1 && (uVar68 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                auVar141 = *(undefined1 (*) [32])
                            ((long)pMVar8[1].data + pMVar8[1].cstep * uVar47 * pMVar8[1].elemsize);
                pvVar45 = pMVar8->data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar60 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  auVar179 = vminps_avx(auVar141,*(undefined1 (*) [32])
                                                  ((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47) =
                       auVar179;
                  lVar63 = lVar63 + 0x20;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar64;
      if ((uVar68 == uVar69) && (iVar46 == 1 && (uVar66 == 1 && uVar67 == uVar6))) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8->data;
                pvVar60 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar60 + lVar63);
                  auVar148._4_4_ = uVar4;
                  auVar148._0_4_ = uVar4;
                  auVar148._8_4_ = uVar4;
                  auVar148._12_4_ = uVar4;
                  auVar148._16_4_ = uVar4;
                  auVar148._20_4_ = uVar4;
                  auVar148._24_4_ = uVar4;
                  auVar148._28_4_ = uVar4;
                  auVar141 = vminps_avx(auVar148,*(undefined1 (*) [32])
                                                  ((long)pvVar45 +
                                                  lVar63 * 8 + sVar10 * sVar11 * uVar47));
                  *(undefined1 (*) [32])((long)pvVar65 + lVar63 * 8 + sVar12 * sVar13 * uVar47) =
                       auVar141;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar69 ^ 1) == 0) && uVar7 == uVar66) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                auVar141 = *(undefined1 (*) [32])
                            ((long)pMVar8->data + pMVar8->cstep * uVar48 * pMVar8->elemsize);
                pvVar45 = pMVar8[1].data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar60 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  auVar179 = vminps_avx(auVar141,*(undefined1 (*) [32])
                                                  ((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48) =
                       auVar179;
                  lVar63 = lVar63 + 0x20;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar68 == uVar69) && (iVar44 == 1)) && (uVar67 == uVar6)) && (uVar7 == 1)) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8[1].data;
                pvVar60 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar60 + lVar63);
                  auVar170._4_4_ = uVar4;
                  auVar170._0_4_ = uVar4;
                  auVar170._8_4_ = uVar4;
                  auVar170._12_4_ = uVar4;
                  auVar170._16_4_ = uVar4;
                  auVar170._20_4_ = uVar4;
                  auVar170._24_4_ = uVar4;
                  auVar170._28_4_ = uVar4;
                  auVar141 = vminps_avx(auVar170,*(undefined1 (*) [32])
                                                  ((long)pvVar45 +
                                                  lVar63 * 8 + sVar10 * sVar11 * uVar48));
                  *(undefined1 (*) [32])((long)pvVar65 + lVar63 * 8 + sVar12 * sVar13 * uVar48) =
                       auVar141;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_130 = (void *)uVar47;
      if ((((uVar68 ^ 1) == 0 && uVar67 == uVar6) && uVar7 == uVar66) && uVar69 != 1) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar49 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar45 = local_120[1].data;
                pauVar51 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar49 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar58 = (undefined1 (*) [32])
                           (local_120->cstep * uVar49 * local_120->elemsize + (long)local_120->data)
                ;
                uVar64 = 0;
                do {
                  if (0 < (int)uVar69) {
                    auVar141 = *(undefined1 (*) [32])
                                ((long)pvVar45 + uVar64 * 0x20 + sVar10 * uVar49 * sVar11);
                    uVar70 = uVar48;
                    do {
                      auVar179 = vminps_avx(auVar141,*pauVar58);
                      *pauVar51 = auVar179;
                      pauVar58 = pauVar58 + 1;
                      pauVar51 = pauVar51 + 1;
                      uVar68 = (int)uVar70 - 1;
                      uVar70 = (ulong)uVar68;
                    } while (uVar68 != 0);
                  }
                  uVar64 = uVar64 + 1;
                } while (uVar64 != uVar6);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar67 == 1 && (uVar68 ^ uVar69) == 0) && uVar66 == uVar7) && uVar6 != 1) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar49 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar60 = (void *)(pMVar9->cstep * uVar49 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar65 = (void *)(local_120->cstep * uVar49 * local_120->elemsize +
                                  (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar45 = local_120[1].data;
                uVar68 = 0;
                do {
                  if (0 < (int)uVar69) {
                    lVar63 = 0;
                    do {
                      auVar141 = vminps_avx(*(undefined1 (*) [32])((long)pvVar65 + lVar63),
                                            *(undefined1 (*) [32])
                                             ((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar49));
                      *(undefined1 (*) [32])((long)pvVar60 + lVar63) = auVar141;
                      lVar63 = lVar63 + 0x20;
                    } while (uVar48 << 5 != lVar63);
                    pvVar60 = (void *)((long)pvVar60 + lVar63);
                    pvVar65 = (void *)((long)pvVar65 + lVar63);
                  }
                  uVar68 = uVar68 + 1;
                } while (uVar68 != uVar6);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar69 ^ 1) == 0 && uVar6 == uVar67) && uVar66 == uVar7) && uVar68 != 1) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)uVar67) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar45 = local_120->data;
                pauVar51 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar58 = (undefined1 (*) [32])
                           (local_120[1].cstep * uVar48 * local_120[1].elemsize +
                           (long)local_120[1].data);
                uVar49 = 0;
                do {
                  if (0 < (int)uVar68) {
                    auVar141 = *(undefined1 (*) [32])
                                ((long)pvVar45 + uVar49 * 0x20 + sVar10 * uVar48 * sVar11);
                    uVar69 = uVar68;
                    do {
                      auVar179 = vminps_avx(auVar141,*pauVar58);
                      *pauVar51 = auVar179;
                      pauVar58 = pauVar58 + 1;
                      pauVar51 = pauVar51 + 1;
                      uVar69 = uVar69 - 1;
                    } while (uVar69 != 0);
                  }
                  uVar49 = uVar49 + 1;
                } while (uVar49 != uVar67);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar68 ^ uVar69) == 0 && uVar6 == 1) && uVar7 == uVar66) && uVar67 != 1) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_130) {
            local_128 = (void *)(uVar49 << 5);
            iVar44 = 0;
            do {
              Mat::channel((Mat *)local_e0,local_120,iVar44);
              auVar43 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar44);
              auVar54 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar44);
              auVar74 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar67) {
                uVar69 = 0;
                do {
                  if (0 < (int)uVar68) {
                    lVar63 = 0;
                    do {
                      auVar141 = vminps_avx(*(undefined1 (*) [32])((long)auVar43 + lVar63),
                                            *(undefined1 (*) [32])((long)auVar54 + lVar63));
                      *(undefined1 (*) [32])((long)auVar74 + lVar63) = auVar141;
                      lVar63 = lVar63 + 0x20;
                    } while (local_128 != (void *)lVar63);
                    auVar74 = (undefined1  [8])((long)auVar74 + lVar63);
                    auVar54 = (undefined1  [8])((long)auVar54 + lVar63);
                  }
                  uVar69 = uVar69 + 1;
                } while (uVar69 != uVar67);
              }
              iVar44 = iVar44 + 1;
            } while (iVar44 != (int)local_130);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_100) {
          iVar44 = 0;
          do {
            pMVar9 = local_108;
            Mat::channel((Mat *)local_e0,local_120,iVar44);
            auVar43 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar44);
            auVar54 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar44);
            auVar74 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_118) {
              lVar63 = 0;
              iVar46 = (int)local_118;
              do {
                auVar141 = vminps_avx(*(undefined1 (*) [32])((long)auVar43 + lVar63),
                                      *(undefined1 (*) [32])((long)auVar54 + lVar63));
                *(undefined1 (*) [32])((long)auVar74 + lVar63) = auVar141;
                lVar63 = lVar63 + 0x20;
                iVar46 = iVar46 + -1;
              } while (iVar46 != 0);
            }
            iVar44 = iVar44 + 1;
          } while (iVar44 != (int)local_100);
          return 0;
        }
        return 0;
      }
      return -100;
    case 6:
      uVar69 = pMVar8->w;
      local_100 = (ulong)uVar69;
      sVar10 = pMVar8->elemsize;
      iVar44 = pMVar8->elempack;
      uVar68 = pMVar8[1].w;
      local_118 = (ulong)uVar68;
      uVar67 = pMVar8[1].h;
      local_130 = (void *)(ulong)uVar67;
      uVar66 = pMVar8[1].c;
      uVar47 = (ulong)uVar66;
      sVar11 = pMVar8[1].elemsize;
      iVar46 = pMVar8[1].elempack;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        local_110 = (pointer)CONCAT44(local_110._4_4_,uVar67 * uVar68);
        if (iVar44 == 1 && uVar69 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            local_110 = pMVar1;
            Mat::create(pMVar9,uVar68,sVar11,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              local_e0._4_4_ = *pMVar8->data;
              local_e0._0_4_ = local_e0._4_4_;
              fStack_d8 = (float)local_e0._4_4_;
              fStack_d4 = (float)local_e0._4_4_;
              fStack_d0 = (float)local_e0._4_4_;
              fStack_cc = (float)local_e0._4_4_;
              fStack_c8 = (float)local_e0._4_4_;
              fStack_c4 = (float)local_e0._4_4_;
              if ((int)local_118 < 1) {
                return 0;
              }
              pvVar60 = local_110->data;
              lVar63 = 0;
              uVar47 = local_118;
              do {
                pafVar71 = (__m256 *)((long)pvVar60 + lVar63);
                uVar201 = *(undefined8 *)*pafVar71;
                uVar200 = *(undefined8 *)(*pafVar71 + 2);
                uVar203 = *(undefined8 *)(*pafVar71 + 4);
                uVar204 = *(undefined8 *)(*pafVar71 + 6);
                local_80 = *pafVar71;
                binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
                puVar55 = (undefined8 *)((long)pvVar45 + lVar63);
                *puVar55 = uVar201;
                puVar55[1] = uVar200;
                puVar55[2] = uVar203;
                puVar55[3] = uVar204;
                lVar63 = lVar63 + 0x20;
                uVar69 = (int)uVar47 - 1;
                uVar47 = (ulong)uVar69;
              } while (uVar69 != 0);
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar68,uVar67,sVar11,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              local_e0._4_4_ = *pMVar8->data;
              local_e0._0_4_ = local_e0._4_4_;
              fStack_d8 = (float)local_e0._4_4_;
              fStack_d4 = (float)local_e0._4_4_;
              fStack_d0 = (float)local_e0._4_4_;
              fStack_cc = (float)local_e0._4_4_;
              fStack_c8 = (float)local_e0._4_4_;
              fStack_c4 = (float)local_e0._4_4_;
              if ((int)local_110 < 1) {
                return 0;
              }
              pvVar60 = pMVar1->data;
              lVar63 = 0;
              iVar44 = (int)local_110;
              do {
                pafVar71 = (__m256 *)((long)pvVar60 + lVar63);
                uVar201 = *(undefined8 *)*pafVar71;
                uVar200 = *(undefined8 *)(*pafVar71 + 2);
                uVar203 = *(undefined8 *)(*pafVar71 + 4);
                uVar204 = *(undefined8 *)(*pafVar71 + 6);
                local_80 = *pafVar71;
                binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
                puVar55 = (undefined8 *)((long)pvVar45 + lVar63);
                *puVar55 = uVar201;
                puVar55[1] = uVar200;
                puVar55[2] = uVar203;
                puVar55[3] = uVar204;
                lVar63 = lVar63 + 0x20;
                iVar44 = iVar44 + -1;
              } while (iVar44 != 0);
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar68,uVar67,uVar66,sVar11,iVar46,opt->blob_allocator);
            if (local_108->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_108->c * local_108->cstep != 0) {
              fVar205 = *local_120->data;
              local_e0._4_4_ = fVar205;
              local_e0._0_4_ = fVar205;
              fStack_d8 = fVar205;
              fStack_d4 = fVar205;
              fStack_d0 = fVar205;
              fStack_cc = fVar205;
              fStack_c8 = fVar205;
              fStack_c4 = fVar205;
              if ((int)uVar66 < 1) {
                return 0;
              }
              local_130 = (void *)0x0;
              local_f0 = uVar47;
              do {
                if (0 < (int)local_110) {
                  lVar63 = local_108->cstep * local_108->elemsize * (long)local_130;
                  pvVar45 = local_108->data;
                  local_128 = (void *)(local_120[1].cstep * local_120[1].elemsize * (long)local_130
                                      + (long)local_120[1].data);
                  lVar75 = 0;
                  iVar44 = (int)local_110;
                  do {
                    local_80 = *(__m256 *)((long)local_128 + lVar75);
                    binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
                    *(__m256 *)((long)pvVar45 + lVar75 + lVar63) = local_80;
                    lVar75 = lVar75 + 0x20;
                    iVar44 = iVar44 + -1;
                  } while (iVar44 != 0);
                }
                local_130 = (void *)((long)local_130 + 1);
              } while (local_130 != (void *)local_f0);
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar69,sVar10,iVar44,opt->blob_allocator);
          pvVar45 = pMVar9->data;
          if (pvVar45 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar46 == 1 && pMVar8[1].w == 1) {
            local_e0._4_4_ = *pMVar1->data;
            local_e0._0_4_ = local_e0._4_4_;
            fStack_d8 = (float)local_e0._4_4_;
            fStack_d4 = (float)local_e0._4_4_;
            fStack_d0 = (float)local_e0._4_4_;
            fStack_cc = (float)local_e0._4_4_;
            fStack_c8 = (float)local_e0._4_4_;
            fStack_c4 = (float)local_e0._4_4_;
            if (0 < (int)local_100) {
              pvVar60 = pMVar8->data;
              lVar63 = 0;
              uVar47 = local_100;
              do {
                pafVar71 = (__m256 *)((long)pvVar60 + lVar63);
                uVar201 = *(undefined8 *)*pafVar71;
                uVar200 = *(undefined8 *)(*pafVar71 + 2);
                uVar203 = *(undefined8 *)(*pafVar71 + 4);
                uVar204 = *(undefined8 *)(*pafVar71 + 6);
                local_80 = *pafVar71;
                binary_op_pow_pack8::operator()(&local_131,&local_80,(__m256 *)local_e0);
                puVar55 = (undefined8 *)((long)pvVar45 + lVar63);
                *puVar55 = uVar201;
                puVar55[1] = uVar200;
                puVar55[2] = uVar203;
                puVar55[3] = uVar204;
                lVar63 = lVar63 + 0x20;
                uVar69 = (int)uVar47 - 1;
                uVar47 = (ulong)uVar69;
              } while (uVar69 != 0);
            }
          }
          else {
            if ((int)local_100 < 1) {
              return 0;
            }
            pvVar60 = pMVar8->data;
            pvVar65 = pMVar8[1].data;
            lVar63 = 0;
            uVar47 = local_100;
            do {
              _local_e0 = *(__m256 *)((long)pvVar60 + lVar63);
              pafVar71 = (__m256 *)((long)pvVar65 + lVar63);
              uVar201 = *(undefined8 *)*pafVar71;
              uVar200 = *(undefined8 *)(*pafVar71 + 2);
              uVar203 = *(undefined8 *)(*pafVar71 + 4);
              uVar204 = *(undefined8 *)(*pafVar71 + 6);
              local_80 = *pafVar71;
              binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
              puVar55 = (undefined8 *)((long)pvVar45 + lVar63);
              *puVar55 = uVar201;
              puVar55[1] = uVar200;
              puVar55[2] = uVar203;
              puVar55[3] = uVar204;
              lVar63 = lVar63 + 0x20;
              uVar69 = (int)uVar47 - 1;
              uVar47 = (ulong)uVar69;
            } while (uVar69 != 0);
          }
        }
        else {
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar68,uVar67,sVar11,iVar46,opt->blob_allocator);
            puVar55 = (undefined8 *)pMVar9->data;
            if (puVar55 == (undefined8 *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)local_130) {
                local_140 = (__m256 *)pMVar8->data;
                pafVar71 = (__m256 *)pMVar8[1].data;
                local_128 = (void *)((ulong)local_128._4_4_ << 0x20);
                do {
                  _local_e0 = *local_140;
                  uVar47 = local_118 & 0xffffffff;
                  if (0 < (int)local_118) {
                    do {
                      uVar201 = *(undefined8 *)*pafVar71;
                      uVar200 = *(undefined8 *)(*pafVar71 + 2);
                      uVar203 = *(undefined8 *)(*pafVar71 + 4);
                      uVar204 = *(undefined8 *)(*pafVar71 + 6);
                      local_80 = *pafVar71;
                      binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
                      *puVar55 = uVar201;
                      puVar55[1] = uVar200;
                      puVar55[2] = uVar203;
                      puVar55[3] = uVar204;
                      pafVar71 = pafVar71 + 1;
                      puVar55 = puVar55 + 4;
                      uVar69 = (int)uVar47 - 1;
                      uVar47 = (ulong)uVar69;
                    } while (uVar69 != 0);
                  }
                  local_140 = local_140 + 1;
                  iVar44 = (int)local_128 + 1;
                  local_128 = (void *)CONCAT44(local_128._4_4_,iVar44);
                } while (iVar44 != (int)local_130);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar68,uVar67,uVar66,sVar11,iVar46,opt->blob_allocator);
            if (local_108->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_108->c * local_108->cstep != 0) {
              if (0 < (int)uVar66) {
                local_130 = (void *)0x0;
                local_f0 = uVar47;
                do {
                  _local_e0 = *(__m256 *)((long)local_120->data + (long)local_130 * 0x20);
                  if (0 < (int)local_110) {
                    lVar75 = local_108->cstep * local_108->elemsize * (long)local_130;
                    pvVar45 = local_108->data;
                    local_128 = (void *)(local_120[1].cstep * local_120[1].elemsize *
                                         (long)local_130 + (long)local_120[1].data);
                    lVar63 = 0;
                    iVar44 = (int)local_110;
                    do {
                      pafVar71 = (__m256 *)((long)local_128 + lVar63);
                      uVar201 = *(undefined8 *)*pafVar71;
                      uVar200 = *(undefined8 *)(*pafVar71 + 2);
                      uVar203 = *(undefined8 *)(*pafVar71 + 4);
                      uVar204 = *(undefined8 *)(*pafVar71 + 6);
                      local_80 = *pafVar71;
                      binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
                      puVar55 = (undefined8 *)((long)pvVar45 + lVar63 + lVar75);
                      *puVar55 = uVar201;
                      puVar55[1] = uVar200;
                      puVar55[2] = uVar203;
                      puVar55[3] = uVar204;
                      lVar63 = lVar63 + 0x20;
                      iVar44 = iVar44 + -1;
                    } while (iVar44 != 0);
                  }
                  local_130 = (void *)((long)local_130 + 1);
                } while (local_130 != (void *)local_f0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        return 0;
      }
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar46);
      uVar6 = pMVar8->h;
      local_f8 = (ulong)uVar6;
      if (iVar5 != 2) {
        if (iVar5 != 3) {
          return 0;
        }
        local_110 = (pointer)CONCAT44(local_110._4_4_,uVar67 * uVar68);
        uVar7 = pMVar8->c;
        local_e8 = (ulong)uVar7;
        local_f0 = CONCAT44(local_f0._4_4_,uVar6 * uVar69);
        if (pMVar8[1].dims != 3) {
          Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
          if (local_108->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_108->c * local_108->cstep == 0) {
            return -100;
          }
          iVar44 = (int)local_e8;
          if (local_120[1].dims != 1) {
            if (local_120[1].dims != 2) {
              return 0;
            }
            if (0 < iVar44) {
              local_130 = (void *)0x0;
              do {
                if (0 < (int)local_f8) {
                  pafVar72 = (__m256 *)
                             (local_108->cstep * (long)local_130 * local_108->elemsize +
                             (long)local_108->data);
                  pafVar71 = (__m256 *)
                             ((long)local_120[1].w * (long)local_130 * local_120[1].elemsize +
                             (long)local_120[1].data);
                  pafVar73 = (__m256 *)
                             (local_120->cstep * (long)local_130 * local_120->elemsize +
                             (long)local_120->data);
                  iVar44 = 0;
                  do {
                    local_128 = (void *)CONCAT44(local_128._4_4_,iVar44);
                    _local_e0 = *pafVar71;
                    uVar47 = local_100 & 0xffffffff;
                    if (0 < (int)local_100) {
                      do {
                        local_80 = *pafVar73;
                        binary_op_pow_pack8::operator()(&local_131,&local_80,(__m256 *)local_e0);
                        *pafVar72 = local_80;
                        pafVar73 = pafVar73 + 1;
                        pafVar72 = pafVar72 + 1;
                        uVar69 = (int)uVar47 - 1;
                        uVar47 = (ulong)uVar69;
                      } while (uVar69 != 0);
                    }
                    pafVar71 = pafVar71 + 1;
                    iVar44 = (int)local_128 + 1;
                  } while (iVar44 != (int)local_f8);
                }
                local_130 = (void *)((long)local_130 + 1);
              } while (local_130 != (void *)local_e8);
              return 0;
            }
            return 0;
          }
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < iVar44) {
              local_130 = (void *)0x0;
              do {
                pvVar45 = local_120->data;
                _local_e0 = *(__m256 *)((long)local_120[1].data + (long)local_130 * 0x20);
                if (0 < (int)(uint)local_f0) {
                  local_128 = (void *)(local_108->cstep * local_108->elemsize * (long)local_130 +
                                      (long)local_108->data);
                  lVar63 = local_120->cstep * local_120->elemsize * (long)local_130;
                  lVar75 = 0;
                  iVar44 = (uint)local_f0;
                  do {
                    pafVar71 = (__m256 *)((long)pvVar45 + lVar75 + lVar63);
                    uVar201 = *(undefined8 *)*pafVar71;
                    uVar200 = *(undefined8 *)(*pafVar71 + 2);
                    uVar203 = *(undefined8 *)(*pafVar71 + 4);
                    uVar204 = *(undefined8 *)(*pafVar71 + 6);
                    local_80 = *pafVar71;
                    binary_op_pow_pack8::operator()(&local_131,&local_80,(__m256 *)local_e0);
                    puVar55 = (undefined8 *)((long)local_128 + lVar75);
                    *puVar55 = uVar201;
                    puVar55[1] = uVar200;
                    puVar55[2] = uVar203;
                    puVar55[3] = uVar204;
                    lVar75 = lVar75 + 0x20;
                    iVar44 = iVar44 + -1;
                  } while (iVar44 != 0);
                }
                local_130 = (void *)((long)local_130 + 1);
              } while (local_130 != (void *)local_e8);
              return 0;
            }
            return 0;
          }
          fVar205 = *pMVar1->data;
          local_e0._4_4_ = fVar205;
          local_e0._0_4_ = fVar205;
          fStack_d8 = fVar205;
          fStack_d4 = fVar205;
          fStack_d0 = fVar205;
          fStack_cc = fVar205;
          fStack_c8 = fVar205;
          fStack_c4 = fVar205;
          if (iVar44 < 1) {
            return 0;
          }
          local_130 = (void *)0x0;
          do {
            if (0 < (int)(uint)local_f0) {
              lVar63 = local_108->cstep * local_108->elemsize * (long)local_130;
              pvVar45 = local_108->data;
              local_128 = (void *)(local_120->cstep * local_120->elemsize * (long)local_130 +
                                  (long)local_120->data);
              lVar75 = 0;
              iVar44 = (uint)local_f0;
              do {
                local_80 = *(__m256 *)((long)local_128 + lVar75);
                binary_op_pow_pack8::operator()(&local_131,&local_80,(__m256 *)local_e0);
                *(__m256 *)((long)pvVar45 + lVar75 + lVar63) = local_80;
                lVar75 = lVar75 + 0x20;
                iVar44 = iVar44 + -1;
              } while (iVar44 != 0);
            }
            local_130 = (void *)((long)local_130 + 1);
          } while (local_130 != (void *)local_e8);
          return 0;
        }
        if (uVar66 == uVar7 && (uVar67 == 1 && (uVar68 ^ 1) == 0)) {
          Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
          if (local_108->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_108->c * local_108->cstep != 0) {
            if (0 < (int)(uint)local_e8) {
              local_130 = (void *)0x0;
              do {
                pvVar45 = local_120->data;
                _local_e0 = *(__m256 *)
                             ((long)local_120[1].data +
                             local_120[1].cstep * (long)local_130 * local_120[1].elemsize);
                if (0 < (int)(uint)local_f0) {
                  lVar63 = local_120->cstep * local_120->elemsize * (long)local_130;
                  local_128 = (void *)((long)local_108->data +
                                      local_108->cstep * local_108->elemsize * (long)local_130);
                  lVar75 = 0;
                  iVar44 = (uint)local_f0;
                  do {
                    pafVar71 = (__m256 *)((long)pvVar45 + lVar75 + lVar63);
                    uVar201 = *(undefined8 *)*pafVar71;
                    uVar200 = *(undefined8 *)(*pafVar71 + 2);
                    uVar203 = *(undefined8 *)(*pafVar71 + 4);
                    uVar204 = *(undefined8 *)(*pafVar71 + 6);
                    local_80 = *pafVar71;
                    binary_op_pow_pack8::operator()(&local_131,&local_80,(__m256 *)local_e0);
                    puVar55 = (undefined8 *)((long)local_128 + lVar75);
                    *puVar55 = uVar201;
                    puVar55[1] = uVar200;
                    puVar55[2] = uVar203;
                    puVar55[3] = uVar204;
                    lVar75 = lVar75 + 0x20;
                    iVar44 = iVar44 + -1;
                  } while (iVar44 != 0);
                }
                local_130 = (void *)((long)local_130 + 1);
              } while (local_130 != (void *)local_e8);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar68 == uVar69) && (iVar46 == 1 && (uVar66 == 1 && uVar67 == uVar6))) {
          Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
          if (local_108->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_108->c * local_108->cstep != 0) {
            if (0 < (int)(uint)local_e8) {
              local_118 = 0;
              do {
                if (0 < (int)(uint)local_f0) {
                  lVar63 = local_120->cstep * local_120->elemsize * local_118;
                  pvVar45 = local_120->data;
                  local_130 = local_120[1].data;
                  local_128 = (void *)(local_108->cstep * local_108->elemsize * local_118 +
                                      (long)local_108->data);
                  lVar75 = 0;
                  iVar44 = (uint)local_f0;
                  do {
                    _local_e0 = *(__m256 *)((long)pvVar45 + lVar75 * 8 + lVar63);
                    fVar205 = *(float *)((long)local_130 + lVar75);
                    local_80[1] = fVar205;
                    local_80[0] = fVar205;
                    local_80[2] = fVar205;
                    local_80[3] = fVar205;
                    local_80[4] = fVar205;
                    local_80[5] = fVar205;
                    local_80[6] = fVar205;
                    local_80[7] = fVar205;
                    binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
                    *(__m256 *)((long)local_128 + lVar75 * 8) = local_80;
                    lVar75 = lVar75 + 4;
                    iVar44 = iVar44 + -1;
                  } while (iVar44 != 0);
                }
                local_118 = local_118 + 1;
              } while (local_118 != local_e8);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar6 == 1 && (uVar69 ^ 1) == 0) && uVar7 == uVar66) {
          Mat::create(pMVar9,uVar68,uVar67,uVar66,sVar11,iVar46,opt->blob_allocator);
          if (local_108->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_108->c * local_108->cstep != 0) {
            if (0 < (int)uVar66) {
              local_130 = (void *)0x0;
              local_f0 = uVar47;
              do {
                pvVar45 = local_120[1].data;
                _local_e0 = *(__m256 *)
                             ((long)local_120->data +
                             local_120->cstep * (long)local_130 * local_120->elemsize);
                if (0 < (int)local_110) {
                  lVar63 = local_120[1].cstep * local_120[1].elemsize * (long)local_130;
                  local_128 = (void *)((long)local_108->data +
                                      local_108->cstep * local_108->elemsize * (long)local_130);
                  lVar75 = 0;
                  iVar44 = (int)local_110;
                  do {
                    pafVar71 = (__m256 *)((long)pvVar45 + lVar75 + lVar63);
                    uVar201 = *(undefined8 *)*pafVar71;
                    uVar200 = *(undefined8 *)(*pafVar71 + 2);
                    uVar203 = *(undefined8 *)(*pafVar71 + 4);
                    uVar204 = *(undefined8 *)(*pafVar71 + 6);
                    local_80 = *pafVar71;
                    binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
                    puVar55 = (undefined8 *)((long)local_128 + lVar75);
                    *puVar55 = uVar201;
                    puVar55[1] = uVar200;
                    puVar55[2] = uVar203;
                    puVar55[3] = uVar204;
                    lVar75 = lVar75 + 0x20;
                    iVar44 = iVar44 + -1;
                  } while (iVar44 != 0);
                }
                local_130 = (void *)((long)local_130 + 1);
              } while (local_130 != (void *)local_f0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar68 == uVar69) && (iVar44 == 1 && (uVar7 == 1 && uVar6 == uVar67))) {
          local_f0 = uVar47;
          Mat::create(pMVar9,uVar68,uVar67,uVar66,sVar11,iVar46,opt->blob_allocator);
          if (local_108->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_108->c * local_108->cstep != 0) {
            if (0 < (int)(uint)local_f0) {
              local_118 = 0;
              do {
                if (0 < (int)local_110) {
                  lVar63 = local_120[1].cstep * local_120[1].elemsize * local_118;
                  pvVar45 = local_120[1].data;
                  local_130 = local_120->data;
                  local_128 = (void *)(local_108->cstep * local_108->elemsize * local_118 +
                                      (long)local_108->data);
                  lVar75 = 0;
                  iVar44 = (int)local_110;
                  do {
                    local_e0._4_4_ = *(float *)((long)local_130 + lVar75);
                    local_e0._0_4_ = local_e0._4_4_;
                    fStack_d8 = (float)local_e0._4_4_;
                    fStack_d4 = (float)local_e0._4_4_;
                    fStack_d0 = (float)local_e0._4_4_;
                    fStack_cc = (float)local_e0._4_4_;
                    fStack_c8 = (float)local_e0._4_4_;
                    fStack_c4 = (float)local_e0._4_4_;
                    local_80 = *(__m256 *)((long)pvVar45 + lVar75 * 8 + lVar63);
                    binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
                    *(__m256 *)((long)local_128 + lVar75 * 8) = local_80;
                    lVar75 = lVar75 + 4;
                    iVar44 = iVar44 + -1;
                  } while (iVar44 != 0);
                }
                local_118 = local_118 + 1;
              } while (local_118 != local_f0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar68 ^ 1) == 0 && uVar67 == uVar6) && uVar7 == uVar66) && uVar69 != 1) {
          Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
          if (local_108->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_108->c * local_108->cstep != 0) {
            if (0 < (int)uVar66) {
              local_130 = (void *)0x0;
              local_f0 = uVar47;
              do {
                if (0 < (int)local_f8) {
                  local_128 = (void *)(local_120[1].cstep * (long)local_130 * local_120[1].elemsize
                                      + (long)local_120[1].data);
                  pafVar71 = (__m256 *)
                             (local_108->cstep * (long)local_130 * local_108->elemsize +
                             (long)local_108->data);
                  pafVar73 = (__m256 *)
                             (local_120->cstep * (long)local_130 * local_120->elemsize +
                             (long)local_120->data);
                  uVar47 = 0;
                  do {
                    _local_e0 = *(__m256 *)((long)local_128 + uVar47 * 0x20);
                    uVar48 = local_100 & 0xffffffff;
                    if (0 < (int)local_100) {
                      do {
                        local_80 = *pafVar73;
                        binary_op_pow_pack8::operator()(&local_131,&local_80,(__m256 *)local_e0);
                        *pafVar71 = local_80;
                        pafVar73 = pafVar73 + 1;
                        pafVar71 = pafVar71 + 1;
                        uVar69 = (int)uVar48 - 1;
                        uVar48 = (ulong)uVar69;
                      } while (uVar69 != 0);
                    }
                    uVar47 = uVar47 + 1;
                  } while (uVar47 != local_f8);
                }
                local_130 = (void *)((long)local_130 + 1);
              } while (local_130 != (void *)local_f0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        uVar50 = uVar68 ^ uVar69;
        local_60 = CONCAT44(local_60._4_4_,uVar50);
        if (((uVar67 != 1 || uVar50 != 0) || uVar66 != uVar7) || uVar6 == 1) {
          if ((((uVar69 ^ 1) == 0 && uVar6 == uVar67) && uVar66 == uVar7) && uVar68 != 1) {
            local_f0 = uVar47;
            Mat::create(pMVar9,uVar68,uVar67,uVar66,sVar11,iVar46,opt->blob_allocator);
            if (local_108->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_108->c * local_108->cstep != 0) {
              if (0 < (int)(uint)local_f0) {
                local_f8 = 0;
                pvVar45 = local_130;
                do {
                  if (0 < (int)pvVar45) {
                    local_128 = (void *)(local_120->cstep * local_f8 * local_120->elemsize +
                                        (long)local_120->data);
                    pafVar73 = (__m256 *)
                               (local_108->cstep * local_f8 * local_108->elemsize +
                               (long)local_108->data);
                    pafVar71 = (__m256 *)
                               (local_120[1].cstep * local_f8 * local_120[1].elemsize +
                               (long)local_120[1].data);
                    uVar47 = 0;
                    do {
                      _local_e0 = *(__m256 *)((long)local_128 + uVar47 * 0x20);
                      uVar48 = local_118 & 0xffffffff;
                      if (0 < (int)local_118) {
                        do {
                          local_80 = *pafVar71;
                          binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
                          *pafVar73 = local_80;
                          pafVar71 = pafVar71 + 1;
                          pafVar73 = pafVar73 + 1;
                          uVar69 = (int)uVar48 - 1;
                          uVar48 = (ulong)uVar69;
                        } while (uVar69 != 0);
                      }
                      uVar47 = uVar47 + 1;
                      pvVar45 = local_130;
                    } while ((void *)uVar47 != local_130);
                  }
                  local_f8 = local_f8 + 1;
                } while (local_f8 != local_f0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar50 == 0 && uVar6 == 1) && uVar7 == uVar66) && uVar67 != 1) {
            local_110 = pMVar1;
            local_f0 = uVar47;
            Mat::create(pMVar9,uVar68,uVar67,uVar66,sVar11,iVar46,opt->blob_allocator);
            if (pMVar9->data != (void *)0x0) {
              if ((long)local_108->c * local_108->cstep == 0) {
                return -100;
              }
              if (0 < (int)(uint)local_f0) {
                lVar63 = local_118 << 5;
                local_100 = 0;
                local_f8 = lVar63;
                do {
                  iVar44 = (int)local_100;
                  Mat::channel((Mat *)local_e0,local_120,iVar44);
                  auVar43 = local_e0;
                  Mat::~Mat((Mat *)local_e0);
                  Mat::channel((Mat *)local_e0,local_110,iVar44);
                  auVar54 = local_e0;
                  Mat::~Mat((Mat *)local_e0);
                  Mat::channel((Mat *)local_e0,local_108,iVar44);
                  auVar74 = local_e0;
                  Mat::~Mat((Mat *)local_e0);
                  if (0 < (int)local_130) {
                    iVar44 = 0;
                    pvVar45 = local_130;
                    do {
                      if (0 < (int)local_118) {
                        local_128 = (void *)CONCAT44(local_128._4_4_,iVar44);
                        lVar75 = 0;
                        do {
                          _local_e0 = *(__m256 *)((long)auVar43 + lVar75);
                          local_80 = *(__m256 *)((long)auVar54 + lVar75);
                          afVar187 = local_80;
                          binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
                          *(__m256 *)((long)auVar74 + lVar75) = afVar187;
                          lVar75 = lVar75 + 0x20;
                        } while (lVar63 != lVar75);
                        auVar74 = (undefined1  [8])((long)auVar74 + lVar75);
                        auVar54 = (undefined1  [8])((long)auVar54 + lVar75);
                        pvVar45 = local_130;
                        iVar44 = (int)local_128;
                      }
                      iVar44 = iVar44 + 1;
                    } while (iVar44 != (int)pvVar45);
                  }
                  uVar69 = (int)local_100 + 1;
                  local_100 = (ulong)uVar69;
                } while (uVar69 != (uint)local_f0);
                return 0;
              }
              return 0;
            }
          }
          else {
            local_110 = pMVar1;
            Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
            if (pMVar9->data != (void *)0x0) {
              if ((long)local_108->c * local_108->cstep == 0) {
                return -100;
              }
              if (0 < (int)(uint)local_e8) {
                local_130 = (void *)0x0;
                do {
                  iVar44 = (int)local_130;
                  Mat::channel((Mat *)local_e0,local_120,iVar44);
                  auVar43 = local_e0;
                  Mat::~Mat((Mat *)local_e0);
                  Mat::channel((Mat *)local_e0,local_110,iVar44);
                  local_128 = (void *)local_e0;
                  Mat::~Mat((Mat *)local_e0);
                  Mat::channel((Mat *)local_e0,local_108,iVar44);
                  auVar54 = local_e0;
                  Mat::~Mat((Mat *)local_e0);
                  if (0 < (int)(uint)local_f0) {
                    lVar63 = 0;
                    iVar44 = (uint)local_f0;
                    do {
                      _local_e0 = *(__m256 *)((long)auVar43 + lVar63);
                      local_80 = *(__m256 *)((long)local_128 + lVar63);
                      afVar187 = local_80;
                      binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
                      *(__m256 *)((long)auVar54 + lVar63) = afVar187;
                      lVar63 = lVar63 + 0x20;
                      iVar44 = iVar44 + -1;
                    } while (iVar44 != 0);
                  }
                  uVar69 = (int)local_130 + 1;
                  local_130 = (void *)(ulong)uVar69;
                } while (uVar69 != (uint)local_e8);
                return 0;
              }
              return 0;
            }
          }
          return -100;
        }
        local_f0 = uVar47;
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (local_108->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)(uint)local_f0) {
            lVar63 = local_100 << 5;
            local_130 = (void *)0x0;
            local_128 = (void *)lVar63;
            do {
              if (0 < (int)local_f8) {
                pvVar60 = (void *)(local_108->cstep * (long)local_130 * local_108->elemsize +
                                  (long)local_108->data);
                pvVar65 = (void *)(local_120->cstep * (long)local_130 * local_120->elemsize +
                                  (long)local_120->data);
                lVar75 = local_120[1].elemsize * local_120[1].cstep * (long)local_130;
                pvVar45 = local_120[1].data;
                iVar44 = 0;
                uVar47 = local_100;
                uVar48 = local_f8;
                do {
                  if (0 < (int)uVar47) {
                    lVar76 = 0;
                    do {
                      _local_e0 = *(__m256 *)((long)pvVar65 + lVar76);
                      local_80 = *(__m256 *)((long)pvVar45 + lVar76 + lVar75);
                      binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
                      *(__m256 *)((long)pvVar60 + lVar76) = local_80;
                      lVar76 = lVar76 + 0x20;
                    } while (lVar63 != lVar76);
                    pvVar60 = (void *)((long)pvVar60 + lVar76);
                    pvVar65 = (void *)((long)pvVar65 + lVar76);
                    uVar47 = local_100;
                    uVar48 = local_f8;
                  }
                  iVar44 = iVar44 + 1;
                } while (iVar44 != (int)uVar48);
              }
              local_130 = (void *)((long)local_130 + 1);
            } while (local_130 != (void *)local_f0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (pMVar8[1].dims == 3) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,sVar11,iVar46,opt->blob_allocator);
        if (local_108->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)uVar66) {
            local_f8 = 0;
            pvVar45 = local_130;
            local_f0 = uVar47;
            do {
              if (0 < (int)pvVar45) {
                pafVar73 = (__m256 *)
                           (local_108->cstep * local_f8 * local_108->elemsize +
                           (long)local_108->data);
                pafVar72 = (__m256 *)
                           (local_120[1].cstep * local_f8 * local_120[1].elemsize +
                           (long)local_120[1].data);
                pafVar71 = (__m256 *)
                           ((long)local_120->w * local_f8 * local_120->elemsize +
                           (long)local_120->data);
                iVar44 = 0;
                do {
                  local_128 = (void *)CONCAT44(local_128._4_4_,iVar44);
                  _local_e0 = *pafVar71;
                  uVar47 = local_118 & 0xffffffff;
                  if (0 < (int)local_118) {
                    do {
                      local_80 = *pafVar72;
                      binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
                      *pafVar73 = local_80;
                      pafVar72 = pafVar72 + 1;
                      pafVar73 = pafVar73 + 1;
                      uVar69 = (int)uVar47 - 1;
                      uVar47 = (ulong)uVar69;
                    } while (uVar69 != 0);
                  }
                  pafVar71 = pafVar71 + 1;
                  iVar44 = (int)local_128 + 1;
                  pvVar45 = local_130;
                } while (iVar44 != (int)local_130);
              }
              local_f8 = local_f8 + 1;
            } while (local_f8 != local_f0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_f0 = CONCAT44(local_f0._4_4_,uVar6 * uVar69);
      Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
      pvVar45 = pMVar9->data;
      if (pvVar45 == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar9->c * pMVar9->cstep == 0) {
        return -100;
      }
      if (local_120[1].dims != 1) {
        if (local_120[1].dims != 2) {
          return 0;
        }
        if (0 < (int)(uint)local_f0) {
          pvVar60 = local_120->data;
          pvVar65 = local_120[1].data;
          lVar63 = 0;
          iVar44 = (uint)local_f0;
          do {
            _local_e0 = *(__m256 *)((long)pvVar60 + lVar63);
            pafVar71 = (__m256 *)((long)pvVar65 + lVar63);
            uVar201 = *(undefined8 *)*pafVar71;
            uVar200 = *(undefined8 *)(*pafVar71 + 2);
            uVar203 = *(undefined8 *)(*pafVar71 + 4);
            uVar204 = *(undefined8 *)(*pafVar71 + 6);
            local_80 = *pafVar71;
            binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
            puVar55 = (undefined8 *)((long)pvVar45 + lVar63);
            *puVar55 = uVar201;
            puVar55[1] = uVar200;
            puVar55[2] = uVar203;
            puVar55[3] = uVar204;
            lVar63 = lVar63 + 0x20;
            iVar44 = iVar44 + -1;
          } while (iVar44 != 0);
          return 0;
        }
        return 0;
      }
      Mat::create(pMVar9,(int)local_100,(int)local_f8,sVar10,iVar44,opt->blob_allocator);
      puVar55 = (undefined8 *)pMVar9->data;
      if (puVar55 == (undefined8 *)0x0) {
        return -100;
      }
      if ((long)pMVar9->c * pMVar9->cstep != 0) {
        if ((int)local_128 != 1 || local_120[1].w != 1) {
          if (0 < (int)local_f8) {
            pafVar71 = (__m256 *)local_120->data;
            local_140 = (__m256 *)local_120[1].data;
            local_128 = (void *)((ulong)local_128 & 0xffffffff00000000);
            do {
              _local_e0 = *local_140;
              uVar47 = local_100 & 0xffffffff;
              if (0 < (int)local_100) {
                do {
                  uVar201 = *(undefined8 *)*pafVar71;
                  uVar200 = *(undefined8 *)(*pafVar71 + 2);
                  uVar203 = *(undefined8 *)(*pafVar71 + 4);
                  uVar204 = *(undefined8 *)(*pafVar71 + 6);
                  local_80 = *pafVar71;
                  binary_op_pow_pack8::operator()(&local_131,&local_80,(__m256 *)local_e0);
                  *puVar55 = uVar201;
                  puVar55[1] = uVar200;
                  puVar55[2] = uVar203;
                  puVar55[3] = uVar204;
                  pafVar71 = pafVar71 + 1;
                  puVar55 = puVar55 + 4;
                  uVar69 = (int)uVar47 - 1;
                  uVar47 = (ulong)uVar69;
                } while (uVar69 != 0);
              }
              local_140 = local_140 + 1;
              iVar44 = (int)local_128 + 1;
              local_128 = (void *)CONCAT44(local_128._4_4_,iVar44);
            } while (iVar44 != (int)local_f8);
            return 0;
          }
          return 0;
        }
        local_e0._4_4_ = *pMVar1->data;
        local_e0._0_4_ = local_e0._4_4_;
        fStack_d8 = (float)local_e0._4_4_;
        fStack_d4 = (float)local_e0._4_4_;
        fStack_d0 = (float)local_e0._4_4_;
        fStack_cc = (float)local_e0._4_4_;
        fStack_c8 = (float)local_e0._4_4_;
        fStack_c4 = (float)local_e0._4_4_;
        if ((int)(uint)local_f0 < 1) {
          return 0;
        }
        pvVar45 = local_120->data;
        lVar63 = 0;
        iVar44 = (uint)local_f0;
        do {
          pafVar71 = (__m256 *)((long)pvVar45 + lVar63);
          uVar201 = *(undefined8 *)*pafVar71;
          uVar200 = *(undefined8 *)(*pafVar71 + 2);
          uVar203 = *(undefined8 *)(*pafVar71 + 4);
          uVar204 = *(undefined8 *)(*pafVar71 + 6);
          local_80 = *pafVar71;
          binary_op_pow_pack8::operator()(&local_131,&local_80,(__m256 *)local_e0);
          puVar3 = (undefined8 *)((long)puVar55 + lVar63);
          *puVar3 = uVar201;
          puVar3[1] = uVar200;
          puVar3[2] = uVar203;
          puVar3[3] = uVar204;
          lVar63 = lVar63 + 0x20;
          iVar44 = iVar44 + -1;
        } while (iVar44 != 0);
        return 0;
      }
      return -100;
    case 7:
      uVar69 = pMVar8->w;
      uVar48 = (ulong)uVar69;
      sVar10 = pMVar8->elemsize;
      uVar68 = pMVar8[1].w;
      uVar49 = (ulong)uVar68;
      uVar67 = pMVar8[1].h;
      uVar66 = pMVar8[1].c;
      uVar47 = (ulong)uVar66;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar67 * uVar68);
      local_f0 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar44 == 1 && uVar69 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar68,local_f0,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar68) {
                uVar4 = *pMVar8->data;
                auVar162._4_4_ = uVar4;
                auVar162._0_4_ = uVar4;
                auVar162._8_4_ = uVar4;
                auVar162._12_4_ = uVar4;
                auVar162._16_4_ = uVar4;
                auVar162._20_4_ = uVar4;
                auVar162._24_4_ = uVar4;
                auVar162._28_4_ = uVar4;
                pvVar60 = pMVar1->data;
                lVar63 = 0;
                do {
                  auVar141 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar60 + lVar63),auVar162);
                  *(undefined1 (*) [32])((long)pvVar45 + lVar63) = auVar141;
                  lVar63 = lVar63 + 0x20;
                  uVar69 = (int)uVar49 - 1;
                  uVar49 = (ulong)uVar69;
                } while (uVar69 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar68,uVar67,local_f0,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)local_130) {
                uVar4 = *pMVar8->data;
                auVar159._4_4_ = uVar4;
                auVar159._0_4_ = uVar4;
                auVar159._8_4_ = uVar4;
                auVar159._12_4_ = uVar4;
                auVar159._16_4_ = uVar4;
                auVar159._20_4_ = uVar4;
                auVar159._24_4_ = uVar4;
                auVar159._28_4_ = uVar4;
                pvVar60 = pMVar1->data;
                lVar63 = 0;
                do {
                  auVar141 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar60 + lVar63),auVar159);
                  *(undefined1 (*) [32])((long)pvVar45 + lVar63) = auVar141;
                  lVar63 = lVar63 + 0x20;
                  local_130._0_4_ = (int)local_130 + -1;
                } while ((int)local_130 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar66) {
                uVar4 = *pMVar8->data;
                auVar139._4_4_ = uVar4;
                auVar139._0_4_ = uVar4;
                auVar139._8_4_ = uVar4;
                auVar139._12_4_ = uVar4;
                auVar139._16_4_ = uVar4;
                auVar139._20_4_ = uVar4;
                auVar139._24_4_ = uVar4;
                auVar139._28_4_ = uVar4;
                uVar48 = 0;
                do {
                  if (0 < (int)local_130) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar45 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar60 = pMVar8[1].data;
                    lVar63 = 0;
                    iVar44 = (int)local_130;
                    do {
                      auVar141 = vsubps_avx(*(undefined1 (*) [32])
                                             ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48),
                                            auVar139);
                      *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) =
                           auVar141;
                      lVar63 = lVar63 + 0x20;
                      iVar44 = iVar44 + -1;
                    } while (iVar44 != 0);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar47);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar69,sVar10,iVar44,opt->blob_allocator);
          pvVar45 = pMVar9->data;
          if (pvVar45 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar46 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar69) {
              pvVar60 = pMVar8->data;
              pvVar65 = pMVar8[1].data;
              lVar63 = 0;
              do {
                auVar141 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar65 + lVar63),
                                      *(undefined1 (*) [32])((long)pvVar60 + lVar63));
                *(undefined1 (*) [32])((long)pvVar45 + lVar63) = auVar141;
                lVar63 = lVar63 + 0x20;
                uVar69 = (int)uVar48 - 1;
                uVar48 = (ulong)uVar69;
              } while (uVar69 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar69) {
            uVar4 = *local_110->data;
            auVar151._4_4_ = uVar4;
            auVar151._0_4_ = uVar4;
            auVar151._8_4_ = uVar4;
            auVar151._12_4_ = uVar4;
            auVar151._16_4_ = uVar4;
            auVar151._20_4_ = uVar4;
            auVar151._24_4_ = uVar4;
            auVar151._28_4_ = uVar4;
            pvVar60 = pMVar8->data;
            lVar63 = 0;
            do {
              auVar141 = vsubps_avx(auVar151,*(undefined1 (*) [32])((long)pvVar60 + lVar63));
              *(undefined1 (*) [32])((long)pvVar45 + lVar63) = auVar141;
              lVar63 = lVar63 + 0x20;
              uVar69 = (int)uVar48 - 1;
              uVar48 = (ulong)uVar69;
            } while (uVar69 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar68,uVar67,local_f0,iVar46,opt->blob_allocator);
          pauVar51 = (undefined1 (*) [32])pMVar9->data;
          if (pauVar51 == (undefined1 (*) [32])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar67) {
              pauVar58 = (undefined1 (*) [32])pMVar8->data;
              pauVar56 = (undefined1 (*) [32])pMVar8[1].data;
              uVar69 = 0;
              do {
                if (0 < (int)uVar68) {
                  auVar141 = *pauVar58;
                  uVar66 = uVar68;
                  do {
                    auVar179 = vsubps_avx(*pauVar56,auVar141);
                    *pauVar51 = auVar179;
                    pauVar56 = pauVar56 + 1;
                    pauVar51 = pauVar51 + 1;
                    uVar66 = uVar66 - 1;
                  } while (uVar66 != 0);
                }
                pauVar58 = pauVar58 + 1;
                uVar69 = uVar69 + 1;
              } while (uVar69 != uVar67);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar66) {
          uVar48 = 0;
          do {
            if (0 < (int)local_130) {
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar9->elemsize;
              auVar141 = *(undefined1 (*) [32])((long)pMVar8->data + uVar48 * 0x20);
              pvVar45 = pMVar9->data;
              sVar12 = pMVar8[1].cstep;
              sVar13 = pMVar8[1].elemsize;
              pvVar60 = pMVar8[1].data;
              lVar63 = 0;
              iVar44 = (int)local_130;
              do {
                auVar179 = vsubps_avx(*(undefined1 (*) [32])
                                       ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48),auVar141)
                ;
                *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) = auVar179
                ;
                lVar63 = lVar63 + 0x20;
                iVar44 = iVar44 + -1;
              } while (iVar44 != 0);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar47);
          return 0;
        }
        return 0;
      }
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar46);
      uVar6 = pMVar8->h;
      local_118 = CONCAT44(local_118._4_4_,uVar6 * uVar69);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar66) {
              uVar48 = 0;
              do {
                if (0 < (int)uVar67) {
                  pauVar51 = (undefined1 (*) [32])
                             (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                  pauVar58 = (undefined1 (*) [32])
                             (local_120[1].cstep * uVar48 * local_120[1].elemsize +
                             (long)local_120[1].data);
                  pauVar56 = (undefined1 (*) [32])
                             ((long)local_120->w * uVar48 * local_120->elemsize +
                             (long)local_120->data);
                  uVar69 = 0;
                  do {
                    if (0 < (int)uVar68) {
                      auVar141 = *pauVar56;
                      uVar66 = uVar68;
                      do {
                        auVar179 = vsubps_avx(*pauVar58,auVar141);
                        *pauVar51 = auVar179;
                        pauVar58 = pauVar58 + 1;
                        pauVar51 = pauVar51 + 1;
                        uVar66 = uVar66 - 1;
                      } while (uVar66 != 0);
                    }
                    pauVar56 = pauVar56 + 1;
                    uVar69 = uVar69 + 1;
                  } while (uVar69 != uVar67);
                }
                uVar48 = uVar48 + 1;
              } while (uVar48 != uVar47);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pvVar45 = pMVar9->data;
        if (pvVar45 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_118) {
            pvVar60 = local_120->data;
            pvVar65 = local_120[1].data;
            lVar63 = 0;
            do {
              auVar141 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar65 + lVar63),
                                    *(undefined1 (*) [32])((long)pvVar60 + lVar63));
              *(undefined1 (*) [32])((long)pvVar45 + lVar63) = auVar141;
              lVar63 = lVar63 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pauVar51 = (undefined1 (*) [32])pMVar9->data;
        if (pauVar51 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pauVar58 = (undefined1 (*) [32])local_120->data;
              pauVar56 = (undefined1 (*) [32])local_120[1].data;
              uVar68 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar141 = *pauVar56;
                  uVar47 = uVar48;
                  do {
                    auVar179 = vsubps_avx(auVar141,*pauVar58);
                    *pauVar51 = auVar179;
                    pauVar58 = pauVar58 + 1;
                    pauVar51 = pauVar51 + 1;
                    uVar67 = (int)uVar47 - 1;
                    uVar47 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                pauVar56 = pauVar56 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            uVar4 = *local_110->data;
            auVar174._4_4_ = uVar4;
            auVar174._0_4_ = uVar4;
            auVar174._8_4_ = uVar4;
            auVar174._12_4_ = uVar4;
            auVar174._16_4_ = uVar4;
            auVar174._20_4_ = uVar4;
            auVar174._24_4_ = uVar4;
            auVar174._28_4_ = uVar4;
            pvVar45 = local_120->data;
            lVar63 = 0;
            do {
              auVar141 = vsubps_avx(auVar174,*(undefined1 (*) [32])((long)pvVar45 + lVar63));
              *(undefined1 (*) [32])((long)*pauVar51 + lVar63) = auVar141;
              lVar63 = lVar63 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar64 = (ulong)uVar7;
      local_f8 = sVar10;
      if (pMVar8[1].dims != 3) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims == 1) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar7) {
              uVar47 = 0;
              do {
                if (0 < (int)local_118) {
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  auVar141 = *(undefined1 (*) [32])((long)local_110->data + uVar47 * 0x20);
                  pvVar45 = pMVar9->data;
                  sVar12 = local_120->cstep;
                  sVar13 = local_120->elemsize;
                  pvVar60 = local_120->data;
                  lVar63 = 0;
                  iVar44 = (int)local_118;
                  do {
                    auVar179 = vsubps_avx(auVar141,*(undefined1 (*) [32])
                                                    ((long)pvVar60 +
                                                    lVar63 + sVar12 * sVar13 * uVar47));
                    *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                         auVar179;
                    lVar63 = lVar63 + 0x20;
                    iVar44 = iVar44 + -1;
                  } while (iVar44 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar64);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar7) {
            uVar4 = *local_110->data;
            auVar176._4_4_ = uVar4;
            auVar176._0_4_ = uVar4;
            auVar176._8_4_ = uVar4;
            auVar176._12_4_ = uVar4;
            auVar176._16_4_ = uVar4;
            auVar176._20_4_ = uVar4;
            auVar176._24_4_ = uVar4;
            auVar176._28_4_ = uVar4;
            uVar47 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar45 = pMVar9->data;
                sVar12 = local_120->cstep;
                sVar13 = local_120->elemsize;
                pvVar60 = local_120->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  auVar141 = vsubps_avx(auVar176,*(undefined1 (*) [32])
                                                  ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                       auVar141;
                  lVar63 = lVar63 + 0x20;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        if (local_120[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar7) {
          uVar47 = 0;
          do {
            if (0 < (int)uVar6) {
              pauVar51 = (undefined1 (*) [32])
                         (pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar58 = (undefined1 (*) [32])
                         ((long)local_120[1].w * uVar47 * local_120[1].elemsize +
                         (long)local_120[1].data);
              pauVar56 = (undefined1 (*) [32])
                         (local_120->cstep * uVar47 * local_120->elemsize + (long)local_120->data);
              uVar68 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar141 = *pauVar58;
                  uVar49 = uVar48;
                  do {
                    auVar179 = vsubps_avx(auVar141,*pauVar56);
                    *pauVar51 = auVar179;
                    pauVar56 = pauVar56 + 1;
                    pauVar51 = pauVar51 + 1;
                    uVar67 = (int)uVar49 - 1;
                    uVar49 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                pauVar58 = pauVar58 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != uVar64);
          return 0;
        }
        return 0;
      }
      if (uVar66 == uVar7 && (uVar67 == 1 && (uVar68 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                auVar141 = *(undefined1 (*) [32])
                            ((long)pMVar8[1].data + pMVar8[1].cstep * uVar47 * pMVar8[1].elemsize);
                pvVar45 = pMVar8->data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar60 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  auVar179 = vsubps_avx(auVar141,*(undefined1 (*) [32])
                                                  ((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47) =
                       auVar179;
                  lVar63 = lVar63 + 0x20;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar64;
      if ((uVar68 == uVar69) && (iVar46 == 1 && (uVar66 == 1 && uVar67 == uVar6))) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8->data;
                pvVar60 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar60 + lVar63);
                  auVar146._4_4_ = uVar4;
                  auVar146._0_4_ = uVar4;
                  auVar146._8_4_ = uVar4;
                  auVar146._12_4_ = uVar4;
                  auVar146._16_4_ = uVar4;
                  auVar146._20_4_ = uVar4;
                  auVar146._24_4_ = uVar4;
                  auVar146._28_4_ = uVar4;
                  auVar141 = vsubps_avx(auVar146,*(undefined1 (*) [32])
                                                  ((long)pvVar45 +
                                                  lVar63 * 8 + sVar10 * sVar11 * uVar47));
                  *(undefined1 (*) [32])((long)pvVar65 + lVar63 * 8 + sVar12 * sVar13 * uVar47) =
                       auVar141;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar69 ^ 1) == 0) && uVar7 == uVar66) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                auVar141 = *(undefined1 (*) [32])
                            ((long)pMVar8->data + pMVar8->cstep * uVar48 * pMVar8->elemsize);
                pvVar45 = pMVar8[1].data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar60 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  auVar179 = vsubps_avx(*(undefined1 (*) [32])
                                         ((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48),
                                        auVar141);
                  *(undefined1 (*) [32])((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48) =
                       auVar179;
                  lVar63 = lVar63 + 0x20;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar68 == uVar69) && (iVar44 == 1)) && ((uVar67 == uVar6 && (uVar7 == 1)))) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8[1].data;
                pvVar60 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar60 + lVar63);
                  auVar167._4_4_ = uVar4;
                  auVar167._0_4_ = uVar4;
                  auVar167._8_4_ = uVar4;
                  auVar167._12_4_ = uVar4;
                  auVar167._16_4_ = uVar4;
                  auVar167._20_4_ = uVar4;
                  auVar167._24_4_ = uVar4;
                  auVar167._28_4_ = uVar4;
                  auVar141 = vsubps_avx(*(undefined1 (*) [32])
                                         ((long)pvVar45 + lVar63 * 8 + sVar10 * sVar11 * uVar48),
                                        auVar167);
                  *(undefined1 (*) [32])((long)pvVar65 + lVar63 * 8 + sVar12 * sVar13 * uVar48) =
                       auVar141;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_130 = (void *)uVar47;
      if ((((uVar68 ^ 1) == 0 && uVar67 == uVar6) && uVar7 == uVar66) && uVar69 != 1) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar49 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar45 = local_120[1].data;
                pauVar51 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar49 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar58 = (undefined1 (*) [32])
                           (local_120->cstep * uVar49 * local_120->elemsize + (long)local_120->data)
                ;
                uVar64 = 0;
                do {
                  if (0 < (int)uVar69) {
                    auVar141 = *(undefined1 (*) [32])
                                ((long)pvVar45 + uVar64 * 0x20 + sVar10 * uVar49 * sVar11);
                    uVar70 = uVar48;
                    do {
                      auVar179 = vsubps_avx(auVar141,*pauVar58);
                      *pauVar51 = auVar179;
                      pauVar58 = pauVar58 + 1;
                      pauVar51 = pauVar51 + 1;
                      uVar68 = (int)uVar70 - 1;
                      uVar70 = (ulong)uVar68;
                    } while (uVar68 != 0);
                  }
                  uVar64 = uVar64 + 1;
                } while (uVar64 != uVar6);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar67 == 1 && (uVar68 ^ uVar69) == 0) && uVar66 == uVar7) && uVar6 != 1) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar49 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar60 = (void *)(pMVar9->cstep * uVar49 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar65 = (void *)(local_120->cstep * uVar49 * local_120->elemsize +
                                  (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar45 = local_120[1].data;
                uVar68 = 0;
                do {
                  if (0 < (int)uVar69) {
                    lVar63 = 0;
                    do {
                      auVar141 = vsubps_avx(*(undefined1 (*) [32])
                                             ((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar49),
                                            *(undefined1 (*) [32])((long)pvVar65 + lVar63));
                      *(undefined1 (*) [32])((long)pvVar60 + lVar63) = auVar141;
                      lVar63 = lVar63 + 0x20;
                    } while (uVar48 << 5 != lVar63);
                    pvVar60 = (void *)((long)pvVar60 + lVar63);
                    pvVar65 = (void *)((long)pvVar65 + lVar63);
                  }
                  uVar68 = uVar68 + 1;
                } while (uVar68 != uVar6);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar69 ^ 1) == 0 && uVar6 == uVar67) && uVar66 == uVar7) && uVar68 != 1) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)uVar67) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar45 = local_120->data;
                pauVar51 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar58 = (undefined1 (*) [32])
                           (local_120[1].cstep * uVar48 * local_120[1].elemsize +
                           (long)local_120[1].data);
                uVar49 = 0;
                do {
                  if (0 < (int)uVar68) {
                    auVar141 = *(undefined1 (*) [32])
                                ((long)pvVar45 + uVar49 * 0x20 + sVar10 * uVar48 * sVar11);
                    uVar69 = uVar68;
                    do {
                      auVar179 = vsubps_avx(*pauVar58,auVar141);
                      *pauVar51 = auVar179;
                      pauVar58 = pauVar58 + 1;
                      pauVar51 = pauVar51 + 1;
                      uVar69 = uVar69 - 1;
                    } while (uVar69 != 0);
                  }
                  uVar49 = uVar49 + 1;
                } while (uVar49 != uVar67);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar68 ^ uVar69) == 0 && uVar6 == 1) && uVar7 == uVar66) && uVar67 != 1) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f0,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_130) {
            local_128 = (void *)(uVar49 << 5);
            iVar44 = 0;
            do {
              Mat::channel((Mat *)local_e0,local_120,iVar44);
              auVar43 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar44);
              auVar54 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar44);
              auVar74 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar67) {
                uVar69 = 0;
                do {
                  if (0 < (int)uVar68) {
                    lVar63 = 0;
                    do {
                      auVar141 = vsubps_avx(*(undefined1 (*) [32])((long)auVar54 + lVar63),
                                            *(undefined1 (*) [32])((long)auVar43 + lVar63));
                      *(undefined1 (*) [32])((long)auVar74 + lVar63) = auVar141;
                      lVar63 = lVar63 + 0x20;
                    } while (local_128 != (void *)lVar63);
                    auVar74 = (undefined1  [8])((long)auVar74 + lVar63);
                    auVar54 = (undefined1  [8])((long)auVar54 + lVar63);
                  }
                  uVar69 = uVar69 + 1;
                } while (uVar69 != uVar67);
              }
              iVar44 = iVar44 + 1;
            } while (iVar44 != (int)local_130);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_100) {
          iVar44 = 0;
          do {
            pMVar9 = local_108;
            Mat::channel((Mat *)local_e0,local_120,iVar44);
            auVar43 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar44);
            auVar54 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar44);
            auVar74 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_118) {
              lVar63 = 0;
              iVar46 = (int)local_118;
              do {
                auVar141 = vsubps_avx(*(undefined1 (*) [32])((long)auVar54 + lVar63),
                                      *(undefined1 (*) [32])((long)auVar43 + lVar63));
                *(undefined1 (*) [32])((long)auVar74 + lVar63) = auVar141;
                lVar63 = lVar63 + 0x20;
                iVar46 = iVar46 + -1;
              } while (iVar46 != 0);
            }
            iVar44 = iVar44 + 1;
          } while (iVar44 != (int)local_100);
          return 0;
        }
        return 0;
      }
      return -100;
    case 8:
      uVar69 = pMVar8->w;
      uVar48 = (ulong)uVar69;
      sVar10 = pMVar8->elemsize;
      uVar68 = pMVar8[1].w;
      uVar49 = (ulong)uVar68;
      uVar67 = pMVar8[1].h;
      uVar66 = pMVar8[1].c;
      uVar47 = (ulong)uVar66;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar67 * uVar68);
      sVar11 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar44 == 1 && uVar69 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar68,sVar11,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar68) {
                fVar205 = 1.0 / *pMVar8->data;
                pvVar60 = pMVar1->data;
                lVar63 = 0;
                do {
                  pfVar61 = (float *)((long)pvVar60 + lVar63);
                  auVar261._0_4_ = fVar205 * *pfVar61;
                  auVar261._4_4_ = fVar205 * pfVar61[1];
                  auVar261._8_4_ = fVar205 * pfVar61[2];
                  auVar261._12_4_ = fVar205 * pfVar61[3];
                  auVar261._16_4_ = fVar205 * pfVar61[4];
                  auVar261._20_4_ = fVar205 * pfVar61[5];
                  auVar261._28_36_ = in_ZMM1._28_36_;
                  auVar261._24_4_ = fVar205 * pfVar61[6];
                  in_ZMM1 = ZEXT3264(auVar261._0_32_);
                  *(undefined1 (*) [32])((long)pvVar45 + lVar63) = auVar261._0_32_;
                  lVar63 = lVar63 + 0x20;
                  uVar69 = (int)uVar49 - 1;
                  uVar49 = (ulong)uVar69;
                } while (uVar69 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar68,uVar67,sVar11,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)local_130) {
                fVar205 = 1.0 / *pMVar8->data;
                pvVar60 = pMVar1->data;
                lVar63 = 0;
                do {
                  pfVar61 = (float *)((long)pvVar60 + lVar63);
                  auVar260._0_4_ = fVar205 * *pfVar61;
                  auVar260._4_4_ = fVar205 * pfVar61[1];
                  auVar260._8_4_ = fVar205 * pfVar61[2];
                  auVar260._12_4_ = fVar205 * pfVar61[3];
                  auVar260._16_4_ = fVar205 * pfVar61[4];
                  auVar260._20_4_ = fVar205 * pfVar61[5];
                  auVar260._28_36_ = in_ZMM1._28_36_;
                  auVar260._24_4_ = fVar205 * pfVar61[6];
                  in_ZMM1 = ZEXT3264(auVar260._0_32_);
                  *(undefined1 (*) [32])((long)pvVar45 + lVar63) = auVar260._0_32_;
                  lVar63 = lVar63 + 0x20;
                  local_130._0_4_ = (int)local_130 + -1;
                } while ((int)local_130 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar68,uVar67,uVar66,sVar11,iVar46,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar66) {
                fVar205 = 1.0 / *pMVar8->data;
                uVar48 = 0;
                do {
                  if (0 < (int)local_130) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar45 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar60 = pMVar8[1].data;
                    lVar63 = 0;
                    iVar44 = (int)local_130;
                    do {
                      pfVar61 = (float *)((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48);
                      auVar251._0_4_ = fVar205 * *pfVar61;
                      auVar251._4_4_ = fVar205 * pfVar61[1];
                      auVar251._8_4_ = fVar205 * pfVar61[2];
                      auVar251._12_4_ = fVar205 * pfVar61[3];
                      auVar251._16_4_ = fVar205 * pfVar61[4];
                      auVar251._20_4_ = fVar205 * pfVar61[5];
                      auVar251._28_36_ = in_ZMM1._28_36_;
                      auVar251._24_4_ = fVar205 * pfVar61[6];
                      in_ZMM1 = ZEXT3264(auVar251._0_32_);
                      *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) =
                           auVar251._0_32_;
                      lVar63 = lVar63 + 0x20;
                      iVar44 = iVar44 + -1;
                    } while (iVar44 != 0);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar47);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar69,sVar10,iVar44,opt->blob_allocator);
          pvVar45 = pMVar9->data;
          if (pvVar45 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar46 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar69) {
              pvVar60 = pMVar8->data;
              pvVar65 = pMVar8[1].data;
              lVar63 = 0;
              do {
                auVar141 = *(undefined1 (*) [32])((long)pvVar60 + lVar63);
                auVar301 = vrcpps_avx(auVar141);
                auVar179 = *(undefined1 (*) [32])((long)pvVar65 + lVar63);
                auVar323._0_4_ = auVar179._0_4_ * auVar301._0_4_;
                auVar323._4_4_ = auVar179._4_4_ * auVar301._4_4_;
                auVar323._8_4_ = auVar179._8_4_ * auVar301._8_4_;
                auVar323._12_4_ = auVar179._12_4_ * auVar301._12_4_;
                auVar323._16_4_ = auVar179._16_4_ * auVar301._16_4_;
                auVar323._20_4_ = auVar179._20_4_ * auVar301._20_4_;
                auVar323._28_36_ = in_ZMM3._28_36_;
                auVar323._24_4_ = auVar179._24_4_ * auVar301._24_4_;
                auVar271 = auVar323._0_32_;
                in_ZMM3 = ZEXT3264(auVar271);
                auVar82 = vfmsub213ps_fma(auVar141,auVar271,auVar179);
                auVar82 = vfnmadd213ps_fma(ZEXT1632(auVar82),auVar301,auVar271);
                *(undefined1 (*) [32])((long)pvVar45 + lVar63) = ZEXT1632(auVar82);
                lVar63 = lVar63 + 0x20;
                uVar69 = (int)uVar48 - 1;
                uVar48 = (ulong)uVar69;
              } while (uVar69 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar69) {
            fVar205 = *local_110->data;
            auVar155._4_4_ = fVar205;
            auVar155._0_4_ = fVar205;
            auVar155._8_4_ = fVar205;
            auVar155._12_4_ = fVar205;
            auVar155._16_4_ = fVar205;
            auVar155._20_4_ = fVar205;
            auVar155._24_4_ = fVar205;
            auVar155._28_4_ = fVar205;
            pvVar60 = pMVar8->data;
            lVar63 = 0;
            do {
              auVar141 = *(undefined1 (*) [32])((long)pvVar60 + lVar63);
              auVar179 = vrcpps_avx(auVar141);
              auVar312._0_4_ = fVar205 * auVar179._0_4_;
              auVar312._4_4_ = fVar205 * auVar179._4_4_;
              auVar312._8_4_ = fVar205 * auVar179._8_4_;
              auVar312._12_4_ = fVar205 * auVar179._12_4_;
              auVar312._16_4_ = fVar205 * auVar179._16_4_;
              auVar312._20_4_ = fVar205 * auVar179._20_4_;
              auVar312._28_36_ = in_ZMM3._28_36_;
              auVar312._24_4_ = fVar205 * auVar179._24_4_;
              auVar301 = auVar312._0_32_;
              in_ZMM3 = ZEXT3264(auVar301);
              auVar82 = vfmsub213ps_fma(auVar141,auVar301,auVar155);
              auVar82 = vfnmadd213ps_fma(ZEXT1632(auVar82),auVar179,auVar301);
              *(undefined1 (*) [32])((long)pvVar45 + lVar63) = ZEXT1632(auVar82);
              lVar63 = lVar63 + 0x20;
              uVar69 = (int)uVar48 - 1;
              uVar48 = (ulong)uVar69;
            } while (uVar69 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar68,uVar67,sVar11,iVar46,opt->blob_allocator);
          pauVar51 = (undefined1 (*) [32])pMVar9->data;
          if (pauVar51 == (undefined1 (*) [32])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar67) {
              pauVar58 = (undefined1 (*) [32])pMVar8->data;
              pfVar61 = (float *)pMVar8[1].data;
              uVar69 = 0;
              auVar153._8_4_ = 0x3f800000;
              auVar153._0_8_ = 0x3f8000003f800000;
              auVar153._12_4_ = 0x3f800000;
              auVar153._16_4_ = 0x3f800000;
              auVar153._20_4_ = 0x3f800000;
              auVar153._24_4_ = 0x3f800000;
              auVar153._28_4_ = 0x3f800000;
              do {
                if (0 < (int)uVar68) {
                  auVar141 = vrcpps_avx(*pauVar58);
                  auVar82 = vfmsub213ps_fma(*pauVar58,auVar141,auVar153);
                  auVar82 = vfnmadd132ps_fma(ZEXT1632(auVar82),auVar141,auVar141);
                  uVar66 = uVar68;
                  do {
                    auVar25._4_4_ = auVar82._4_4_ * pfVar61[1];
                    auVar25._0_4_ = auVar82._0_4_ * *pfVar61;
                    auVar25._8_4_ = auVar82._8_4_ * pfVar61[2];
                    auVar25._12_4_ = auVar82._12_4_ * pfVar61[3];
                    auVar25._16_4_ = pfVar61[4] * 0.0;
                    auVar25._20_4_ = pfVar61[5] * 0.0;
                    auVar25._24_4_ = pfVar61[6] * 0.0;
                    auVar25._28_4_ = auVar141._28_4_;
                    *pauVar51 = auVar25;
                    pfVar61 = pfVar61 + 8;
                    pauVar51 = pauVar51 + 1;
                    uVar66 = uVar66 - 1;
                    auVar141 = auVar25;
                  } while (uVar66 != 0);
                }
                pauVar58 = pauVar58 + 1;
                uVar69 = uVar69 + 1;
              } while (uVar69 != uVar67);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar68,uVar67,uVar66,sVar11,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar66) {
          uVar48 = 0;
          auVar143._8_4_ = 0x3f800000;
          auVar143._0_8_ = 0x3f8000003f800000;
          auVar143._12_4_ = 0x3f800000;
          auVar143._16_4_ = 0x3f800000;
          auVar143._20_4_ = 0x3f800000;
          auVar143._24_4_ = 0x3f800000;
          auVar143._28_4_ = 0x3f800000;
          do {
            if (0 < (int)local_130) {
              auVar141 = *(undefined1 (*) [32])((long)pMVar8->data + uVar48 * 0x20);
              auVar179 = vrcpps_avx(auVar141);
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar8[1].cstep;
              sVar12 = pMVar9->elemsize;
              auVar82 = vfmsub213ps_fma(auVar141,auVar179,auVar143);
              pvVar45 = pMVar9->data;
              auVar82 = vfnmadd132ps_fma(ZEXT1632(auVar82),auVar179,auVar179);
              sVar13 = pMVar8[1].elemsize;
              pvVar60 = pMVar8[1].data;
              lVar63 = 0;
              iVar44 = (int)local_130;
              do {
                pfVar61 = (float *)((long)pvVar60 + lVar63 + sVar11 * sVar13 * uVar48);
                auVar22._4_4_ = auVar82._4_4_ * pfVar61[1];
                auVar22._0_4_ = auVar82._0_4_ * *pfVar61;
                auVar22._8_4_ = auVar82._8_4_ * pfVar61[2];
                auVar22._12_4_ = auVar82._12_4_ * pfVar61[3];
                auVar22._16_4_ = pfVar61[4] * 0.0;
                auVar22._20_4_ = pfVar61[5] * 0.0;
                auVar22._24_4_ = pfVar61[6] * 0.0;
                auVar22._28_4_ = auVar179._28_4_;
                *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar12 * uVar48) = auVar22;
                lVar63 = lVar63 + 0x20;
                iVar44 = iVar44 + -1;
                auVar179 = auVar22;
              } while (iVar44 != 0);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar47);
          return 0;
        }
        return 0;
      }
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar46);
      uVar6 = pMVar8->h;
      local_118 = CONCAT44(local_118._4_4_,uVar6 * uVar69);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar68,uVar67,uVar66,sVar11,iVar46,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar66) {
              uVar48 = 0;
              auVar141._8_4_ = 0x3f800000;
              auVar141._0_8_ = 0x3f8000003f800000;
              auVar141._12_4_ = 0x3f800000;
              auVar141._16_4_ = 0x3f800000;
              auVar141._20_4_ = 0x3f800000;
              auVar141._24_4_ = 0x3f800000;
              auVar141._28_4_ = 0x3f800000;
              do {
                if (0 < (int)uVar67) {
                  pauVar51 = (undefined1 (*) [32])
                             (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                  pfVar61 = (float *)(local_120[1].cstep * uVar48 * local_120[1].elemsize +
                                     (long)local_120[1].data);
                  pauVar58 = (undefined1 (*) [32])
                             ((long)local_120->w * uVar48 * local_120->elemsize +
                             (long)local_120->data);
                  uVar69 = 0;
                  do {
                    if (0 < (int)uVar68) {
                      auVar179 = vrcpps_avx(*pauVar58);
                      auVar82 = vfmsub213ps_fma(*pauVar58,auVar179,auVar141);
                      auVar82 = vfnmadd132ps_fma(ZEXT1632(auVar82),auVar179,auVar179);
                      uVar66 = uVar68;
                      do {
                        auVar301._4_4_ = auVar82._4_4_ * pfVar61[1];
                        auVar301._0_4_ = auVar82._0_4_ * *pfVar61;
                        auVar301._8_4_ = auVar82._8_4_ * pfVar61[2];
                        auVar301._12_4_ = auVar82._12_4_ * pfVar61[3];
                        auVar301._16_4_ = pfVar61[4] * 0.0;
                        auVar301._20_4_ = pfVar61[5] * 0.0;
                        auVar301._24_4_ = pfVar61[6] * 0.0;
                        auVar301._28_4_ = auVar179._28_4_;
                        *pauVar51 = auVar301;
                        pfVar61 = pfVar61 + 8;
                        pauVar51 = pauVar51 + 1;
                        uVar66 = uVar66 - 1;
                        auVar179 = auVar301;
                      } while (uVar66 != 0);
                    }
                    pauVar58 = pauVar58 + 1;
                    uVar69 = uVar69 + 1;
                  } while (uVar69 != uVar67);
                }
                uVar48 = uVar48 + 1;
              } while (uVar48 != uVar47);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pvVar45 = pMVar9->data;
        if (pvVar45 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_118) {
            pvVar60 = local_120->data;
            pvVar65 = local_120[1].data;
            lVar63 = 0;
            do {
              auVar141 = *(undefined1 (*) [32])((long)pvVar60 + lVar63);
              auVar301 = vrcpps_avx(auVar141);
              auVar179 = *(undefined1 (*) [32])((long)pvVar65 + lVar63);
              auVar307._0_4_ = auVar179._0_4_ * auVar301._0_4_;
              auVar307._4_4_ = auVar179._4_4_ * auVar301._4_4_;
              auVar307._8_4_ = auVar179._8_4_ * auVar301._8_4_;
              auVar307._12_4_ = auVar179._12_4_ * auVar301._12_4_;
              auVar307._16_4_ = auVar179._16_4_ * auVar301._16_4_;
              auVar307._20_4_ = auVar179._20_4_ * auVar301._20_4_;
              auVar307._28_36_ = in_ZMM3._28_36_;
              auVar307._24_4_ = auVar179._24_4_ * auVar301._24_4_;
              auVar271 = auVar307._0_32_;
              in_ZMM3 = ZEXT3264(auVar271);
              auVar82 = vfmsub213ps_fma(auVar141,auVar271,auVar179);
              auVar82 = vfnmadd213ps_fma(ZEXT1632(auVar82),auVar301,auVar271);
              *(undefined1 (*) [32])((long)pvVar45 + lVar63) = ZEXT1632(auVar82);
              lVar63 = lVar63 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pauVar51 = (undefined1 (*) [32])pMVar9->data;
        if (pauVar51 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pauVar58 = (undefined1 (*) [32])local_120->data;
              pauVar56 = (undefined1 (*) [32])local_120[1].data;
              uVar68 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar141 = *pauVar56;
                  uVar47 = uVar48;
                  do {
                    auVar179 = vrcpps_avx(*pauVar58);
                    auVar325._0_4_ = auVar141._0_4_ * auVar179._0_4_;
                    auVar325._4_4_ = auVar141._4_4_ * auVar179._4_4_;
                    auVar325._8_4_ = auVar141._8_4_ * auVar179._8_4_;
                    auVar325._12_4_ = auVar141._12_4_ * auVar179._12_4_;
                    auVar325._16_4_ = auVar141._16_4_ * auVar179._16_4_;
                    auVar325._20_4_ = auVar141._20_4_ * auVar179._20_4_;
                    auVar325._28_36_ = in_ZMM3._28_36_;
                    auVar325._24_4_ = auVar141._24_4_ * auVar179._24_4_;
                    auVar301 = auVar325._0_32_;
                    in_ZMM3 = ZEXT3264(auVar301);
                    auVar82 = vfmsub213ps_fma(*pauVar58,auVar301,auVar141);
                    auVar82 = vfnmadd213ps_fma(ZEXT1632(auVar82),auVar179,auVar301);
                    *pauVar51 = ZEXT1632(auVar82);
                    pauVar58 = pauVar58 + 1;
                    pauVar51 = pauVar51 + 1;
                    uVar67 = (int)uVar47 - 1;
                    uVar47 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                pauVar56 = pauVar56 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            fVar205 = *local_110->data;
            auVar179._4_4_ = fVar205;
            auVar179._0_4_ = fVar205;
            auVar179._8_4_ = fVar205;
            auVar179._12_4_ = fVar205;
            auVar179._16_4_ = fVar205;
            auVar179._20_4_ = fVar205;
            auVar179._24_4_ = fVar205;
            auVar179._28_4_ = fVar205;
            pvVar45 = local_120->data;
            lVar63 = 0;
            do {
              auVar141 = *(undefined1 (*) [32])((long)pvVar45 + lVar63);
              auVar301 = vrcpps_avx(auVar141);
              auVar317._0_4_ = fVar205 * auVar301._0_4_;
              auVar317._4_4_ = fVar205 * auVar301._4_4_;
              auVar317._8_4_ = fVar205 * auVar301._8_4_;
              auVar317._12_4_ = fVar205 * auVar301._12_4_;
              auVar317._16_4_ = fVar205 * auVar301._16_4_;
              auVar317._20_4_ = fVar205 * auVar301._20_4_;
              auVar317._28_36_ = in_ZMM3._28_36_;
              auVar317._24_4_ = fVar205 * auVar301._24_4_;
              auVar271 = auVar317._0_32_;
              in_ZMM3 = ZEXT3264(auVar271);
              auVar82 = vfmsub213ps_fma(auVar141,auVar271,auVar179);
              auVar82 = vfnmadd213ps_fma(ZEXT1632(auVar82),auVar301,auVar271);
              *(undefined1 (*) [32])((long)*pauVar51 + lVar63) = ZEXT1632(auVar82);
              lVar63 = lVar63 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar64 = (ulong)uVar7;
      if (pMVar8[1].dims != 3) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims == 1) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar7) {
              uVar47 = 0;
              do {
                if (0 < (int)local_118) {
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  auVar141 = *(undefined1 (*) [32])((long)local_110->data + uVar47 * 0x20);
                  pvVar45 = pMVar9->data;
                  sVar12 = local_120->cstep;
                  sVar13 = local_120->elemsize;
                  pvVar60 = local_120->data;
                  lVar63 = 0;
                  iVar44 = (int)local_118;
                  do {
                    auVar179 = *(undefined1 (*) [32])
                                ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47);
                    auVar301 = vrcpps_avx(auVar179);
                    auVar321._0_4_ = auVar141._0_4_ * auVar301._0_4_;
                    auVar321._4_4_ = auVar141._4_4_ * auVar301._4_4_;
                    auVar321._8_4_ = auVar141._8_4_ * auVar301._8_4_;
                    auVar321._12_4_ = auVar141._12_4_ * auVar301._12_4_;
                    auVar321._16_4_ = auVar141._16_4_ * auVar301._16_4_;
                    auVar321._20_4_ = auVar141._20_4_ * auVar301._20_4_;
                    auVar321._28_36_ = in_ZMM3._28_36_;
                    auVar321._24_4_ = auVar141._24_4_ * auVar301._24_4_;
                    auVar271 = auVar321._0_32_;
                    in_ZMM3 = ZEXT3264(auVar271);
                    auVar82 = vfmsub213ps_fma(auVar179,auVar271,auVar141);
                    auVar82 = vfnmadd213ps_fma(ZEXT1632(auVar82),auVar301,auVar271);
                    *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                         ZEXT1632(auVar82);
                    lVar63 = lVar63 + 0x20;
                    iVar44 = iVar44 + -1;
                  } while (iVar44 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar64);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar7) {
            fVar205 = *local_110->data;
            auVar181._4_4_ = fVar205;
            auVar181._0_4_ = fVar205;
            auVar181._8_4_ = fVar205;
            auVar181._12_4_ = fVar205;
            auVar181._16_4_ = fVar205;
            auVar181._20_4_ = fVar205;
            auVar181._24_4_ = fVar205;
            auVar181._28_4_ = fVar205;
            uVar47 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar45 = pMVar9->data;
                sVar12 = local_120->cstep;
                sVar13 = local_120->elemsize;
                pvVar60 = local_120->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  auVar141 = *(undefined1 (*) [32])
                              ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47);
                  auVar179 = vrcpps_avx(auVar141);
                  auVar318._0_4_ = fVar205 * auVar179._0_4_;
                  auVar318._4_4_ = fVar205 * auVar179._4_4_;
                  auVar318._8_4_ = fVar205 * auVar179._8_4_;
                  auVar318._12_4_ = fVar205 * auVar179._12_4_;
                  auVar318._16_4_ = fVar205 * auVar179._16_4_;
                  auVar318._20_4_ = fVar205 * auVar179._20_4_;
                  auVar318._28_36_ = in_ZMM3._28_36_;
                  auVar318._24_4_ = fVar205 * auVar179._24_4_;
                  auVar301 = auVar318._0_32_;
                  in_ZMM3 = ZEXT3264(auVar301);
                  auVar82 = vfmsub213ps_fma(auVar141,auVar301,auVar181);
                  auVar82 = vfnmadd213ps_fma(ZEXT1632(auVar82),auVar179,auVar301);
                  *(undefined1 (*) [32])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                       ZEXT1632(auVar82);
                  lVar63 = lVar63 + 0x20;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        if (local_120[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar7) {
          uVar47 = 0;
          do {
            if (0 < (int)uVar6) {
              pauVar51 = (undefined1 (*) [32])
                         (pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar58 = (undefined1 (*) [32])
                         ((long)local_120[1].w * uVar47 * local_120[1].elemsize +
                         (long)local_120[1].data);
              pauVar56 = (undefined1 (*) [32])
                         (local_120->cstep * uVar47 * local_120->elemsize + (long)local_120->data);
              uVar68 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar141 = *pauVar58;
                  uVar49 = uVar48;
                  do {
                    auVar179 = vrcpps_avx(*pauVar56);
                    auVar308._0_4_ = auVar141._0_4_ * auVar179._0_4_;
                    auVar308._4_4_ = auVar141._4_4_ * auVar179._4_4_;
                    auVar308._8_4_ = auVar141._8_4_ * auVar179._8_4_;
                    auVar308._12_4_ = auVar141._12_4_ * auVar179._12_4_;
                    auVar308._16_4_ = auVar141._16_4_ * auVar179._16_4_;
                    auVar308._20_4_ = auVar141._20_4_ * auVar179._20_4_;
                    auVar308._28_36_ = in_ZMM3._28_36_;
                    auVar308._24_4_ = auVar141._24_4_ * auVar179._24_4_;
                    auVar301 = auVar308._0_32_;
                    in_ZMM3 = ZEXT3264(auVar301);
                    auVar82 = vfmsub213ps_fma(*pauVar56,auVar301,auVar141);
                    auVar82 = vfnmadd213ps_fma(ZEXT1632(auVar82),auVar179,auVar301);
                    *pauVar51 = ZEXT1632(auVar82);
                    pauVar56 = pauVar56 + 1;
                    pauVar51 = pauVar51 + 1;
                    uVar67 = (int)uVar49 - 1;
                    uVar49 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                pauVar58 = pauVar58 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != uVar64);
          return 0;
        }
        return 0;
      }
      local_f8 = sVar10;
      if (uVar66 == uVar7 && (uVar67 == 1 && (uVar68 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                auVar141 = *(undefined1 (*) [32])
                            ((long)pMVar8[1].data + pMVar8[1].cstep * uVar47 * pMVar8[1].elemsize);
                pvVar45 = pMVar8->data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar60 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  auVar179 = *(undefined1 (*) [32])
                              ((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47);
                  auVar301 = vrcpps_avx(auVar179);
                  auVar302._0_4_ = auVar141._0_4_ * auVar301._0_4_;
                  auVar302._4_4_ = auVar141._4_4_ * auVar301._4_4_;
                  auVar302._8_4_ = auVar141._8_4_ * auVar301._8_4_;
                  auVar302._12_4_ = auVar141._12_4_ * auVar301._12_4_;
                  auVar302._16_4_ = auVar141._16_4_ * auVar301._16_4_;
                  auVar302._20_4_ = auVar141._20_4_ * auVar301._20_4_;
                  auVar302._28_36_ = in_ZMM3._28_36_;
                  auVar302._24_4_ = auVar141._24_4_ * auVar301._24_4_;
                  auVar271 = auVar302._0_32_;
                  in_ZMM3 = ZEXT3264(auVar271);
                  auVar82 = vfmsub213ps_fma(auVar179,auVar271,auVar141);
                  auVar82 = vfnmadd213ps_fma(ZEXT1632(auVar82),auVar301,auVar271);
                  *(undefined1 (*) [32])((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47) =
                       ZEXT1632(auVar82);
                  lVar63 = lVar63 + 0x20;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar64;
      if ((uVar68 == uVar69) && (iVar46 == 1 && (uVar66 == 1 && uVar67 == uVar6))) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8->data;
                pvVar60 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  auVar141 = *(undefined1 (*) [32])
                              ((long)pvVar45 + lVar63 * 8 + sVar10 * sVar11 * uVar47);
                  auVar179 = vrcpps_avx(auVar141);
                  fVar205 = *(float *)((long)pvVar60 + lVar63);
                  auVar271._4_4_ = fVar205;
                  auVar271._0_4_ = fVar205;
                  auVar271._8_4_ = fVar205;
                  auVar271._12_4_ = fVar205;
                  auVar271._16_4_ = fVar205;
                  auVar271._20_4_ = fVar205;
                  auVar271._24_4_ = fVar205;
                  auVar271._28_4_ = fVar205;
                  auVar309._0_4_ = fVar205 * auVar179._0_4_;
                  auVar309._4_4_ = fVar205 * auVar179._4_4_;
                  auVar309._8_4_ = fVar205 * auVar179._8_4_;
                  auVar309._12_4_ = fVar205 * auVar179._12_4_;
                  auVar309._16_4_ = fVar205 * auVar179._16_4_;
                  auVar309._20_4_ = fVar205 * auVar179._20_4_;
                  auVar309._28_36_ = in_ZMM3._28_36_;
                  auVar309._24_4_ = fVar205 * auVar179._24_4_;
                  auVar301 = auVar309._0_32_;
                  in_ZMM3 = ZEXT3264(auVar301);
                  auVar82 = vfmsub213ps_fma(auVar141,auVar301,auVar271);
                  auVar82 = vfnmadd213ps_fma(ZEXT1632(auVar82),auVar179,auVar301);
                  *(undefined1 (*) [32])((long)pvVar65 + lVar63 * 8 + sVar12 * sVar13 * uVar47) =
                       ZEXT1632(auVar82);
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar69 ^ 1) == 0) && uVar7 == uVar66) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,sVar11,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            auVar149._8_4_ = 0x3f800000;
            auVar149._0_8_ = 0x3f8000003f800000;
            auVar149._12_4_ = 0x3f800000;
            auVar149._16_4_ = 0x3f800000;
            auVar149._20_4_ = 0x3f800000;
            auVar149._24_4_ = 0x3f800000;
            auVar149._28_4_ = 0x3f800000;
            do {
              if (0 < (int)local_130) {
                auVar141 = *(undefined1 (*) [32])
                            ((long)pMVar8->data + pMVar8->cstep * uVar48 * pMVar8->elemsize);
                auVar179 = vrcpps_avx(auVar141);
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar8[1].cstep;
                sVar12 = pMVar8[1].elemsize;
                auVar82 = vfmsub213ps_fma(auVar141,auVar179,auVar149);
                pvVar45 = pMVar8[1].data;
                auVar82 = vfnmadd132ps_fma(ZEXT1632(auVar82),auVar179,auVar179);
                sVar13 = pMVar9->elemsize;
                pvVar60 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  pfVar61 = (float *)((long)pvVar45 + lVar63 + sVar11 * sVar12 * uVar48);
                  auVar24._4_4_ = auVar82._4_4_ * pfVar61[1];
                  auVar24._0_4_ = auVar82._0_4_ * *pfVar61;
                  auVar24._8_4_ = auVar82._8_4_ * pfVar61[2];
                  auVar24._12_4_ = auVar82._12_4_ * pfVar61[3];
                  auVar24._16_4_ = pfVar61[4] * 0.0;
                  auVar24._20_4_ = pfVar61[5] * 0.0;
                  auVar24._24_4_ = pfVar61[6] * 0.0;
                  auVar24._28_4_ = auVar179._28_4_;
                  *(undefined1 (*) [32])((long)pvVar60 + lVar63 + sVar10 * sVar13 * uVar48) =
                       auVar24;
                  lVar63 = lVar63 + 0x20;
                  iVar44 = iVar44 + -1;
                  auVar179 = auVar24;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar68 == uVar69) && (iVar44 == 1)) && (uVar67 == uVar6)) && (uVar7 == 1)) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,sVar11,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8[1].data;
                pvVar60 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  fVar205 = 1.0 / *(float *)((long)pvVar60 + lVar63);
                  pfVar61 = (float *)((long)pvVar45 + lVar63 * 8 + sVar10 * sVar11 * uVar48);
                  auVar17._4_4_ = fVar205 * pfVar61[1];
                  auVar17._0_4_ = fVar205 * *pfVar61;
                  auVar17._8_4_ = fVar205 * pfVar61[2];
                  auVar17._12_4_ = fVar205 * pfVar61[3];
                  auVar17._16_4_ = fVar205 * pfVar61[4];
                  auVar17._20_4_ = fVar205 * pfVar61[5];
                  auVar17._24_4_ = fVar205 * pfVar61[6];
                  auVar17._28_4_ = fVar205;
                  *(undefined1 (*) [32])((long)pvVar65 + lVar63 * 8 + sVar12 * sVar13 * uVar48) =
                       auVar17;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_130 = (void *)uVar47;
      if ((((uVar68 ^ 1) == 0 && uVar67 == uVar6) && uVar7 == uVar66) && uVar69 != 1) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar49 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar45 = local_120[1].data;
                pauVar51 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar49 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar58 = (undefined1 (*) [32])
                           (local_120->cstep * uVar49 * local_120->elemsize + (long)local_120->data)
                ;
                uVar64 = 0;
                do {
                  if (0 < (int)uVar69) {
                    auVar141 = *(undefined1 (*) [32])
                                ((long)pvVar45 + uVar64 * 0x20 + sVar10 * uVar49 * sVar11);
                    uVar70 = uVar48;
                    do {
                      auVar179 = vrcpps_avx(*pauVar58);
                      auVar316._0_4_ = auVar141._0_4_ * auVar179._0_4_;
                      auVar316._4_4_ = auVar141._4_4_ * auVar179._4_4_;
                      auVar316._8_4_ = auVar141._8_4_ * auVar179._8_4_;
                      auVar316._12_4_ = auVar141._12_4_ * auVar179._12_4_;
                      auVar316._16_4_ = auVar141._16_4_ * auVar179._16_4_;
                      auVar316._20_4_ = auVar141._20_4_ * auVar179._20_4_;
                      auVar316._28_36_ = in_ZMM3._28_36_;
                      auVar316._24_4_ = auVar141._24_4_ * auVar179._24_4_;
                      auVar301 = auVar316._0_32_;
                      in_ZMM3 = ZEXT3264(auVar301);
                      auVar82 = vfmsub213ps_fma(*pauVar58,auVar301,auVar141);
                      auVar82 = vfnmadd213ps_fma(ZEXT1632(auVar82),auVar179,auVar301);
                      *pauVar51 = ZEXT1632(auVar82);
                      pauVar58 = pauVar58 + 1;
                      pauVar51 = pauVar51 + 1;
                      uVar68 = (int)uVar70 - 1;
                      uVar70 = (ulong)uVar68;
                    } while (uVar68 != 0);
                  }
                  uVar64 = uVar64 + 1;
                } while (uVar64 != uVar6);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar67 == 1 && (uVar68 ^ uVar69) == 0) && uVar66 == uVar7) && uVar6 != 1) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar49 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar60 = (void *)(pMVar9->cstep * uVar49 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar65 = (void *)(local_120->cstep * uVar49 * local_120->elemsize +
                                  (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar45 = local_120[1].data;
                uVar68 = 0;
                do {
                  if (0 < (int)uVar69) {
                    lVar63 = 0;
                    do {
                      auVar179 = vrcpps_avx(*(undefined1 (*) [32])((long)pvVar65 + lVar63));
                      auVar141 = *(undefined1 (*) [32])
                                  ((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar49);
                      auVar320._0_4_ = auVar141._0_4_ * auVar179._0_4_;
                      auVar320._4_4_ = auVar141._4_4_ * auVar179._4_4_;
                      auVar320._8_4_ = auVar141._8_4_ * auVar179._8_4_;
                      auVar320._12_4_ = auVar141._12_4_ * auVar179._12_4_;
                      auVar320._16_4_ = auVar141._16_4_ * auVar179._16_4_;
                      auVar320._20_4_ = auVar141._20_4_ * auVar179._20_4_;
                      auVar320._28_36_ = in_ZMM3._28_36_;
                      auVar320._24_4_ = auVar141._24_4_ * auVar179._24_4_;
                      auVar301 = auVar320._0_32_;
                      in_ZMM3 = ZEXT3264(auVar301);
                      auVar82 = vfmsub213ps_fma(*(undefined1 (*) [32])((long)pvVar65 + lVar63),
                                                auVar301,auVar141);
                      auVar82 = vfnmadd213ps_fma(ZEXT1632(auVar82),auVar179,auVar301);
                      *(undefined1 (*) [32])((long)pvVar60 + lVar63) = ZEXT1632(auVar82);
                      lVar63 = lVar63 + 0x20;
                    } while (uVar48 << 5 != lVar63);
                    pvVar60 = (void *)((long)pvVar60 + lVar63);
                    pvVar65 = (void *)((long)pvVar65 + lVar63);
                  }
                  uVar68 = uVar68 + 1;
                } while (uVar68 != uVar6);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar69 ^ 1) == 0 && uVar6 == uVar67) && uVar66 == uVar7) && uVar68 != 1) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,sVar11,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            auVar184._8_4_ = 0x3f800000;
            auVar184._0_8_ = 0x3f8000003f800000;
            auVar184._12_4_ = 0x3f800000;
            auVar184._16_4_ = 0x3f800000;
            auVar184._20_4_ = 0x3f800000;
            auVar184._24_4_ = 0x3f800000;
            auVar184._28_4_ = 0x3f800000;
            do {
              if (0 < (int)uVar67) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar45 = local_120->data;
                pauVar51 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                pfVar61 = (float *)(local_120[1].cstep * uVar48 * local_120[1].elemsize +
                                   (long)local_120[1].data);
                uVar49 = 0;
                do {
                  if (0 < (int)uVar68) {
                    auVar141 = *(undefined1 (*) [32])
                                ((long)pvVar45 + uVar49 * 0x20 + sVar10 * uVar48 * sVar11);
                    auVar179 = vrcpps_avx(auVar141);
                    auVar82 = vfmsub213ps_fma(auVar141,auVar179,auVar184);
                    auVar82 = vfnmadd132ps_fma(ZEXT1632(auVar82),auVar179,auVar179);
                    uVar69 = uVar68;
                    do {
                      auVar28._4_4_ = auVar82._4_4_ * pfVar61[1];
                      auVar28._0_4_ = auVar82._0_4_ * *pfVar61;
                      auVar28._8_4_ = auVar82._8_4_ * pfVar61[2];
                      auVar28._12_4_ = auVar82._12_4_ * pfVar61[3];
                      auVar28._16_4_ = pfVar61[4] * 0.0;
                      auVar28._20_4_ = pfVar61[5] * 0.0;
                      auVar28._24_4_ = pfVar61[6] * 0.0;
                      auVar28._28_4_ = auVar179._28_4_;
                      *pauVar51 = auVar28;
                      pfVar61 = pfVar61 + 8;
                      pauVar51 = pauVar51 + 1;
                      uVar69 = uVar69 - 1;
                      auVar179 = auVar28;
                    } while (uVar69 != 0);
                  }
                  uVar49 = uVar49 + 1;
                } while (uVar49 != uVar67);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar68 ^ uVar69) == 0 && uVar6 == 1) && uVar7 == uVar66) && uVar67 != 1) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,sVar11,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_130) {
            local_128 = (void *)(uVar49 << 5);
            iVar44 = 0;
            do {
              in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
              Mat::channel((Mat *)local_e0,local_120,iVar44);
              auVar43 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar44);
              auVar54 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar44);
              auVar74 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar67) {
                uVar69 = 0;
                do {
                  if (0 < (int)uVar68) {
                    lVar63 = 0;
                    do {
                      auVar179 = vrcpps_avx(*(undefined1 (*) [32])((long)auVar43 + lVar63));
                      auVar141 = *(undefined1 (*) [32])((long)auVar54 + lVar63);
                      auVar327._0_4_ = auVar141._0_4_ * auVar179._0_4_;
                      auVar327._4_4_ = auVar141._4_4_ * auVar179._4_4_;
                      auVar327._8_4_ = auVar141._8_4_ * auVar179._8_4_;
                      auVar327._12_4_ = auVar141._12_4_ * auVar179._12_4_;
                      auVar327._16_4_ = auVar141._16_4_ * auVar179._16_4_;
                      auVar327._20_4_ = auVar141._20_4_ * auVar179._20_4_;
                      auVar327._28_36_ = in_ZMM3._28_36_;
                      auVar327._24_4_ = auVar141._24_4_ * auVar179._24_4_;
                      auVar301 = auVar327._0_32_;
                      in_ZMM3 = ZEXT3264(auVar301);
                      auVar82 = vfmsub213ps_fma(*(undefined1 (*) [32])((long)auVar43 + lVar63),
                                                auVar301,auVar141);
                      auVar82 = vfnmadd213ps_fma(ZEXT1632(auVar82),auVar179,auVar301);
                      *(undefined1 (*) [32])((long)auVar74 + lVar63) = ZEXT1632(auVar82);
                      lVar63 = lVar63 + 0x20;
                    } while (local_128 != (void *)lVar63);
                    auVar74 = (undefined1  [8])((long)auVar74 + lVar63);
                    auVar54 = (undefined1  [8])((long)auVar54 + lVar63);
                  }
                  uVar69 = uVar69 + 1;
                } while (uVar69 != uVar67);
              }
              iVar44 = iVar44 + 1;
            } while (iVar44 != (int)local_130);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_100) {
          iVar44 = 0;
          do {
            pMVar9 = local_108;
            in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
            Mat::channel((Mat *)local_e0,local_120,iVar44);
            auVar43 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar44);
            auVar54 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar44);
            auVar74 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_118) {
              lVar63 = 0;
              iVar46 = (int)local_118;
              do {
                auVar179 = vrcpps_avx(*(undefined1 (*) [32])((long)auVar43 + lVar63));
                auVar141 = *(undefined1 (*) [32])((long)auVar54 + lVar63);
                auVar329._0_4_ = auVar141._0_4_ * auVar179._0_4_;
                auVar329._4_4_ = auVar141._4_4_ * auVar179._4_4_;
                auVar329._8_4_ = auVar141._8_4_ * auVar179._8_4_;
                auVar329._12_4_ = auVar141._12_4_ * auVar179._12_4_;
                auVar329._16_4_ = auVar141._16_4_ * auVar179._16_4_;
                auVar329._20_4_ = auVar141._20_4_ * auVar179._20_4_;
                auVar329._28_36_ = in_ZMM3._28_36_;
                auVar329._24_4_ = auVar141._24_4_ * auVar179._24_4_;
                auVar301 = auVar329._0_32_;
                in_ZMM3 = ZEXT3264(auVar301);
                auVar82 = vfmsub213ps_fma(*(undefined1 (*) [32])((long)auVar43 + lVar63),auVar301,
                                          auVar141);
                auVar82 = vfnmadd213ps_fma(ZEXT1632(auVar82),auVar179,auVar301);
                *(undefined1 (*) [32])((long)auVar74 + lVar63) = ZEXT1632(auVar82);
                lVar63 = lVar63 + 0x20;
                iVar46 = iVar46 + -1;
              } while (iVar46 != 0);
            }
            iVar44 = iVar44 + 1;
          } while (iVar44 != (int)local_100);
          return 0;
        }
        return 0;
      }
      return -100;
    }
  }
  if (iVar46 == 4 || iVar44 == 4) {
    switch(*(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86_avx2[-3])) {
    case 0:
      uVar69 = pMVar8->w;
      uVar48 = (ulong)uVar69;
      sVar10 = pMVar8->elemsize;
      uVar68 = pMVar8[1].w;
      uVar49 = (ulong)uVar68;
      uVar67 = pMVar8[1].h;
      uVar66 = pMVar8[1].c;
      uVar47 = (ulong)uVar66;
      iVar53 = uVar67 * uVar68;
      local_f8 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar44 == 1 && uVar69 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar68,local_f8,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar68) {
                fVar205 = *pMVar8->data;
                pvVar60 = pMVar1->data;
                lVar63 = 0;
                do {
                  pfVar61 = (float *)((long)pvVar60 + lVar63);
                  fVar30 = pfVar61[1];
                  fVar31 = pfVar61[2];
                  fVar32 = pfVar61[3];
                  pfVar62 = (float *)((long)pvVar45 + lVar63);
                  *pfVar62 = fVar205 + *pfVar61;
                  pfVar62[1] = fVar205 + fVar30;
                  pfVar62[2] = fVar205 + fVar31;
                  pfVar62[3] = fVar205 + fVar32;
                  lVar63 = lVar63 + 0x10;
                  uVar69 = (int)uVar49 - 1;
                  uVar49 = (ulong)uVar69;
                } while (uVar69 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar68,uVar67,local_f8,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < iVar53) {
                fVar205 = *pMVar8->data;
                pvVar60 = local_110->data;
                lVar63 = 0;
                do {
                  pfVar61 = (float *)((long)pvVar60 + lVar63);
                  fVar30 = pfVar61[1];
                  fVar31 = pfVar61[2];
                  fVar32 = pfVar61[3];
                  pfVar62 = (float *)((long)pvVar45 + lVar63);
                  *pfVar62 = fVar205 + *pfVar61;
                  pfVar62[1] = fVar205 + fVar30;
                  pfVar62[2] = fVar205 + fVar31;
                  pfVar62[3] = fVar205 + fVar32;
                  lVar63 = lVar63 + 0x10;
                  iVar53 = iVar53 + -1;
                } while (iVar53 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar66) {
                fVar205 = *pMVar8->data;
                uVar48 = 0;
                do {
                  if (0 < iVar53) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar45 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar60 = pMVar8[1].data;
                    lVar63 = 0;
                    iVar44 = iVar53;
                    do {
                      pfVar61 = (float *)((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48);
                      auVar211._0_4_ = fVar205 + *pfVar61;
                      auVar211._4_4_ = fVar205 + pfVar61[1];
                      auVar211._8_4_ = fVar205 + pfVar61[2];
                      auVar211._12_4_ = fVar205 + pfVar61[3];
                      *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) =
                           auVar211;
                      lVar63 = lVar63 + 0x10;
                      iVar44 = iVar44 + -1;
                    } while (iVar44 != 0);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar47);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar69,sVar10,iVar44,opt->blob_allocator);
          pvVar45 = pMVar9->data;
          if (pvVar45 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar46 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar69) {
              pvVar60 = pMVar8->data;
              pvVar65 = pMVar8[1].data;
              lVar63 = 0;
              do {
                pfVar61 = (float *)((long)pvVar65 + lVar63);
                fVar205 = pfVar61[1];
                fVar30 = pfVar61[2];
                fVar31 = pfVar61[3];
                pfVar62 = (float *)((long)pvVar60 + lVar63);
                fVar32 = pfVar62[1];
                fVar33 = pfVar62[2];
                fVar34 = pfVar62[3];
                pfVar2 = (float *)((long)pvVar45 + lVar63);
                *pfVar2 = *pfVar61 + *pfVar62;
                pfVar2[1] = fVar205 + fVar32;
                pfVar2[2] = fVar30 + fVar33;
                pfVar2[3] = fVar31 + fVar34;
                lVar63 = lVar63 + 0x10;
                uVar69 = (int)uVar48 - 1;
                uVar48 = (ulong)uVar69;
              } while (uVar69 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar69) {
            fVar205 = *local_110->data;
            pvVar60 = pMVar8->data;
            lVar63 = 0;
            do {
              pfVar61 = (float *)((long)pvVar60 + lVar63);
              fVar30 = pfVar61[1];
              fVar31 = pfVar61[2];
              fVar32 = pfVar61[3];
              pfVar62 = (float *)((long)pvVar45 + lVar63);
              *pfVar62 = fVar205 + *pfVar61;
              pfVar62[1] = fVar205 + fVar30;
              pfVar62[2] = fVar205 + fVar31;
              pfVar62[3] = fVar205 + fVar32;
              lVar63 = lVar63 + 0x10;
              uVar69 = (int)uVar48 - 1;
              uVar48 = (ulong)uVar69;
            } while (uVar69 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar68,uVar67,local_f8,iVar46,opt->blob_allocator);
          pauVar52 = (undefined1 (*) [16])pMVar9->data;
          if (pauVar52 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar67) {
              pauVar59 = (undefined1 (*) [16])pMVar8->data;
              pfVar61 = (float *)pMVar8[1].data;
              uVar69 = 0;
              do {
                if (0 < (int)uVar68) {
                  auVar82 = *pauVar59;
                  uVar66 = uVar68;
                  do {
                    auVar222._0_4_ = auVar82._0_4_ + *pfVar61;
                    auVar222._4_4_ = auVar82._4_4_ + pfVar61[1];
                    auVar222._8_4_ = auVar82._8_4_ + pfVar61[2];
                    auVar222._12_4_ = auVar82._12_4_ + pfVar61[3];
                    *pauVar52 = auVar222;
                    pfVar61 = pfVar61 + 4;
                    pauVar52 = pauVar52 + 1;
                    uVar66 = uVar66 - 1;
                  } while (uVar66 != 0);
                }
                pauVar59 = pauVar59 + 1;
                uVar69 = uVar69 + 1;
              } while (uVar69 != uVar67);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar66) {
          uVar48 = 0;
          do {
            if (0 < iVar53) {
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar9->elemsize;
              auVar82 = *(undefined1 (*) [16])((long)pMVar8->data + uVar48 * 0x10);
              pvVar45 = pMVar9->data;
              sVar12 = pMVar8[1].cstep;
              sVar13 = pMVar8[1].elemsize;
              pvVar60 = pMVar8[1].data;
              lVar63 = 0;
              iVar44 = iVar53;
              do {
                pfVar61 = (float *)((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48);
                auVar214._0_4_ = auVar82._0_4_ + *pfVar61;
                auVar214._4_4_ = auVar82._4_4_ + pfVar61[1];
                auVar214._8_4_ = auVar82._8_4_ + pfVar61[2];
                auVar214._12_4_ = auVar82._12_4_ + pfVar61[3];
                *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) = auVar214
                ;
                lVar63 = lVar63 + 0x10;
                iVar44 = iVar44 + -1;
              } while (iVar44 != 0);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar47);
          return 0;
        }
        return 0;
      }
      local_118 = CONCAT44(local_118._4_4_,iVar53);
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar46);
      uVar6 = pMVar8->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar6 * uVar69);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar66) {
              uVar48 = 0;
              do {
                if (0 < (int)uVar67) {
                  pauVar52 = (undefined1 (*) [16])
                             (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                  pfVar61 = (float *)(local_120[1].cstep * uVar48 * local_120[1].elemsize +
                                     (long)local_120[1].data);
                  pauVar59 = (undefined1 (*) [16])
                             ((long)local_120->w * uVar48 * local_120->elemsize +
                             (long)local_120->data);
                  uVar69 = 0;
                  do {
                    if (0 < (int)uVar68) {
                      auVar82 = *pauVar59;
                      uVar66 = uVar68;
                      do {
                        auVar210._0_4_ = auVar82._0_4_ + *pfVar61;
                        auVar210._4_4_ = auVar82._4_4_ + pfVar61[1];
                        auVar210._8_4_ = auVar82._8_4_ + pfVar61[2];
                        auVar210._12_4_ = auVar82._12_4_ + pfVar61[3];
                        *pauVar52 = auVar210;
                        pfVar61 = pfVar61 + 4;
                        pauVar52 = pauVar52 + 1;
                        uVar66 = uVar66 - 1;
                      } while (uVar66 != 0);
                    }
                    pauVar59 = pauVar59 + 1;
                    uVar69 = uVar69 + 1;
                  } while (uVar69 != uVar67);
                }
                uVar48 = uVar48 + 1;
              } while (uVar48 != uVar47);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pvVar45 = pMVar9->data;
        if (pvVar45 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar60 = local_120->data;
            pvVar65 = local_120[1].data;
            lVar63 = 0;
            do {
              pfVar61 = (float *)((long)pvVar65 + lVar63);
              fVar205 = pfVar61[1];
              fVar30 = pfVar61[2];
              fVar31 = pfVar61[3];
              pfVar62 = (float *)((long)pvVar60 + lVar63);
              fVar32 = pfVar62[1];
              fVar33 = pfVar62[2];
              fVar34 = pfVar62[3];
              pfVar2 = (float *)((long)pvVar45 + lVar63);
              *pfVar2 = *pfVar61 + *pfVar62;
              pfVar2[1] = fVar205 + fVar32;
              pfVar2[2] = fVar30 + fVar33;
              pfVar2[3] = fVar31 + fVar34;
              lVar63 = lVar63 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pauVar52 = (undefined1 (*) [16])pMVar9->data;
        if (pauVar52 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pfVar61 = (float *)local_120->data;
              pauVar59 = (undefined1 (*) [16])local_120[1].data;
              uVar68 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar82 = *pauVar59;
                  uVar47 = uVar48;
                  do {
                    auVar234._0_4_ = auVar82._0_4_ + *pfVar61;
                    auVar234._4_4_ = auVar82._4_4_ + pfVar61[1];
                    auVar234._8_4_ = auVar82._8_4_ + pfVar61[2];
                    auVar234._12_4_ = auVar82._12_4_ + pfVar61[3];
                    *pauVar52 = auVar234;
                    pfVar61 = pfVar61 + 4;
                    pauVar52 = pauVar52 + 1;
                    uVar67 = (int)uVar47 - 1;
                    uVar47 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                pauVar59 = pauVar59 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            fVar205 = *local_110->data;
            pvVar45 = local_120->data;
            lVar63 = 0;
            do {
              pfVar61 = (float *)((long)pvVar45 + lVar63);
              fVar30 = pfVar61[1];
              fVar31 = pfVar61[2];
              fVar32 = pfVar61[3];
              pfVar62 = (float *)((long)*pauVar52 + lVar63);
              *pfVar62 = fVar205 + *pfVar61;
              pfVar62[1] = fVar205 + fVar30;
              pfVar62[2] = fVar205 + fVar31;
              pfVar62[3] = fVar205 + fVar32;
              lVar63 = lVar63 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar64 = (ulong)uVar7;
      if (pMVar8[1].dims != 3) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (pMVar8[1].dims == 1) {
          if ((int)local_128 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)local_118) {
              uVar47 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  auVar82 = *(undefined1 (*) [16])((long)local_110->data + uVar47 * 0x10);
                  pvVar45 = pMVar9->data;
                  sVar12 = pMVar8->cstep;
                  sVar13 = pMVar8->elemsize;
                  pvVar60 = pMVar8->data;
                  lVar63 = 0;
                  iVar44 = (int)local_130;
                  do {
                    pfVar61 = (float *)((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47);
                    auVar230._0_4_ = auVar82._0_4_ + *pfVar61;
                    auVar230._4_4_ = auVar82._4_4_ + pfVar61[1];
                    auVar230._8_4_ = auVar82._8_4_ + pfVar61[2];
                    auVar230._12_4_ = auVar82._12_4_ + pfVar61[3];
                    *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                         auVar230;
                    lVar63 = lVar63 + 0x10;
                    iVar44 = iVar44 + -1;
                  } while (iVar44 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != local_118);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            fVar205 = *local_110->data;
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar45 = pMVar9->data;
                sVar12 = pMVar8->cstep;
                sVar13 = pMVar8->elemsize;
                pvVar60 = pMVar8->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  pfVar61 = (float *)((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47);
                  auVar228._0_4_ = fVar205 + *pfVar61;
                  auVar228._4_4_ = fVar205 + pfVar61[1];
                  auVar228._8_4_ = fVar205 + pfVar61[2];
                  auVar228._12_4_ = fVar205 + pfVar61[3];
                  *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                       auVar228;
                  lVar63 = lVar63 + 0x10;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_118);
            return 0;
          }
          return 0;
        }
        if (pMVar8[1].dims != 2) {
          return 0;
        }
        if (0 < (int)local_118) {
          uVar47 = 0;
          do {
            if (0 < (int)uVar6) {
              pauVar52 = (undefined1 (*) [16])
                         (pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar59 = (undefined1 (*) [16])
                         ((long)pMVar8[1].w * uVar47 * pMVar8[1].elemsize + (long)pMVar8[1].data);
              pfVar61 = (float *)(pMVar8->cstep * uVar47 * pMVar8->elemsize + (long)pMVar8->data);
              uVar68 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar82 = *pauVar59;
                  uVar49 = uVar48;
                  do {
                    auVar216._0_4_ = auVar82._0_4_ + *pfVar61;
                    auVar216._4_4_ = auVar82._4_4_ + pfVar61[1];
                    auVar216._8_4_ = auVar82._8_4_ + pfVar61[2];
                    auVar216._12_4_ = auVar82._12_4_ + pfVar61[3];
                    *pauVar52 = auVar216;
                    pfVar61 = pfVar61 + 4;
                    pauVar52 = pauVar52 + 1;
                    uVar67 = (int)uVar49 - 1;
                    uVar49 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                pauVar59 = pauVar59 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != local_118);
          return 0;
        }
        return 0;
      }
      if (uVar66 == uVar7 && (uVar67 == 1 && (uVar68 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                auVar82 = *(undefined1 (*) [16])
                           ((long)pMVar8[1].data + pMVar8[1].cstep * uVar47 * pMVar8[1].elemsize);
                pvVar45 = pMVar8->data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar60 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  pfVar61 = (float *)((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47);
                  auVar206._0_4_ = auVar82._0_4_ + *pfVar61;
                  auVar206._4_4_ = auVar82._4_4_ + pfVar61[1];
                  auVar206._8_4_ = auVar82._8_4_ + pfVar61[2];
                  auVar206._12_4_ = auVar82._12_4_ + pfVar61[3];
                  *(undefined1 (*) [16])((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47) =
                       auVar206;
                  lVar63 = lVar63 + 0x10;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_f0 = sVar10;
      if ((uVar68 == uVar69) && (iVar46 == 1 && (uVar66 == 1 && uVar67 == uVar6))) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8->data;
                pvVar60 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  fVar205 = *(float *)((long)pvVar60 + lVar63);
                  pfVar61 = (float *)((long)pvVar45 + lVar63 * 4 + sVar10 * sVar11 * uVar47);
                  auVar89._0_4_ = fVar205 + *pfVar61;
                  auVar89._4_4_ = fVar205 + pfVar61[1];
                  auVar89._8_4_ = fVar205 + pfVar61[2];
                  auVar89._12_4_ = fVar205 + pfVar61[3];
                  *(undefined1 (*) [16])((long)pvVar65 + lVar63 * 4 + sVar12 * sVar13 * uVar47) =
                       auVar89;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar69 ^ 1) == 0) && uVar7 == uVar66) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar82 = *(undefined1 (*) [16])
                           ((long)pMVar8->data + pMVar8->cstep * uVar48 * pMVar8->elemsize);
                pvVar45 = pMVar9->data;
                sVar12 = pMVar8[1].cstep;
                sVar13 = pMVar8[1].elemsize;
                pvVar60 = pMVar8[1].data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  pfVar61 = (float *)((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48);
                  auVar220._0_4_ = auVar82._0_4_ + *pfVar61;
                  auVar220._4_4_ = auVar82._4_4_ + pfVar61[1];
                  auVar220._8_4_ = auVar82._8_4_ + pfVar61[2];
                  auVar220._12_4_ = auVar82._12_4_ + pfVar61[3];
                  *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) =
                       auVar220;
                  lVar63 = lVar63 + 0x10;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar68 == uVar69) && (iVar44 == 1)) && ((uVar67 == uVar6 && (uVar7 == 1)))) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8[1].data;
                pvVar60 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  fVar205 = *(float *)((long)pvVar60 + lVar63);
                  pfVar61 = (float *)((long)pvVar45 + lVar63 * 4 + sVar10 * sVar11 * uVar48);
                  auVar113._0_4_ = fVar205 + *pfVar61;
                  auVar113._4_4_ = fVar205 + pfVar61[1];
                  auVar113._8_4_ = fVar205 + pfVar61[2];
                  auVar113._12_4_ = fVar205 + pfVar61[3];
                  *(undefined1 (*) [16])((long)pvVar65 + lVar63 * 4 + sVar12 * sVar13 * uVar48) =
                       auVar113;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar47;
      if ((((uVar68 ^ 1) == 0 && uVar67 == uVar6) && uVar7 == uVar66) && uVar69 != 1) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar49 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar45 = local_120[1].data;
                pauVar52 = (undefined1 (*) [16])
                           (pMVar9->cstep * uVar49 * pMVar9->elemsize + (long)pMVar9->data);
                pfVar61 = (float *)(local_120->cstep * uVar49 * local_120->elemsize +
                                   (long)local_120->data);
                uVar64 = 0;
                do {
                  if (0 < (int)uVar69) {
                    auVar82 = *(undefined1 (*) [16])
                               ((long)pvVar45 + uVar64 * 0x10 + sVar10 * uVar49 * sVar11);
                    uVar70 = uVar48;
                    do {
                      auVar225._0_4_ = auVar82._0_4_ + *pfVar61;
                      auVar225._4_4_ = auVar82._4_4_ + pfVar61[1];
                      auVar225._8_4_ = auVar82._8_4_ + pfVar61[2];
                      auVar225._12_4_ = auVar82._12_4_ + pfVar61[3];
                      *pauVar52 = auVar225;
                      pfVar61 = pfVar61 + 4;
                      pauVar52 = pauVar52 + 1;
                      uVar68 = (int)uVar70 - 1;
                      uVar70 = (ulong)uVar68;
                    } while (uVar68 != 0);
                  }
                  uVar64 = uVar64 + 1;
                } while (uVar64 != uVar6);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar67 == 1 && (uVar68 ^ uVar69) == 0) && uVar66 == uVar7) && uVar6 != 1) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)local_100) {
            uVar47 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar60 = (void *)(pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar65 = (void *)(local_120->cstep * uVar47 * local_120->elemsize +
                                  (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar45 = local_120[1].data;
                uVar68 = 0;
                do {
                  if (0 < (int)uVar69) {
                    lVar63 = 0;
                    do {
                      pfVar61 = (float *)((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47);
                      pfVar62 = (float *)((long)pvVar65 + lVar63);
                      auVar128._0_4_ = *pfVar61 + *pfVar62;
                      auVar128._4_4_ = pfVar61[1] + pfVar62[1];
                      auVar128._8_4_ = pfVar61[2] + pfVar62[2];
                      auVar128._12_4_ = pfVar61[3] + pfVar62[3];
                      *(undefined1 (*) [16])((long)pvVar60 + lVar63) = auVar128;
                      lVar63 = lVar63 + 0x10;
                    } while (uVar48 << 4 != lVar63);
                    pvVar60 = (void *)((long)pvVar60 + lVar63);
                    pvVar65 = (void *)((long)pvVar65 + lVar63);
                  }
                  uVar68 = uVar68 + 1;
                } while (uVar68 != uVar6);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar69 ^ 1) == 0 && uVar6 == uVar67) && uVar66 == uVar7) && uVar68 != 1) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)local_100) {
            uVar47 = 0;
            do {
              if (0 < (int)uVar67) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar45 = local_120->data;
                pauVar52 = (undefined1 (*) [16])
                           (pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                pfVar61 = (float *)(local_120[1].cstep * uVar47 * local_120[1].elemsize +
                                   (long)local_120[1].data);
                uVar48 = 0;
                do {
                  if (0 < (int)uVar68) {
                    auVar82 = *(undefined1 (*) [16])
                               ((long)pvVar45 + uVar48 * 0x10 + sVar10 * uVar47 * sVar11);
                    uVar69 = uVar68;
                    do {
                      auVar232._0_4_ = auVar82._0_4_ + *pfVar61;
                      auVar232._4_4_ = auVar82._4_4_ + pfVar61[1];
                      auVar232._8_4_ = auVar82._8_4_ + pfVar61[2];
                      auVar232._12_4_ = auVar82._12_4_ + pfVar61[3];
                      *pauVar52 = auVar232;
                      pfVar61 = pfVar61 + 4;
                      pauVar52 = pauVar52 + 1;
                      uVar69 = uVar69 - 1;
                    } while (uVar69 != 0);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar67);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar68 ^ uVar69) == 0 && uVar6 == 1) && uVar7 == uVar66) && uVar67 != 1) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_100) {
            local_128 = (void *)(uVar49 << 4);
            iVar44 = 0;
            do {
              Mat::channel((Mat *)local_e0,local_120,iVar44);
              auVar43 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar44);
              auVar54 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar44);
              auVar74 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar67) {
                uVar69 = 0;
                do {
                  if (0 < (int)uVar68) {
                    lVar63 = 0;
                    do {
                      pfVar61 = (float *)((long)auVar54 + lVar63);
                      pfVar62 = (float *)((long)auVar43 + lVar63);
                      auVar133._0_4_ = *pfVar61 + *pfVar62;
                      auVar133._4_4_ = pfVar61[1] + pfVar62[1];
                      auVar133._8_4_ = pfVar61[2] + pfVar62[2];
                      auVar133._12_4_ = pfVar61[3] + pfVar62[3];
                      *(undefined1 (*) [16])((long)auVar74 + lVar63) = auVar133;
                      lVar63 = lVar63 + 0x10;
                    } while (local_128 != (void *)lVar63);
                    auVar74 = (undefined1  [8])((long)auVar74 + lVar63);
                    auVar54 = (undefined1  [8])((long)auVar54 + lVar63);
                  }
                  uVar69 = uVar69 + 1;
                } while (uVar69 != uVar67);
              }
              iVar44 = iVar44 + 1;
            } while (iVar44 != (int)local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_118 = uVar64;
      Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_118) {
          iVar44 = 0;
          do {
            pMVar9 = local_108;
            Mat::channel((Mat *)local_e0,local_120,iVar44);
            auVar43 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar44);
            auVar54 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar44);
            auVar74 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_130) {
              lVar63 = 0;
              iVar46 = (int)local_130;
              do {
                pfVar61 = (float *)((long)auVar54 + lVar63);
                pfVar62 = (float *)((long)auVar43 + lVar63);
                auVar135._0_4_ = *pfVar61 + *pfVar62;
                auVar135._4_4_ = pfVar61[1] + pfVar62[1];
                auVar135._8_4_ = pfVar61[2] + pfVar62[2];
                auVar135._12_4_ = pfVar61[3] + pfVar62[3];
                *(undefined1 (*) [16])((long)auVar74 + lVar63) = auVar135;
                lVar63 = lVar63 + 0x10;
                iVar46 = iVar46 + -1;
              } while (iVar46 != 0);
            }
            iVar44 = iVar44 + 1;
          } while (iVar44 != (int)local_118);
          return 0;
        }
        return 0;
      }
      return -100;
    case 1:
      uVar69 = pMVar8->w;
      uVar48 = (ulong)uVar69;
      sVar10 = pMVar8->elemsize;
      uVar68 = pMVar8[1].w;
      uVar49 = (ulong)uVar68;
      uVar67 = pMVar8[1].h;
      uVar66 = pMVar8[1].c;
      uVar47 = (ulong)uVar66;
      iVar53 = uVar67 * uVar68;
      local_f8 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar44 == 1 && uVar69 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar68,local_f8,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar68) {
                uVar4 = *pMVar8->data;
                auVar106._4_4_ = uVar4;
                auVar106._0_4_ = uVar4;
                auVar106._8_4_ = uVar4;
                auVar106._12_4_ = uVar4;
                pvVar60 = pMVar1->data;
                lVar63 = 0;
                do {
                  auVar82 = vsubps_avx(auVar106,*(undefined1 (*) [16])((long)pvVar60 + lVar63));
                  *(undefined1 (*) [16])((long)pvVar45 + lVar63) = auVar82;
                  lVar63 = lVar63 + 0x10;
                  uVar69 = (int)uVar49 - 1;
                  uVar49 = (ulong)uVar69;
                } while (uVar69 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar68,uVar67,local_f8,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < iVar53) {
                uVar4 = *pMVar8->data;
                auVar103._4_4_ = uVar4;
                auVar103._0_4_ = uVar4;
                auVar103._8_4_ = uVar4;
                auVar103._12_4_ = uVar4;
                pvVar60 = local_110->data;
                lVar63 = 0;
                do {
                  auVar82 = vsubps_avx(auVar103,*(undefined1 (*) [16])((long)pvVar60 + lVar63));
                  *(undefined1 (*) [16])((long)pvVar45 + lVar63) = auVar82;
                  lVar63 = lVar63 + 0x10;
                  iVar53 = iVar53 + -1;
                } while (iVar53 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar66) {
                uVar4 = *pMVar8->data;
                auVar81._4_4_ = uVar4;
                auVar81._0_4_ = uVar4;
                auVar81._8_4_ = uVar4;
                auVar81._12_4_ = uVar4;
                uVar48 = 0;
                do {
                  if (0 < iVar53) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar45 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar60 = pMVar8[1].data;
                    lVar63 = 0;
                    iVar44 = iVar53;
                    do {
                      auVar82 = vsubps_avx(auVar81,*(undefined1 (*) [16])
                                                    ((long)pvVar60 +
                                                    lVar63 + sVar12 * sVar13 * uVar48));
                      *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) =
                           auVar82;
                      lVar63 = lVar63 + 0x10;
                      iVar44 = iVar44 + -1;
                    } while (iVar44 != 0);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar47);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar69,sVar10,iVar44,opt->blob_allocator);
          pvVar45 = pMVar9->data;
          if (pvVar45 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar46 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar69) {
              pvVar60 = pMVar8->data;
              pvVar65 = pMVar8[1].data;
              lVar63 = 0;
              do {
                auVar82 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar60 + lVar63),
                                     *(undefined1 (*) [16])((long)pvVar65 + lVar63));
                *(undefined1 (*) [16])((long)pvVar45 + lVar63) = auVar82;
                lVar63 = lVar63 + 0x10;
                uVar69 = (int)uVar48 - 1;
                uVar48 = (ulong)uVar69;
              } while (uVar69 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar69) {
            uVar4 = *local_110->data;
            auVar95._4_4_ = uVar4;
            auVar95._0_4_ = uVar4;
            auVar95._8_4_ = uVar4;
            auVar95._12_4_ = uVar4;
            pvVar60 = pMVar8->data;
            lVar63 = 0;
            do {
              auVar82 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar60 + lVar63),auVar95);
              *(undefined1 (*) [16])((long)pvVar45 + lVar63) = auVar82;
              lVar63 = lVar63 + 0x10;
              uVar69 = (int)uVar48 - 1;
              uVar48 = (ulong)uVar69;
            } while (uVar69 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar68,uVar67,local_f8,iVar46,opt->blob_allocator);
          pauVar52 = (undefined1 (*) [16])pMVar9->data;
          if (pauVar52 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar67) {
              pauVar59 = (undefined1 (*) [16])pMVar8->data;
              pauVar57 = (undefined1 (*) [16])pMVar8[1].data;
              uVar69 = 0;
              do {
                if (0 < (int)uVar68) {
                  auVar82 = *pauVar59;
                  uVar66 = uVar68;
                  do {
                    auVar124 = vsubps_avx(auVar82,*pauVar57);
                    *pauVar52 = auVar124;
                    pauVar57 = pauVar57 + 1;
                    pauVar52 = pauVar52 + 1;
                    uVar66 = uVar66 - 1;
                  } while (uVar66 != 0);
                }
                pauVar59 = pauVar59 + 1;
                uVar69 = uVar69 + 1;
              } while (uVar69 != uVar67);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar66) {
          uVar48 = 0;
          do {
            if (0 < iVar53) {
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar9->elemsize;
              auVar82 = *(undefined1 (*) [16])((long)pMVar8->data + uVar48 * 0x10);
              pvVar45 = pMVar9->data;
              sVar12 = pMVar8[1].cstep;
              sVar13 = pMVar8[1].elemsize;
              pvVar60 = pMVar8[1].data;
              lVar63 = 0;
              iVar44 = iVar53;
              do {
                auVar124 = vsubps_avx(auVar82,*(undefined1 (*) [16])
                                               ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48));
                *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) = auVar124
                ;
                lVar63 = lVar63 + 0x10;
                iVar44 = iVar44 + -1;
              } while (iVar44 != 0);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar47);
          return 0;
        }
        return 0;
      }
      local_118 = CONCAT44(local_118._4_4_,iVar53);
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar46);
      uVar6 = pMVar8->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar6 * uVar69);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar66) {
              uVar48 = 0;
              do {
                if (0 < (int)uVar67) {
                  pauVar52 = (undefined1 (*) [16])
                             (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                  pauVar59 = (undefined1 (*) [16])
                             (local_120[1].cstep * uVar48 * local_120[1].elemsize +
                             (long)local_120[1].data);
                  pauVar57 = (undefined1 (*) [16])
                             ((long)local_120->w * uVar48 * local_120->elemsize +
                             (long)local_120->data);
                  uVar69 = 0;
                  do {
                    if (0 < (int)uVar68) {
                      auVar82 = *pauVar57;
                      uVar66 = uVar68;
                      do {
                        auVar124 = vsubps_avx(auVar82,*pauVar59);
                        *pauVar52 = auVar124;
                        pauVar59 = pauVar59 + 1;
                        pauVar52 = pauVar52 + 1;
                        uVar66 = uVar66 - 1;
                      } while (uVar66 != 0);
                    }
                    pauVar57 = pauVar57 + 1;
                    uVar69 = uVar69 + 1;
                  } while (uVar69 != uVar67);
                }
                uVar48 = uVar48 + 1;
              } while (uVar48 != uVar47);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pvVar45 = pMVar9->data;
        if (pvVar45 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar60 = local_120->data;
            pvVar65 = local_120[1].data;
            lVar63 = 0;
            do {
              auVar82 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar60 + lVar63),
                                   *(undefined1 (*) [16])((long)pvVar65 + lVar63));
              *(undefined1 (*) [16])((long)pvVar45 + lVar63) = auVar82;
              lVar63 = lVar63 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pauVar52 = (undefined1 (*) [16])pMVar9->data;
        if (pauVar52 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pauVar59 = (undefined1 (*) [16])local_120->data;
              pauVar57 = (undefined1 (*) [16])local_120[1].data;
              uVar68 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar82 = *pauVar57;
                  uVar47 = uVar48;
                  do {
                    auVar124 = vsubps_avx(*pauVar59,auVar82);
                    *pauVar52 = auVar124;
                    pauVar59 = pauVar59 + 1;
                    pauVar52 = pauVar52 + 1;
                    uVar67 = (int)uVar47 - 1;
                    uVar47 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                pauVar57 = pauVar57 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            uVar4 = *local_110->data;
            auVar120._4_4_ = uVar4;
            auVar120._0_4_ = uVar4;
            auVar120._8_4_ = uVar4;
            auVar120._12_4_ = uVar4;
            pvVar45 = local_120->data;
            lVar63 = 0;
            do {
              auVar82 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar45 + lVar63),auVar120);
              *(undefined1 (*) [16])((long)*pauVar52 + lVar63) = auVar82;
              lVar63 = lVar63 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar64 = (ulong)uVar7;
      if (pMVar8[1].dims != 3) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (pMVar8[1].dims == 1) {
          if ((int)local_128 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)local_118) {
              uVar47 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  auVar82 = *(undefined1 (*) [16])((long)local_110->data + uVar47 * 0x10);
                  pvVar45 = pMVar9->data;
                  sVar12 = pMVar8->cstep;
                  sVar13 = pMVar8->elemsize;
                  pvVar60 = pMVar8->data;
                  lVar63 = 0;
                  iVar44 = (int)local_130;
                  do {
                    auVar124 = vsubps_avx(*(undefined1 (*) [16])
                                           ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47),
                                          auVar82);
                    *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                         auVar124;
                    lVar63 = lVar63 + 0x10;
                    iVar44 = iVar44 + -1;
                  } while (iVar44 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != local_118);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            uVar4 = *local_110->data;
            auVar123._4_4_ = uVar4;
            auVar123._0_4_ = uVar4;
            auVar123._8_4_ = uVar4;
            auVar123._12_4_ = uVar4;
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar45 = pMVar9->data;
                sVar12 = pMVar8->cstep;
                sVar13 = pMVar8->elemsize;
                pvVar60 = pMVar8->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  auVar82 = vsubps_avx(*(undefined1 (*) [16])
                                        ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47),auVar123
                                      );
                  *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                       auVar82;
                  lVar63 = lVar63 + 0x10;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_118);
            return 0;
          }
          return 0;
        }
        if (pMVar8[1].dims != 2) {
          return 0;
        }
        if (0 < (int)local_118) {
          uVar47 = 0;
          do {
            if (0 < (int)uVar6) {
              pauVar52 = (undefined1 (*) [16])
                         (pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar59 = (undefined1 (*) [16])
                         ((long)pMVar8[1].w * uVar47 * pMVar8[1].elemsize + (long)pMVar8[1].data);
              pauVar57 = (undefined1 (*) [16])
                         (pMVar8->cstep * uVar47 * pMVar8->elemsize + (long)pMVar8->data);
              uVar68 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar82 = *pauVar59;
                  uVar49 = uVar48;
                  do {
                    auVar124 = vsubps_avx(*pauVar57,auVar82);
                    *pauVar52 = auVar124;
                    pauVar57 = pauVar57 + 1;
                    pauVar52 = pauVar52 + 1;
                    uVar67 = (int)uVar49 - 1;
                    uVar49 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                pauVar59 = pauVar59 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != local_118);
          return 0;
        }
        return 0;
      }
      if (uVar66 == uVar7 && (uVar67 == 1 && (uVar68 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                auVar82 = *(undefined1 (*) [16])
                           ((long)pMVar8[1].data + pMVar8[1].cstep * uVar47 * pMVar8[1].elemsize);
                pvVar45 = pMVar8->data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar60 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  auVar124 = vsubps_avx(*(undefined1 (*) [16])
                                         ((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47),auVar82
                                       );
                  *(undefined1 (*) [16])((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47) =
                       auVar124;
                  lVar63 = lVar63 + 0x10;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_f0 = sVar10;
      if ((uVar68 == uVar69) && (iVar46 == 1 && (uVar66 == 1 && uVar67 == uVar6))) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8->data;
                pvVar60 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar60 + lVar63);
                  auVar218._4_4_ = uVar4;
                  auVar218._0_4_ = uVar4;
                  auVar218._8_4_ = uVar4;
                  auVar218._12_4_ = uVar4;
                  auVar82 = vsubps_avx(*(undefined1 (*) [16])
                                        ((long)pvVar45 + lVar63 * 4 + sVar10 * sVar11 * uVar47),
                                       auVar218);
                  *(undefined1 (*) [16])((long)pvVar65 + lVar63 * 4 + sVar12 * sVar13 * uVar47) =
                       auVar82;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar69 ^ 1) == 0) && uVar7 == uVar66) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar82 = *(undefined1 (*) [16])
                           ((long)pMVar8->data + pMVar8->cstep * uVar48 * pMVar8->elemsize);
                pvVar45 = pMVar9->data;
                sVar12 = pMVar8[1].cstep;
                sVar13 = pMVar8[1].elemsize;
                pvVar60 = pMVar8[1].data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  auVar124 = vsubps_avx(auVar82,*(undefined1 (*) [16])
                                                 ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48)
                                       );
                  *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) =
                       auVar124;
                  lVar63 = lVar63 + 0x10;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar68 == uVar69) && (iVar44 == 1)) && (uVar67 == uVar6)) && (uVar7 == 1)) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8[1].data;
                pvVar60 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar60 + lVar63);
                  auVar114._4_4_ = uVar4;
                  auVar114._0_4_ = uVar4;
                  auVar114._8_4_ = uVar4;
                  auVar114._12_4_ = uVar4;
                  auVar82 = vsubps_avx(auVar114,*(undefined1 (*) [16])
                                                 ((long)pvVar45 +
                                                 lVar63 * 4 + sVar10 * sVar11 * uVar48));
                  *(undefined1 (*) [16])((long)pvVar65 + lVar63 * 4 + sVar12 * sVar13 * uVar48) =
                       auVar82;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar47;
      if ((((uVar68 ^ 1) == 0 && uVar67 == uVar6) && uVar7 == uVar66) && uVar69 != 1) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar49 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar45 = local_120[1].data;
                pauVar52 = (undefined1 (*) [16])
                           (pMVar9->cstep * uVar49 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar59 = (undefined1 (*) [16])
                           (local_120->cstep * uVar49 * local_120->elemsize + (long)local_120->data)
                ;
                uVar64 = 0;
                do {
                  if (0 < (int)uVar69) {
                    auVar82 = *(undefined1 (*) [16])
                               ((long)pvVar45 + uVar64 * 0x10 + sVar10 * uVar49 * sVar11);
                    uVar70 = uVar48;
                    do {
                      auVar124 = vsubps_avx(*pauVar59,auVar82);
                      *pauVar52 = auVar124;
                      pauVar59 = pauVar59 + 1;
                      pauVar52 = pauVar52 + 1;
                      uVar68 = (int)uVar70 - 1;
                      uVar70 = (ulong)uVar68;
                    } while (uVar68 != 0);
                  }
                  uVar64 = uVar64 + 1;
                } while (uVar64 != uVar6);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar67 == 1 && (uVar68 ^ uVar69) == 0) && uVar66 == uVar7) && uVar6 != 1) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)local_100) {
            uVar47 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar60 = (void *)(pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar65 = (void *)(local_120->cstep * uVar47 * local_120->elemsize +
                                  (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar45 = local_120[1].data;
                uVar68 = 0;
                do {
                  if (0 < (int)uVar69) {
                    lVar63 = 0;
                    do {
                      auVar82 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar65 + lVar63),
                                           *(undefined1 (*) [16])
                                            ((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47));
                      *(undefined1 (*) [16])((long)pvVar60 + lVar63) = auVar82;
                      lVar63 = lVar63 + 0x10;
                    } while (uVar48 << 4 != lVar63);
                    pvVar60 = (void *)((long)pvVar60 + lVar63);
                    pvVar65 = (void *)((long)pvVar65 + lVar63);
                  }
                  uVar68 = uVar68 + 1;
                } while (uVar68 != uVar6);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar69 ^ 1) == 0 && uVar6 == uVar67) && uVar66 == uVar7) && uVar68 != 1) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)local_100) {
            uVar47 = 0;
            do {
              if (0 < (int)uVar67) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar45 = local_120->data;
                pauVar52 = (undefined1 (*) [16])
                           (pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar59 = (undefined1 (*) [16])
                           (local_120[1].cstep * uVar47 * local_120[1].elemsize +
                           (long)local_120[1].data);
                uVar48 = 0;
                do {
                  if (0 < (int)uVar68) {
                    auVar82 = *(undefined1 (*) [16])
                               ((long)pvVar45 + uVar48 * 0x10 + sVar10 * uVar47 * sVar11);
                    uVar69 = uVar68;
                    do {
                      auVar124 = vsubps_avx(auVar82,*pauVar59);
                      *pauVar52 = auVar124;
                      pauVar59 = pauVar59 + 1;
                      pauVar52 = pauVar52 + 1;
                      uVar69 = uVar69 - 1;
                    } while (uVar69 != 0);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar67);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar68 ^ uVar69) == 0 && uVar6 == 1) && uVar7 == uVar66) && uVar67 != 1) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_100) {
            local_128 = (void *)(uVar49 << 4);
            iVar44 = 0;
            do {
              Mat::channel((Mat *)local_e0,local_120,iVar44);
              auVar43 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar44);
              auVar54 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar44);
              auVar74 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar67) {
                uVar69 = 0;
                do {
                  if (0 < (int)uVar68) {
                    lVar63 = 0;
                    do {
                      auVar82 = vsubps_avx(*(undefined1 (*) [16])((long)auVar43 + lVar63),
                                           *(undefined1 (*) [16])((long)auVar54 + lVar63));
                      *(undefined1 (*) [16])((long)auVar74 + lVar63) = auVar82;
                      lVar63 = lVar63 + 0x10;
                    } while (local_128 != (void *)lVar63);
                    auVar74 = (undefined1  [8])((long)auVar74 + lVar63);
                    auVar54 = (undefined1  [8])((long)auVar54 + lVar63);
                  }
                  uVar69 = uVar69 + 1;
                } while (uVar69 != uVar67);
              }
              iVar44 = iVar44 + 1;
            } while (iVar44 != (int)local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_118 = uVar64;
      Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_118) {
          iVar44 = 0;
          do {
            pMVar9 = local_108;
            Mat::channel((Mat *)local_e0,local_120,iVar44);
            auVar43 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar44);
            auVar54 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar44);
            auVar74 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_130) {
              lVar63 = 0;
              iVar46 = (int)local_130;
              do {
                auVar82 = vsubps_avx(*(undefined1 (*) [16])((long)auVar43 + lVar63),
                                     *(undefined1 (*) [16])((long)auVar54 + lVar63));
                *(undefined1 (*) [16])((long)auVar74 + lVar63) = auVar82;
                lVar63 = lVar63 + 0x10;
                iVar46 = iVar46 + -1;
              } while (iVar46 != 0);
            }
            iVar44 = iVar44 + 1;
          } while (iVar44 != (int)local_118);
          return 0;
        }
        return 0;
      }
      return -100;
    case 2:
      uVar69 = pMVar8->w;
      uVar48 = (ulong)uVar69;
      sVar10 = pMVar8->elemsize;
      uVar68 = pMVar8[1].w;
      uVar49 = (ulong)uVar68;
      uVar67 = pMVar8[1].h;
      uVar66 = pMVar8[1].c;
      uVar47 = (ulong)uVar66;
      iVar53 = uVar67 * uVar68;
      local_f8 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar44 == 1 && uVar69 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar68,local_f8,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar68) {
                fVar205 = *pMVar8->data;
                pvVar60 = pMVar1->data;
                lVar63 = 0;
                do {
                  pfVar61 = (float *)((long)pvVar60 + lVar63);
                  fVar30 = pfVar61[1];
                  fVar31 = pfVar61[2];
                  fVar32 = pfVar61[3];
                  pfVar62 = (float *)((long)pvVar45 + lVar63);
                  *pfVar62 = fVar205 * *pfVar61;
                  pfVar62[1] = fVar205 * fVar30;
                  pfVar62[2] = fVar205 * fVar31;
                  pfVar62[3] = fVar205 * fVar32;
                  lVar63 = lVar63 + 0x10;
                  uVar69 = (int)uVar49 - 1;
                  uVar49 = (ulong)uVar69;
                } while (uVar69 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar68,uVar67,local_f8,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < iVar53) {
                fVar205 = *pMVar8->data;
                pvVar60 = local_110->data;
                lVar63 = 0;
                do {
                  pfVar61 = (float *)((long)pvVar60 + lVar63);
                  fVar30 = pfVar61[1];
                  fVar31 = pfVar61[2];
                  fVar32 = pfVar61[3];
                  pfVar62 = (float *)((long)pvVar45 + lVar63);
                  *pfVar62 = fVar205 * *pfVar61;
                  pfVar62[1] = fVar205 * fVar30;
                  pfVar62[2] = fVar205 * fVar31;
                  pfVar62[3] = fVar205 * fVar32;
                  lVar63 = lVar63 + 0x10;
                  iVar53 = iVar53 + -1;
                } while (iVar53 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar66) {
                fVar205 = *pMVar8->data;
                uVar48 = 0;
                do {
                  if (0 < iVar53) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar45 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar60 = pMVar8[1].data;
                    lVar63 = 0;
                    iVar44 = iVar53;
                    do {
                      pfVar61 = (float *)((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48);
                      auVar209._0_4_ = fVar205 * *pfVar61;
                      auVar209._4_4_ = fVar205 * pfVar61[1];
                      auVar209._8_4_ = fVar205 * pfVar61[2];
                      auVar209._12_4_ = fVar205 * pfVar61[3];
                      *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) =
                           auVar209;
                      lVar63 = lVar63 + 0x10;
                      iVar44 = iVar44 + -1;
                    } while (iVar44 != 0);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar47);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar69,sVar10,iVar44,opt->blob_allocator);
          pvVar45 = pMVar9->data;
          if (pvVar45 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar46 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar69) {
              pvVar60 = pMVar8->data;
              pvVar65 = pMVar8[1].data;
              lVar63 = 0;
              do {
                pfVar61 = (float *)((long)pvVar65 + lVar63);
                fVar205 = pfVar61[1];
                fVar30 = pfVar61[2];
                fVar31 = pfVar61[3];
                pfVar62 = (float *)((long)pvVar60 + lVar63);
                fVar32 = pfVar62[1];
                fVar33 = pfVar62[2];
                fVar34 = pfVar62[3];
                pfVar2 = (float *)((long)pvVar45 + lVar63);
                *pfVar2 = *pfVar61 * *pfVar62;
                pfVar2[1] = fVar205 * fVar32;
                pfVar2[2] = fVar30 * fVar33;
                pfVar2[3] = fVar31 * fVar34;
                lVar63 = lVar63 + 0x10;
                uVar69 = (int)uVar48 - 1;
                uVar48 = (ulong)uVar69;
              } while (uVar69 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar69) {
            fVar205 = *local_110->data;
            pvVar60 = pMVar8->data;
            lVar63 = 0;
            do {
              pfVar61 = (float *)((long)pvVar60 + lVar63);
              fVar30 = pfVar61[1];
              fVar31 = pfVar61[2];
              fVar32 = pfVar61[3];
              pfVar62 = (float *)((long)pvVar45 + lVar63);
              *pfVar62 = fVar205 * *pfVar61;
              pfVar62[1] = fVar205 * fVar30;
              pfVar62[2] = fVar205 * fVar31;
              pfVar62[3] = fVar205 * fVar32;
              lVar63 = lVar63 + 0x10;
              uVar69 = (int)uVar48 - 1;
              uVar48 = (ulong)uVar69;
            } while (uVar69 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar68,uVar67,local_f8,iVar46,opt->blob_allocator);
          pauVar52 = (undefined1 (*) [16])pMVar9->data;
          if (pauVar52 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar67) {
              pauVar59 = (undefined1 (*) [16])pMVar8->data;
              pfVar61 = (float *)pMVar8[1].data;
              uVar69 = 0;
              do {
                if (0 < (int)uVar68) {
                  auVar82 = *pauVar59;
                  uVar66 = uVar68;
                  do {
                    auVar221._0_4_ = auVar82._0_4_ * *pfVar61;
                    auVar221._4_4_ = auVar82._4_4_ * pfVar61[1];
                    auVar221._8_4_ = auVar82._8_4_ * pfVar61[2];
                    auVar221._12_4_ = auVar82._12_4_ * pfVar61[3];
                    *pauVar52 = auVar221;
                    pfVar61 = pfVar61 + 4;
                    pauVar52 = pauVar52 + 1;
                    uVar66 = uVar66 - 1;
                  } while (uVar66 != 0);
                }
                pauVar59 = pauVar59 + 1;
                uVar69 = uVar69 + 1;
              } while (uVar69 != uVar67);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar66) {
          uVar48 = 0;
          do {
            if (0 < iVar53) {
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar9->elemsize;
              auVar82 = *(undefined1 (*) [16])((long)pMVar8->data + uVar48 * 0x10);
              pvVar45 = pMVar9->data;
              sVar12 = pMVar8[1].cstep;
              sVar13 = pMVar8[1].elemsize;
              pvVar60 = pMVar8[1].data;
              lVar63 = 0;
              iVar44 = iVar53;
              do {
                pfVar61 = (float *)((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48);
                auVar213._0_4_ = auVar82._0_4_ * *pfVar61;
                auVar213._4_4_ = auVar82._4_4_ * pfVar61[1];
                auVar213._8_4_ = auVar82._8_4_ * pfVar61[2];
                auVar213._12_4_ = auVar82._12_4_ * pfVar61[3];
                *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) = auVar213
                ;
                lVar63 = lVar63 + 0x10;
                iVar44 = iVar44 + -1;
              } while (iVar44 != 0);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar47);
          return 0;
        }
        return 0;
      }
      local_118 = CONCAT44(local_118._4_4_,iVar53);
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar46);
      uVar6 = pMVar8->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar6 * uVar69);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar66) {
              uVar48 = 0;
              do {
                if (0 < (int)uVar67) {
                  pauVar52 = (undefined1 (*) [16])
                             (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                  pfVar61 = (float *)(local_120[1].cstep * uVar48 * local_120[1].elemsize +
                                     (long)local_120[1].data);
                  pauVar59 = (undefined1 (*) [16])
                             ((long)local_120->w * uVar48 * local_120->elemsize +
                             (long)local_120->data);
                  uVar69 = 0;
                  do {
                    if (0 < (int)uVar68) {
                      auVar82 = *pauVar59;
                      uVar66 = uVar68;
                      do {
                        auVar208._0_4_ = auVar82._0_4_ * *pfVar61;
                        auVar208._4_4_ = auVar82._4_4_ * pfVar61[1];
                        auVar208._8_4_ = auVar82._8_4_ * pfVar61[2];
                        auVar208._12_4_ = auVar82._12_4_ * pfVar61[3];
                        *pauVar52 = auVar208;
                        pfVar61 = pfVar61 + 4;
                        pauVar52 = pauVar52 + 1;
                        uVar66 = uVar66 - 1;
                      } while (uVar66 != 0);
                    }
                    pauVar59 = pauVar59 + 1;
                    uVar69 = uVar69 + 1;
                  } while (uVar69 != uVar67);
                }
                uVar48 = uVar48 + 1;
              } while (uVar48 != uVar47);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pvVar45 = pMVar9->data;
        if (pvVar45 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar60 = local_120->data;
            pvVar65 = local_120[1].data;
            lVar63 = 0;
            do {
              pfVar61 = (float *)((long)pvVar65 + lVar63);
              fVar205 = pfVar61[1];
              fVar30 = pfVar61[2];
              fVar31 = pfVar61[3];
              pfVar62 = (float *)((long)pvVar60 + lVar63);
              fVar32 = pfVar62[1];
              fVar33 = pfVar62[2];
              fVar34 = pfVar62[3];
              pfVar2 = (float *)((long)pvVar45 + lVar63);
              *pfVar2 = *pfVar61 * *pfVar62;
              pfVar2[1] = fVar205 * fVar32;
              pfVar2[2] = fVar30 * fVar33;
              pfVar2[3] = fVar31 * fVar34;
              lVar63 = lVar63 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pauVar52 = (undefined1 (*) [16])pMVar9->data;
        if (pauVar52 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pfVar61 = (float *)local_120->data;
              pauVar59 = (undefined1 (*) [16])local_120[1].data;
              uVar68 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar82 = *pauVar59;
                  uVar47 = uVar48;
                  do {
                    auVar233._0_4_ = auVar82._0_4_ * *pfVar61;
                    auVar233._4_4_ = auVar82._4_4_ * pfVar61[1];
                    auVar233._8_4_ = auVar82._8_4_ * pfVar61[2];
                    auVar233._12_4_ = auVar82._12_4_ * pfVar61[3];
                    *pauVar52 = auVar233;
                    pfVar61 = pfVar61 + 4;
                    pauVar52 = pauVar52 + 1;
                    uVar67 = (int)uVar47 - 1;
                    uVar47 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                pauVar59 = pauVar59 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            fVar205 = *local_110->data;
            pvVar45 = local_120->data;
            lVar63 = 0;
            do {
              pfVar61 = (float *)((long)pvVar45 + lVar63);
              fVar30 = pfVar61[1];
              fVar31 = pfVar61[2];
              fVar32 = pfVar61[3];
              pfVar62 = (float *)((long)*pauVar52 + lVar63);
              *pfVar62 = fVar205 * *pfVar61;
              pfVar62[1] = fVar205 * fVar30;
              pfVar62[2] = fVar205 * fVar31;
              pfVar62[3] = fVar205 * fVar32;
              lVar63 = lVar63 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar64 = (ulong)uVar7;
      if (pMVar8[1].dims != 3) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (pMVar8[1].dims == 1) {
          if ((int)local_128 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)local_118) {
              uVar47 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  auVar82 = *(undefined1 (*) [16])((long)local_110->data + uVar47 * 0x10);
                  pvVar45 = pMVar9->data;
                  sVar12 = pMVar8->cstep;
                  sVar13 = pMVar8->elemsize;
                  pvVar60 = pMVar8->data;
                  lVar63 = 0;
                  iVar44 = (int)local_130;
                  do {
                    pfVar61 = (float *)((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47);
                    auVar229._0_4_ = auVar82._0_4_ * *pfVar61;
                    auVar229._4_4_ = auVar82._4_4_ * pfVar61[1];
                    auVar229._8_4_ = auVar82._8_4_ * pfVar61[2];
                    auVar229._12_4_ = auVar82._12_4_ * pfVar61[3];
                    *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                         auVar229;
                    lVar63 = lVar63 + 0x10;
                    iVar44 = iVar44 + -1;
                  } while (iVar44 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != local_118);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            fVar205 = *local_110->data;
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar45 = pMVar9->data;
                sVar12 = pMVar8->cstep;
                sVar13 = pMVar8->elemsize;
                pvVar60 = pMVar8->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  pfVar61 = (float *)((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47);
                  auVar226._0_4_ = fVar205 * *pfVar61;
                  auVar226._4_4_ = fVar205 * pfVar61[1];
                  auVar226._8_4_ = fVar205 * pfVar61[2];
                  auVar226._12_4_ = fVar205 * pfVar61[3];
                  *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                       auVar226;
                  lVar63 = lVar63 + 0x10;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_118);
            return 0;
          }
          return 0;
        }
        if (pMVar8[1].dims != 2) {
          return 0;
        }
        if (0 < (int)local_118) {
          uVar47 = 0;
          do {
            if (0 < (int)uVar6) {
              pauVar52 = (undefined1 (*) [16])
                         (pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar59 = (undefined1 (*) [16])
                         ((long)pMVar8[1].w * uVar47 * pMVar8[1].elemsize + (long)pMVar8[1].data);
              pfVar61 = (float *)(pMVar8->cstep * uVar47 * pMVar8->elemsize + (long)pMVar8->data);
              uVar68 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar82 = *pauVar59;
                  uVar49 = uVar48;
                  do {
                    auVar215._0_4_ = auVar82._0_4_ * *pfVar61;
                    auVar215._4_4_ = auVar82._4_4_ * pfVar61[1];
                    auVar215._8_4_ = auVar82._8_4_ * pfVar61[2];
                    auVar215._12_4_ = auVar82._12_4_ * pfVar61[3];
                    *pauVar52 = auVar215;
                    pfVar61 = pfVar61 + 4;
                    pauVar52 = pauVar52 + 1;
                    uVar67 = (int)uVar49 - 1;
                    uVar49 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                pauVar59 = pauVar59 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != local_118);
          return 0;
        }
        return 0;
      }
      if (uVar66 == uVar7 && (uVar67 == 1 && (uVar68 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                auVar82 = *(undefined1 (*) [16])
                           ((long)pMVar8[1].data + pMVar8[1].cstep * uVar47 * pMVar8[1].elemsize);
                pvVar45 = pMVar8->data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar60 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  pfVar61 = (float *)((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47);
                  auVar207._0_4_ = auVar82._0_4_ * *pfVar61;
                  auVar207._4_4_ = auVar82._4_4_ * pfVar61[1];
                  auVar207._8_4_ = auVar82._8_4_ * pfVar61[2];
                  auVar207._12_4_ = auVar82._12_4_ * pfVar61[3];
                  *(undefined1 (*) [16])((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47) =
                       auVar207;
                  lVar63 = lVar63 + 0x10;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_f0 = sVar10;
      if ((uVar68 == uVar69) && (iVar46 == 1 && (uVar66 == 1 && uVar67 == uVar6))) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8->data;
                pvVar60 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  fVar205 = *(float *)((long)pvVar60 + lVar63);
                  pfVar61 = (float *)((long)pvVar45 + lVar63 * 4 + sVar10 * sVar11 * uVar47);
                  auVar87._0_4_ = fVar205 * *pfVar61;
                  auVar87._4_4_ = fVar205 * pfVar61[1];
                  auVar87._8_4_ = fVar205 * pfVar61[2];
                  auVar87._12_4_ = fVar205 * pfVar61[3];
                  *(undefined1 (*) [16])((long)pvVar65 + lVar63 * 4 + sVar12 * sVar13 * uVar47) =
                       auVar87;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar69 ^ 1) == 0) && uVar7 == uVar66) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar82 = *(undefined1 (*) [16])
                           ((long)pMVar8->data + pMVar8->cstep * uVar48 * pMVar8->elemsize);
                pvVar45 = pMVar9->data;
                sVar12 = pMVar8[1].cstep;
                sVar13 = pMVar8[1].elemsize;
                pvVar60 = pMVar8[1].data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  pfVar61 = (float *)((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48);
                  auVar219._0_4_ = auVar82._0_4_ * *pfVar61;
                  auVar219._4_4_ = auVar82._4_4_ * pfVar61[1];
                  auVar219._8_4_ = auVar82._8_4_ * pfVar61[2];
                  auVar219._12_4_ = auVar82._12_4_ * pfVar61[3];
                  *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) =
                       auVar219;
                  lVar63 = lVar63 + 0x10;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar68 == uVar69) && (iVar44 == 1)) && ((uVar67 == uVar6 && (uVar7 == 1)))) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8[1].data;
                pvVar60 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  fVar205 = *(float *)((long)pvVar60 + lVar63);
                  pfVar61 = (float *)((long)pvVar45 + lVar63 * 4 + sVar10 * sVar11 * uVar48);
                  auVar110._0_4_ = fVar205 * *pfVar61;
                  auVar110._4_4_ = fVar205 * pfVar61[1];
                  auVar110._8_4_ = fVar205 * pfVar61[2];
                  auVar110._12_4_ = fVar205 * pfVar61[3];
                  *(undefined1 (*) [16])((long)pvVar65 + lVar63 * 4 + sVar12 * sVar13 * uVar48) =
                       auVar110;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar47;
      if ((((uVar68 ^ 1) == 0 && uVar67 == uVar6) && uVar7 == uVar66) && uVar69 != 1) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar49 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar45 = local_120[1].data;
                pauVar52 = (undefined1 (*) [16])
                           (pMVar9->cstep * uVar49 * pMVar9->elemsize + (long)pMVar9->data);
                pfVar61 = (float *)(local_120->cstep * uVar49 * local_120->elemsize +
                                   (long)local_120->data);
                uVar64 = 0;
                do {
                  if (0 < (int)uVar69) {
                    auVar82 = *(undefined1 (*) [16])
                               ((long)pvVar45 + uVar64 * 0x10 + sVar10 * uVar49 * sVar11);
                    uVar70 = uVar48;
                    do {
                      auVar224._0_4_ = auVar82._0_4_ * *pfVar61;
                      auVar224._4_4_ = auVar82._4_4_ * pfVar61[1];
                      auVar224._8_4_ = auVar82._8_4_ * pfVar61[2];
                      auVar224._12_4_ = auVar82._12_4_ * pfVar61[3];
                      *pauVar52 = auVar224;
                      pfVar61 = pfVar61 + 4;
                      pauVar52 = pauVar52 + 1;
                      uVar68 = (int)uVar70 - 1;
                      uVar70 = (ulong)uVar68;
                    } while (uVar68 != 0);
                  }
                  uVar64 = uVar64 + 1;
                } while (uVar64 != uVar6);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar67 == 1 && (uVar68 ^ uVar69) == 0) && uVar66 == uVar7) && uVar6 != 1) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)local_100) {
            uVar47 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar60 = (void *)(pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar65 = (void *)(local_120->cstep * uVar47 * local_120->elemsize +
                                  (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar45 = local_120[1].data;
                uVar68 = 0;
                do {
                  if (0 < (int)uVar69) {
                    lVar63 = 0;
                    do {
                      pfVar61 = (float *)((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47);
                      pfVar62 = (float *)((long)pvVar65 + lVar63);
                      auVar127._0_4_ = *pfVar61 * *pfVar62;
                      auVar127._4_4_ = pfVar61[1] * pfVar62[1];
                      auVar127._8_4_ = pfVar61[2] * pfVar62[2];
                      auVar127._12_4_ = pfVar61[3] * pfVar62[3];
                      *(undefined1 (*) [16])((long)pvVar60 + lVar63) = auVar127;
                      lVar63 = lVar63 + 0x10;
                    } while (uVar48 << 4 != lVar63);
                    pvVar60 = (void *)((long)pvVar60 + lVar63);
                    pvVar65 = (void *)((long)pvVar65 + lVar63);
                  }
                  uVar68 = uVar68 + 1;
                } while (uVar68 != uVar6);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar69 ^ 1) == 0 && uVar6 == uVar67) && uVar66 == uVar7) && uVar68 != 1) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)local_100) {
            uVar47 = 0;
            do {
              if (0 < (int)uVar67) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar45 = local_120->data;
                pauVar52 = (undefined1 (*) [16])
                           (pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                pfVar61 = (float *)(local_120[1].cstep * uVar47 * local_120[1].elemsize +
                                   (long)local_120[1].data);
                uVar48 = 0;
                do {
                  if (0 < (int)uVar68) {
                    auVar82 = *(undefined1 (*) [16])
                               ((long)pvVar45 + uVar48 * 0x10 + sVar10 * uVar47 * sVar11);
                    uVar69 = uVar68;
                    do {
                      auVar231._0_4_ = auVar82._0_4_ * *pfVar61;
                      auVar231._4_4_ = auVar82._4_4_ * pfVar61[1];
                      auVar231._8_4_ = auVar82._8_4_ * pfVar61[2];
                      auVar231._12_4_ = auVar82._12_4_ * pfVar61[3];
                      *pauVar52 = auVar231;
                      pfVar61 = pfVar61 + 4;
                      pauVar52 = pauVar52 + 1;
                      uVar69 = uVar69 - 1;
                    } while (uVar69 != 0);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar67);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar68 ^ uVar69) == 0 && uVar6 == 1) && uVar7 == uVar66) && uVar67 != 1) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_100) {
            local_128 = (void *)(uVar49 << 4);
            iVar44 = 0;
            do {
              Mat::channel((Mat *)local_e0,local_120,iVar44);
              auVar43 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar44);
              auVar54 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar44);
              auVar74 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar67) {
                uVar69 = 0;
                do {
                  if (0 < (int)uVar68) {
                    lVar63 = 0;
                    do {
                      pfVar61 = (float *)((long)auVar54 + lVar63);
                      pfVar62 = (float *)((long)auVar43 + lVar63);
                      auVar132._0_4_ = *pfVar61 * *pfVar62;
                      auVar132._4_4_ = pfVar61[1] * pfVar62[1];
                      auVar132._8_4_ = pfVar61[2] * pfVar62[2];
                      auVar132._12_4_ = pfVar61[3] * pfVar62[3];
                      *(undefined1 (*) [16])((long)auVar74 + lVar63) = auVar132;
                      lVar63 = lVar63 + 0x10;
                    } while (local_128 != (void *)lVar63);
                    auVar74 = (undefined1  [8])((long)auVar74 + lVar63);
                    auVar54 = (undefined1  [8])((long)auVar54 + lVar63);
                  }
                  uVar69 = uVar69 + 1;
                } while (uVar69 != uVar67);
              }
              iVar44 = iVar44 + 1;
            } while (iVar44 != (int)local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_118 = uVar64;
      Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_118) {
          iVar44 = 0;
          do {
            pMVar9 = local_108;
            Mat::channel((Mat *)local_e0,local_120,iVar44);
            auVar43 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar44);
            auVar54 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar44);
            auVar74 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_130) {
              lVar63 = 0;
              iVar46 = (int)local_130;
              do {
                pfVar61 = (float *)((long)auVar54 + lVar63);
                pfVar62 = (float *)((long)auVar43 + lVar63);
                auVar134._0_4_ = *pfVar61 * *pfVar62;
                auVar134._4_4_ = pfVar61[1] * pfVar62[1];
                auVar134._8_4_ = pfVar61[2] * pfVar62[2];
                auVar134._12_4_ = pfVar61[3] * pfVar62[3];
                *(undefined1 (*) [16])((long)auVar74 + lVar63) = auVar134;
                lVar63 = lVar63 + 0x10;
                iVar46 = iVar46 + -1;
              } while (iVar46 != 0);
            }
            iVar44 = iVar44 + 1;
          } while (iVar44 != (int)local_118);
          return 0;
        }
        return 0;
      }
      return -100;
    case 3:
      uVar69 = pMVar8->w;
      uVar48 = (ulong)uVar69;
      sVar10 = pMVar8->elemsize;
      uVar68 = pMVar8[1].w;
      uVar49 = (ulong)uVar68;
      uVar67 = pMVar8[1].h;
      uVar66 = pMVar8[1].c;
      uVar47 = (ulong)uVar66;
      iVar53 = uVar67 * uVar68;
      local_f8 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar44 == 1 && uVar69 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar68,local_f8,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar68) {
                fVar205 = *pMVar8->data;
                auVar104._4_4_ = fVar205;
                auVar104._0_4_ = fVar205;
                auVar104._8_4_ = fVar205;
                auVar104._12_4_ = fVar205;
                pvVar60 = pMVar1->data;
                lVar63 = 0;
                do {
                  auVar82 = *(undefined1 (*) [16])((long)pvVar60 + lVar63);
                  auVar124 = vrcpps_avx(auVar82);
                  auVar285._0_4_ = fVar205 * auVar124._0_4_;
                  auVar285._4_4_ = fVar205 * auVar124._4_4_;
                  auVar285._8_4_ = fVar205 * auVar124._8_4_;
                  auVar285._12_4_ = fVar205 * auVar124._12_4_;
                  auVar82 = vfmsub213ps_fma(auVar82,auVar285,auVar104);
                  auVar82 = vfnmadd213ps_fma(auVar82,auVar124,auVar285);
                  *(undefined1 (*) [16])((long)pvVar45 + lVar63) = auVar82;
                  lVar63 = lVar63 + 0x10;
                  uVar69 = (int)uVar49 - 1;
                  uVar49 = (ulong)uVar69;
                } while (uVar69 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar68,uVar67,local_f8,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < iVar53) {
                fVar205 = *pMVar8->data;
                auVar101._4_4_ = fVar205;
                auVar101._0_4_ = fVar205;
                auVar101._8_4_ = fVar205;
                auVar101._12_4_ = fVar205;
                pvVar60 = local_110->data;
                lVar63 = 0;
                do {
                  auVar82 = *(undefined1 (*) [16])((long)pvVar60 + lVar63);
                  auVar124 = vrcpps_avx(auVar82);
                  auVar284._0_4_ = fVar205 * auVar124._0_4_;
                  auVar284._4_4_ = fVar205 * auVar124._4_4_;
                  auVar284._8_4_ = fVar205 * auVar124._8_4_;
                  auVar284._12_4_ = fVar205 * auVar124._12_4_;
                  auVar82 = vfmsub213ps_fma(auVar82,auVar284,auVar101);
                  auVar82 = vfnmadd213ps_fma(auVar82,auVar124,auVar284);
                  *(undefined1 (*) [16])((long)pvVar45 + lVar63) = auVar82;
                  lVar63 = lVar63 + 0x10;
                  iVar53 = iVar53 + -1;
                } while (iVar53 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar66) {
                fVar205 = *pMVar8->data;
                auVar79._4_4_ = fVar205;
                auVar79._0_4_ = fVar205;
                auVar79._8_4_ = fVar205;
                auVar79._12_4_ = fVar205;
                uVar48 = 0;
                do {
                  if (0 < iVar53) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar45 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar60 = pMVar8[1].data;
                    lVar63 = 0;
                    iVar44 = iVar53;
                    do {
                      auVar82 = *(undefined1 (*) [16])
                                 ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48);
                      auVar124 = vrcpps_avx(auVar82);
                      auVar275._0_4_ = fVar205 * auVar124._0_4_;
                      auVar275._4_4_ = fVar205 * auVar124._4_4_;
                      auVar275._8_4_ = fVar205 * auVar124._8_4_;
                      auVar275._12_4_ = fVar205 * auVar124._12_4_;
                      auVar82 = vfmsub213ps_fma(auVar82,auVar275,auVar79);
                      auVar82 = vfnmadd213ps_fma(auVar82,auVar124,auVar275);
                      *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) =
                           auVar82;
                      lVar63 = lVar63 + 0x10;
                      iVar44 = iVar44 + -1;
                    } while (iVar44 != 0);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar47);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar69,sVar10,iVar44,opt->blob_allocator);
          pvVar45 = pMVar9->data;
          if (pvVar45 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar46 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar69) {
              pvVar60 = pMVar8->data;
              pvVar65 = pMVar8[1].data;
              lVar63 = 0;
              do {
                auVar82 = *(undefined1 (*) [16])((long)pvVar60 + lVar63);
                auVar124 = *(undefined1 (*) [16])((long)pvVar65 + lVar63);
                auVar270 = vrcpps_avx(auVar124);
                auVar293._0_4_ = auVar82._0_4_ * auVar270._0_4_;
                auVar293._4_4_ = auVar82._4_4_ * auVar270._4_4_;
                auVar293._8_4_ = auVar82._8_4_ * auVar270._8_4_;
                auVar293._12_4_ = auVar82._12_4_ * auVar270._12_4_;
                auVar82 = vfmsub213ps_fma(auVar124,auVar293,auVar82);
                auVar82 = vfnmadd213ps_fma(auVar82,auVar270,auVar293);
                *(undefined1 (*) [16])((long)pvVar45 + lVar63) = auVar82;
                lVar63 = lVar63 + 0x10;
                uVar69 = (int)uVar48 - 1;
                uVar48 = (ulong)uVar69;
              } while (uVar69 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar69) {
            fVar205 = 1.0 / *local_110->data;
            pvVar60 = pMVar8->data;
            lVar63 = 0;
            do {
              pfVar61 = (float *)((long)pvVar60 + lVar63);
              fVar30 = pfVar61[1];
              fVar31 = pfVar61[2];
              fVar32 = pfVar61[3];
              pfVar62 = (float *)((long)pvVar45 + lVar63);
              *pfVar62 = fVar205 * *pfVar61;
              pfVar62[1] = fVar205 * fVar30;
              pfVar62[2] = fVar205 * fVar31;
              pfVar62[3] = fVar205 * fVar32;
              lVar63 = lVar63 + 0x10;
              uVar69 = (int)uVar48 - 1;
              uVar48 = (ulong)uVar69;
            } while (uVar69 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar68,uVar67,local_f8,iVar46,opt->blob_allocator);
          pauVar52 = (undefined1 (*) [16])pMVar9->data;
          if (pauVar52 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar67) {
              pauVar59 = (undefined1 (*) [16])pMVar8->data;
              pauVar57 = (undefined1 (*) [16])pMVar8[1].data;
              uVar69 = 0;
              do {
                if (0 < (int)uVar68) {
                  auVar82 = *pauVar59;
                  uVar66 = uVar68;
                  do {
                    auVar124 = vrcpps_avx(*pauVar57);
                    auVar282._0_4_ = auVar82._0_4_ * auVar124._0_4_;
                    auVar282._4_4_ = auVar82._4_4_ * auVar124._4_4_;
                    auVar282._8_4_ = auVar82._8_4_ * auVar124._8_4_;
                    auVar282._12_4_ = auVar82._12_4_ * auVar124._12_4_;
                    auVar270 = vfmsub213ps_fma(*pauVar57,auVar282,auVar82);
                    auVar124 = vfnmadd213ps_fma(auVar270,auVar124,auVar282);
                    *pauVar52 = auVar124;
                    pauVar57 = pauVar57 + 1;
                    pauVar52 = pauVar52 + 1;
                    uVar66 = uVar66 - 1;
                  } while (uVar66 != 0);
                }
                pauVar59 = pauVar59 + 1;
                uVar69 = uVar69 + 1;
              } while (uVar69 != uVar67);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar66) {
          uVar48 = 0;
          do {
            if (0 < iVar53) {
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar9->elemsize;
              auVar82 = *(undefined1 (*) [16])((long)pMVar8->data + uVar48 * 0x10);
              pvVar45 = pMVar9->data;
              sVar12 = pMVar8[1].cstep;
              sVar13 = pMVar8[1].elemsize;
              pvVar60 = pMVar8[1].data;
              lVar63 = 0;
              iVar44 = iVar53;
              do {
                auVar124 = *(undefined1 (*) [16])((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48)
                ;
                auVar270 = vrcpps_avx(auVar124);
                auVar276._0_4_ = auVar82._0_4_ * auVar270._0_4_;
                auVar276._4_4_ = auVar82._4_4_ * auVar270._4_4_;
                auVar276._8_4_ = auVar82._8_4_ * auVar270._8_4_;
                auVar276._12_4_ = auVar82._12_4_ * auVar270._12_4_;
                auVar124 = vfmsub213ps_fma(auVar124,auVar276,auVar82);
                auVar124 = vfnmadd213ps_fma(auVar124,auVar270,auVar276);
                *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) = auVar124
                ;
                lVar63 = lVar63 + 0x10;
                iVar44 = iVar44 + -1;
              } while (iVar44 != 0);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar47);
          return 0;
        }
        return 0;
      }
      local_118 = CONCAT44(local_118._4_4_,iVar53);
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar46);
      uVar6 = pMVar8->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar6 * uVar69);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar66) {
              uVar48 = 0;
              do {
                if (0 < (int)uVar67) {
                  pauVar52 = (undefined1 (*) [16])
                             (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                  pauVar59 = (undefined1 (*) [16])
                             (local_120[1].cstep * uVar48 * local_120[1].elemsize +
                             (long)local_120[1].data);
                  pauVar57 = (undefined1 (*) [16])
                             ((long)local_120->w * uVar48 * local_120->elemsize +
                             (long)local_120->data);
                  uVar69 = 0;
                  do {
                    if (0 < (int)uVar68) {
                      auVar82 = *pauVar57;
                      uVar66 = uVar68;
                      do {
                        auVar124 = vrcpps_avx(*pauVar59);
                        auVar274._0_4_ = auVar82._0_4_ * auVar124._0_4_;
                        auVar274._4_4_ = auVar82._4_4_ * auVar124._4_4_;
                        auVar274._8_4_ = auVar82._8_4_ * auVar124._8_4_;
                        auVar274._12_4_ = auVar82._12_4_ * auVar124._12_4_;
                        auVar270 = vfmsub213ps_fma(*pauVar59,auVar274,auVar82);
                        auVar124 = vfnmadd213ps_fma(auVar270,auVar124,auVar274);
                        *pauVar52 = auVar124;
                        pauVar59 = pauVar59 + 1;
                        pauVar52 = pauVar52 + 1;
                        uVar66 = uVar66 - 1;
                      } while (uVar66 != 0);
                    }
                    pauVar57 = pauVar57 + 1;
                    uVar69 = uVar69 + 1;
                  } while (uVar69 != uVar67);
                }
                uVar48 = uVar48 + 1;
              } while (uVar48 != uVar47);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pvVar45 = pMVar9->data;
        if (pvVar45 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar60 = local_120->data;
            pvVar65 = local_120[1].data;
            lVar63 = 0;
            do {
              auVar82 = *(undefined1 (*) [16])((long)pvVar60 + lVar63);
              auVar124 = *(undefined1 (*) [16])((long)pvVar65 + lVar63);
              auVar270 = vrcpps_avx(auVar124);
              auVar277._0_4_ = auVar82._0_4_ * auVar270._0_4_;
              auVar277._4_4_ = auVar82._4_4_ * auVar270._4_4_;
              auVar277._8_4_ = auVar82._8_4_ * auVar270._8_4_;
              auVar277._12_4_ = auVar82._12_4_ * auVar270._12_4_;
              auVar82 = vfmsub213ps_fma(auVar124,auVar277,auVar82);
              auVar82 = vfnmadd213ps_fma(auVar82,auVar270,auVar277);
              *(undefined1 (*) [16])((long)pvVar45 + lVar63) = auVar82;
              lVar63 = lVar63 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pfVar61 = (float *)pMVar9->data;
        if (pfVar61 == (float *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pfVar62 = (float *)local_120->data;
              pauVar52 = (undefined1 (*) [16])local_120[1].data;
              uVar68 = 0;
              auVar131._8_4_ = 0x3f800000;
              auVar131._0_8_ = 0x3f8000003f800000;
              auVar131._12_4_ = 0x3f800000;
              do {
                if (0 < (int)uVar69) {
                  auVar82 = vrcpps_avx(*pauVar52);
                  auVar124 = vfmsub213ps_fma(*pauVar52,auVar82,auVar131);
                  auVar82 = vfnmadd132ps_fma(auVar124,auVar82,auVar82);
                  uVar47 = uVar48;
                  do {
                    fVar205 = pfVar62[1];
                    fVar30 = pfVar62[2];
                    fVar31 = pfVar62[3];
                    *pfVar61 = auVar82._0_4_ * *pfVar62;
                    pfVar61[1] = auVar82._4_4_ * fVar205;
                    pfVar61[2] = auVar82._8_4_ * fVar30;
                    pfVar61[3] = auVar82._12_4_ * fVar31;
                    pfVar62 = pfVar62 + 4;
                    pfVar61 = pfVar61 + 4;
                    uVar67 = (int)uVar47 - 1;
                    uVar47 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                pauVar52 = pauVar52 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            fVar205 = 1.0 / *local_110->data;
            pvVar45 = local_120->data;
            lVar63 = 0;
            do {
              pfVar62 = (float *)((long)pvVar45 + lVar63);
              fVar30 = pfVar62[1];
              fVar31 = pfVar62[2];
              fVar32 = pfVar62[3];
              pfVar2 = (float *)((long)pfVar61 + lVar63);
              *pfVar2 = fVar205 * *pfVar62;
              pfVar2[1] = fVar205 * fVar30;
              pfVar2[2] = fVar205 * fVar31;
              pfVar2[3] = fVar205 * fVar32;
              lVar63 = lVar63 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar64 = (ulong)uVar7;
      if (pMVar8[1].dims != 3) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (pMVar8[1].dims == 1) {
          if ((int)local_128 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)local_118) {
              uVar47 = 0;
              auVar129._8_4_ = 0x3f800000;
              auVar129._0_8_ = 0x3f8000003f800000;
              auVar129._12_4_ = 0x3f800000;
              do {
                if (0 < (int)local_130) {
                  auVar82 = *(undefined1 (*) [16])((long)local_110->data + uVar47 * 0x10);
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar8->cstep;
                  auVar124 = vrcpps_avx(auVar82);
                  sVar12 = pMVar9->elemsize;
                  auVar82 = vfmsub213ps_fma(auVar82,auVar124,auVar129);
                  pvVar45 = pMVar9->data;
                  auVar82 = vfnmadd132ps_fma(auVar82,auVar124,auVar124);
                  sVar13 = pMVar8->elemsize;
                  pvVar60 = pMVar8->data;
                  lVar63 = 0;
                  iVar44 = (int)local_130;
                  do {
                    pfVar61 = (float *)((long)pvVar60 + lVar63 + sVar11 * sVar13 * uVar47);
                    fVar205 = pfVar61[1];
                    fVar30 = pfVar61[2];
                    fVar31 = pfVar61[3];
                    pfVar62 = (float *)((long)pvVar45 + lVar63 + sVar10 * sVar12 * uVar47);
                    *pfVar62 = auVar82._0_4_ * *pfVar61;
                    pfVar62[1] = auVar82._4_4_ * fVar205;
                    pfVar62[2] = auVar82._8_4_ * fVar30;
                    pfVar62[3] = auVar82._12_4_ * fVar31;
                    lVar63 = lVar63 + 0x10;
                    iVar44 = iVar44 + -1;
                  } while (iVar44 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != local_118);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            fVar205 = 1.0 / *pMVar8[1].data;
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar45 = pMVar9->data;
                sVar12 = pMVar8->cstep;
                sVar13 = pMVar8->elemsize;
                pvVar60 = pMVar8->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  pfVar61 = (float *)((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47);
                  auVar227._0_4_ = fVar205 * *pfVar61;
                  auVar227._4_4_ = fVar205 * pfVar61[1];
                  auVar227._8_4_ = fVar205 * pfVar61[2];
                  auVar227._12_4_ = fVar205 * pfVar61[3];
                  *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                       auVar227;
                  lVar63 = lVar63 + 0x10;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_118);
            return 0;
          }
          return 0;
        }
        if (pMVar8[1].dims != 2) {
          return 0;
        }
        if (0 < (int)local_118) {
          uVar47 = 0;
          auVar85._8_4_ = 0x3f800000;
          auVar85._0_8_ = 0x3f8000003f800000;
          auVar85._12_4_ = 0x3f800000;
          do {
            if (0 < (int)uVar6) {
              pfVar61 = (float *)(pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar52 = (undefined1 (*) [16])
                         ((long)pMVar8[1].w * uVar47 * pMVar8[1].elemsize + (long)pMVar8[1].data);
              pfVar62 = (float *)(pMVar8->cstep * uVar47 * pMVar8->elemsize + (long)pMVar8->data);
              uVar68 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar82 = vrcpps_avx(*pauVar52);
                  auVar124 = vfmsub213ps_fma(*pauVar52,auVar82,auVar85);
                  auVar82 = vfnmadd132ps_fma(auVar124,auVar82,auVar82);
                  uVar49 = uVar48;
                  do {
                    fVar205 = pfVar62[1];
                    fVar30 = pfVar62[2];
                    fVar31 = pfVar62[3];
                    *pfVar61 = auVar82._0_4_ * *pfVar62;
                    pfVar61[1] = auVar82._4_4_ * fVar205;
                    pfVar61[2] = auVar82._8_4_ * fVar30;
                    pfVar61[3] = auVar82._12_4_ * fVar31;
                    pfVar62 = pfVar62 + 4;
                    pfVar61 = pfVar61 + 4;
                    uVar67 = (int)uVar49 - 1;
                    uVar49 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                pauVar52 = pauVar52 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != local_118);
          return 0;
        }
        return 0;
      }
      if (uVar66 == uVar7 && (uVar67 == 1 && (uVar68 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            auVar77._8_4_ = 0x3f800000;
            auVar77._0_8_ = 0x3f8000003f800000;
            auVar77._12_4_ = 0x3f800000;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar9->cstep;
                auVar82 = *(undefined1 (*) [16])
                           ((long)pMVar8[1].data + pMVar8[1].cstep * uVar47 * pMVar8[1].elemsize);
                auVar124 = vrcpps_avx(auVar82);
                sVar12 = pMVar8->elemsize;
                auVar82 = vfmsub213ps_fma(auVar82,auVar124,auVar77);
                pvVar45 = pMVar8->data;
                auVar82 = vfnmadd132ps_fma(auVar82,auVar124,auVar124);
                sVar13 = pMVar9->elemsize;
                pvVar60 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  pfVar61 = (float *)((long)pvVar45 + lVar63 + sVar10 * sVar12 * uVar47);
                  fVar205 = pfVar61[1];
                  fVar30 = pfVar61[2];
                  fVar31 = pfVar61[3];
                  pfVar62 = (float *)((long)pvVar60 + lVar63 + sVar11 * sVar13 * uVar47);
                  *pfVar62 = auVar82._0_4_ * *pfVar61;
                  pfVar62[1] = auVar82._4_4_ * fVar205;
                  pfVar62[2] = auVar82._8_4_ * fVar30;
                  pfVar62[3] = auVar82._12_4_ * fVar31;
                  lVar63 = lVar63 + 0x10;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_f0 = sVar10;
      if ((uVar68 == uVar69) && (iVar46 == 1 && (uVar66 == 1 && uVar67 == uVar6))) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8->data;
                pvVar60 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  fVar205 = 1.0 / *(float *)((long)pvVar60 + lVar63);
                  pfVar61 = (float *)((long)pvVar45 + lVar63 * 4 + sVar10 * sVar11 * uVar47);
                  auVar217._0_4_ = fVar205 * *pfVar61;
                  auVar217._4_4_ = fVar205 * pfVar61[1];
                  auVar217._8_4_ = fVar205 * pfVar61[2];
                  auVar217._12_4_ = fVar205 * pfVar61[3];
                  *(undefined1 (*) [16])((long)pvVar65 + lVar63 * 4 + sVar12 * sVar13 * uVar47) =
                       auVar217;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar69 ^ 1) == 0) && uVar7 == uVar66) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar82 = *(undefined1 (*) [16])
                           ((long)pMVar8->data + pMVar8->cstep * uVar48 * pMVar8->elemsize);
                pvVar45 = pMVar9->data;
                sVar12 = pMVar8[1].cstep;
                sVar13 = pMVar8[1].elemsize;
                pvVar60 = pMVar8[1].data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  auVar124 = *(undefined1 (*) [16])
                              ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48);
                  auVar270 = vrcpps_avx(auVar124);
                  auVar281._0_4_ = auVar82._0_4_ * auVar270._0_4_;
                  auVar281._4_4_ = auVar82._4_4_ * auVar270._4_4_;
                  auVar281._8_4_ = auVar82._8_4_ * auVar270._8_4_;
                  auVar281._12_4_ = auVar82._12_4_ * auVar270._12_4_;
                  auVar124 = vfmsub213ps_fma(auVar124,auVar281,auVar82);
                  auVar124 = vfnmadd213ps_fma(auVar124,auVar270,auVar281);
                  *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) =
                       auVar124;
                  lVar63 = lVar63 + 0x10;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar68 == uVar69) && (iVar44 == 1)) && (uVar67 == uVar6)) && (uVar7 == 1)) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8[1].data;
                pvVar60 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  fVar205 = *(float *)((long)pvVar60 + lVar63);
                  auVar111._4_4_ = fVar205;
                  auVar111._0_4_ = fVar205;
                  auVar111._8_4_ = fVar205;
                  auVar111._12_4_ = fVar205;
                  auVar82 = *(undefined1 (*) [16])
                             ((long)pvVar45 + lVar63 * 4 + sVar10 * sVar11 * uVar48);
                  auVar124 = vrcpps_avx(auVar82);
                  auVar286._0_4_ = fVar205 * auVar124._0_4_;
                  auVar286._4_4_ = fVar205 * auVar124._4_4_;
                  auVar286._8_4_ = fVar205 * auVar124._8_4_;
                  auVar286._12_4_ = fVar205 * auVar124._12_4_;
                  auVar82 = vfmsub213ps_fma(auVar82,auVar286,auVar111);
                  auVar82 = vfnmadd213ps_fma(auVar82,auVar124,auVar286);
                  *(undefined1 (*) [16])((long)pvVar65 + lVar63 * 4 + sVar12 * sVar13 * uVar48) =
                       auVar82;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar47;
      if ((((uVar68 ^ 1) == 0 && uVar67 == uVar6) && uVar7 == uVar66) && uVar69 != 1) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar49 = 0;
            auVar116._8_4_ = 0x3f800000;
            auVar116._0_8_ = 0x3f8000003f800000;
            auVar116._12_4_ = 0x3f800000;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar45 = local_120[1].data;
                pfVar61 = (float *)(pMVar9->cstep * uVar49 * pMVar9->elemsize + (long)pMVar9->data);
                pfVar62 = (float *)(local_120->cstep * uVar49 * local_120->elemsize +
                                   (long)local_120->data);
                uVar64 = 0;
                do {
                  if (0 < (int)uVar69) {
                    auVar82 = *(undefined1 (*) [16])
                               ((long)pvVar45 + uVar64 * 0x10 + sVar10 * uVar49 * sVar11);
                    auVar124 = vrcpps_avx(auVar82);
                    auVar82 = vfmsub213ps_fma(auVar82,auVar124,auVar116);
                    auVar82 = vfnmadd132ps_fma(auVar82,auVar124,auVar124);
                    uVar70 = uVar48;
                    do {
                      fVar205 = pfVar62[1];
                      fVar30 = pfVar62[2];
                      fVar31 = pfVar62[3];
                      *pfVar61 = auVar82._0_4_ * *pfVar62;
                      pfVar61[1] = auVar82._4_4_ * fVar205;
                      pfVar61[2] = auVar82._8_4_ * fVar30;
                      pfVar61[3] = auVar82._12_4_ * fVar31;
                      pfVar62 = pfVar62 + 4;
                      pfVar61 = pfVar61 + 4;
                      uVar68 = (int)uVar70 - 1;
                      uVar70 = (ulong)uVar68;
                    } while (uVar68 != 0);
                  }
                  uVar64 = uVar64 + 1;
                } while (uVar64 != uVar6);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar67 == 1 && (uVar68 ^ uVar69) == 0) && uVar66 == uVar7) && uVar6 != 1) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)local_100) {
            uVar47 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar60 = (void *)(pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar65 = (void *)(local_120->cstep * uVar47 * local_120->elemsize +
                                  (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar45 = local_120[1].data;
                uVar68 = 0;
                do {
                  if (0 < (int)uVar69) {
                    lVar63 = 0;
                    do {
                      auVar82 = *(undefined1 (*) [16])((long)pvVar65 + lVar63);
                      auVar124 = *(undefined1 (*) [16])
                                  ((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47);
                      auVar270 = vrcpps_avx(auVar124);
                      auVar290._0_4_ = auVar82._0_4_ * auVar270._0_4_;
                      auVar290._4_4_ = auVar82._4_4_ * auVar270._4_4_;
                      auVar290._8_4_ = auVar82._8_4_ * auVar270._8_4_;
                      auVar290._12_4_ = auVar82._12_4_ * auVar270._12_4_;
                      auVar82 = vfmsub213ps_fma(auVar124,auVar290,auVar82);
                      auVar82 = vfnmadd213ps_fma(auVar82,auVar270,auVar290);
                      *(undefined1 (*) [16])((long)pvVar60 + lVar63) = auVar82;
                      lVar63 = lVar63 + 0x10;
                    } while (uVar48 << 4 != lVar63);
                    pvVar60 = (void *)((long)pvVar60 + lVar63);
                    pvVar65 = (void *)((long)pvVar65 + lVar63);
                  }
                  uVar68 = uVar68 + 1;
                } while (uVar68 != uVar6);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar69 ^ 1) == 0 && uVar6 == uVar67) && uVar66 == uVar7) && uVar68 != 1) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)local_100) {
            uVar47 = 0;
            do {
              if (0 < (int)uVar67) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar45 = local_120->data;
                pauVar52 = (undefined1 (*) [16])
                           (pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar59 = (undefined1 (*) [16])
                           (local_120[1].cstep * uVar47 * local_120[1].elemsize +
                           (long)local_120[1].data);
                uVar48 = 0;
                do {
                  if (0 < (int)uVar68) {
                    auVar82 = *(undefined1 (*) [16])
                               ((long)pvVar45 + uVar48 * 0x10 + sVar10 * uVar47 * sVar11);
                    uVar69 = uVar68;
                    do {
                      auVar124 = vrcpps_avx(*pauVar59);
                      auVar295._0_4_ = auVar82._0_4_ * auVar124._0_4_;
                      auVar295._4_4_ = auVar82._4_4_ * auVar124._4_4_;
                      auVar295._8_4_ = auVar82._8_4_ * auVar124._8_4_;
                      auVar295._12_4_ = auVar82._12_4_ * auVar124._12_4_;
                      auVar270 = vfmsub213ps_fma(*pauVar59,auVar295,auVar82);
                      auVar124 = vfnmadd213ps_fma(auVar270,auVar124,auVar295);
                      *pauVar52 = auVar124;
                      pauVar59 = pauVar59 + 1;
                      pauVar52 = pauVar52 + 1;
                      uVar69 = uVar69 - 1;
                    } while (uVar69 != 0);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar67);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar68 ^ uVar69) == 0 && uVar6 == 1) && uVar66 == uVar7) && uVar67 != 1) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_100) {
            local_128 = (void *)(uVar49 << 4);
            iVar44 = 0;
            do {
              Mat::channel((Mat *)local_e0,local_120,iVar44);
              auVar43 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar44);
              auVar54 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar44);
              auVar74 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar67) {
                uVar69 = 0;
                do {
                  if (0 < (int)uVar68) {
                    lVar63 = 0;
                    do {
                      auVar82 = *(undefined1 (*) [16])((long)auVar43 + lVar63);
                      auVar124 = vrcpps_avx(*(undefined1 (*) [16])((long)auVar54 + lVar63));
                      auVar297._0_4_ = auVar82._0_4_ * auVar124._0_4_;
                      auVar297._4_4_ = auVar82._4_4_ * auVar124._4_4_;
                      auVar297._8_4_ = auVar82._8_4_ * auVar124._8_4_;
                      auVar297._12_4_ = auVar82._12_4_ * auVar124._12_4_;
                      auVar82 = vfmsub213ps_fma(*(undefined1 (*) [16])((long)auVar54 + lVar63),
                                                auVar297,auVar82);
                      auVar82 = vfnmadd213ps_fma(auVar82,auVar124,auVar297);
                      *(undefined1 (*) [16])((long)auVar74 + lVar63) = auVar82;
                      lVar63 = lVar63 + 0x10;
                    } while (local_128 != (void *)lVar63);
                    auVar74 = (undefined1  [8])((long)auVar74 + lVar63);
                    auVar54 = (undefined1  [8])((long)auVar54 + lVar63);
                  }
                  uVar69 = uVar69 + 1;
                } while (uVar69 != uVar67);
              }
              iVar44 = iVar44 + 1;
            } while (iVar44 != (int)local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_118 = uVar64;
      Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_118) {
          iVar44 = 0;
          do {
            pMVar9 = local_108;
            Mat::channel((Mat *)local_e0,local_120,iVar44);
            auVar43 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar44);
            auVar54 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar44);
            auVar74 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_130) {
              lVar63 = 0;
              iVar46 = (int)local_130;
              do {
                auVar82 = *(undefined1 (*) [16])((long)auVar43 + lVar63);
                auVar124 = vrcpps_avx(*(undefined1 (*) [16])((long)auVar54 + lVar63));
                auVar299._0_4_ = auVar82._0_4_ * auVar124._0_4_;
                auVar299._4_4_ = auVar82._4_4_ * auVar124._4_4_;
                auVar299._8_4_ = auVar82._8_4_ * auVar124._8_4_;
                auVar299._12_4_ = auVar82._12_4_ * auVar124._12_4_;
                auVar82 = vfmsub213ps_fma(*(undefined1 (*) [16])((long)auVar54 + lVar63),auVar299,
                                          auVar82);
                auVar82 = vfnmadd213ps_fma(auVar82,auVar124,auVar299);
                *(undefined1 (*) [16])((long)auVar74 + lVar63) = auVar82;
                lVar63 = lVar63 + 0x10;
                iVar46 = iVar46 + -1;
              } while (iVar46 != 0);
            }
            iVar44 = iVar44 + 1;
          } while (iVar44 != (int)local_118);
          return 0;
        }
        return 0;
      }
      return -100;
    case 4:
      uVar69 = pMVar8->w;
      uVar48 = (ulong)uVar69;
      sVar10 = pMVar8->elemsize;
      uVar68 = pMVar8[1].w;
      uVar49 = (ulong)uVar68;
      uVar67 = pMVar8[1].h;
      uVar66 = pMVar8[1].c;
      uVar47 = (ulong)uVar66;
      iVar53 = uVar67 * uVar68;
      local_f8 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar44 == 1 && uVar69 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar68,local_f8,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar68) {
                uVar4 = *pMVar8->data;
                auVar100._4_4_ = uVar4;
                auVar100._0_4_ = uVar4;
                auVar100._8_4_ = uVar4;
                auVar100._12_4_ = uVar4;
                pvVar60 = pMVar1->data;
                lVar63 = 0;
                do {
                  auVar82 = vmaxps_avx(auVar100,*(undefined1 (*) [16])((long)pvVar60 + lVar63));
                  *(undefined1 (*) [16])((long)pvVar45 + lVar63) = auVar82;
                  lVar63 = lVar63 + 0x10;
                  uVar69 = (int)uVar49 - 1;
                  uVar49 = (ulong)uVar69;
                } while (uVar69 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar68,uVar67,local_f8,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < iVar53) {
                uVar4 = *pMVar8->data;
                auVar99._4_4_ = uVar4;
                auVar99._0_4_ = uVar4;
                auVar99._8_4_ = uVar4;
                auVar99._12_4_ = uVar4;
                pvVar60 = local_110->data;
                lVar63 = 0;
                do {
                  auVar82 = vmaxps_avx(auVar99,*(undefined1 (*) [16])((long)pvVar60 + lVar63));
                  *(undefined1 (*) [16])((long)pvVar45 + lVar63) = auVar82;
                  lVar63 = lVar63 + 0x10;
                  iVar53 = iVar53 + -1;
                } while (iVar53 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar66) {
                uVar4 = *pMVar8->data;
                auVar78._4_4_ = uVar4;
                auVar78._0_4_ = uVar4;
                auVar78._8_4_ = uVar4;
                auVar78._12_4_ = uVar4;
                uVar48 = 0;
                do {
                  if (0 < iVar53) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar45 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar60 = pMVar8[1].data;
                    lVar63 = 0;
                    iVar44 = iVar53;
                    do {
                      auVar82 = vmaxps_avx(auVar78,*(undefined1 (*) [16])
                                                    ((long)pvVar60 +
                                                    lVar63 + sVar12 * sVar13 * uVar48));
                      *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) =
                           auVar82;
                      lVar63 = lVar63 + 0x10;
                      iVar44 = iVar44 + -1;
                    } while (iVar44 != 0);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar47);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar69,sVar10,iVar44,opt->blob_allocator);
          pvVar45 = pMVar9->data;
          if (pvVar45 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar46 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar69) {
              pvVar60 = pMVar8->data;
              pvVar65 = pMVar8[1].data;
              lVar63 = 0;
              do {
                auVar82 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar60 + lVar63),
                                     *(undefined1 (*) [16])((long)pvVar65 + lVar63));
                *(undefined1 (*) [16])((long)pvVar45 + lVar63) = auVar82;
                lVar63 = lVar63 + 0x10;
                uVar69 = (int)uVar48 - 1;
                uVar48 = (ulong)uVar69;
              } while (uVar69 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar69) {
            uVar4 = *local_110->data;
            auVar93._4_4_ = uVar4;
            auVar93._0_4_ = uVar4;
            auVar93._8_4_ = uVar4;
            auVar93._12_4_ = uVar4;
            pvVar60 = pMVar8->data;
            lVar63 = 0;
            do {
              auVar82 = vmaxps_avx(auVar93,*(undefined1 (*) [16])((long)pvVar60 + lVar63));
              *(undefined1 (*) [16])((long)pvVar45 + lVar63) = auVar82;
              lVar63 = lVar63 + 0x10;
              uVar69 = (int)uVar48 - 1;
              uVar48 = (ulong)uVar69;
            } while (uVar69 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar68,uVar67,local_f8,iVar46,opt->blob_allocator);
          pauVar52 = (undefined1 (*) [16])pMVar9->data;
          if (pauVar52 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar67) {
              pauVar59 = (undefined1 (*) [16])pMVar8->data;
              pauVar57 = (undefined1 (*) [16])pMVar8[1].data;
              uVar69 = 0;
              do {
                if (0 < (int)uVar68) {
                  auVar82 = *pauVar59;
                  uVar66 = uVar68;
                  do {
                    auVar124 = vmaxps_avx(auVar82,*pauVar57);
                    *pauVar52 = auVar124;
                    pauVar57 = pauVar57 + 1;
                    pauVar52 = pauVar52 + 1;
                    uVar66 = uVar66 - 1;
                  } while (uVar66 != 0);
                }
                pauVar59 = pauVar59 + 1;
                uVar69 = uVar69 + 1;
              } while (uVar69 != uVar67);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar66) {
          uVar48 = 0;
          do {
            if (0 < iVar53) {
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar9->elemsize;
              auVar82 = *(undefined1 (*) [16])((long)pMVar8->data + uVar48 * 0x10);
              pvVar45 = pMVar9->data;
              sVar12 = pMVar8[1].cstep;
              sVar13 = pMVar8[1].elemsize;
              pvVar60 = pMVar8[1].data;
              lVar63 = 0;
              iVar44 = iVar53;
              do {
                auVar124 = vmaxps_avx(auVar82,*(undefined1 (*) [16])
                                               ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48));
                *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) = auVar124
                ;
                lVar63 = lVar63 + 0x10;
                iVar44 = iVar44 + -1;
              } while (iVar44 != 0);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar47);
          return 0;
        }
        return 0;
      }
      local_118 = CONCAT44(local_118._4_4_,iVar53);
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar46);
      uVar6 = pMVar8->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar6 * uVar69);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar66) {
              uVar48 = 0;
              do {
                if (0 < (int)uVar67) {
                  pauVar52 = (undefined1 (*) [16])
                             (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                  pauVar59 = (undefined1 (*) [16])
                             (local_120[1].cstep * uVar48 * local_120[1].elemsize +
                             (long)local_120[1].data);
                  pauVar57 = (undefined1 (*) [16])
                             ((long)local_120->w * uVar48 * local_120->elemsize +
                             (long)local_120->data);
                  uVar69 = 0;
                  do {
                    if (0 < (int)uVar68) {
                      auVar82 = *pauVar57;
                      uVar66 = uVar68;
                      do {
                        auVar124 = vmaxps_avx(auVar82,*pauVar59);
                        *pauVar52 = auVar124;
                        pauVar59 = pauVar59 + 1;
                        pauVar52 = pauVar52 + 1;
                        uVar66 = uVar66 - 1;
                      } while (uVar66 != 0);
                    }
                    pauVar57 = pauVar57 + 1;
                    uVar69 = uVar69 + 1;
                  } while (uVar69 != uVar67);
                }
                uVar48 = uVar48 + 1;
              } while (uVar48 != uVar47);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pvVar45 = pMVar9->data;
        if (pvVar45 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar60 = local_120->data;
            pvVar65 = local_120[1].data;
            lVar63 = 0;
            do {
              auVar82 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar60 + lVar63),
                                   *(undefined1 (*) [16])((long)pvVar65 + lVar63));
              *(undefined1 (*) [16])((long)pvVar45 + lVar63) = auVar82;
              lVar63 = lVar63 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pauVar52 = (undefined1 (*) [16])pMVar9->data;
        if (pauVar52 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pauVar59 = (undefined1 (*) [16])local_120->data;
              pauVar57 = (undefined1 (*) [16])local_120[1].data;
              uVar68 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar82 = *pauVar57;
                  uVar47 = uVar48;
                  do {
                    auVar124 = vmaxps_avx(auVar82,*pauVar59);
                    *pauVar52 = auVar124;
                    pauVar59 = pauVar59 + 1;
                    pauVar52 = pauVar52 + 1;
                    uVar67 = (int)uVar47 - 1;
                    uVar47 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                pauVar57 = pauVar57 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            uVar4 = *local_110->data;
            auVar117._4_4_ = uVar4;
            auVar117._0_4_ = uVar4;
            auVar117._8_4_ = uVar4;
            auVar117._12_4_ = uVar4;
            pvVar45 = local_120->data;
            lVar63 = 0;
            do {
              auVar82 = vmaxps_avx(auVar117,*(undefined1 (*) [16])((long)pvVar45 + lVar63));
              *(undefined1 (*) [16])((long)*pauVar52 + lVar63) = auVar82;
              lVar63 = lVar63 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar64 = (ulong)uVar7;
      if (pMVar8[1].dims != 3) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (pMVar8[1].dims == 1) {
          if ((int)local_128 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)local_118) {
              uVar47 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  auVar82 = *(undefined1 (*) [16])((long)local_110->data + uVar47 * 0x10);
                  pvVar45 = pMVar9->data;
                  sVar12 = pMVar8->cstep;
                  sVar13 = pMVar8->elemsize;
                  pvVar60 = pMVar8->data;
                  lVar63 = 0;
                  iVar44 = (int)local_130;
                  do {
                    auVar124 = vmaxps_avx(auVar82,*(undefined1 (*) [16])
                                                   ((long)pvVar60 +
                                                   lVar63 + sVar12 * sVar13 * uVar47));
                    *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                         auVar124;
                    lVar63 = lVar63 + 0x10;
                    iVar44 = iVar44 + -1;
                  } while (iVar44 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != local_118);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            uVar4 = *local_110->data;
            auVar118._4_4_ = uVar4;
            auVar118._0_4_ = uVar4;
            auVar118._8_4_ = uVar4;
            auVar118._12_4_ = uVar4;
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar45 = pMVar9->data;
                sVar12 = pMVar8->cstep;
                sVar13 = pMVar8->elemsize;
                pvVar60 = pMVar8->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  auVar82 = vmaxps_avx(auVar118,*(undefined1 (*) [16])
                                                 ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47)
                                      );
                  *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                       auVar82;
                  lVar63 = lVar63 + 0x10;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_118);
            return 0;
          }
          return 0;
        }
        if (pMVar8[1].dims != 2) {
          return 0;
        }
        if (0 < (int)local_118) {
          uVar47 = 0;
          do {
            if (0 < (int)uVar6) {
              pauVar52 = (undefined1 (*) [16])
                         (pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar59 = (undefined1 (*) [16])
                         ((long)pMVar8[1].w * uVar47 * pMVar8[1].elemsize + (long)pMVar8[1].data);
              pauVar57 = (undefined1 (*) [16])
                         (pMVar8->cstep * uVar47 * pMVar8->elemsize + (long)pMVar8->data);
              uVar68 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar82 = *pauVar59;
                  uVar49 = uVar48;
                  do {
                    auVar124 = vmaxps_avx(auVar82,*pauVar57);
                    *pauVar52 = auVar124;
                    pauVar57 = pauVar57 + 1;
                    pauVar52 = pauVar52 + 1;
                    uVar67 = (int)uVar49 - 1;
                    uVar49 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                pauVar59 = pauVar59 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != local_118);
          return 0;
        }
        return 0;
      }
      if (uVar66 == uVar7 && (uVar67 == 1 && (uVar68 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                auVar82 = *(undefined1 (*) [16])
                           ((long)pMVar8[1].data + pMVar8[1].cstep * uVar47 * pMVar8[1].elemsize);
                pvVar45 = pMVar8->data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar60 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  auVar124 = vmaxps_avx(auVar82,*(undefined1 (*) [16])
                                                 ((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47)
                                       );
                  *(undefined1 (*) [16])((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47) =
                       auVar124;
                  lVar63 = lVar63 + 0x10;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_f0 = sVar10;
      if ((uVar68 == uVar69) && (iVar46 == 1 && (uVar66 == 1 && uVar67 == uVar6))) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8->data;
                pvVar60 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar60 + lVar63);
                  auVar86._4_4_ = uVar4;
                  auVar86._0_4_ = uVar4;
                  auVar86._8_4_ = uVar4;
                  auVar86._12_4_ = uVar4;
                  auVar82 = vmaxps_avx(auVar86,*(undefined1 (*) [16])
                                                ((long)pvVar45 +
                                                lVar63 * 4 + sVar10 * sVar11 * uVar47));
                  *(undefined1 (*) [16])((long)pvVar65 + lVar63 * 4 + sVar12 * sVar13 * uVar47) =
                       auVar82;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar69 ^ 1) == 0) && uVar7 == uVar66) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar82 = *(undefined1 (*) [16])
                           ((long)pMVar8->data + pMVar8->cstep * uVar48 * pMVar8->elemsize);
                pvVar45 = pMVar9->data;
                sVar12 = pMVar8[1].cstep;
                sVar13 = pMVar8[1].elemsize;
                pvVar60 = pMVar8[1].data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  auVar124 = vmaxps_avx(auVar82,*(undefined1 (*) [16])
                                                 ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48)
                                       );
                  *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) =
                       auVar124;
                  lVar63 = lVar63 + 0x10;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar68 == uVar69) && (iVar44 == 1)) && ((uVar67 == uVar6 && (uVar7 == 1)))) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8[1].data;
                pvVar60 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar60 + lVar63);
                  auVar109._4_4_ = uVar4;
                  auVar109._0_4_ = uVar4;
                  auVar109._8_4_ = uVar4;
                  auVar109._12_4_ = uVar4;
                  auVar82 = vmaxps_avx(auVar109,*(undefined1 (*) [16])
                                                 ((long)pvVar45 +
                                                 lVar63 * 4 + sVar10 * sVar11 * uVar48));
                  *(undefined1 (*) [16])((long)pvVar65 + lVar63 * 4 + sVar12 * sVar13 * uVar48) =
                       auVar82;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar47;
      if ((((uVar68 ^ 1) == 0 && uVar67 == uVar6) && uVar7 == uVar66) && uVar69 != 1) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar49 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar45 = local_120[1].data;
                pauVar52 = (undefined1 (*) [16])
                           (pMVar9->cstep * uVar49 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar59 = (undefined1 (*) [16])
                           (local_120->cstep * uVar49 * local_120->elemsize + (long)local_120->data)
                ;
                uVar64 = 0;
                do {
                  if (0 < (int)uVar69) {
                    auVar82 = *(undefined1 (*) [16])
                               ((long)pvVar45 + uVar64 * 0x10 + sVar10 * uVar49 * sVar11);
                    uVar70 = uVar48;
                    do {
                      auVar124 = vmaxps_avx(auVar82,*pauVar59);
                      *pauVar52 = auVar124;
                      pauVar59 = pauVar59 + 1;
                      pauVar52 = pauVar52 + 1;
                      uVar68 = (int)uVar70 - 1;
                      uVar70 = (ulong)uVar68;
                    } while (uVar68 != 0);
                  }
                  uVar64 = uVar64 + 1;
                } while (uVar64 != uVar6);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar67 == 1 && (uVar68 ^ uVar69) == 0) && uVar66 == uVar7) && uVar6 != 1) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)local_100) {
            uVar47 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar60 = (void *)(pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar65 = (void *)(local_120->cstep * uVar47 * local_120->elemsize +
                                  (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar45 = local_120[1].data;
                uVar68 = 0;
                do {
                  if (0 < (int)uVar69) {
                    lVar63 = 0;
                    do {
                      auVar82 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar65 + lVar63),
                                           *(undefined1 (*) [16])
                                            ((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47));
                      *(undefined1 (*) [16])((long)pvVar60 + lVar63) = auVar82;
                      lVar63 = lVar63 + 0x10;
                    } while (uVar48 << 4 != lVar63);
                    pvVar60 = (void *)((long)pvVar60 + lVar63);
                    pvVar65 = (void *)((long)pvVar65 + lVar63);
                  }
                  uVar68 = uVar68 + 1;
                } while (uVar68 != uVar6);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar69 ^ 1) == 0 && uVar6 == uVar67) && uVar66 == uVar7) && uVar68 != 1) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)local_100) {
            uVar47 = 0;
            do {
              if (0 < (int)uVar67) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar45 = local_120->data;
                pauVar52 = (undefined1 (*) [16])
                           (pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar59 = (undefined1 (*) [16])
                           (local_120[1].cstep * uVar47 * local_120[1].elemsize +
                           (long)local_120[1].data);
                uVar48 = 0;
                do {
                  if (0 < (int)uVar68) {
                    auVar82 = *(undefined1 (*) [16])
                               ((long)pvVar45 + uVar48 * 0x10 + sVar10 * uVar47 * sVar11);
                    uVar69 = uVar68;
                    do {
                      auVar124 = vmaxps_avx(auVar82,*pauVar59);
                      *pauVar52 = auVar124;
                      pauVar59 = pauVar59 + 1;
                      pauVar52 = pauVar52 + 1;
                      uVar69 = uVar69 - 1;
                    } while (uVar69 != 0);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar67);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar68 ^ uVar69) == 0 && uVar6 == 1) && uVar7 == uVar66) && uVar67 != 1) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_100) {
            local_128 = (void *)(uVar49 << 4);
            iVar44 = 0;
            do {
              Mat::channel((Mat *)local_e0,local_120,iVar44);
              auVar43 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar44);
              auVar54 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar44);
              auVar74 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar67) {
                uVar69 = 0;
                do {
                  if (0 < (int)uVar68) {
                    lVar63 = 0;
                    do {
                      auVar82 = vmaxps_avx(*(undefined1 (*) [16])((long)auVar43 + lVar63),
                                           *(undefined1 (*) [16])((long)auVar54 + lVar63));
                      *(undefined1 (*) [16])((long)auVar74 + lVar63) = auVar82;
                      lVar63 = lVar63 + 0x10;
                    } while (local_128 != (void *)lVar63);
                    auVar74 = (undefined1  [8])((long)auVar74 + lVar63);
                    auVar54 = (undefined1  [8])((long)auVar54 + lVar63);
                  }
                  uVar69 = uVar69 + 1;
                } while (uVar69 != uVar67);
              }
              iVar44 = iVar44 + 1;
            } while (iVar44 != (int)local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_118 = uVar64;
      Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_118) {
          iVar44 = 0;
          do {
            pMVar9 = local_108;
            Mat::channel((Mat *)local_e0,local_120,iVar44);
            auVar43 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar44);
            auVar54 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar44);
            auVar74 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_130) {
              lVar63 = 0;
              iVar46 = (int)local_130;
              do {
                auVar82 = vmaxps_avx(*(undefined1 (*) [16])((long)auVar43 + lVar63),
                                     *(undefined1 (*) [16])((long)auVar54 + lVar63));
                *(undefined1 (*) [16])((long)auVar74 + lVar63) = auVar82;
                lVar63 = lVar63 + 0x10;
                iVar46 = iVar46 + -1;
              } while (iVar46 != 0);
            }
            iVar44 = iVar44 + 1;
          } while (iVar44 != (int)local_118);
          return 0;
        }
        return 0;
      }
      return -100;
    case 5:
      uVar69 = pMVar8->w;
      uVar48 = (ulong)uVar69;
      sVar10 = pMVar8->elemsize;
      uVar68 = pMVar8[1].w;
      uVar49 = (ulong)uVar68;
      uVar67 = pMVar8[1].h;
      uVar66 = pMVar8[1].c;
      uVar47 = (ulong)uVar66;
      iVar53 = uVar67 * uVar68;
      local_f8 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar44 == 1 && uVar69 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar68,local_f8,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar68) {
                uVar4 = *pMVar8->data;
                auVar108._4_4_ = uVar4;
                auVar108._0_4_ = uVar4;
                auVar108._8_4_ = uVar4;
                auVar108._12_4_ = uVar4;
                pvVar60 = pMVar1->data;
                lVar63 = 0;
                do {
                  auVar82 = vminps_avx(auVar108,*(undefined1 (*) [16])((long)pvVar60 + lVar63));
                  *(undefined1 (*) [16])((long)pvVar45 + lVar63) = auVar82;
                  lVar63 = lVar63 + 0x10;
                  uVar69 = (int)uVar49 - 1;
                  uVar49 = (ulong)uVar69;
                } while (uVar69 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar68,uVar67,local_f8,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < iVar53) {
                uVar4 = *pMVar8->data;
                auVar107._4_4_ = uVar4;
                auVar107._0_4_ = uVar4;
                auVar107._8_4_ = uVar4;
                auVar107._12_4_ = uVar4;
                pvVar60 = local_110->data;
                lVar63 = 0;
                do {
                  auVar82 = vminps_avx(auVar107,*(undefined1 (*) [16])((long)pvVar60 + lVar63));
                  *(undefined1 (*) [16])((long)pvVar45 + lVar63) = auVar82;
                  lVar63 = lVar63 + 0x10;
                  iVar53 = iVar53 + -1;
                } while (iVar53 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar66) {
                uVar4 = *pMVar8->data;
                auVar83._4_4_ = uVar4;
                auVar83._0_4_ = uVar4;
                auVar83._8_4_ = uVar4;
                auVar83._12_4_ = uVar4;
                uVar48 = 0;
                do {
                  if (0 < iVar53) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar45 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar60 = pMVar8[1].data;
                    lVar63 = 0;
                    iVar44 = iVar53;
                    do {
                      auVar82 = vminps_avx(auVar83,*(undefined1 (*) [16])
                                                    ((long)pvVar60 +
                                                    lVar63 + sVar12 * sVar13 * uVar48));
                      *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) =
                           auVar82;
                      lVar63 = lVar63 + 0x10;
                      iVar44 = iVar44 + -1;
                    } while (iVar44 != 0);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar47);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar69,sVar10,iVar44,opt->blob_allocator);
          pvVar45 = pMVar9->data;
          if (pvVar45 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar46 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar69) {
              pvVar60 = pMVar8->data;
              pvVar65 = pMVar8[1].data;
              lVar63 = 0;
              do {
                auVar82 = vminps_avx(*(undefined1 (*) [16])((long)pvVar60 + lVar63),
                                     *(undefined1 (*) [16])((long)pvVar65 + lVar63));
                *(undefined1 (*) [16])((long)pvVar45 + lVar63) = auVar82;
                lVar63 = lVar63 + 0x10;
                uVar69 = (int)uVar48 - 1;
                uVar48 = (ulong)uVar69;
              } while (uVar69 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar69) {
            uVar4 = *local_110->data;
            auVar97._4_4_ = uVar4;
            auVar97._0_4_ = uVar4;
            auVar97._8_4_ = uVar4;
            auVar97._12_4_ = uVar4;
            pvVar60 = pMVar8->data;
            lVar63 = 0;
            do {
              auVar82 = vminps_avx(auVar97,*(undefined1 (*) [16])((long)pvVar60 + lVar63));
              *(undefined1 (*) [16])((long)pvVar45 + lVar63) = auVar82;
              lVar63 = lVar63 + 0x10;
              uVar69 = (int)uVar48 - 1;
              uVar48 = (ulong)uVar69;
            } while (uVar69 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar68,uVar67,local_f8,iVar46,opt->blob_allocator);
          pauVar52 = (undefined1 (*) [16])pMVar9->data;
          if (pauVar52 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar67) {
              pauVar59 = (undefined1 (*) [16])pMVar8->data;
              pauVar57 = (undefined1 (*) [16])pMVar8[1].data;
              uVar69 = 0;
              do {
                if (0 < (int)uVar68) {
                  auVar82 = *pauVar59;
                  uVar66 = uVar68;
                  do {
                    auVar124 = vminps_avx(auVar82,*pauVar57);
                    *pauVar52 = auVar124;
                    pauVar57 = pauVar57 + 1;
                    pauVar52 = pauVar52 + 1;
                    uVar66 = uVar66 - 1;
                  } while (uVar66 != 0);
                }
                pauVar59 = pauVar59 + 1;
                uVar69 = uVar69 + 1;
              } while (uVar69 != uVar67);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar66) {
          uVar48 = 0;
          do {
            if (0 < iVar53) {
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar9->elemsize;
              auVar82 = *(undefined1 (*) [16])((long)pMVar8->data + uVar48 * 0x10);
              pvVar45 = pMVar9->data;
              sVar12 = pMVar8[1].cstep;
              sVar13 = pMVar8[1].elemsize;
              pvVar60 = pMVar8[1].data;
              lVar63 = 0;
              iVar44 = iVar53;
              do {
                auVar124 = vminps_avx(auVar82,*(undefined1 (*) [16])
                                               ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48));
                *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) = auVar124
                ;
                lVar63 = lVar63 + 0x10;
                iVar44 = iVar44 + -1;
              } while (iVar44 != 0);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar47);
          return 0;
        }
        return 0;
      }
      local_118 = CONCAT44(local_118._4_4_,iVar53);
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar46);
      uVar6 = pMVar8->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar6 * uVar69);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar66) {
              uVar48 = 0;
              do {
                if (0 < (int)uVar67) {
                  pauVar52 = (undefined1 (*) [16])
                             (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                  pauVar59 = (undefined1 (*) [16])
                             (local_120[1].cstep * uVar48 * local_120[1].elemsize +
                             (long)local_120[1].data);
                  pauVar57 = (undefined1 (*) [16])
                             ((long)local_120->w * uVar48 * local_120->elemsize +
                             (long)local_120->data);
                  uVar69 = 0;
                  do {
                    if (0 < (int)uVar68) {
                      auVar82 = *pauVar57;
                      uVar66 = uVar68;
                      do {
                        auVar124 = vminps_avx(auVar82,*pauVar59);
                        *pauVar52 = auVar124;
                        pauVar59 = pauVar59 + 1;
                        pauVar52 = pauVar52 + 1;
                        uVar66 = uVar66 - 1;
                      } while (uVar66 != 0);
                    }
                    pauVar57 = pauVar57 + 1;
                    uVar69 = uVar69 + 1;
                  } while (uVar69 != uVar67);
                }
                uVar48 = uVar48 + 1;
              } while (uVar48 != uVar47);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pvVar45 = pMVar9->data;
        if (pvVar45 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar60 = local_120->data;
            pvVar65 = local_120[1].data;
            lVar63 = 0;
            do {
              auVar82 = vminps_avx(*(undefined1 (*) [16])((long)pvVar60 + lVar63),
                                   *(undefined1 (*) [16])((long)pvVar65 + lVar63));
              *(undefined1 (*) [16])((long)pvVar45 + lVar63) = auVar82;
              lVar63 = lVar63 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pauVar52 = (undefined1 (*) [16])pMVar9->data;
        if (pauVar52 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pauVar59 = (undefined1 (*) [16])local_120->data;
              pauVar57 = (undefined1 (*) [16])local_120[1].data;
              uVar68 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar82 = *pauVar57;
                  uVar47 = uVar48;
                  do {
                    auVar124 = vminps_avx(auVar82,*pauVar59);
                    *pauVar52 = auVar124;
                    pauVar59 = pauVar59 + 1;
                    pauVar52 = pauVar52 + 1;
                    uVar67 = (int)uVar47 - 1;
                    uVar47 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                pauVar57 = pauVar57 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            uVar4 = *local_110->data;
            auVar122._4_4_ = uVar4;
            auVar122._0_4_ = uVar4;
            auVar122._8_4_ = uVar4;
            auVar122._12_4_ = uVar4;
            pvVar45 = local_120->data;
            lVar63 = 0;
            do {
              auVar82 = vminps_avx(auVar122,*(undefined1 (*) [16])((long)pvVar45 + lVar63));
              *(undefined1 (*) [16])((long)*pauVar52 + lVar63) = auVar82;
              lVar63 = lVar63 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar64 = (ulong)uVar7;
      if (pMVar8[1].dims != 3) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (pMVar8[1].dims == 1) {
          if ((int)local_128 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)local_118) {
              uVar47 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  auVar82 = *(undefined1 (*) [16])((long)local_110->data + uVar47 * 0x10);
                  pvVar45 = pMVar9->data;
                  sVar12 = pMVar8->cstep;
                  sVar13 = pMVar8->elemsize;
                  pvVar60 = pMVar8->data;
                  lVar63 = 0;
                  iVar44 = (int)local_130;
                  do {
                    auVar124 = vminps_avx(auVar82,*(undefined1 (*) [16])
                                                   ((long)pvVar60 +
                                                   lVar63 + sVar12 * sVar13 * uVar47));
                    *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                         auVar124;
                    lVar63 = lVar63 + 0x10;
                    iVar44 = iVar44 + -1;
                  } while (iVar44 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != local_118);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            uVar4 = *local_110->data;
            auVar125._4_4_ = uVar4;
            auVar125._0_4_ = uVar4;
            auVar125._8_4_ = uVar4;
            auVar125._12_4_ = uVar4;
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar45 = pMVar9->data;
                sVar12 = pMVar8->cstep;
                sVar13 = pMVar8->elemsize;
                pvVar60 = pMVar8->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  auVar82 = vminps_avx(auVar125,*(undefined1 (*) [16])
                                                 ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47)
                                      );
                  *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                       auVar82;
                  lVar63 = lVar63 + 0x10;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_118);
            return 0;
          }
          return 0;
        }
        if (pMVar8[1].dims != 2) {
          return 0;
        }
        if (0 < (int)local_118) {
          uVar47 = 0;
          do {
            if (0 < (int)uVar6) {
              pauVar52 = (undefined1 (*) [16])
                         (pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar59 = (undefined1 (*) [16])
                         ((long)pMVar8[1].w * uVar47 * pMVar8[1].elemsize + (long)pMVar8[1].data);
              pauVar57 = (undefined1 (*) [16])
                         (pMVar8->cstep * uVar47 * pMVar8->elemsize + (long)pMVar8->data);
              uVar68 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar82 = *pauVar59;
                  uVar49 = uVar48;
                  do {
                    auVar124 = vminps_avx(auVar82,*pauVar57);
                    *pauVar52 = auVar124;
                    pauVar57 = pauVar57 + 1;
                    pauVar52 = pauVar52 + 1;
                    uVar67 = (int)uVar49 - 1;
                    uVar49 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                pauVar59 = pauVar59 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != local_118);
          return 0;
        }
        return 0;
      }
      if (uVar66 == uVar7 && (uVar67 == 1 && (uVar68 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                auVar82 = *(undefined1 (*) [16])
                           ((long)pMVar8[1].data + pMVar8[1].cstep * uVar47 * pMVar8[1].elemsize);
                pvVar45 = pMVar8->data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar60 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  auVar124 = vminps_avx(auVar82,*(undefined1 (*) [16])
                                                 ((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47)
                                       );
                  *(undefined1 (*) [16])((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47) =
                       auVar124;
                  lVar63 = lVar63 + 0x10;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_f0 = sVar10;
      if ((uVar68 == uVar69) && (iVar46 == 1 && (uVar66 == 1 && uVar67 == uVar6))) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8->data;
                pvVar60 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar60 + lVar63);
                  auVar90._4_4_ = uVar4;
                  auVar90._0_4_ = uVar4;
                  auVar90._8_4_ = uVar4;
                  auVar90._12_4_ = uVar4;
                  auVar82 = vminps_avx(auVar90,*(undefined1 (*) [16])
                                                ((long)pvVar45 +
                                                lVar63 * 4 + sVar10 * sVar11 * uVar47));
                  *(undefined1 (*) [16])((long)pvVar65 + lVar63 * 4 + sVar12 * sVar13 * uVar47) =
                       auVar82;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar69 ^ 1) == 0) && uVar7 == uVar66) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar82 = *(undefined1 (*) [16])
                           ((long)pMVar8->data + pMVar8->cstep * uVar48 * pMVar8->elemsize);
                pvVar45 = pMVar9->data;
                sVar12 = pMVar8[1].cstep;
                sVar13 = pMVar8[1].elemsize;
                pvVar60 = pMVar8[1].data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  auVar124 = vminps_avx(auVar82,*(undefined1 (*) [16])
                                                 ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48)
                                       );
                  *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) =
                       auVar124;
                  lVar63 = lVar63 + 0x10;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar68 == uVar69) && (iVar44 == 1)) && (uVar67 == uVar6)) && (uVar7 == 1)) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8[1].data;
                pvVar60 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar60 + lVar63);
                  auVar115._4_4_ = uVar4;
                  auVar115._0_4_ = uVar4;
                  auVar115._8_4_ = uVar4;
                  auVar115._12_4_ = uVar4;
                  auVar82 = vminps_avx(auVar115,*(undefined1 (*) [16])
                                                 ((long)pvVar45 +
                                                 lVar63 * 4 + sVar10 * sVar11 * uVar48));
                  *(undefined1 (*) [16])((long)pvVar65 + lVar63 * 4 + sVar12 * sVar13 * uVar48) =
                       auVar82;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar47;
      if ((((uVar68 ^ 1) == 0 && uVar67 == uVar6) && uVar7 == uVar66) && uVar69 != 1) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar49 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar45 = local_120[1].data;
                pauVar52 = (undefined1 (*) [16])
                           (pMVar9->cstep * uVar49 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar59 = (undefined1 (*) [16])
                           (local_120->cstep * uVar49 * local_120->elemsize + (long)local_120->data)
                ;
                uVar64 = 0;
                do {
                  if (0 < (int)uVar69) {
                    auVar82 = *(undefined1 (*) [16])
                               ((long)pvVar45 + uVar64 * 0x10 + sVar10 * uVar49 * sVar11);
                    uVar70 = uVar48;
                    do {
                      auVar124 = vminps_avx(auVar82,*pauVar59);
                      *pauVar52 = auVar124;
                      pauVar59 = pauVar59 + 1;
                      pauVar52 = pauVar52 + 1;
                      uVar68 = (int)uVar70 - 1;
                      uVar70 = (ulong)uVar68;
                    } while (uVar68 != 0);
                  }
                  uVar64 = uVar64 + 1;
                } while (uVar64 != uVar6);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar67 == 1 && (uVar68 ^ uVar69) == 0) && uVar66 == uVar7) && uVar6 != 1) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)local_100) {
            uVar47 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar60 = (void *)(pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar65 = (void *)(local_120->cstep * uVar47 * local_120->elemsize +
                                  (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar45 = local_120[1].data;
                uVar68 = 0;
                do {
                  if (0 < (int)uVar69) {
                    lVar63 = 0;
                    do {
                      auVar82 = vminps_avx(*(undefined1 (*) [16])((long)pvVar65 + lVar63),
                                           *(undefined1 (*) [16])
                                            ((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47));
                      *(undefined1 (*) [16])((long)pvVar60 + lVar63) = auVar82;
                      lVar63 = lVar63 + 0x10;
                    } while (uVar48 << 4 != lVar63);
                    pvVar60 = (void *)((long)pvVar60 + lVar63);
                    pvVar65 = (void *)((long)pvVar65 + lVar63);
                  }
                  uVar68 = uVar68 + 1;
                } while (uVar68 != uVar6);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar69 ^ 1) == 0 && uVar6 == uVar67) && uVar66 == uVar7) && uVar68 != 1) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)local_100) {
            uVar47 = 0;
            do {
              if (0 < (int)uVar67) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar45 = local_120->data;
                pauVar52 = (undefined1 (*) [16])
                           (pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar59 = (undefined1 (*) [16])
                           (local_120[1].cstep * uVar47 * local_120[1].elemsize +
                           (long)local_120[1].data);
                uVar48 = 0;
                do {
                  if (0 < (int)uVar68) {
                    auVar82 = *(undefined1 (*) [16])
                               ((long)pvVar45 + uVar48 * 0x10 + sVar10 * uVar47 * sVar11);
                    uVar69 = uVar68;
                    do {
                      auVar124 = vminps_avx(auVar82,*pauVar59);
                      *pauVar52 = auVar124;
                      pauVar59 = pauVar59 + 1;
                      pauVar52 = pauVar52 + 1;
                      uVar69 = uVar69 - 1;
                    } while (uVar69 != 0);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar67);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar68 ^ uVar69) == 0 && uVar6 == 1) && uVar7 == uVar66) && uVar67 != 1) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_100) {
            local_128 = (void *)(uVar49 << 4);
            iVar44 = 0;
            do {
              Mat::channel((Mat *)local_e0,local_120,iVar44);
              auVar43 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar44);
              auVar54 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar44);
              auVar74 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar67) {
                uVar69 = 0;
                do {
                  if (0 < (int)uVar68) {
                    lVar63 = 0;
                    do {
                      auVar82 = vminps_avx(*(undefined1 (*) [16])((long)auVar43 + lVar63),
                                           *(undefined1 (*) [16])((long)auVar54 + lVar63));
                      *(undefined1 (*) [16])((long)auVar74 + lVar63) = auVar82;
                      lVar63 = lVar63 + 0x10;
                    } while (local_128 != (void *)lVar63);
                    auVar74 = (undefined1  [8])((long)auVar74 + lVar63);
                    auVar54 = (undefined1  [8])((long)auVar54 + lVar63);
                  }
                  uVar69 = uVar69 + 1;
                } while (uVar69 != uVar67);
              }
              iVar44 = iVar44 + 1;
            } while (iVar44 != (int)local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_118 = uVar64;
      Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_118) {
          iVar44 = 0;
          do {
            pMVar9 = local_108;
            Mat::channel((Mat *)local_e0,local_120,iVar44);
            auVar43 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar44);
            auVar54 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar44);
            auVar74 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_130) {
              lVar63 = 0;
              iVar46 = (int)local_130;
              do {
                auVar82 = vminps_avx(*(undefined1 (*) [16])((long)auVar43 + lVar63),
                                     *(undefined1 (*) [16])((long)auVar54 + lVar63));
                *(undefined1 (*) [16])((long)auVar74 + lVar63) = auVar82;
                lVar63 = lVar63 + 0x10;
                iVar46 = iVar46 + -1;
              } while (iVar46 != 0);
            }
            iVar44 = iVar44 + 1;
          } while (iVar44 != (int)local_118);
          return 0;
        }
        return 0;
      }
      return -100;
    case 6:
      uVar69 = pMVar8->w;
      local_100 = (ulong)uVar69;
      sVar10 = pMVar8->elemsize;
      iVar44 = pMVar8->elempack;
      uVar68 = pMVar8[1].w;
      local_118 = (ulong)uVar68;
      uVar67 = pMVar8[1].h;
      local_130 = (void *)(ulong)uVar67;
      uVar66 = pMVar8[1].c;
      uVar47 = (ulong)uVar66;
      iVar53 = uVar67 * uVar68;
      sVar11 = pMVar8[1].elemsize;
      iVar46 = pMVar8[1].elempack;
      iVar5 = pMVar8->dims;
      local_f0 = uVar47;
      if (iVar5 == 1) {
        if (iVar44 == 1 && uVar69 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar68,sVar11,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              local_e0._4_4_ = *pMVar8->data;
              local_e0._0_4_ = local_e0._4_4_;
              fStack_d8 = (float)local_e0._4_4_;
              fStack_d4 = (float)local_e0._4_4_;
              if ((int)local_118 < 1) {
                return 0;
              }
              pvVar60 = local_110->data;
              lVar63 = 0;
              uVar47 = local_118;
              do {
                pauVar52 = (undefined1 (*) [16])((long)pvVar60 + lVar63);
                uVar201 = *(undefined8 *)(*pauVar52 + 8);
                local_80._0_16_ = *pauVar52;
                afVar330 = binary_op_pow_pack4::operator()
                                     ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0,
                                      (__m128 *)local_80);
                puVar55 = (undefined8 *)((long)pvVar45 + lVar63);
                *puVar55 = afVar330._0_8_;
                puVar55[1] = uVar201;
                lVar63 = lVar63 + 0x10;
                uVar69 = (int)uVar47 - 1;
                uVar47 = (ulong)uVar69;
              } while (uVar69 != 0);
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            local_110 = (pointer)CONCAT44(local_110._4_4_,iVar53);
            Mat::create(pMVar9,uVar68,uVar67,sVar11,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              local_e0._4_4_ = *pMVar8->data;
              local_e0._0_4_ = local_e0._4_4_;
              fStack_d8 = (float)local_e0._4_4_;
              fStack_d4 = (float)local_e0._4_4_;
              if ((int)local_110 < 1) {
                return 0;
              }
              pvVar60 = pMVar1->data;
              lVar63 = 0;
              iVar44 = (int)local_110;
              do {
                pauVar52 = (undefined1 (*) [16])((long)pvVar60 + lVar63);
                uVar201 = *(undefined8 *)(*pauVar52 + 8);
                local_80._0_16_ = *pauVar52;
                afVar330 = binary_op_pow_pack4::operator()
                                     ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0,
                                      (__m128 *)local_80);
                puVar55 = (undefined8 *)((long)pvVar45 + lVar63);
                *puVar55 = afVar330._0_8_;
                puVar55[1] = uVar201;
                lVar63 = lVar63 + 0x10;
                iVar44 = iVar44 + -1;
              } while (iVar44 != 0);
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            local_110 = (pointer)CONCAT44(local_110._4_4_,iVar53);
            Mat::create(pMVar9,uVar68,uVar67,uVar66,sVar11,iVar46,opt->blob_allocator);
            if (local_108->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_108->c * local_108->cstep != 0) {
              local_e0._4_4_ = *local_120->data;
              local_e0._0_4_ = local_e0._4_4_;
              fStack_d8 = (float)local_e0._4_4_;
              fStack_d4 = (float)local_e0._4_4_;
              if ((int)uVar66 < 1) {
                return 0;
              }
              local_130 = (void *)0x0;
              do {
                if (0 < (int)local_110) {
                  lVar63 = local_108->cstep * local_108->elemsize * (long)local_130;
                  pvVar45 = local_108->data;
                  local_128 = (void *)(local_120[1].cstep * local_120[1].elemsize * (long)local_130
                                      + (long)local_120[1].data);
                  lVar75 = 0;
                  iVar44 = (int)local_110;
                  do {
                    auVar202 = ZEXT856(*(ulong *)(*(undefined1 (*) [16])((long)local_128 + lVar75) +
                                                 8));
                    local_80._0_16_ = *(undefined1 (*) [16])((long)local_128 + lVar75);
                    afVar330 = binary_op_pow_pack4::operator()
                                         ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0,
                                          (__m128 *)local_80);
                    auVar190._0_8_ = afVar330._0_8_;
                    auVar190._8_56_ = auVar202;
                    *(undefined1 (*) [16])((long)pvVar45 + lVar75 + lVar63) = auVar190._0_16_;
                    lVar75 = lVar75 + 0x10;
                    iVar44 = iVar44 + -1;
                  } while (iVar44 != 0);
                }
                local_130 = (void *)((long)local_130 + 1);
              } while (local_130 != (void *)local_f0);
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar69,sVar10,iVar44,opt->blob_allocator);
          afVar187 = _local_e0;
          pvVar45 = pMVar9->data;
          if (pvVar45 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar46 == 1 && pMVar8[1].w == 1) {
            local_e0._4_4_ = *pMVar1->data;
            local_e0._0_4_ = local_e0._4_4_;
            fStack_d8 = (float)local_e0._4_4_;
            _fStack_d0 = afVar187._16_16_;
            fStack_d4 = (float)local_e0._4_4_;
            if (0 < (int)local_100) {
              pvVar60 = pMVar8->data;
              lVar63 = 0;
              uVar47 = local_100;
              do {
                pauVar52 = (undefined1 (*) [16])((long)pvVar60 + lVar63);
                uVar201 = *(undefined8 *)(*pauVar52 + 8);
                local_80._0_16_ = *pauVar52;
                afVar330 = binary_op_pow_pack4::operator()
                                     ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_80,
                                      (__m128 *)local_e0);
                *(undefined8 *)((long)pvVar45 + lVar63) = afVar330._0_8_;
                ((undefined8 *)((long)pvVar45 + lVar63))[1] = uVar201;
                lVar63 = lVar63 + 0x10;
                uVar69 = (int)uVar47 - 1;
                uVar47 = (ulong)uVar69;
              } while (uVar69 != 0);
            }
          }
          else {
            if ((int)local_100 < 1) {
              return 0;
            }
            pvVar60 = pMVar8->data;
            pvVar65 = pMVar8[1].data;
            lVar63 = 0;
            uVar47 = local_100;
            do {
              _local_e0 = (__m128)*(undefined1 (*) [16])((long)pvVar60 + lVar63);
              pauVar52 = (undefined1 (*) [16])((long)pvVar65 + lVar63);
              uVar201 = *(undefined8 *)(*pauVar52 + 8);
              local_80._0_16_ = *pauVar52;
              afVar330 = binary_op_pow_pack4::operator()
                                   ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0,
                                    (__m128 *)local_80);
              *(undefined8 *)((long)pvVar45 + lVar63) = afVar330._0_8_;
              ((undefined8 *)((long)pvVar45 + lVar63))[1] = uVar201;
              lVar63 = lVar63 + 0x10;
              uVar69 = (int)uVar47 - 1;
              uVar47 = (ulong)uVar69;
            } while (uVar69 != 0);
          }
        }
        else {
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar68,uVar67,sVar11,iVar46,opt->blob_allocator);
            puVar55 = (undefined8 *)pMVar9->data;
            if (puVar55 == (undefined8 *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)local_130) {
                local_140 = (__m256 *)pMVar8->data;
                pauVar52 = (undefined1 (*) [16])pMVar8[1].data;
                local_128 = (void *)((ulong)local_128._4_4_ << 0x20);
                do {
                  _local_e0 = (__m128)*(undefined1 (*) [16])local_140;
                  uVar47 = local_118 & 0xffffffff;
                  if (0 < (int)local_118) {
                    do {
                      uVar201 = *(undefined8 *)(*pauVar52 + 8);
                      local_80._0_16_ = *pauVar52;
                      afVar330 = binary_op_pow_pack4::operator()
                                           ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0,
                                            (__m128 *)local_80);
                      *puVar55 = afVar330._0_8_;
                      puVar55[1] = uVar201;
                      pauVar52 = pauVar52 + 1;
                      puVar55 = puVar55 + 2;
                      uVar69 = (int)uVar47 - 1;
                      uVar47 = (ulong)uVar69;
                    } while (uVar69 != 0);
                  }
                  local_140 = (__m256 *)((long)local_140 + 0x10);
                  iVar44 = (int)local_128 + 1;
                  local_128 = (void *)CONCAT44(local_128._4_4_,iVar44);
                } while (iVar44 != (int)local_130);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            local_110 = (pointer)CONCAT44(local_110._4_4_,iVar53);
            Mat::create(pMVar9,uVar68,uVar67,uVar66,sVar11,iVar46,opt->blob_allocator);
            if (local_108->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_108->c * local_108->cstep != 0) {
              if (0 < (int)uVar66) {
                local_130 = (void *)0x0;
                do {
                  _local_e0 = (__m128)*(undefined1 (*) [16])
                                       ((long)local_120->data + (long)local_130 * 0x10);
                  if (0 < (int)local_110) {
                    lVar75 = local_108->cstep * local_108->elemsize * (long)local_130;
                    pvVar45 = local_108->data;
                    local_128 = (void *)(local_120[1].cstep * local_120[1].elemsize *
                                         (long)local_130 + (long)local_120[1].data);
                    lVar63 = 0;
                    iVar44 = (int)local_110;
                    do {
                      uVar201 = *(undefined8 *)
                                 (*(undefined1 (*) [16])((long)local_128 + lVar63) + 8);
                      local_80._0_16_ = *(undefined1 (*) [16])((long)local_128 + lVar63);
                      afVar330 = binary_op_pow_pack4::operator()
                                           ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0,
                                            (__m128 *)local_80);
                      puVar55 = (undefined8 *)((long)pvVar45 + lVar63 + lVar75);
                      *puVar55 = afVar330._0_8_;
                      puVar55[1] = uVar201;
                      lVar63 = lVar63 + 0x10;
                      iVar44 = iVar44 + -1;
                    } while (iVar44 != 0);
                  }
                  local_130 = (void *)((long)local_130 + 1);
                } while (local_130 != (void *)local_f0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        return 0;
      }
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar46);
      uVar6 = pMVar8->h;
      local_f8 = (ulong)uVar6;
      if (iVar5 != 2) {
        if (iVar5 != 3) {
          return 0;
        }
        local_e8 = CONCAT44(local_e8._4_4_,uVar6 * uVar69);
        uVar7 = pMVar8->c;
        local_60 = (ulong)uVar7;
        if (pMVar8[1].dims != 3) {
          Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
          afVar187 = _local_e0;
          if (local_108->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_108->c * local_108->cstep == 0) {
            return -100;
          }
          iVar44 = (int)local_60;
          if (local_120[1].dims != 1) {
            if (local_120[1].dims != 2) {
              return 0;
            }
            if (0 < iVar44) {
              local_130 = (void *)0x0;
              do {
                if (0 < (int)local_f8) {
                  pauVar57 = (undefined1 (*) [16])
                             (local_108->cstep * (long)local_130 * local_108->elemsize +
                             (long)local_108->data);
                  pauVar52 = (undefined1 (*) [16])
                             ((long)local_120[1].w * (long)local_130 * local_120[1].elemsize +
                             (long)local_120[1].data);
                  pauVar59 = (undefined1 (*) [16])
                             (local_120->cstep * (long)local_130 * local_120->elemsize +
                             (long)local_120->data);
                  iVar44 = 0;
                  do {
                    local_128 = (void *)CONCAT44(local_128._4_4_,iVar44);
                    _local_e0 = (__m128)*pauVar52;
                    uVar47 = local_100 & 0xffffffff;
                    if (0 < (int)local_100) {
                      do {
                        auVar202 = ZEXT856(*(ulong *)(*pauVar59 + 8));
                        local_80._0_16_ = *pauVar59;
                        afVar330 = binary_op_pow_pack4::operator()
                                             ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_80,
                                              (__m128 *)local_e0);
                        auVar191._0_8_ = afVar330._0_8_;
                        auVar191._8_56_ = auVar202;
                        *pauVar57 = auVar191._0_16_;
                        pauVar59 = pauVar59 + 1;
                        pauVar57 = pauVar57 + 1;
                        uVar69 = (int)uVar47 - 1;
                        uVar47 = (ulong)uVar69;
                      } while (uVar69 != 0);
                    }
                    pauVar52 = pauVar52 + 1;
                    iVar44 = (int)local_128 + 1;
                  } while (iVar44 != (int)local_f8);
                }
                local_130 = (void *)((long)local_130 + 1);
              } while (local_130 != (void *)local_60);
              return 0;
            }
            return 0;
          }
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < iVar44) {
              local_130 = (void *)0x0;
              do {
                pvVar45 = local_120->data;
                _local_e0 = (__m128)*(undefined1 (*) [16])
                                     ((long)local_120[1].data + (long)local_130 * 0x10);
                if (0 < (int)(uint)local_e8) {
                  local_128 = (void *)(local_108->cstep * local_108->elemsize * (long)local_130 +
                                      (long)local_108->data);
                  lVar63 = local_120->cstep * local_120->elemsize * (long)local_130;
                  lVar75 = 0;
                  iVar44 = (uint)local_e8;
                  do {
                    pauVar52 = (undefined1 (*) [16])((long)pvVar45 + lVar75 + lVar63);
                    uVar201 = *(undefined8 *)(*pauVar52 + 8);
                    local_80._0_16_ = *pauVar52;
                    afVar330 = binary_op_pow_pack4::operator()
                                         ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_80,
                                          (__m128 *)local_e0);
                    *(undefined8 *)((long)local_128 + lVar75) = afVar330._0_8_;
                    ((undefined8 *)((long)local_128 + lVar75))[1] = uVar201;
                    lVar75 = lVar75 + 0x10;
                    iVar44 = iVar44 + -1;
                  } while (iVar44 != 0);
                }
                local_130 = (void *)((long)local_130 + 1);
              } while (local_130 != (void *)local_60);
              return 0;
            }
            return 0;
          }
          local_e0._4_4_ = *pMVar1->data;
          local_e0._0_4_ = local_e0._4_4_;
          fStack_d8 = (float)local_e0._4_4_;
          fStack_d4 = (float)local_e0._4_4_;
          _fStack_d0 = afVar187._16_16_;
          if (iVar44 < 1) {
            return 0;
          }
          local_130 = (void *)0x0;
          do {
            if (0 < (int)(uint)local_e8) {
              lVar63 = local_108->cstep * local_108->elemsize * (long)local_130;
              pvVar45 = local_108->data;
              local_128 = (void *)(local_120->cstep * local_120->elemsize * (long)local_130 +
                                  (long)local_120->data);
              lVar75 = 0;
              iVar44 = (uint)local_e8;
              do {
                auVar202 = ZEXT856(*(ulong *)(*(undefined1 (*) [16])((long)local_128 + lVar75) + 8))
                ;
                local_80._0_16_ = *(undefined1 (*) [16])((long)local_128 + lVar75);
                afVar330 = binary_op_pow_pack4::operator()
                                     ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_80,
                                      (__m128 *)local_e0);
                auVar195._0_8_ = afVar330._0_8_;
                auVar195._8_56_ = auVar202;
                *(undefined1 (*) [16])((long)pvVar45 + lVar75 + lVar63) = auVar195._0_16_;
                lVar75 = lVar75 + 0x10;
                iVar44 = iVar44 + -1;
              } while (iVar44 != 0);
            }
            local_130 = (void *)((long)local_130 + 1);
          } while (local_130 != (void *)local_60);
          return 0;
        }
        if (uVar66 == uVar7 && (uVar67 == 1 && (uVar68 ^ 1) == 0)) {
          Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
          if (local_108->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_108->c * local_108->cstep != 0) {
            if (0 < (int)(uint)local_60) {
              local_130 = (void *)0x0;
              do {
                pvVar45 = local_120->data;
                _local_e0 = (__m128)*(undefined1 (*) [16])
                                     ((long)local_120[1].data +
                                     local_120[1].cstep * (long)local_130 * local_120[1].elemsize);
                if (0 < (int)(uint)local_e8) {
                  lVar63 = local_120->cstep * local_120->elemsize * (long)local_130;
                  local_128 = (void *)((long)local_108->data +
                                      local_108->cstep * local_108->elemsize * (long)local_130);
                  lVar75 = 0;
                  iVar44 = (uint)local_e8;
                  do {
                    pauVar52 = (undefined1 (*) [16])((long)pvVar45 + lVar75 + lVar63);
                    uVar201 = *(undefined8 *)(*pauVar52 + 8);
                    local_80._0_16_ = *pauVar52;
                    afVar330 = binary_op_pow_pack4::operator()
                                         ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_80,
                                          (__m128 *)local_e0);
                    *(undefined8 *)((long)local_128 + lVar75) = afVar330._0_8_;
                    ((undefined8 *)((long)local_128 + lVar75))[1] = uVar201;
                    lVar75 = lVar75 + 0x10;
                    iVar44 = iVar44 + -1;
                  } while (iVar44 != 0);
                }
                local_130 = (void *)((long)local_130 + 1);
              } while (local_130 != (void *)local_60);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar68 == uVar69) && (iVar46 == 1 && (uVar66 == 1 && uVar67 == uVar6))) {
          Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
          if (local_108->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_108->c * local_108->cstep != 0) {
            if (0 < (int)(uint)local_60) {
              local_118 = 0;
              do {
                if (0 < (int)(uint)local_e8) {
                  lVar63 = local_120->cstep * local_120->elemsize * local_118;
                  pvVar45 = local_120->data;
                  local_130 = local_120[1].data;
                  local_128 = (void *)(local_108->cstep * local_108->elemsize * local_118 +
                                      (long)local_108->data);
                  lVar75 = 0;
                  iVar44 = (uint)local_e8;
                  do {
                    _local_e0 = (__m128)*(undefined1 (*) [16])((long)pvVar45 + lVar75 * 4 + lVar63);
                    uVar4 = *(undefined4 *)((long)local_130 + lVar75);
                    auVar91._4_4_ = uVar4;
                    auVar91._0_4_ = uVar4;
                    auVar91._8_4_ = uVar4;
                    auVar91._12_4_ = uVar4;
                    auVar202 = ZEXT856(auVar91._8_8_);
                    local_80[0] = (float)uVar4;
                    local_80[1] = (float)uVar4;
                    local_80[2] = (float)uVar4;
                    local_80[3] = (float)uVar4;
                    afVar330 = binary_op_pow_pack4::operator()
                                         ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0,
                                          (__m128 *)local_80);
                    auVar192._0_8_ = afVar330._0_8_;
                    auVar192._8_56_ = auVar202;
                    *(undefined1 (*) [16])((long)local_128 + lVar75 * 4) = auVar192._0_16_;
                    lVar75 = lVar75 + 4;
                    iVar44 = iVar44 + -1;
                  } while (iVar44 != 0);
                }
                local_118 = local_118 + 1;
              } while (local_118 != local_60);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_110 = (pointer)CONCAT44(local_110._4_4_,iVar53);
        if ((uVar6 == 1 && (uVar69 ^ 1) == 0) && uVar7 == uVar66) {
          Mat::create(pMVar9,uVar68,uVar67,uVar66,sVar11,iVar46,opt->blob_allocator);
          if (local_108->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_108->c * local_108->cstep != 0) {
            if (0 < (int)uVar66) {
              local_130 = (void *)0x0;
              do {
                pvVar45 = local_108->data;
                _local_e0 = (__m128)*(undefined1 (*) [16])
                                     ((long)local_120->data +
                                     local_120->cstep * (long)local_130 * local_120->elemsize);
                if (0 < (int)local_110) {
                  lVar63 = local_108->cstep * local_108->elemsize * (long)local_130;
                  local_128 = (void *)((long)local_120[1].data +
                                      local_120[1].cstep * local_120[1].elemsize * (long)local_130);
                  lVar75 = 0;
                  iVar44 = (int)local_110;
                  do {
                    uVar201 = *(undefined8 *)(*(undefined1 (*) [16])((long)local_128 + lVar75) + 8);
                    local_80._0_16_ = *(undefined1 (*) [16])((long)local_128 + lVar75);
                    afVar330 = binary_op_pow_pack4::operator()
                                         ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0,
                                          (__m128 *)local_80);
                    puVar55 = (undefined8 *)((long)pvVar45 + lVar75 + lVar63);
                    *puVar55 = afVar330._0_8_;
                    puVar55[1] = uVar201;
                    lVar75 = lVar75 + 0x10;
                    iVar44 = iVar44 + -1;
                  } while (iVar44 != 0);
                }
                local_130 = (void *)((long)local_130 + 1);
              } while (local_130 != (void *)local_f0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar68 == uVar69) && (iVar44 == 1 && (uVar7 == 1 && uVar6 == uVar67))) {
          Mat::create(pMVar9,uVar68,uVar67,uVar66,sVar11,iVar46,opt->blob_allocator);
          if (local_108->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_108->c * local_108->cstep != 0) {
            if (0 < (int)(uint)local_f0) {
              local_118 = 0;
              do {
                if (0 < (int)local_110) {
                  lVar63 = local_120[1].cstep * local_120[1].elemsize * local_118;
                  pvVar45 = local_120[1].data;
                  local_130 = local_120->data;
                  local_128 = (void *)(local_108->cstep * local_108->elemsize * local_118 +
                                      (long)local_108->data);
                  lVar75 = 0;
                  iVar44 = (int)local_110;
                  do {
                    afVar187 = _local_e0;
                    local_e0._4_4_ = *(float *)((long)local_130 + lVar75);
                    local_e0._0_4_ = local_e0._4_4_;
                    fStack_d8 = (float)local_e0._4_4_;
                    _fStack_d0 = afVar187._16_16_;
                    fStack_d4 = (float)local_e0._4_4_;
                    pauVar52 = (undefined1 (*) [16])((long)pvVar45 + lVar75 * 4 + lVar63);
                    auVar202 = ZEXT856(*(ulong *)(*pauVar52 + 8));
                    local_80._0_16_ = *pauVar52;
                    afVar330 = binary_op_pow_pack4::operator()
                                         ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0,
                                          (__m128 *)local_80);
                    auVar193._0_8_ = afVar330._0_8_;
                    auVar193._8_56_ = auVar202;
                    *(undefined1 (*) [16])((long)local_128 + lVar75 * 4) = auVar193._0_16_;
                    lVar75 = lVar75 + 4;
                    iVar44 = iVar44 + -1;
                  } while (iVar44 != 0);
                }
                local_118 = local_118 + 1;
              } while (local_118 != local_f0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar68 ^ 1) == 0 && uVar67 == uVar6) && uVar7 == uVar66) && uVar69 != 1) {
          Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
          if (local_108->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_108->c * local_108->cstep != 0) {
            if (0 < (int)(uint)local_f0) {
              local_130 = (void *)0x0;
              do {
                if (0 < (int)local_f8) {
                  local_128 = (void *)(local_120[1].cstep * (long)local_130 * local_120[1].elemsize
                                      + (long)local_120[1].data);
                  pauVar52 = (undefined1 (*) [16])
                             (local_108->cstep * (long)local_130 * local_108->elemsize +
                             (long)local_108->data);
                  pauVar59 = (undefined1 (*) [16])
                             (local_120->cstep * (long)local_130 * local_120->elemsize +
                             (long)local_120->data);
                  uVar47 = 0;
                  do {
                    _local_e0 = (__m128)*(undefined1 (*) [16])((long)local_128 + uVar47 * 0x10);
                    uVar48 = local_100 & 0xffffffff;
                    if (0 < (int)local_100) {
                      do {
                        auVar202 = ZEXT856(*(ulong *)(*pauVar59 + 8));
                        local_80._0_16_ = *pauVar59;
                        afVar330 = binary_op_pow_pack4::operator()
                                             ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_80,
                                              (__m128 *)local_e0);
                        auVar194._0_8_ = afVar330._0_8_;
                        auVar194._8_56_ = auVar202;
                        *pauVar52 = auVar194._0_16_;
                        pauVar59 = pauVar59 + 1;
                        pauVar52 = pauVar52 + 1;
                        uVar69 = (int)uVar48 - 1;
                        uVar48 = (ulong)uVar69;
                      } while (uVar69 != 0);
                    }
                    uVar47 = uVar47 + 1;
                  } while (uVar47 != local_f8);
                }
                local_130 = (void *)((long)local_130 + 1);
              } while (local_130 != (void *)local_f0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((uVar67 != 1 || (uVar68 ^ uVar69) != 0) || uVar66 != uVar7) || uVar6 == 1) {
          if ((((uVar69 ^ 1) == 0 && uVar6 == uVar67) && uVar66 == uVar7) && uVar68 != 1) {
            local_110 = pMVar1;
            Mat::create(pMVar9,uVar68,uVar67,uVar66,sVar11,iVar46,opt->blob_allocator);
            if (pMVar9->data != (void *)0x0) {
              if ((long)local_108->c * local_108->cstep == 0) {
                return -100;
              }
              if (0 < (int)(uint)local_f0) {
                local_f8 = 0;
                do {
                  if (0 < (int)local_130) {
                    local_128 = (void *)(local_120->cstep * local_f8 * local_120->elemsize +
                                        (long)local_120->data);
                    pauVar59 = (undefined1 (*) [16])
                               (local_108->cstep * local_f8 * local_108->elemsize +
                               (long)local_108->data);
                    pauVar52 = (undefined1 (*) [16])
                               (local_120[1].cstep * local_f8 * local_120[1].elemsize +
                               (long)local_120[1].data);
                    uVar47 = 0;
                    do {
                      _local_e0 = (__m128)*(undefined1 (*) [16])((long)local_128 + uVar47 * 0x10);
                      uVar48 = local_118 & 0xffffffff;
                      if (0 < (int)local_118) {
                        do {
                          auVar202 = ZEXT856(*(ulong *)(*pauVar52 + 8));
                          local_80._0_16_ = *pauVar52;
                          afVar330 = binary_op_pow_pack4::operator()
                                               ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0
                                                ,(__m128 *)local_80);
                          auVar197._0_8_ = afVar330._0_8_;
                          auVar197._8_56_ = auVar202;
                          *pauVar59 = auVar197._0_16_;
                          pauVar52 = pauVar52 + 1;
                          pauVar59 = pauVar59 + 1;
                          uVar69 = (int)uVar48 - 1;
                          uVar48 = (ulong)uVar69;
                        } while (uVar69 != 0);
                      }
                      uVar47 = uVar47 + 1;
                    } while ((void *)uVar47 != local_130);
                  }
                  local_f8 = local_f8 + 1;
                } while (local_f8 != local_f0);
                return 0;
              }
              return 0;
            }
          }
          else if ((((uVar68 ^ uVar69) == 0 && uVar6 == 1) && uVar7 == uVar66) && uVar67 != 1) {
            local_110 = pMVar1;
            Mat::create(pMVar9,uVar68,uVar67,uVar66,sVar11,iVar46,opt->blob_allocator);
            if (pMVar9->data != (void *)0x0) {
              if ((long)local_108->c * local_108->cstep == 0) {
                return -100;
              }
              if (0 < (int)(uint)local_f0) {
                local_f8 = local_118 << 4;
                local_100 = 0;
                do {
                  iVar44 = (int)local_100;
                  Mat::channel((Mat *)local_e0,local_120,iVar44);
                  auVar43 = local_e0;
                  Mat::~Mat((Mat *)local_e0);
                  Mat::channel((Mat *)local_e0,local_110,iVar44);
                  auVar54 = local_e0;
                  Mat::~Mat((Mat *)local_e0);
                  Mat::channel((Mat *)local_e0,local_108,iVar44);
                  auVar74 = local_e0;
                  Mat::~Mat((Mat *)local_e0);
                  if (0 < (int)local_130) {
                    iVar44 = 0;
                    pvVar45 = local_130;
                    do {
                      uVar47 = local_f8;
                      if (0 < (int)local_118) {
                        local_128 = (void *)CONCAT44(local_128._4_4_,iVar44);
                        lVar63 = 0;
                        do {
                          _local_e0 = (__m128)*(undefined1 (*) [16])((long)auVar43 + lVar63);
                          auVar202 = ZEXT856(*(ulong *)(*(undefined1 (*) [16])
                                                         ((long)auVar54 + lVar63) + 8));
                          local_80._0_16_ = *(undefined1 (*) [16])((long)auVar54 + lVar63);
                          afVar330 = binary_op_pow_pack4::operator()
                                               ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0
                                                ,(__m128 *)local_80);
                          auVar198._0_8_ = afVar330._0_8_;
                          auVar198._8_56_ = auVar202;
                          *(undefined1 (*) [16])((long)auVar74 + lVar63) = auVar198._0_16_;
                          lVar63 = lVar63 + 0x10;
                        } while (uVar47 != lVar63);
                        auVar74 = (undefined1  [8])((long)auVar74 + lVar63);
                        auVar54 = (undefined1  [8])((long)auVar54 + lVar63);
                        pvVar45 = local_130;
                        iVar44 = (int)local_128;
                      }
                      iVar44 = iVar44 + 1;
                    } while (iVar44 != (int)pvVar45);
                  }
                  uVar69 = (int)local_100 + 1;
                  local_100 = (ulong)uVar69;
                } while (uVar69 != (uint)local_f0);
                return 0;
              }
              return 0;
            }
          }
          else {
            local_110 = pMVar1;
            Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
            if (pMVar9->data != (void *)0x0) {
              if ((long)local_108->c * local_108->cstep == 0) {
                return -100;
              }
              if (0 < (int)(uint)local_60) {
                local_130 = (void *)0x0;
                do {
                  iVar44 = (int)local_130;
                  Mat::channel((Mat *)local_e0,local_120,iVar44);
                  auVar43 = local_e0;
                  Mat::~Mat((Mat *)local_e0);
                  Mat::channel((Mat *)local_e0,local_110,iVar44);
                  local_128 = (void *)local_e0;
                  Mat::~Mat((Mat *)local_e0);
                  Mat::channel((Mat *)local_e0,local_108,iVar44);
                  auVar54 = local_e0;
                  Mat::~Mat((Mat *)local_e0);
                  if (0 < (int)(uint)local_e8) {
                    lVar63 = 0;
                    iVar44 = (uint)local_e8;
                    do {
                      _local_e0 = (__m128)*(undefined1 (*) [16])((long)auVar43 + lVar63);
                      auVar202 = ZEXT856(*(ulong *)(*(undefined1 (*) [16])((long)local_128 + lVar63)
                                                   + 8));
                      local_80._0_16_ = *(undefined1 (*) [16])((long)local_128 + lVar63);
                      afVar330 = binary_op_pow_pack4::operator()
                                           ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0,
                                            (__m128 *)local_80);
                      auVar199._0_8_ = afVar330._0_8_;
                      auVar199._8_56_ = auVar202;
                      *(undefined1 (*) [16])((long)auVar54 + lVar63) = auVar199._0_16_;
                      lVar63 = lVar63 + 0x10;
                      iVar44 = iVar44 + -1;
                    } while (iVar44 != 0);
                  }
                  uVar69 = (int)local_130 + 1;
                  local_130 = (void *)(ulong)uVar69;
                } while (uVar69 != (uint)local_60);
                return 0;
              }
              return 0;
            }
          }
          return -100;
        }
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (local_108->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)(uint)local_f0) {
            lVar63 = local_100 << 4;
            local_130 = (void *)0x0;
            local_128 = (void *)lVar63;
            do {
              if (0 < (int)local_f8) {
                pvVar60 = (void *)(local_108->cstep * (long)local_130 * local_108->elemsize +
                                  (long)local_108->data);
                pvVar65 = (void *)(local_120->cstep * (long)local_130 * local_120->elemsize +
                                  (long)local_120->data);
                lVar75 = local_120[1].elemsize * local_120[1].cstep * (long)local_130;
                pvVar45 = local_120[1].data;
                iVar44 = 0;
                uVar47 = local_100;
                uVar48 = local_f8;
                do {
                  if (0 < (int)uVar47) {
                    lVar76 = 0;
                    do {
                      _local_e0 = (__m128)*(undefined1 (*) [16])((long)pvVar65 + lVar76);
                      pauVar52 = (undefined1 (*) [16])((long)pvVar45 + lVar76 + lVar75);
                      auVar202 = ZEXT856(*(ulong *)(*pauVar52 + 8));
                      local_80._0_16_ = *pauVar52;
                      afVar330 = binary_op_pow_pack4::operator()
                                           ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0,
                                            (__m128 *)local_80);
                      auVar196._0_8_ = afVar330._0_8_;
                      auVar196._8_56_ = auVar202;
                      *(undefined1 (*) [16])((long)pvVar60 + lVar76) = auVar196._0_16_;
                      lVar76 = lVar76 + 0x10;
                    } while (lVar63 != lVar76);
                    pvVar60 = (void *)((long)pvVar60 + lVar76);
                    pvVar65 = (void *)((long)pvVar65 + lVar76);
                    uVar47 = local_100;
                    uVar48 = local_f8;
                  }
                  iVar44 = iVar44 + 1;
                } while (iVar44 != (int)uVar48);
              }
              local_130 = (void *)((long)local_130 + 1);
            } while (local_130 != (void *)local_f0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (pMVar8[1].dims == 3) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,sVar11,iVar46,opt->blob_allocator);
        if (local_108->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)uVar66) {
            local_f8 = 0;
            do {
              if (0 < (int)local_130) {
                pauVar59 = (undefined1 (*) [16])
                           (local_108->cstep * local_f8 * local_108->elemsize +
                           (long)local_108->data);
                pauVar57 = (undefined1 (*) [16])
                           (local_120[1].cstep * local_f8 * local_120[1].elemsize +
                           (long)local_120[1].data);
                pauVar52 = (undefined1 (*) [16])
                           ((long)local_120->w * local_f8 * local_120->elemsize +
                           (long)local_120->data);
                iVar44 = 0;
                do {
                  local_128 = (void *)CONCAT44(local_128._4_4_,iVar44);
                  _local_e0 = (__m128)*pauVar52;
                  uVar47 = local_118 & 0xffffffff;
                  if (0 < (int)local_118) {
                    do {
                      auVar202 = ZEXT856(*(ulong *)(*pauVar57 + 8));
                      local_80._0_16_ = *pauVar57;
                      afVar330 = binary_op_pow_pack4::operator()
                                           ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0,
                                            (__m128 *)local_80);
                      auVar189._0_8_ = afVar330._0_8_;
                      auVar189._8_56_ = auVar202;
                      *pauVar59 = auVar189._0_16_;
                      pauVar57 = pauVar57 + 1;
                      pauVar59 = pauVar59 + 1;
                      uVar69 = (int)uVar47 - 1;
                      uVar47 = (ulong)uVar69;
                    } while (uVar69 != 0);
                  }
                  pauVar52 = pauVar52 + 1;
                  iVar44 = (int)local_128 + 1;
                } while (iVar44 != (int)local_130);
              }
              local_f8 = local_f8 + 1;
            } while (local_f8 != local_f0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_e8 = CONCAT44(local_e8._4_4_,uVar6 * uVar69);
      Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
      pvVar45 = pMVar9->data;
      if (pvVar45 == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar9->c * pMVar9->cstep == 0) {
        return -100;
      }
      if (local_120[1].dims != 1) {
        if (local_120[1].dims != 2) {
          return 0;
        }
        if (0 < (int)(uint)local_e8) {
          pvVar60 = local_120->data;
          pvVar65 = local_120[1].data;
          lVar63 = 0;
          iVar44 = (uint)local_e8;
          do {
            _local_e0 = (__m128)*(undefined1 (*) [16])((long)pvVar60 + lVar63);
            pauVar52 = (undefined1 (*) [16])((long)pvVar65 + lVar63);
            uVar201 = *(undefined8 *)(*pauVar52 + 8);
            local_80._0_16_ = *pauVar52;
            afVar330 = binary_op_pow_pack4::operator()
                                 ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0,
                                  (__m128 *)local_80);
            puVar55 = (undefined8 *)((long)pvVar45 + lVar63);
            *puVar55 = afVar330._0_8_;
            puVar55[1] = uVar201;
            lVar63 = lVar63 + 0x10;
            iVar44 = iVar44 + -1;
          } while (iVar44 != 0);
          return 0;
        }
        return 0;
      }
      Mat::create(pMVar9,(int)local_100,(int)local_f8,sVar10,iVar44,opt->blob_allocator);
      afVar187 = _local_e0;
      puVar55 = (undefined8 *)pMVar9->data;
      if (puVar55 == (undefined8 *)0x0) {
        return -100;
      }
      if ((long)pMVar9->c * pMVar9->cstep != 0) {
        if ((int)local_128 != 1 || local_120[1].w != 1) {
          if (0 < (int)local_f8) {
            pauVar52 = (undefined1 (*) [16])local_120->data;
            local_140 = (__m256 *)local_120[1].data;
            local_128 = (void *)((ulong)local_128 & 0xffffffff00000000);
            do {
              _local_e0 = (__m128)*(undefined1 (*) [16])local_140;
              uVar47 = local_100 & 0xffffffff;
              if (0 < (int)local_100) {
                do {
                  uVar201 = *(undefined8 *)(*pauVar52 + 8);
                  local_80._0_16_ = *pauVar52;
                  afVar330 = binary_op_pow_pack4::operator()
                                       ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_80,
                                        (__m128 *)local_e0);
                  *puVar55 = afVar330._0_8_;
                  puVar55[1] = uVar201;
                  pauVar52 = pauVar52 + 1;
                  puVar55 = puVar55 + 2;
                  uVar69 = (int)uVar47 - 1;
                  uVar47 = (ulong)uVar69;
                } while (uVar69 != 0);
              }
              local_140 = (__m256 *)((long)local_140 + 0x10);
              iVar44 = (int)local_128 + 1;
              local_128 = (void *)CONCAT44(local_128._4_4_,iVar44);
            } while (iVar44 != (int)local_f8);
            return 0;
          }
          return 0;
        }
        local_e0._4_4_ = *pMVar1->data;
        local_e0._0_4_ = local_e0._4_4_;
        fStack_d8 = (float)local_e0._4_4_;
        _fStack_d0 = afVar187._16_16_;
        fStack_d4 = (float)local_e0._4_4_;
        if ((int)(uint)local_e8 < 1) {
          return 0;
        }
        pvVar45 = local_120->data;
        lVar63 = 0;
        iVar44 = (uint)local_e8;
        do {
          pauVar52 = (undefined1 (*) [16])((long)pvVar45 + lVar63);
          uVar201 = *(undefined8 *)(*pauVar52 + 8);
          local_80._0_16_ = *pauVar52;
          afVar330 = binary_op_pow_pack4::operator()
                               ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_80,
                                (__m128 *)local_e0);
          *(undefined8 *)((long)puVar55 + lVar63) = afVar330._0_8_;
          ((undefined8 *)((long)puVar55 + lVar63))[1] = uVar201;
          lVar63 = lVar63 + 0x10;
          iVar44 = iVar44 + -1;
        } while (iVar44 != 0);
        return 0;
      }
      return -100;
    case 7:
      uVar69 = pMVar8->w;
      uVar48 = (ulong)uVar69;
      sVar10 = pMVar8->elemsize;
      uVar68 = pMVar8[1].w;
      uVar49 = (ulong)uVar68;
      uVar67 = pMVar8[1].h;
      uVar66 = pMVar8[1].c;
      uVar47 = (ulong)uVar66;
      iVar53 = uVar67 * uVar68;
      local_f8 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar44 == 1 && uVar69 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar68,local_f8,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar68) {
                uVar4 = *pMVar8->data;
                auVar105._4_4_ = uVar4;
                auVar105._0_4_ = uVar4;
                auVar105._8_4_ = uVar4;
                auVar105._12_4_ = uVar4;
                pvVar60 = pMVar1->data;
                lVar63 = 0;
                do {
                  auVar82 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar60 + lVar63),auVar105);
                  *(undefined1 (*) [16])((long)pvVar45 + lVar63) = auVar82;
                  lVar63 = lVar63 + 0x10;
                  uVar69 = (int)uVar49 - 1;
                  uVar49 = (ulong)uVar69;
                } while (uVar69 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar68,uVar67,local_f8,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < iVar53) {
                uVar4 = *pMVar8->data;
                auVar102._4_4_ = uVar4;
                auVar102._0_4_ = uVar4;
                auVar102._8_4_ = uVar4;
                auVar102._12_4_ = uVar4;
                pvVar60 = local_110->data;
                lVar63 = 0;
                do {
                  auVar82 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar60 + lVar63),auVar102);
                  *(undefined1 (*) [16])((long)pvVar45 + lVar63) = auVar82;
                  lVar63 = lVar63 + 0x10;
                  iVar53 = iVar53 + -1;
                } while (iVar53 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar66) {
                uVar4 = *pMVar8->data;
                auVar80._4_4_ = uVar4;
                auVar80._0_4_ = uVar4;
                auVar80._8_4_ = uVar4;
                auVar80._12_4_ = uVar4;
                uVar48 = 0;
                do {
                  if (0 < iVar53) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar45 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar60 = pMVar8[1].data;
                    lVar63 = 0;
                    iVar44 = iVar53;
                    do {
                      auVar82 = vsubps_avx(*(undefined1 (*) [16])
                                            ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48),
                                           auVar80);
                      *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) =
                           auVar82;
                      lVar63 = lVar63 + 0x10;
                      iVar44 = iVar44 + -1;
                    } while (iVar44 != 0);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar47);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar69,sVar10,iVar44,opt->blob_allocator);
          pvVar45 = pMVar9->data;
          if (pvVar45 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar46 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar69) {
              pvVar60 = pMVar8->data;
              pvVar65 = pMVar8[1].data;
              lVar63 = 0;
              do {
                auVar82 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar65 + lVar63),
                                     *(undefined1 (*) [16])((long)pvVar60 + lVar63));
                *(undefined1 (*) [16])((long)pvVar45 + lVar63) = auVar82;
                lVar63 = lVar63 + 0x10;
                uVar69 = (int)uVar48 - 1;
                uVar48 = (ulong)uVar69;
              } while (uVar69 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar69) {
            uVar4 = *local_110->data;
            auVar94._4_4_ = uVar4;
            auVar94._0_4_ = uVar4;
            auVar94._8_4_ = uVar4;
            auVar94._12_4_ = uVar4;
            pvVar60 = pMVar8->data;
            lVar63 = 0;
            do {
              auVar82 = vsubps_avx(auVar94,*(undefined1 (*) [16])((long)pvVar60 + lVar63));
              *(undefined1 (*) [16])((long)pvVar45 + lVar63) = auVar82;
              lVar63 = lVar63 + 0x10;
              uVar69 = (int)uVar48 - 1;
              uVar48 = (ulong)uVar69;
            } while (uVar69 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar68,uVar67,local_f8,iVar46,opt->blob_allocator);
          pauVar52 = (undefined1 (*) [16])pMVar9->data;
          if (pauVar52 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar67) {
              pauVar59 = (undefined1 (*) [16])pMVar8->data;
              pauVar57 = (undefined1 (*) [16])pMVar8[1].data;
              uVar69 = 0;
              do {
                if (0 < (int)uVar68) {
                  auVar82 = *pauVar59;
                  uVar66 = uVar68;
                  do {
                    auVar124 = vsubps_avx(*pauVar57,auVar82);
                    *pauVar52 = auVar124;
                    pauVar57 = pauVar57 + 1;
                    pauVar52 = pauVar52 + 1;
                    uVar66 = uVar66 - 1;
                  } while (uVar66 != 0);
                }
                pauVar59 = pauVar59 + 1;
                uVar69 = uVar69 + 1;
              } while (uVar69 != uVar67);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar66) {
          uVar48 = 0;
          do {
            if (0 < iVar53) {
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar9->elemsize;
              auVar82 = *(undefined1 (*) [16])((long)pMVar8->data + uVar48 * 0x10);
              pvVar45 = pMVar9->data;
              sVar12 = pMVar8[1].cstep;
              sVar13 = pMVar8[1].elemsize;
              pvVar60 = pMVar8[1].data;
              lVar63 = 0;
              iVar44 = iVar53;
              do {
                auVar124 = vsubps_avx(*(undefined1 (*) [16])
                                       ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48),auVar82);
                *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) = auVar124
                ;
                lVar63 = lVar63 + 0x10;
                iVar44 = iVar44 + -1;
              } while (iVar44 != 0);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar47);
          return 0;
        }
        return 0;
      }
      local_118 = CONCAT44(local_118._4_4_,iVar53);
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar46);
      uVar6 = pMVar8->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar6 * uVar69);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar66) {
              uVar48 = 0;
              do {
                if (0 < (int)uVar67) {
                  pauVar52 = (undefined1 (*) [16])
                             (pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data);
                  pauVar59 = (undefined1 (*) [16])
                             (local_120[1].cstep * uVar48 * local_120[1].elemsize +
                             (long)local_120[1].data);
                  pauVar57 = (undefined1 (*) [16])
                             ((long)local_120->w * uVar48 * local_120->elemsize +
                             (long)local_120->data);
                  uVar69 = 0;
                  do {
                    if (0 < (int)uVar68) {
                      auVar82 = *pauVar57;
                      uVar66 = uVar68;
                      do {
                        auVar124 = vsubps_avx(*pauVar59,auVar82);
                        *pauVar52 = auVar124;
                        pauVar59 = pauVar59 + 1;
                        pauVar52 = pauVar52 + 1;
                        uVar66 = uVar66 - 1;
                      } while (uVar66 != 0);
                    }
                    pauVar57 = pauVar57 + 1;
                    uVar69 = uVar69 + 1;
                  } while (uVar69 != uVar67);
                }
                uVar48 = uVar48 + 1;
              } while (uVar48 != uVar47);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pvVar45 = pMVar9->data;
        if (pvVar45 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar60 = local_120->data;
            pvVar65 = local_120[1].data;
            lVar63 = 0;
            do {
              auVar82 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar65 + lVar63),
                                   *(undefined1 (*) [16])((long)pvVar60 + lVar63));
              *(undefined1 (*) [16])((long)pvVar45 + lVar63) = auVar82;
              lVar63 = lVar63 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pauVar52 = (undefined1 (*) [16])pMVar9->data;
        if (pauVar52 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pauVar59 = (undefined1 (*) [16])local_120->data;
              pauVar57 = (undefined1 (*) [16])local_120[1].data;
              uVar68 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar82 = *pauVar57;
                  uVar47 = uVar48;
                  do {
                    auVar124 = vsubps_avx(auVar82,*pauVar59);
                    *pauVar52 = auVar124;
                    pauVar59 = pauVar59 + 1;
                    pauVar52 = pauVar52 + 1;
                    uVar67 = (int)uVar47 - 1;
                    uVar47 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                pauVar57 = pauVar57 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            uVar4 = *local_110->data;
            auVar119._4_4_ = uVar4;
            auVar119._0_4_ = uVar4;
            auVar119._8_4_ = uVar4;
            auVar119._12_4_ = uVar4;
            pvVar45 = local_120->data;
            lVar63 = 0;
            do {
              auVar82 = vsubps_avx(auVar119,*(undefined1 (*) [16])((long)pvVar45 + lVar63));
              *(undefined1 (*) [16])((long)*pauVar52 + lVar63) = auVar82;
              lVar63 = lVar63 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar64 = (ulong)uVar7;
      if (pMVar8[1].dims != 3) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (pMVar8[1].dims == 1) {
          if ((int)local_128 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)local_118) {
              uVar47 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  auVar82 = *(undefined1 (*) [16])((long)local_110->data + uVar47 * 0x10);
                  pvVar45 = pMVar9->data;
                  sVar12 = pMVar8->cstep;
                  sVar13 = pMVar8->elemsize;
                  pvVar60 = pMVar8->data;
                  lVar63 = 0;
                  iVar44 = (int)local_130;
                  do {
                    auVar124 = vsubps_avx(auVar82,*(undefined1 (*) [16])
                                                   ((long)pvVar60 +
                                                   lVar63 + sVar12 * sVar13 * uVar47));
                    *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                         auVar124;
                    lVar63 = lVar63 + 0x10;
                    iVar44 = iVar44 + -1;
                  } while (iVar44 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != local_118);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            uVar4 = *local_110->data;
            auVar121._4_4_ = uVar4;
            auVar121._0_4_ = uVar4;
            auVar121._8_4_ = uVar4;
            auVar121._12_4_ = uVar4;
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar45 = pMVar9->data;
                sVar12 = pMVar8->cstep;
                sVar13 = pMVar8->elemsize;
                pvVar60 = pMVar8->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  auVar82 = vsubps_avx(auVar121,*(undefined1 (*) [16])
                                                 ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47)
                                      );
                  *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                       auVar82;
                  lVar63 = lVar63 + 0x10;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_118);
            return 0;
          }
          return 0;
        }
        if (pMVar8[1].dims != 2) {
          return 0;
        }
        if (0 < (int)local_118) {
          uVar47 = 0;
          do {
            if (0 < (int)uVar6) {
              pauVar52 = (undefined1 (*) [16])
                         (pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar59 = (undefined1 (*) [16])
                         ((long)pMVar8[1].w * uVar47 * pMVar8[1].elemsize + (long)pMVar8[1].data);
              pauVar57 = (undefined1 (*) [16])
                         (pMVar8->cstep * uVar47 * pMVar8->elemsize + (long)pMVar8->data);
              uVar68 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar82 = *pauVar59;
                  uVar49 = uVar48;
                  do {
                    auVar124 = vsubps_avx(auVar82,*pauVar57);
                    *pauVar52 = auVar124;
                    pauVar57 = pauVar57 + 1;
                    pauVar52 = pauVar52 + 1;
                    uVar67 = (int)uVar49 - 1;
                    uVar49 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                pauVar59 = pauVar59 + 1;
                uVar68 = uVar68 + 1;
              } while (uVar68 != uVar6);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != local_118);
          return 0;
        }
        return 0;
      }
      if (uVar66 == uVar7 && (uVar67 == 1 && (uVar68 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                auVar82 = *(undefined1 (*) [16])
                           ((long)pMVar8[1].data + pMVar8[1].cstep * uVar47 * pMVar8[1].elemsize);
                pvVar45 = pMVar8->data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar60 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  auVar124 = vsubps_avx(auVar82,*(undefined1 (*) [16])
                                                 ((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47)
                                       );
                  *(undefined1 (*) [16])((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47) =
                       auVar124;
                  lVar63 = lVar63 + 0x10;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_f0 = sVar10;
      if ((uVar68 == uVar69) && (iVar46 == 1 && (uVar66 == 1 && uVar67 == uVar6))) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8->data;
                pvVar60 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar60 + lVar63);
                  auVar88._4_4_ = uVar4;
                  auVar88._0_4_ = uVar4;
                  auVar88._8_4_ = uVar4;
                  auVar88._12_4_ = uVar4;
                  auVar82 = vsubps_avx(auVar88,*(undefined1 (*) [16])
                                                ((long)pvVar45 +
                                                lVar63 * 4 + sVar10 * sVar11 * uVar47));
                  *(undefined1 (*) [16])((long)pvVar65 + lVar63 * 4 + sVar12 * sVar13 * uVar47) =
                       auVar82;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar69 ^ 1) == 0) && uVar7 == uVar66) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar82 = *(undefined1 (*) [16])
                           ((long)pMVar8->data + pMVar8->cstep * uVar48 * pMVar8->elemsize);
                pvVar45 = pMVar9->data;
                sVar12 = pMVar8[1].cstep;
                sVar13 = pMVar8[1].elemsize;
                pvVar60 = pMVar8[1].data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  auVar124 = vsubps_avx(*(undefined1 (*) [16])
                                         ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48),auVar82
                                       );
                  *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) =
                       auVar124;
                  lVar63 = lVar63 + 0x10;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar68 == uVar69) && (iVar44 == 1)) && ((uVar67 == uVar6 && (uVar7 == 1)))) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8[1].data;
                pvVar60 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_118;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar60 + lVar63);
                  auVar112._4_4_ = uVar4;
                  auVar112._0_4_ = uVar4;
                  auVar112._8_4_ = uVar4;
                  auVar112._12_4_ = uVar4;
                  auVar82 = vsubps_avx(*(undefined1 (*) [16])
                                        ((long)pvVar45 + lVar63 * 4 + sVar10 * sVar11 * uVar48),
                                       auVar112);
                  *(undefined1 (*) [16])((long)pvVar65 + lVar63 * 4 + sVar12 * sVar13 * uVar48) =
                       auVar82;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar47;
      if ((((uVar68 ^ 1) == 0 && uVar67 == uVar6) && uVar7 == uVar66) && uVar69 != 1) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar49 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar45 = local_120[1].data;
                pauVar52 = (undefined1 (*) [16])
                           (pMVar9->cstep * uVar49 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar59 = (undefined1 (*) [16])
                           (local_120->cstep * uVar49 * local_120->elemsize + (long)local_120->data)
                ;
                uVar64 = 0;
                do {
                  if (0 < (int)uVar69) {
                    auVar82 = *(undefined1 (*) [16])
                               ((long)pvVar45 + uVar64 * 0x10 + sVar10 * uVar49 * sVar11);
                    uVar70 = uVar48;
                    do {
                      auVar124 = vsubps_avx(auVar82,*pauVar59);
                      *pauVar52 = auVar124;
                      pauVar59 = pauVar59 + 1;
                      pauVar52 = pauVar52 + 1;
                      uVar68 = (int)uVar70 - 1;
                      uVar70 = (ulong)uVar68;
                    } while (uVar68 != 0);
                  }
                  uVar64 = uVar64 + 1;
                } while (uVar64 != uVar6);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar67 == 1 && (uVar68 ^ uVar69) == 0) && uVar66 == uVar7) && uVar6 != 1) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)local_100) {
            uVar47 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar60 = (void *)(pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar65 = (void *)(local_120->cstep * uVar47 * local_120->elemsize +
                                  (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar45 = local_120[1].data;
                uVar68 = 0;
                do {
                  if (0 < (int)uVar69) {
                    lVar63 = 0;
                    do {
                      auVar82 = vsubps_avx(*(undefined1 (*) [16])
                                            ((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47),
                                           *(undefined1 (*) [16])((long)pvVar65 + lVar63));
                      *(undefined1 (*) [16])((long)pvVar60 + lVar63) = auVar82;
                      lVar63 = lVar63 + 0x10;
                    } while (uVar48 << 4 != lVar63);
                    pvVar60 = (void *)((long)pvVar60 + lVar63);
                    pvVar65 = (void *)((long)pvVar65 + lVar63);
                  }
                  uVar68 = uVar68 + 1;
                } while (uVar68 != uVar6);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar69 ^ 1) == 0 && uVar6 == uVar67) && uVar66 == uVar7) && uVar68 != 1) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)local_100) {
            uVar47 = 0;
            do {
              if (0 < (int)uVar67) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar45 = local_120->data;
                pauVar52 = (undefined1 (*) [16])
                           (pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar59 = (undefined1 (*) [16])
                           (local_120[1].cstep * uVar47 * local_120[1].elemsize +
                           (long)local_120[1].data);
                uVar48 = 0;
                do {
                  if (0 < (int)uVar68) {
                    auVar82 = *(undefined1 (*) [16])
                               ((long)pvVar45 + uVar48 * 0x10 + sVar10 * uVar47 * sVar11);
                    uVar69 = uVar68;
                    do {
                      auVar124 = vsubps_avx(*pauVar59,auVar82);
                      *pauVar52 = auVar124;
                      pauVar59 = pauVar59 + 1;
                      pauVar52 = pauVar52 + 1;
                      uVar69 = uVar69 - 1;
                    } while (uVar69 != 0);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar67);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar68 ^ uVar69) == 0 && uVar6 == 1) && uVar7 == uVar66) && uVar67 != 1) {
        local_118 = uVar64;
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_f8,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_100) {
            local_128 = (void *)(uVar49 << 4);
            iVar44 = 0;
            do {
              Mat::channel((Mat *)local_e0,local_120,iVar44);
              auVar43 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar44);
              auVar54 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar44);
              auVar74 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar67) {
                uVar69 = 0;
                do {
                  if (0 < (int)uVar68) {
                    lVar63 = 0;
                    do {
                      auVar82 = vsubps_avx(*(undefined1 (*) [16])((long)auVar54 + lVar63),
                                           *(undefined1 (*) [16])((long)auVar43 + lVar63));
                      *(undefined1 (*) [16])((long)auVar74 + lVar63) = auVar82;
                      lVar63 = lVar63 + 0x10;
                    } while (local_128 != (void *)lVar63);
                    auVar74 = (undefined1  [8])((long)auVar74 + lVar63);
                    auVar54 = (undefined1  [8])((long)auVar54 + lVar63);
                  }
                  uVar69 = uVar69 + 1;
                } while (uVar69 != uVar67);
              }
              iVar44 = iVar44 + 1;
            } while (iVar44 != (int)local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_118 = uVar64;
      Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_118) {
          iVar44 = 0;
          do {
            pMVar9 = local_108;
            Mat::channel((Mat *)local_e0,local_120,iVar44);
            auVar43 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar44);
            auVar54 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar44);
            auVar74 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_130) {
              lVar63 = 0;
              iVar46 = (int)local_130;
              do {
                auVar82 = vsubps_avx(*(undefined1 (*) [16])((long)auVar54 + lVar63),
                                     *(undefined1 (*) [16])((long)auVar43 + lVar63));
                *(undefined1 (*) [16])((long)auVar74 + lVar63) = auVar82;
                lVar63 = lVar63 + 0x10;
                iVar46 = iVar46 + -1;
              } while (iVar46 != 0);
            }
            iVar44 = iVar44 + 1;
          } while (iVar44 != (int)local_118);
          return 0;
        }
        return 0;
      }
      return -100;
    case 8:
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar46);
      uVar69 = pMVar8->w;
      uVar48 = (ulong)uVar69;
      sVar10 = pMVar8->elemsize;
      uVar68 = pMVar8[1].w;
      uVar49 = (ulong)uVar68;
      uVar67 = pMVar8[1].h;
      uVar66 = pMVar8[1].c;
      uVar47 = (ulong)uVar66;
      iVar53 = uVar67 * uVar68;
      local_100 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar44 == 1 && uVar69 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar68,local_100,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar68) {
                fVar205 = 1.0 / *pMVar8->data;
                pvVar60 = pMVar1->data;
                lVar63 = 0;
                do {
                  pfVar61 = (float *)((long)pvVar60 + lVar63);
                  fVar30 = pfVar61[1];
                  fVar31 = pfVar61[2];
                  fVar32 = pfVar61[3];
                  pfVar62 = (float *)((long)pvVar45 + lVar63);
                  *pfVar62 = fVar205 * *pfVar61;
                  pfVar62[1] = fVar205 * fVar30;
                  pfVar62[2] = fVar205 * fVar31;
                  pfVar62[3] = fVar205 * fVar32;
                  lVar63 = lVar63 + 0x10;
                  uVar69 = (int)uVar49 - 1;
                  uVar49 = (ulong)uVar69;
                } while (uVar69 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar68,uVar67,local_100,iVar46,opt->blob_allocator);
            pvVar45 = pMVar9->data;
            if (pvVar45 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < iVar53) {
                fVar205 = 1.0 / *pMVar8->data;
                pvVar60 = pMVar1->data;
                lVar63 = 0;
                do {
                  pfVar61 = (float *)((long)pvVar60 + lVar63);
                  fVar30 = pfVar61[1];
                  fVar31 = pfVar61[2];
                  fVar32 = pfVar61[3];
                  pfVar62 = (float *)((long)pvVar45 + lVar63);
                  *pfVar62 = fVar205 * *pfVar61;
                  pfVar62[1] = fVar205 * fVar30;
                  pfVar62[2] = fVar205 * fVar31;
                  pfVar62[3] = fVar205 * fVar32;
                  lVar63 = lVar63 + 0x10;
                  iVar53 = iVar53 + -1;
                } while (iVar53 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar68,uVar67,uVar66,local_100,iVar46,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar66) {
                fVar205 = 1.0 / *pMVar8->data;
                uVar48 = 0;
                do {
                  if (0 < iVar53) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar45 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar60 = pMVar8[1].data;
                    lVar63 = 0;
                    iVar44 = iVar53;
                    do {
                      pfVar61 = (float *)((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar48);
                      auVar212._0_4_ = fVar205 * *pfVar61;
                      auVar212._4_4_ = fVar205 * pfVar61[1];
                      auVar212._8_4_ = fVar205 * pfVar61[2];
                      auVar212._12_4_ = fVar205 * pfVar61[3];
                      *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar48) =
                           auVar212;
                      lVar63 = lVar63 + 0x10;
                      iVar44 = iVar44 + -1;
                    } while (iVar44 != 0);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar47);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar69,sVar10,iVar44,opt->blob_allocator);
          pvVar45 = pMVar9->data;
          if (pvVar45 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if ((int)local_128 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar69) {
              pvVar60 = pMVar8->data;
              pvVar65 = pMVar8[1].data;
              lVar63 = 0;
              do {
                auVar82 = *(undefined1 (*) [16])((long)pvVar60 + lVar63);
                auVar270 = vrcpps_avx(auVar82);
                auVar124 = *(undefined1 (*) [16])((long)pvVar65 + lVar63);
                auVar294._0_4_ = auVar124._0_4_ * auVar270._0_4_;
                auVar294._4_4_ = auVar124._4_4_ * auVar270._4_4_;
                auVar294._8_4_ = auVar124._8_4_ * auVar270._8_4_;
                auVar294._12_4_ = auVar124._12_4_ * auVar270._12_4_;
                auVar82 = vfmsub213ps_fma(auVar82,auVar294,auVar124);
                auVar82 = vfnmadd213ps_fma(auVar82,auVar270,auVar294);
                *(undefined1 (*) [16])((long)pvVar45 + lVar63) = auVar82;
                lVar63 = lVar63 + 0x10;
                uVar69 = (int)uVar48 - 1;
                uVar48 = (ulong)uVar69;
              } while (uVar69 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar69) {
            fVar205 = *pMVar1->data;
            auVar98._4_4_ = fVar205;
            auVar98._0_4_ = fVar205;
            auVar98._8_4_ = fVar205;
            auVar98._12_4_ = fVar205;
            pvVar60 = pMVar8->data;
            lVar63 = 0;
            do {
              auVar82 = *(undefined1 (*) [16])((long)pvVar60 + lVar63);
              auVar124 = vrcpps_avx(auVar82);
              auVar283._0_4_ = fVar205 * auVar124._0_4_;
              auVar283._4_4_ = fVar205 * auVar124._4_4_;
              auVar283._8_4_ = fVar205 * auVar124._8_4_;
              auVar283._12_4_ = fVar205 * auVar124._12_4_;
              auVar82 = vfmsub213ps_fma(auVar82,auVar283,auVar98);
              auVar82 = vfnmadd213ps_fma(auVar82,auVar124,auVar283);
              *(undefined1 (*) [16])((long)pvVar45 + lVar63) = auVar82;
              lVar63 = lVar63 + 0x10;
              uVar69 = (int)uVar48 - 1;
              uVar48 = (ulong)uVar69;
            } while (uVar69 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar68,uVar67,local_100,iVar46,opt->blob_allocator);
          pfVar61 = (float *)pMVar9->data;
          if (pfVar61 == (float *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar67) {
              pauVar52 = (undefined1 (*) [16])pMVar8->data;
              pfVar62 = (float *)pMVar8[1].data;
              uVar69 = 0;
              auVar96._8_4_ = 0x3f800000;
              auVar96._0_8_ = 0x3f8000003f800000;
              auVar96._12_4_ = 0x3f800000;
              do {
                if (0 < (int)uVar68) {
                  auVar82 = vrcpps_avx(*pauVar52);
                  auVar124 = vfmsub213ps_fma(*pauVar52,auVar82,auVar96);
                  auVar82 = vfnmadd132ps_fma(auVar124,auVar82,auVar82);
                  uVar66 = uVar68;
                  do {
                    fVar205 = pfVar62[1];
                    fVar30 = pfVar62[2];
                    fVar31 = pfVar62[3];
                    *pfVar61 = auVar82._0_4_ * *pfVar62;
                    pfVar61[1] = auVar82._4_4_ * fVar205;
                    pfVar61[2] = auVar82._8_4_ * fVar30;
                    pfVar61[3] = auVar82._12_4_ * fVar31;
                    pfVar62 = pfVar62 + 4;
                    pfVar61 = pfVar61 + 4;
                    uVar66 = uVar66 - 1;
                  } while (uVar66 != 0);
                }
                pauVar52 = pauVar52 + 1;
                uVar69 = uVar69 + 1;
              } while (uVar69 != uVar67);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_100,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar66) {
          uVar48 = 0;
          auVar84._8_4_ = 0x3f800000;
          auVar84._0_8_ = 0x3f8000003f800000;
          auVar84._12_4_ = 0x3f800000;
          do {
            if (0 < iVar53) {
              auVar82 = *(undefined1 (*) [16])((long)pMVar8->data + uVar48 * 0x10);
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar8[1].cstep;
              auVar124 = vrcpps_avx(auVar82);
              sVar12 = pMVar9->elemsize;
              auVar82 = vfmsub213ps_fma(auVar82,auVar124,auVar84);
              pvVar45 = pMVar9->data;
              auVar82 = vfnmadd132ps_fma(auVar82,auVar124,auVar124);
              sVar13 = pMVar8[1].elemsize;
              pvVar60 = pMVar8[1].data;
              lVar63 = 0;
              iVar44 = iVar53;
              do {
                pfVar61 = (float *)((long)pvVar60 + lVar63 + sVar11 * sVar13 * uVar48);
                fVar205 = pfVar61[1];
                fVar30 = pfVar61[2];
                fVar31 = pfVar61[3];
                pfVar62 = (float *)((long)pvVar45 + lVar63 + sVar10 * sVar12 * uVar48);
                *pfVar62 = auVar82._0_4_ * *pfVar61;
                pfVar62[1] = auVar82._4_4_ * fVar205;
                pfVar62[2] = auVar82._8_4_ * fVar30;
                pfVar62[3] = auVar82._12_4_ * fVar31;
                lVar63 = lVar63 + 0x10;
                iVar44 = iVar44 + -1;
              } while (iVar44 != 0);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar47);
          return 0;
        }
        return 0;
      }
      uVar6 = pMVar8->h;
      local_118 = (ulong)uVar6;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar6 * uVar69);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar68,uVar67,uVar66,local_100,iVar46,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar66) {
              uVar48 = 0;
              auVar82._8_4_ = 0x3f800000;
              auVar82._0_8_ = 0x3f8000003f800000;
              auVar82._12_4_ = 0x3f800000;
              do {
                if (0 < (int)uVar67) {
                  pfVar61 = (float *)(pMVar9->cstep * uVar48 * pMVar9->elemsize + (long)pMVar9->data
                                     );
                  pfVar62 = (float *)(local_120[1].cstep * uVar48 * local_120[1].elemsize +
                                     (long)local_120[1].data);
                  pauVar52 = (undefined1 (*) [16])
                             ((long)local_120->w * uVar48 * local_120->elemsize +
                             (long)local_120->data);
                  uVar69 = 0;
                  do {
                    if (0 < (int)uVar68) {
                      auVar124 = vrcpps_avx(*pauVar52);
                      auVar270 = vfmsub213ps_fma(*pauVar52,auVar124,auVar82);
                      auVar124 = vfnmadd132ps_fma(auVar270,auVar124,auVar124);
                      uVar66 = uVar68;
                      do {
                        fVar205 = pfVar62[1];
                        fVar30 = pfVar62[2];
                        fVar31 = pfVar62[3];
                        *pfVar61 = auVar124._0_4_ * *pfVar62;
                        pfVar61[1] = auVar124._4_4_ * fVar205;
                        pfVar61[2] = auVar124._8_4_ * fVar30;
                        pfVar61[3] = auVar124._12_4_ * fVar31;
                        pfVar62 = pfVar62 + 4;
                        pfVar61 = pfVar61 + 4;
                        uVar66 = uVar66 - 1;
                      } while (uVar66 != 0);
                    }
                    pauVar52 = pauVar52 + 1;
                    uVar69 = uVar69 + 1;
                  } while (uVar69 != uVar67);
                }
                uVar48 = uVar48 + 1;
              } while (uVar48 != uVar47);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar69,uVar6,sVar10,iVar44,opt->blob_allocator);
        pvVar45 = pMVar9->data;
        if (pvVar45 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar60 = local_120->data;
            pvVar65 = local_120[1].data;
            lVar63 = 0;
            do {
              auVar82 = *(undefined1 (*) [16])((long)pvVar60 + lVar63);
              auVar270 = vrcpps_avx(auVar82);
              auVar124 = *(undefined1 (*) [16])((long)pvVar65 + lVar63);
              auVar278._0_4_ = auVar124._0_4_ * auVar270._0_4_;
              auVar278._4_4_ = auVar124._4_4_ * auVar270._4_4_;
              auVar278._8_4_ = auVar124._8_4_ * auVar270._8_4_;
              auVar278._12_4_ = auVar124._12_4_ * auVar270._12_4_;
              auVar82 = vfmsub213ps_fma(auVar82,auVar278,auVar124);
              auVar82 = vfnmadd213ps_fma(auVar82,auVar270,auVar278);
              *(undefined1 (*) [16])((long)pvVar45 + lVar63) = auVar82;
              lVar63 = lVar63 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar69,(int)local_118,sVar10,iVar44,opt->blob_allocator);
        pauVar52 = (undefined1 (*) [16])pMVar9->data;
        if (pauVar52 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)local_118) {
              pauVar59 = (undefined1 (*) [16])local_120->data;
              pauVar57 = (undefined1 (*) [16])local_120[1].data;
              iVar44 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar82 = *pauVar57;
                  uVar47 = uVar48;
                  do {
                    auVar124 = vrcpps_avx(*pauVar59);
                    auVar296._0_4_ = auVar82._0_4_ * auVar124._0_4_;
                    auVar296._4_4_ = auVar82._4_4_ * auVar124._4_4_;
                    auVar296._8_4_ = auVar82._8_4_ * auVar124._8_4_;
                    auVar296._12_4_ = auVar82._12_4_ * auVar124._12_4_;
                    auVar270 = vfmsub213ps_fma(*pauVar59,auVar296,auVar82);
                    auVar124 = vfnmadd213ps_fma(auVar270,auVar124,auVar296);
                    *pauVar52 = auVar124;
                    pauVar59 = pauVar59 + 1;
                    pauVar52 = pauVar52 + 1;
                    uVar68 = (int)uVar47 - 1;
                    uVar47 = (ulong)uVar68;
                  } while (uVar68 != 0);
                }
                pauVar57 = pauVar57 + 1;
                iVar44 = iVar44 + 1;
              } while (iVar44 != (int)local_118);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            fVar205 = *pMVar1->data;
            auVar124._4_4_ = fVar205;
            auVar124._0_4_ = fVar205;
            auVar124._8_4_ = fVar205;
            auVar124._12_4_ = fVar205;
            pvVar45 = local_120->data;
            lVar63 = 0;
            do {
              auVar82 = *(undefined1 (*) [16])((long)pvVar45 + lVar63);
              auVar270 = vrcpps_avx(auVar82);
              auVar288._0_4_ = fVar205 * auVar270._0_4_;
              auVar288._4_4_ = fVar205 * auVar270._4_4_;
              auVar288._8_4_ = fVar205 * auVar270._8_4_;
              auVar288._12_4_ = fVar205 * auVar270._12_4_;
              auVar82 = vfmsub213ps_fma(auVar82,auVar288,auVar124);
              auVar82 = vfnmadd213ps_fma(auVar82,auVar270,auVar288);
              *(undefined1 (*) [16])((long)*pauVar52 + lVar63) = auVar82;
              lVar63 = lVar63 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar64 = (ulong)uVar7;
      if (pMVar8[1].dims != 3) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (pMVar8[1].dims == 1) {
          if ((int)local_128 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar7) {
              uVar47 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  auVar82 = *(undefined1 (*) [16])((long)local_110->data + uVar47 * 0x10);
                  pvVar45 = pMVar9->data;
                  sVar12 = pMVar8->cstep;
                  sVar13 = pMVar8->elemsize;
                  pvVar60 = pMVar8->data;
                  lVar63 = 0;
                  iVar44 = (int)local_130;
                  do {
                    auVar124 = *(undefined1 (*) [16])
                                ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47);
                    auVar270 = vrcpps_avx(auVar124);
                    auVar292._0_4_ = auVar82._0_4_ * auVar270._0_4_;
                    auVar292._4_4_ = auVar82._4_4_ * auVar270._4_4_;
                    auVar292._8_4_ = auVar82._8_4_ * auVar270._8_4_;
                    auVar292._12_4_ = auVar82._12_4_ * auVar270._12_4_;
                    auVar124 = vfmsub213ps_fma(auVar124,auVar292,auVar82);
                    auVar124 = vfnmadd213ps_fma(auVar124,auVar270,auVar292);
                    *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                         auVar124;
                    lVar63 = lVar63 + 0x10;
                    iVar44 = iVar44 + -1;
                  } while (iVar44 != 0);
                }
                uVar47 = uVar47 + 1;
              } while (uVar47 != uVar64);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar7) {
            fVar205 = *local_110->data;
            auVar126._4_4_ = fVar205;
            auVar126._0_4_ = fVar205;
            auVar126._8_4_ = fVar205;
            auVar126._12_4_ = fVar205;
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar45 = pMVar9->data;
                sVar12 = pMVar8->cstep;
                sVar13 = pMVar8->elemsize;
                pvVar60 = pMVar8->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  auVar82 = *(undefined1 (*) [16])
                             ((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47);
                  auVar124 = vrcpps_avx(auVar82);
                  auVar289._0_4_ = fVar205 * auVar124._0_4_;
                  auVar289._4_4_ = fVar205 * auVar124._4_4_;
                  auVar289._8_4_ = fVar205 * auVar124._8_4_;
                  auVar289._12_4_ = fVar205 * auVar124._12_4_;
                  auVar82 = vfmsub213ps_fma(auVar82,auVar289,auVar126);
                  auVar82 = vfnmadd213ps_fma(auVar82,auVar124,auVar289);
                  *(undefined1 (*) [16])((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47) =
                       auVar82;
                  lVar63 = lVar63 + 0x10;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        if (pMVar8[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar7) {
          uVar47 = 0;
          do {
            if (0 < (int)local_118) {
              pauVar52 = (undefined1 (*) [16])
                         (pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar59 = (undefined1 (*) [16])
                         ((long)pMVar8[1].w * uVar47 * pMVar8[1].elemsize + (long)pMVar8[1].data);
              pauVar57 = (undefined1 (*) [16])
                         (pMVar8->cstep * uVar47 * pMVar8->elemsize + (long)pMVar8->data);
              iVar44 = 0;
              do {
                if (0 < (int)uVar69) {
                  auVar82 = *pauVar59;
                  uVar49 = uVar48;
                  do {
                    auVar124 = vrcpps_avx(*pauVar57);
                    auVar279._0_4_ = auVar82._0_4_ * auVar124._0_4_;
                    auVar279._4_4_ = auVar82._4_4_ * auVar124._4_4_;
                    auVar279._8_4_ = auVar82._8_4_ * auVar124._8_4_;
                    auVar279._12_4_ = auVar82._12_4_ * auVar124._12_4_;
                    auVar270 = vfmsub213ps_fma(*pauVar57,auVar279,auVar82);
                    auVar124 = vfnmadd213ps_fma(auVar270,auVar124,auVar279);
                    *pauVar52 = auVar124;
                    pauVar57 = pauVar57 + 1;
                    pauVar52 = pauVar52 + 1;
                    uVar68 = (int)uVar49 - 1;
                    uVar49 = (ulong)uVar68;
                  } while (uVar68 != 0);
                }
                pauVar59 = pauVar59 + 1;
                iVar44 = iVar44 + 1;
              } while (iVar44 != (int)local_118);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != uVar64);
          return 0;
        }
        return 0;
      }
      local_f8 = sVar10;
      if (uVar66 == uVar7 && (uVar67 == 1 && (uVar68 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                auVar82 = *(undefined1 (*) [16])
                           ((long)pMVar8[1].data + pMVar8[1].cstep * uVar47 * pMVar8[1].elemsize);
                pvVar45 = pMVar8->data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar60 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  auVar124 = *(undefined1 (*) [16])
                              ((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47);
                  auVar270 = vrcpps_avx(auVar124);
                  auVar273._0_4_ = auVar82._0_4_ * auVar270._0_4_;
                  auVar273._4_4_ = auVar82._4_4_ * auVar270._4_4_;
                  auVar273._8_4_ = auVar82._8_4_ * auVar270._8_4_;
                  auVar273._12_4_ = auVar82._12_4_ * auVar270._12_4_;
                  auVar124 = vfmsub213ps_fma(auVar124,auVar273,auVar82);
                  auVar124 = vfnmadd213ps_fma(auVar124,auVar270,auVar273);
                  *(undefined1 (*) [16])((long)pvVar60 + lVar63 + sVar12 * sVar13 * uVar47) =
                       auVar124;
                  lVar63 = lVar63 + 0x10;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar68 == uVar69) && (iVar46 == 1 && (uVar66 == 1 && uVar67 == uVar6))) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar47 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8->data;
                pvVar60 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = (int)local_130;
                do {
                  auVar82 = *(undefined1 (*) [16])
                             ((long)pvVar45 + lVar63 * 4 + sVar10 * sVar11 * uVar47);
                  auVar124 = vrcpps_avx(auVar82);
                  fVar205 = *(float *)((long)pvVar60 + lVar63);
                  auVar270._4_4_ = fVar205;
                  auVar270._0_4_ = fVar205;
                  auVar270._8_4_ = fVar205;
                  auVar270._12_4_ = fVar205;
                  auVar280._0_4_ = fVar205 * auVar124._0_4_;
                  auVar280._4_4_ = fVar205 * auVar124._4_4_;
                  auVar280._8_4_ = fVar205 * auVar124._8_4_;
                  auVar280._12_4_ = fVar205 * auVar124._12_4_;
                  auVar82 = vfmsub213ps_fma(auVar82,auVar280,auVar270);
                  auVar82 = vfnmadd213ps_fma(auVar82,auVar124,auVar280);
                  *(undefined1 (*) [16])((long)pvVar65 + lVar63 * 4 + sVar12 * sVar13 * uVar47) =
                       auVar82;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar64);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar69 ^ 1) == 0) && uVar7 == uVar66) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_100,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            auVar92._8_4_ = 0x3f800000;
            auVar92._0_8_ = 0x3f8000003f800000;
            auVar92._12_4_ = 0x3f800000;
            do {
              if (0 < iVar53) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar9->cstep;
                auVar82 = *(undefined1 (*) [16])
                           ((long)pMVar8->data + pMVar8->cstep * uVar48 * pMVar8->elemsize);
                auVar124 = vrcpps_avx(auVar82);
                sVar12 = pMVar9->elemsize;
                auVar82 = vfmsub213ps_fma(auVar82,auVar124,auVar92);
                pvVar45 = pMVar9->data;
                auVar82 = vfnmadd132ps_fma(auVar82,auVar124,auVar124);
                sVar13 = pMVar8[1].elemsize;
                pvVar60 = pMVar8[1].data;
                lVar63 = 0;
                iVar44 = iVar53;
                do {
                  pfVar61 = (float *)((long)pvVar60 + lVar63 + sVar10 * sVar13 * uVar48);
                  fVar205 = pfVar61[1];
                  fVar30 = pfVar61[2];
                  fVar31 = pfVar61[3];
                  pfVar62 = (float *)((long)pvVar45 + lVar63 + sVar11 * sVar12 * uVar48);
                  *pfVar62 = auVar82._0_4_ * *pfVar61;
                  pfVar62[1] = auVar82._4_4_ * fVar205;
                  pfVar62[2] = auVar82._8_4_ * fVar30;
                  pfVar62[3] = auVar82._12_4_ * fVar31;
                  lVar63 = lVar63 + 0x10;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar68 == uVar69) && (iVar44 == 1)) && (uVar67 == uVar6)) && (uVar7 == 1)) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_100,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar48 = 0;
            do {
              if (0 < iVar53) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar45 = pMVar8[1].data;
                pvVar60 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar65 = pMVar9->data;
                lVar63 = 0;
                iVar44 = iVar53;
                do {
                  fVar205 = 1.0 / *(float *)((long)pvVar60 + lVar63);
                  pfVar61 = (float *)((long)pvVar45 + lVar63 * 4 + sVar10 * sVar11 * uVar48);
                  auVar223._0_4_ = fVar205 * *pfVar61;
                  auVar223._4_4_ = fVar205 * pfVar61[1];
                  auVar223._8_4_ = fVar205 * pfVar61[2];
                  auVar223._12_4_ = fVar205 * pfVar61[3];
                  *(undefined1 (*) [16])((long)pvVar65 + lVar63 * 4 + sVar12 * sVar13 * uVar48) =
                       auVar223;
                  lVar63 = lVar63 + 4;
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar68 ^ 1) == 0 && uVar67 == uVar6) && uVar7 == uVar66) && uVar69 != 1) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar49 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                pvVar45 = pMVar8[1].data;
                pauVar52 = (undefined1 (*) [16])
                           (pMVar9->cstep * uVar49 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar59 = (undefined1 (*) [16])
                           (pMVar8->cstep * uVar49 * pMVar8->elemsize + (long)pMVar8->data);
                uVar64 = 0;
                do {
                  if (0 < (int)uVar69) {
                    auVar82 = *(undefined1 (*) [16])
                               ((long)pvVar45 + uVar64 * 0x10 + sVar10 * uVar49 * sVar11);
                    uVar70 = uVar48;
                    do {
                      auVar124 = vrcpps_avx(*pauVar59);
                      auVar287._0_4_ = auVar82._0_4_ * auVar124._0_4_;
                      auVar287._4_4_ = auVar82._4_4_ * auVar124._4_4_;
                      auVar287._8_4_ = auVar82._8_4_ * auVar124._8_4_;
                      auVar287._12_4_ = auVar82._12_4_ * auVar124._12_4_;
                      auVar270 = vfmsub213ps_fma(*pauVar59,auVar287,auVar82);
                      auVar124 = vfnmadd213ps_fma(auVar270,auVar124,auVar287);
                      *pauVar52 = auVar124;
                      pauVar59 = pauVar59 + 1;
                      pauVar52 = pauVar52 + 1;
                      uVar68 = (int)uVar70 - 1;
                      uVar70 = (ulong)uVar68;
                    } while (uVar68 != 0);
                  }
                  uVar64 = uVar64 + 1;
                } while (uVar64 != local_118);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != uVar47);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_f0 = uVar47;
      if (((uVar67 == 1 && (uVar68 ^ uVar69) == 0) && uVar66 == uVar7) && uVar6 != 1) {
        Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)(uint)local_f0) {
            uVar47 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = local_120[1].elemsize;
                pvVar60 = (void *)(pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar65 = (void *)(local_120->cstep * uVar47 * local_120->elemsize +
                                  (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar45 = local_120[1].data;
                iVar44 = 0;
                do {
                  if (0 < (int)uVar69) {
                    lVar63 = 0;
                    do {
                      auVar124 = vrcpps_avx(*(undefined1 (*) [16])((long)pvVar65 + lVar63));
                      auVar82 = *(undefined1 (*) [16])
                                 ((long)pvVar45 + lVar63 + sVar10 * sVar11 * uVar47);
                      auVar291._0_4_ = auVar82._0_4_ * auVar124._0_4_;
                      auVar291._4_4_ = auVar82._4_4_ * auVar124._4_4_;
                      auVar291._8_4_ = auVar82._8_4_ * auVar124._8_4_;
                      auVar291._12_4_ = auVar82._12_4_ * auVar124._12_4_;
                      auVar82 = vfmsub213ps_fma(*(undefined1 (*) [16])((long)pvVar65 + lVar63),
                                                auVar291,auVar82);
                      auVar82 = vfnmadd213ps_fma(auVar82,auVar124,auVar291);
                      *(undefined1 (*) [16])((long)pvVar60 + lVar63) = auVar82;
                      lVar63 = lVar63 + 0x10;
                    } while (uVar48 << 4 != lVar63);
                    pvVar60 = (void *)((long)pvVar60 + lVar63);
                    pvVar65 = (void *)((long)pvVar65 + lVar63);
                  }
                  iVar44 = iVar44 + 1;
                } while (iVar44 != (int)local_118);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_f0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar69 ^ 1) == 0 && uVar6 == uVar67) && uVar66 == uVar7) && uVar68 != 1) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_100,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)(uint)local_f0) {
            uVar47 = 0;
            auVar130._8_4_ = 0x3f800000;
            auVar130._0_8_ = 0x3f8000003f800000;
            auVar130._12_4_ = 0x3f800000;
            do {
              if (0 < (int)uVar67) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar45 = local_120->data;
                pfVar61 = (float *)(pMVar9->cstep * uVar47 * pMVar9->elemsize + (long)pMVar9->data);
                pfVar62 = (float *)(local_120[1].cstep * uVar47 * local_120[1].elemsize +
                                   (long)local_120[1].data);
                uVar48 = 0;
                do {
                  if (0 < (int)uVar68) {
                    auVar82 = *(undefined1 (*) [16])
                               ((long)pvVar45 + uVar48 * 0x10 + sVar10 * uVar47 * sVar11);
                    auVar124 = vrcpps_avx(auVar82);
                    auVar82 = vfmsub213ps_fma(auVar82,auVar124,auVar130);
                    auVar82 = vfnmadd132ps_fma(auVar82,auVar124,auVar124);
                    uVar69 = uVar68;
                    do {
                      fVar205 = pfVar62[1];
                      fVar30 = pfVar62[2];
                      fVar31 = pfVar62[3];
                      *pfVar61 = auVar82._0_4_ * *pfVar62;
                      pfVar61[1] = auVar82._4_4_ * fVar205;
                      pfVar61[2] = auVar82._8_4_ * fVar30;
                      pfVar61[3] = auVar82._12_4_ * fVar31;
                      pfVar62 = pfVar62 + 4;
                      pfVar61 = pfVar61 + 4;
                      uVar69 = uVar69 - 1;
                    } while (uVar69 != 0);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar67);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_f0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_e8 = uVar64;
      if ((((uVar68 ^ uVar69) == 0 && uVar6 == 1) && uVar7 == uVar66) && uVar67 != 1) {
        Mat::create(pMVar9,uVar68,uVar67,uVar66,local_100,iVar46,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)(uint)local_f0) {
            local_128 = (void *)(uVar49 << 4);
            iVar44 = 0;
            do {
              Mat::channel((Mat *)local_e0,local_120,iVar44);
              auVar43 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar44);
              auVar54 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar44);
              auVar74 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar67) {
                uVar69 = 0;
                do {
                  if (0 < (int)uVar68) {
                    lVar63 = 0;
                    do {
                      auVar124 = vrcpps_avx(*(undefined1 (*) [16])((long)auVar43 + lVar63));
                      auVar82 = *(undefined1 (*) [16])((long)auVar54 + lVar63);
                      auVar298._0_4_ = auVar82._0_4_ * auVar124._0_4_;
                      auVar298._4_4_ = auVar82._4_4_ * auVar124._4_4_;
                      auVar298._8_4_ = auVar82._8_4_ * auVar124._8_4_;
                      auVar298._12_4_ = auVar82._12_4_ * auVar124._12_4_;
                      auVar82 = vfmsub213ps_fma(*(undefined1 (*) [16])((long)auVar43 + lVar63),
                                                auVar298,auVar82);
                      auVar82 = vfnmadd213ps_fma(auVar82,auVar124,auVar298);
                      *(undefined1 (*) [16])((long)auVar74 + lVar63) = auVar82;
                      lVar63 = lVar63 + 0x10;
                    } while (local_128 != (void *)lVar63);
                    auVar74 = (undefined1  [8])((long)auVar74 + lVar63);
                    auVar54 = (undefined1  [8])((long)auVar54 + lVar63);
                  }
                  uVar69 = uVar69 + 1;
                } while (uVar69 != uVar67);
              }
              iVar44 = iVar44 + 1;
            } while (iVar44 != (int)local_f0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(pMVar9,uVar69,uVar6,uVar7,sVar10,iVar44,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)(uint)local_e8) {
          iVar44 = 0;
          do {
            pMVar9 = local_108;
            Mat::channel((Mat *)local_e0,local_120,iVar44);
            auVar43 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar44);
            auVar54 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar44);
            auVar74 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_130) {
              lVar63 = 0;
              iVar46 = (int)local_130;
              do {
                auVar124 = vrcpps_avx(*(undefined1 (*) [16])((long)auVar43 + lVar63));
                auVar82 = *(undefined1 (*) [16])((long)auVar54 + lVar63);
                auVar300._0_4_ = auVar82._0_4_ * auVar124._0_4_;
                auVar300._4_4_ = auVar82._4_4_ * auVar124._4_4_;
                auVar300._8_4_ = auVar82._8_4_ * auVar124._8_4_;
                auVar300._12_4_ = auVar82._12_4_ * auVar124._12_4_;
                auVar82 = vfmsub213ps_fma(*(undefined1 (*) [16])((long)auVar43 + lVar63),auVar300,
                                          auVar82);
                auVar82 = vfnmadd213ps_fma(auVar82,auVar124,auVar300);
                *(undefined1 (*) [16])((long)auVar74 + lVar63) = auVar82;
                lVar63 = lVar63 + 0x10;
                iVar46 = iVar46 + -1;
              } while (iVar46 != 0);
            }
            iVar44 = iVar44 + 1;
          } while (iVar44 != (uint)local_e8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
  }
  iVar44 = BinaryOp::forward((BinaryOp *)
                             ((long)&this->_vptr_BinaryOp_x86_avx2 +
                             (long)this->_vptr_BinaryOp_x86_avx2[-3]),bottom_blobs,top_blobs,opt);
  return iVar44;
}

Assistant:

int BinaryOp_x86_avx2::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if __SSE2__
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int elempack = bottom_blob.elempack;
    int elempack1 = bottom_blob1.elempack;

#if __AVX__
    if (elempack == 8 || elempack1 == 8)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack8<binary_op_add_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack8<binary_op_sub_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack8<binary_op_mul_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack8<binary_op_div_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack8<binary_op_max_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack8<binary_op_min_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack8<binary_op_pow_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack8<binary_op_rsub_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack8<binary_op_rdiv_pack8>(bottom_blob, bottom_blob1, top_blob, opt);
    }
#endif // __AVX__

    if (elempack == 4 || elempack1 == 4)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack4<binary_op_add_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack4<binary_op_sub_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack4<binary_op_mul_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack4<binary_op_div_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack4<binary_op_max_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack4<binary_op_min_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack4<binary_op_pow_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack4<binary_op_rsub_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack4<binary_op_rdiv_pack4>(bottom_blob, bottom_blob1, top_blob, opt);
    }
#endif // __SSE2__

    return BinaryOp::forward(bottom_blobs, top_blobs, opt);
}